

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O3

void cdef_filter_8_0_sse4_1
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int iVar18;
  undefined1 auVar19 [16];
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  bool bVar30;
  short sVar31;
  short sVar33;
  ushort uVar47;
  short sVar49;
  ushort uVar50;
  short sVar52;
  ushort uVar53;
  short sVar55;
  ushort uVar56;
  ushort uVar60;
  ushort uVar65;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  ushort uVar32;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  short sVar48;
  short sVar51;
  short sVar54;
  undefined1 auVar46 [16];
  short sVar76;
  short sVar94;
  short sVar96;
  short sVar98;
  short sVar100;
  short sVar102;
  short sVar104;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  short sVar95;
  short sVar97;
  short sVar99;
  short sVar101;
  short sVar103;
  short sVar105;
  short sVar106;
  short sVar107;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  byte bVar122;
  byte bVar123;
  byte bVar142;
  byte bVar143;
  ushort uVar124;
  byte bVar144;
  byte bVar149;
  byte bVar150;
  ushort uVar146;
  byte bVar151;
  byte bVar156;
  byte bVar157;
  ushort uVar153;
  byte bVar158;
  byte bVar163;
  byte bVar164;
  ushort uVar160;
  byte bVar165;
  byte bVar170;
  byte bVar171;
  ushort uVar167;
  byte bVar172;
  byte bVar177;
  byte bVar178;
  ushort uVar174;
  byte bVar179;
  byte bVar184;
  byte bVar185;
  ushort uVar182;
  byte bVar186;
  undefined1 in_XMM3 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  byte bVar145;
  byte bVar152;
  byte bVar159;
  byte bVar166;
  byte bVar173;
  byte bVar180;
  byte bVar187;
  byte bVar191;
  byte bVar192;
  ushort uVar190;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  ushort uVar214;
  short sVar215;
  ushort uVar235;
  ushort uVar237;
  ushort uVar239;
  ushort uVar241;
  ushort uVar243;
  ushort uVar245;
  undefined1 in_XMM5 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  byte bVar250;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  ushort uVar247;
  ushort uVar248;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  short sVar236;
  short sVar238;
  short sVar240;
  short sVar242;
  short sVar244;
  short sVar246;
  short sVar249;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  byte bVar251;
  byte bVar263;
  byte bVar264;
  byte bVar265;
  byte bVar266;
  byte bVar267;
  byte bVar268;
  byte bVar269;
  byte bVar270;
  byte bVar271;
  byte bVar272;
  byte bVar273;
  byte bVar274;
  byte bVar275;
  byte bVar276;
  undefined1 in_XMM6 [16];
  undefined1 auVar252 [16];
  byte bVar277;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  short sVar278;
  short sVar290;
  short sVar291;
  short sVar292;
  byte bVar293;
  short sVar295;
  byte bVar298;
  short sVar300;
  byte bVar303;
  short sVar305;
  byte bVar308;
  undefined1 in_XMM7 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  short sVar310;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  byte bVar296;
  byte bVar301;
  byte bVar306;
  byte bVar311;
  undefined1 auVar284 [16];
  byte bVar294;
  byte bVar297;
  byte bVar299;
  byte bVar302;
  byte bVar304;
  byte bVar307;
  byte bVar309;
  byte bVar312;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  byte bVar313;
  byte bVar325;
  byte bVar326;
  byte bVar327;
  byte bVar328;
  byte bVar329;
  byte bVar330;
  byte bVar331;
  byte bVar332;
  byte bVar333;
  byte bVar334;
  byte bVar335;
  byte bVar336;
  byte bVar337;
  byte bVar338;
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  byte bVar339;
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  short sVar340;
  short sVar341;
  short sVar354;
  short sVar355;
  short sVar356;
  short sVar357;
  short sVar358;
  short sVar359;
  short sVar361;
  short sVar362;
  short sVar364;
  short sVar365;
  short sVar367;
  short sVar368;
  undefined1 in_XMM9 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  short sVar370;
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  short sVar371;
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  byte bVar382;
  ushort uVar383;
  byte bVar390;
  ushort uVar391;
  byte bVar393;
  ushort uVar394;
  byte bVar396;
  ushort uVar397;
  byte bVar399;
  ushort uVar400;
  byte bVar403;
  ushort uVar404;
  byte bVar407;
  ushort uVar408;
  byte bVar411;
  undefined1 auVar384 [16];
  byte bVar389;
  byte bVar392;
  byte bVar395;
  byte bVar398;
  byte bVar402;
  byte bVar406;
  byte bVar410;
  ushort uVar412;
  byte bVar414;
  undefined1 auVar385 [16];
  ushort uVar401;
  ushort uVar405;
  ushort uVar409;
  ushort uVar413;
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  short sVar415;
  short sVar423;
  short sVar424;
  short sVar425;
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  short sVar426;
  ulong uVar427;
  short sVar434;
  short sVar435;
  short sVar436;
  short sVar437;
  short sVar438;
  short sVar439;
  short sVar440;
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  ushort uVar448;
  ushort uVar449;
  ushort uVar453;
  ushort uVar454;
  ushort uVar455;
  ushort uVar456;
  ushort uVar457;
  ushort uVar458;
  ushort uVar459;
  ushort uVar460;
  ushort uVar461;
  ushort uVar462;
  ushort uVar463;
  ushort uVar464;
  ushort uVar465;
  ushort uVar466;
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  byte local_1f8;
  byte bStack_1f7;
  byte bStack_1f6;
  byte bStack_1f5;
  byte bStack_1f4;
  byte bStack_1f3;
  byte bStack_1f2;
  byte bStack_1f1;
  byte bStack_1f0;
  byte bStack_1ef;
  byte bStack_1ee;
  byte bStack_1ed;
  byte bStack_1ec;
  byte bStack_1eb;
  byte bStack_1ea;
  byte bStack_1e9;
  undefined1 local_1d8 [16];
  ulong local_1c8;
  ulong local_1b8;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_168 [16];
  undefined1 local_148 [16];
  undefined1 local_108 [16];
  undefined1 local_e8 [16];
  short local_d8;
  short sStack_d6;
  short local_c8;
  short sStack_c6;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short local_a8;
  short sStack_a6;
  undefined8 local_98;
  undefined1 local_88 [16];
  undefined2 uStack_74;
  undefined2 uStack_72;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  short sVar75;
  short sVar125;
  short sVar126;
  short sVar147;
  short sVar148;
  short sVar154;
  short sVar155;
  short sVar161;
  short sVar162;
  short sVar168;
  short sVar169;
  short sVar175;
  short sVar176;
  short sVar181;
  short sVar183;
  short sVar188;
  short sVar189;
  short sVar193;
  short sVar207;
  short sVar208;
  short sVar209;
  short sVar210;
  short sVar211;
  short sVar212;
  short sVar213;
  short sVar360;
  short sVar363;
  short sVar366;
  short sVar369;
  
  bVar30 = ((uint)pri_strength >> (coeff_shift & 0x1fU) & 1) != 0;
  lVar27 = (long)dir;
  lVar23 = (long)cdef_directions_padded[lVar27 + 2][0];
  lVar24 = (long)cdef_directions_padded[lVar27 + 2][1];
  lVar25 = (long)cdef_directions_padded[lVar27 + 4][0];
  lVar26 = (long)cdef_directions_padded[lVar27 + 4][1];
  lVar22 = (long)cdef_directions_padded[lVar27][0];
  lVar27 = (long)cdef_directions_padded[lVar27][1];
  if (block_width == 8) {
    local_88._0_4_ = pri_damping;
    if (pri_strength != 0) {
      iVar18 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar18 == 0; iVar18 = iVar18 + -1) {
        }
      }
      local_88._0_4_ = pri_damping - iVar18;
      if (pri_damping < iVar18) {
        local_88._0_4_ = 0;
      }
    }
    uVar28 = sec_damping;
    if (sec_strength != 0) {
      iVar18 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar18 == 0; iVar18 = iVar18 + -1) {
        }
      }
      uVar28 = sec_damping - iVar18;
      if (sec_damping < iVar18) {
        uVar28 = 0;
      }
    }
    if (0 < block_height) {
      auVar34 = pshuflw(ZEXT416((uint)pri_strength),ZEXT416((uint)pri_strength),0);
      uStack_74 = auVar34._0_2_;
      uStack_72 = auVar34._2_2_;
      auVar35 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar30][0]),
                        ZEXT416((uint)cdef_pri_taps[bVar30][0]),0);
      auVar36 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar30][1]),
                        ZEXT416((uint)cdef_pri_taps[bVar30][1]),0);
      auVar37 = pshuflw(ZEXT416((uint)sec_strength),ZEXT416((uint)sec_strength),0);
      local_108._4_4_ = auVar37._0_4_;
      local_108._0_4_ = local_108._4_4_;
      local_108._8_4_ = local_108._4_4_;
      local_108._12_4_ = local_108._4_4_;
      auVar37 = pshuflw(ZEXT416((uint)2),ZEXT416((uint)2),0);
      local_b8 = auVar37._0_2_;
      sStack_b6 = auVar37._2_2_;
      auVar37 = pshuflw(ZEXT416((uint)1),ZEXT416((uint)1),0);
      uVar20 = 0;
      do {
        auVar46 = *(undefined1 (*) [16])in;
        auVar85 = *(undefined1 (*) [16])((long)in + 0x120);
        auVar252 = lddqu(in_XMM6,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar23 * 2));
        auVar127 = lddqu(in_XMM3,*(undefined1 (*) [16])
                                  (*(undefined1 (*) [16])((long)in + 0x120) + lVar23 * 2));
        auVar342 = lddqu(in_XMM9,*(undefined1 (*) [16])((long)in + lVar23 * -2));
        auVar194 = lddqu(in_XMM4,*(undefined1 (*) [16])((long)in + lVar23 * -2 + 0x120));
        sVar97 = auVar252._0_2_;
        sVar340 = auVar46._0_2_;
        auVar108._0_2_ = sVar97 - sVar340;
        sVar359 = auVar252._2_2_;
        sVar354 = auVar46._2_2_;
        auVar108._2_2_ = sVar359 - sVar354;
        sVar98 = auVar252._4_2_;
        sVar356 = auVar46._4_2_;
        auVar108._4_2_ = sVar98 - sVar356;
        sVar99 = auVar252._6_2_;
        sVar358 = auVar46._6_2_;
        auVar108._6_2_ = sVar99 - sVar358;
        sVar362 = auVar252._8_2_;
        sVar361 = auVar46._8_2_;
        auVar108._8_2_ = sVar362 - sVar361;
        sVar100 = auVar252._10_2_;
        sVar364 = auVar46._10_2_;
        auVar108._10_2_ = sVar100 - sVar364;
        sVar101 = auVar252._12_2_;
        sVar365 = auVar252._14_2_;
        sVar367 = auVar46._12_2_;
        auVar108._12_2_ = sVar101 - sVar367;
        sVar370 = auVar46._14_2_;
        auVar108._14_2_ = sVar365 - sVar370;
        sVar215 = auVar85._0_2_;
        sVar102 = auVar127._0_2_;
        auVar128._0_2_ = sVar102 - sVar215;
        sVar236 = auVar85._2_2_;
        sVar104 = auVar127._2_2_;
        auVar128._2_2_ = sVar104 - sVar236;
        sVar238 = auVar85._4_2_;
        sVar106 = auVar127._4_2_;
        auVar128._4_2_ = sVar106 - sVar238;
        sVar240 = auVar85._6_2_;
        sVar126 = auVar127._6_2_;
        auVar128._6_2_ = sVar126 - sVar240;
        sVar242 = auVar85._8_2_;
        sVar154 = auVar127._8_2_;
        auVar128._8_2_ = sVar154 - sVar242;
        sVar244 = auVar85._10_2_;
        sVar162 = auVar127._10_2_;
        auVar128._10_2_ = sVar162 - sVar244;
        sVar246 = auVar85._12_2_;
        sVar175 = auVar127._12_2_;
        sVar183 = auVar127._14_2_;
        auVar128._12_2_ = sVar175 - sVar246;
        sVar249 = auVar85._14_2_;
        auVar128._14_2_ = sVar183 - sVar249;
        auVar216 = pabsw(in_XMM5,auVar108);
        auVar109 = psraw(auVar108,0xf);
        auVar279 = pabsw(in_XMM7,auVar128);
        auVar129 = psraw(auVar128,0xf);
        local_88._4_4_ = 0;
        uVar32 = auVar216._0_2_;
        auVar38._0_2_ = uVar32 >> local_88._0_8_;
        uVar47 = auVar216._2_2_;
        auVar38._2_2_ = uVar47 >> local_88._0_8_;
        uVar50 = auVar216._4_2_;
        auVar38._4_2_ = uVar50 >> local_88._0_8_;
        uVar53 = auVar216._6_2_;
        auVar38._6_2_ = uVar53 >> local_88._0_8_;
        uVar448 = auVar216._8_2_;
        auVar38._8_2_ = uVar448 >> local_88._0_8_;
        uVar56 = auVar216._10_2_;
        auVar38._10_2_ = uVar56 >> local_88._0_8_;
        uVar60 = auVar216._12_2_;
        uVar65 = auVar216._14_2_;
        auVar38._12_2_ = uVar60 >> local_88._0_8_;
        auVar38._14_2_ = uVar65 >> local_88._0_8_;
        uVar453 = auVar279._0_2_;
        auVar314._0_2_ = uVar453 >> local_88._0_8_;
        uVar70 = auVar279._2_2_;
        auVar314._2_2_ = uVar70 >> local_88._0_8_;
        uVar455 = auVar279._4_2_;
        auVar314._4_2_ = uVar455 >> local_88._0_8_;
        uVar457 = auVar279._6_2_;
        auVar314._6_2_ = uVar457 >> local_88._0_8_;
        uVar459 = auVar279._8_2_;
        auVar314._8_2_ = uVar459 >> local_88._0_8_;
        uVar461 = auVar279._10_2_;
        auVar314._10_2_ = uVar461 >> local_88._0_8_;
        uVar463 = auVar279._12_2_;
        uVar465 = auVar279._14_2_;
        auVar314._12_2_ = uVar463 >> local_88._0_8_;
        auVar314._14_2_ = uVar465 >> local_88._0_8_;
        auVar19._4_2_ = uStack_74;
        auVar19._0_4_ = auVar34._0_4_;
        auVar19._6_2_ = uStack_72;
        auVar19._8_2_ = uStack_74;
        auVar19._10_2_ = uStack_72;
        auVar19._12_2_ = uStack_74;
        auVar19._14_2_ = uStack_72;
        auVar279 = psubusw(auVar19,auVar38);
        auVar216 = psubusw(auVar19,auVar314);
        sVar341 = auVar279._0_2_;
        sVar75 = auVar279._2_2_;
        sVar76 = auVar279._4_2_;
        sVar355 = auVar279._6_2_;
        sVar94 = auVar279._8_2_;
        sVar95 = auVar279._10_2_;
        sVar357 = auVar279._12_2_;
        sVar96 = auVar279._14_2_;
        sVar31 = auVar216._0_2_;
        sVar33 = auVar216._2_2_;
        sVar48 = auVar216._4_2_;
        sVar49 = auVar216._6_2_;
        sVar51 = auVar216._8_2_;
        sVar52 = auVar216._10_2_;
        sVar54 = auVar216._12_2_;
        sVar55 = auVar216._14_2_;
        auVar77._0_2_ =
             (((short)uVar32 < sVar341) * uVar32 | (ushort)((short)uVar32 >= sVar341) * sVar341) +
             auVar109._0_2_;
        auVar77._2_2_ =
             (((short)uVar47 < sVar75) * uVar47 | (ushort)((short)uVar47 >= sVar75) * sVar75) +
             auVar109._2_2_;
        auVar77._4_2_ =
             (((short)uVar50 < sVar76) * uVar50 | (ushort)((short)uVar50 >= sVar76) * sVar76) +
             auVar109._4_2_;
        auVar77._6_2_ =
             (((short)uVar53 < sVar355) * uVar53 | (ushort)((short)uVar53 >= sVar355) * sVar355) +
             auVar109._6_2_;
        auVar77._8_2_ =
             (((short)uVar448 < sVar94) * uVar448 | (ushort)((short)uVar448 >= sVar94) * sVar94) +
             auVar109._8_2_;
        auVar77._10_2_ =
             (((short)uVar56 < sVar95) * uVar56 | (ushort)((short)uVar56 >= sVar95) * sVar95) +
             auVar109._10_2_;
        auVar77._12_2_ =
             (((short)uVar60 < sVar357) * uVar60 | (ushort)((short)uVar60 >= sVar357) * sVar357) +
             auVar109._12_2_;
        auVar77._14_2_ =
             (((short)uVar65 < sVar96) * uVar65 | (ushort)((short)uVar65 >= sVar96) * sVar96) +
             auVar109._14_2_;
        auVar39._0_2_ =
             (((short)uVar453 < sVar31) * uVar453 | (ushort)((short)uVar453 >= sVar31) * sVar31) +
             auVar129._0_2_;
        auVar39._2_2_ =
             (((short)uVar70 < sVar33) * uVar70 | (ushort)((short)uVar70 >= sVar33) * sVar33) +
             auVar129._2_2_;
        auVar39._4_2_ =
             (((short)uVar455 < sVar48) * uVar455 | (ushort)((short)uVar455 >= sVar48) * sVar48) +
             auVar129._4_2_;
        auVar39._6_2_ =
             (((short)uVar457 < sVar49) * uVar457 | (ushort)((short)uVar457 >= sVar49) * sVar49) +
             auVar129._6_2_;
        auVar39._8_2_ =
             (((short)uVar459 < sVar51) * uVar459 | (ushort)((short)uVar459 >= sVar51) * sVar51) +
             auVar129._8_2_;
        auVar39._10_2_ =
             (((short)uVar461 < sVar52) * uVar461 | (ushort)((short)uVar461 >= sVar52) * sVar52) +
             auVar129._10_2_;
        auVar39._12_2_ =
             (((short)uVar463 < sVar54) * uVar463 | (ushort)((short)uVar463 >= sVar54) * sVar54) +
             auVar129._12_2_;
        auVar39._14_2_ =
             (((short)uVar465 < sVar55) * uVar465 | (ushort)((short)uVar465 >= sVar55) * sVar55) +
             auVar129._14_2_;
        auVar77 = auVar77 ^ auVar109;
        auVar39 = auVar39 ^ auVar129;
        sVar103 = auVar342._0_2_;
        auVar130._0_2_ = sVar103 - sVar340;
        sVar105 = auVar342._2_2_;
        auVar130._2_2_ = sVar105 - sVar354;
        sVar107 = auVar342._4_2_;
        auVar130._4_2_ = sVar107 - sVar356;
        sVar147 = auVar342._6_2_;
        auVar130._6_2_ = sVar147 - sVar358;
        sVar155 = auVar342._8_2_;
        auVar130._8_2_ = sVar155 - sVar361;
        sVar168 = auVar342._10_2_;
        auVar130._10_2_ = sVar168 - sVar364;
        sVar176 = auVar342._12_2_;
        sVar188 = auVar342._14_2_;
        auVar130._12_2_ = sVar176 - sVar367;
        auVar130._14_2_ = sVar188 - sVar370;
        sVar193 = auVar194._0_2_;
        auVar280._0_2_ = sVar193 - sVar215;
        sVar208 = auVar194._2_2_;
        auVar280._2_2_ = sVar208 - sVar236;
        sVar210 = auVar194._4_2_;
        auVar280._4_2_ = sVar210 - sVar238;
        sVar212 = auVar194._6_2_;
        auVar280._6_2_ = sVar212 - sVar240;
        sVar278 = auVar194._8_2_;
        auVar280._8_2_ = sVar278 - sVar242;
        sVar291 = auVar194._10_2_;
        auVar280._10_2_ = sVar291 - sVar244;
        sVar295 = auVar194._12_2_;
        sVar305 = auVar194._14_2_;
        auVar280._12_2_ = sVar295 - sVar246;
        auVar280._14_2_ = sVar305 - sVar249;
        auVar315 = pabsw(auVar314,auVar130);
        auVar279 = psraw(auVar130,0xf);
        auVar343 = pabsw(auVar342,auVar280);
        auVar129 = psraw(auVar280,0xf);
        uVar32 = auVar315._0_2_;
        auVar217._0_2_ = uVar32 >> local_88._0_8_;
        uVar47 = auVar315._2_2_;
        auVar217._2_2_ = uVar47 >> local_88._0_8_;
        uVar50 = auVar315._4_2_;
        auVar217._4_2_ = uVar50 >> local_88._0_8_;
        uVar53 = auVar315._6_2_;
        auVar217._6_2_ = uVar53 >> local_88._0_8_;
        uVar448 = auVar315._8_2_;
        auVar217._8_2_ = uVar448 >> local_88._0_8_;
        uVar56 = auVar315._10_2_;
        auVar217._10_2_ = uVar56 >> local_88._0_8_;
        uVar60 = auVar315._12_2_;
        uVar65 = auVar315._14_2_;
        auVar217._12_2_ = uVar60 >> local_88._0_8_;
        auVar217._14_2_ = uVar65 >> local_88._0_8_;
        uVar453 = auVar343._0_2_;
        auVar372._0_2_ = uVar453 >> local_88._0_8_;
        uVar70 = auVar343._2_2_;
        auVar372._2_2_ = uVar70 >> local_88._0_8_;
        uVar455 = auVar343._4_2_;
        auVar372._4_2_ = uVar455 >> local_88._0_8_;
        uVar457 = auVar343._6_2_;
        auVar372._6_2_ = uVar457 >> local_88._0_8_;
        uVar459 = auVar343._8_2_;
        auVar372._8_2_ = uVar459 >> local_88._0_8_;
        uVar461 = auVar343._10_2_;
        auVar372._10_2_ = uVar461 >> local_88._0_8_;
        uVar463 = auVar343._12_2_;
        uVar465 = auVar343._14_2_;
        auVar372._12_2_ = uVar463 >> local_88._0_8_;
        auVar372._14_2_ = uVar465 >> local_88._0_8_;
        auVar216 = psubusw(auVar19,auVar217);
        auVar109 = psubusw(auVar19,auVar372);
        sVar31 = auVar216._0_2_;
        sVar33 = auVar216._2_2_;
        sVar48 = auVar216._4_2_;
        sVar49 = auVar216._6_2_;
        sVar51 = auVar216._8_2_;
        sVar52 = auVar216._10_2_;
        sVar54 = auVar216._12_2_;
        sVar55 = auVar216._14_2_;
        sVar341 = auVar109._0_2_;
        sVar75 = auVar109._2_2_;
        sVar76 = auVar109._4_2_;
        sVar355 = auVar109._6_2_;
        sVar94 = auVar109._8_2_;
        sVar95 = auVar109._10_2_;
        sVar357 = auVar109._12_2_;
        sVar96 = auVar109._14_2_;
        auVar110._0_2_ =
             (((short)uVar32 < sVar31) * uVar32 | (ushort)((short)uVar32 >= sVar31) * sVar31) +
             auVar279._0_2_;
        auVar110._2_2_ =
             (((short)uVar47 < sVar33) * uVar47 | (ushort)((short)uVar47 >= sVar33) * sVar33) +
             auVar279._2_2_;
        auVar110._4_2_ =
             (((short)uVar50 < sVar48) * uVar50 | (ushort)((short)uVar50 >= sVar48) * sVar48) +
             auVar279._4_2_;
        auVar110._6_2_ =
             (((short)uVar53 < sVar49) * uVar53 | (ushort)((short)uVar53 >= sVar49) * sVar49) +
             auVar279._6_2_;
        auVar110._8_2_ =
             (((short)uVar448 < sVar51) * uVar448 | (ushort)((short)uVar448 >= sVar51) * sVar51) +
             auVar279._8_2_;
        auVar110._10_2_ =
             (((short)uVar56 < sVar52) * uVar56 | (ushort)((short)uVar56 >= sVar52) * sVar52) +
             auVar279._10_2_;
        auVar110._12_2_ =
             (((short)uVar60 < sVar54) * uVar60 | (ushort)((short)uVar60 >= sVar54) * sVar54) +
             auVar279._12_2_;
        auVar110._14_2_ =
             (((short)uVar65 < sVar55) * uVar65 | (ushort)((short)uVar65 >= sVar55) * sVar55) +
             auVar279._14_2_;
        auVar218._0_2_ =
             (((short)uVar453 < sVar341) * uVar453 | (ushort)((short)uVar453 >= sVar341) * sVar341)
             + auVar129._0_2_;
        auVar218._2_2_ =
             (((short)uVar70 < sVar75) * uVar70 | (ushort)((short)uVar70 >= sVar75) * sVar75) +
             auVar129._2_2_;
        auVar218._4_2_ =
             (((short)uVar455 < sVar76) * uVar455 | (ushort)((short)uVar455 >= sVar76) * sVar76) +
             auVar129._4_2_;
        auVar218._6_2_ =
             (((short)uVar457 < sVar355) * uVar457 | (ushort)((short)uVar457 >= sVar355) * sVar355)
             + auVar129._6_2_;
        auVar218._8_2_ =
             (((short)uVar459 < sVar94) * uVar459 | (ushort)((short)uVar459 >= sVar94) * sVar94) +
             auVar129._8_2_;
        auVar218._10_2_ =
             (((short)uVar461 < sVar95) * uVar461 | (ushort)((short)uVar461 >= sVar95) * sVar95) +
             auVar129._10_2_;
        auVar218._12_2_ =
             (((short)uVar463 < sVar357) * uVar463 | (ushort)((short)uVar463 >= sVar357) * sVar357)
             + auVar129._12_2_;
        auVar218._14_2_ =
             (((short)uVar465 < sVar96) * uVar465 | (ushort)((short)uVar465 >= sVar96) * sVar96) +
             auVar129._14_2_;
        auVar110 = auVar110 ^ auVar279;
        auVar218 = auVar218 ^ auVar129;
        auVar216 = lddqu(auVar39,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar24 * 2));
        auVar109 = lddqu(auVar77,*(undefined1 (*) [16])
                                  (*(undefined1 (*) [16])((long)in + 0x120) + lVar24 * 2));
        sVar31 = auVar216._0_2_;
        auVar40._0_2_ = sVar31 - sVar340;
        sVar33 = auVar216._2_2_;
        auVar40._2_2_ = sVar33 - sVar354;
        sVar48 = auVar216._4_2_;
        auVar40._4_2_ = sVar48 - sVar356;
        sVar49 = auVar216._6_2_;
        auVar40._6_2_ = sVar49 - sVar358;
        sVar51 = auVar216._8_2_;
        auVar40._8_2_ = sVar51 - sVar361;
        sVar52 = auVar216._10_2_;
        auVar40._10_2_ = sVar52 - sVar364;
        sVar54 = auVar216._12_2_;
        sVar55 = auVar216._14_2_;
        auVar40._12_2_ = sVar54 - sVar367;
        auVar40._14_2_ = sVar55 - sVar370;
        sVar368 = auVar109._0_2_;
        auVar131._0_2_ = sVar368 - sVar215;
        sVar371 = auVar109._2_2_;
        auVar131._2_2_ = sVar371 - sVar236;
        sVar125 = auVar109._4_2_;
        auVar131._4_2_ = sVar125 - sVar238;
        sVar148 = auVar109._6_2_;
        auVar131._6_2_ = sVar148 - sVar240;
        sVar161 = auVar109._8_2_;
        auVar131._8_2_ = sVar161 - sVar242;
        sVar169 = auVar109._10_2_;
        auVar131._10_2_ = sVar169 - sVar244;
        sVar181 = auVar109._12_2_;
        sVar189 = auVar109._14_2_;
        auVar131._12_2_ = sVar181 - sVar246;
        auVar131._14_2_ = sVar189 - sVar249;
        auVar279 = pabsw(auVar315,auVar40);
        auVar315 = pabsw(auVar343,auVar131);
        uVar32 = auVar279._0_2_;
        auVar78._0_2_ = uVar32 >> local_88._0_8_;
        uVar47 = auVar279._2_2_;
        auVar78._2_2_ = uVar47 >> local_88._0_8_;
        uVar50 = auVar279._4_2_;
        auVar78._4_2_ = uVar50 >> local_88._0_8_;
        uVar53 = auVar279._6_2_;
        auVar78._6_2_ = uVar53 >> local_88._0_8_;
        uVar448 = auVar279._8_2_;
        auVar78._8_2_ = uVar448 >> local_88._0_8_;
        uVar56 = auVar279._10_2_;
        auVar78._10_2_ = uVar56 >> local_88._0_8_;
        uVar60 = auVar279._12_2_;
        uVar65 = auVar279._14_2_;
        auVar78._12_2_ = uVar60 >> local_88._0_8_;
        auVar78._14_2_ = uVar65 >> local_88._0_8_;
        auVar129 = psubusw(auVar19,auVar78);
        uVar453 = auVar315._0_2_;
        auVar373._0_2_ = uVar453 >> local_88._0_8_;
        uVar70 = auVar315._2_2_;
        auVar373._2_2_ = uVar70 >> local_88._0_8_;
        uVar455 = auVar315._4_2_;
        auVar373._4_2_ = uVar455 >> local_88._0_8_;
        uVar457 = auVar315._6_2_;
        auVar373._6_2_ = uVar457 >> local_88._0_8_;
        uVar459 = auVar315._8_2_;
        auVar373._8_2_ = uVar459 >> local_88._0_8_;
        uVar461 = auVar315._10_2_;
        auVar373._10_2_ = uVar461 >> local_88._0_8_;
        uVar463 = auVar315._12_2_;
        uVar465 = auVar315._14_2_;
        auVar373._12_2_ = uVar463 >> local_88._0_8_;
        auVar373._14_2_ = uVar465 >> local_88._0_8_;
        auVar279 = psubusw(auVar19,auVar373);
        sVar207 = auVar129._0_2_;
        sVar209 = auVar129._2_2_;
        sVar211 = auVar129._4_2_;
        sVar213 = auVar129._6_2_;
        sVar290 = auVar129._8_2_;
        sVar292 = auVar129._10_2_;
        sVar300 = auVar129._12_2_;
        sVar310 = auVar129._14_2_;
        auVar315 = lddqu(auVar85,*(undefined1 (*) [16])((long)in + lVar24 * -2));
        sVar341 = auVar279._0_2_;
        sVar75 = auVar279._2_2_;
        sVar76 = auVar279._4_2_;
        sVar355 = auVar279._6_2_;
        sVar94 = auVar279._8_2_;
        sVar95 = auVar279._10_2_;
        sVar357 = auVar279._12_2_;
        sVar96 = auVar279._14_2_;
        auVar343 = lddqu(auVar373,*(undefined1 (*) [16])((long)in + lVar24 * -2 + 0x120));
        auVar279 = psraw(auVar40,0xf);
        auVar129 = psraw(auVar131,0xf);
        auVar281._0_2_ =
             (((short)uVar32 < sVar207) * uVar32 | (ushort)((short)uVar32 >= sVar207) * sVar207) +
             auVar279._0_2_;
        auVar281._2_2_ =
             (((short)uVar47 < sVar209) * uVar47 | (ushort)((short)uVar47 >= sVar209) * sVar209) +
             auVar279._2_2_;
        auVar281._4_2_ =
             (((short)uVar50 < sVar211) * uVar50 | (ushort)((short)uVar50 >= sVar211) * sVar211) +
             auVar279._4_2_;
        auVar281._6_2_ =
             (((short)uVar53 < sVar213) * uVar53 | (ushort)((short)uVar53 >= sVar213) * sVar213) +
             auVar279._6_2_;
        auVar281._8_2_ =
             (((short)uVar448 < sVar290) * uVar448 | (ushort)((short)uVar448 >= sVar290) * sVar290)
             + auVar279._8_2_;
        auVar281._10_2_ =
             (((short)uVar56 < sVar292) * uVar56 | (ushort)((short)uVar56 >= sVar292) * sVar292) +
             auVar279._10_2_;
        auVar281._12_2_ =
             (((short)uVar60 < sVar300) * uVar60 | (ushort)((short)uVar60 >= sVar300) * sVar300) +
             auVar279._12_2_;
        auVar281._14_2_ =
             (((short)uVar65 < sVar310) * uVar65 | (ushort)((short)uVar65 >= sVar310) * sVar310) +
             auVar279._14_2_;
        auVar79._0_2_ =
             (((short)uVar453 < sVar341) * uVar453 | (ushort)((short)uVar453 >= sVar341) * sVar341)
             + auVar129._0_2_;
        auVar79._2_2_ =
             (((short)uVar70 < sVar75) * uVar70 | (ushort)((short)uVar70 >= sVar75) * sVar75) +
             auVar129._2_2_;
        auVar79._4_2_ =
             (((short)uVar455 < sVar76) * uVar455 | (ushort)((short)uVar455 >= sVar76) * sVar76) +
             auVar129._4_2_;
        auVar79._6_2_ =
             (((short)uVar457 < sVar355) * uVar457 | (ushort)((short)uVar457 >= sVar355) * sVar355)
             + auVar129._6_2_;
        auVar79._8_2_ =
             (((short)uVar459 < sVar94) * uVar459 | (ushort)((short)uVar459 >= sVar94) * sVar94) +
             auVar129._8_2_;
        auVar79._10_2_ =
             (((short)uVar461 < sVar95) * uVar461 | (ushort)((short)uVar461 >= sVar95) * sVar95) +
             auVar129._10_2_;
        auVar79._12_2_ =
             (((short)uVar463 < sVar357) * uVar463 | (ushort)((short)uVar463 >= sVar357) * sVar357)
             + auVar129._12_2_;
        auVar79._14_2_ =
             (((short)uVar465 < sVar96) * uVar465 | (ushort)((short)uVar465 >= sVar96) * sVar96) +
             auVar129._14_2_;
        auVar281 = auVar281 ^ auVar279;
        auVar79 = auVar79 ^ auVar129;
        sVar415 = auVar315._0_2_;
        auVar344._0_2_ = sVar415 - sVar340;
        sVar423 = auVar315._2_2_;
        auVar344._2_2_ = sVar423 - sVar354;
        sVar424 = auVar315._4_2_;
        auVar344._4_2_ = sVar424 - sVar356;
        sVar425 = auVar315._6_2_;
        auVar344._6_2_ = sVar425 - sVar358;
        sVar360 = auVar315._8_2_;
        auVar344._8_2_ = sVar360 - sVar361;
        sVar363 = auVar315._10_2_;
        auVar344._10_2_ = sVar363 - sVar364;
        sVar366 = auVar315._12_2_;
        sVar369 = auVar315._14_2_;
        auVar344._12_2_ = sVar366 - sVar367;
        auVar344._14_2_ = sVar369 - sVar370;
        sVar207 = auVar343._0_2_;
        auVar316._0_2_ = sVar207 - sVar215;
        sVar209 = auVar343._2_2_;
        auVar316._2_2_ = sVar209 - sVar236;
        sVar211 = auVar343._4_2_;
        auVar316._4_2_ = sVar211 - sVar238;
        sVar213 = auVar343._6_2_;
        auVar316._6_2_ = sVar213 - sVar240;
        sVar290 = auVar343._8_2_;
        auVar316._8_2_ = sVar290 - sVar242;
        sVar292 = auVar343._10_2_;
        auVar316._10_2_ = sVar292 - sVar244;
        sVar300 = auVar343._12_2_;
        sVar310 = auVar343._14_2_;
        auVar316._12_2_ = sVar300 - sVar246;
        auVar316._14_2_ = sVar310 - sVar249;
        auVar279 = pabsw(auVar343,auVar344);
        uVar32 = auVar279._0_2_;
        auVar132._0_2_ = uVar32 >> local_88._0_8_;
        uVar47 = auVar279._2_2_;
        auVar132._2_2_ = uVar47 >> local_88._0_8_;
        uVar50 = auVar279._4_2_;
        auVar132._4_2_ = uVar50 >> local_88._0_8_;
        uVar53 = auVar279._6_2_;
        auVar132._6_2_ = uVar53 >> local_88._0_8_;
        uVar448 = auVar279._8_2_;
        auVar132._8_2_ = uVar448 >> local_88._0_8_;
        uVar56 = auVar279._10_2_;
        auVar132._10_2_ = uVar56 >> local_88._0_8_;
        uVar60 = auVar279._12_2_;
        uVar65 = auVar279._14_2_;
        auVar132._12_2_ = uVar60 >> local_88._0_8_;
        auVar132._14_2_ = uVar65 >> local_88._0_8_;
        auVar384 = pabsw(auVar85,auVar316);
        uVar453 = auVar384._0_2_;
        auVar441._0_2_ = uVar453 >> local_88._0_8_;
        uVar70 = auVar384._2_2_;
        auVar441._2_2_ = uVar70 >> local_88._0_8_;
        uVar455 = auVar384._4_2_;
        auVar441._4_2_ = uVar455 >> local_88._0_8_;
        uVar457 = auVar384._6_2_;
        auVar441._6_2_ = uVar457 >> local_88._0_8_;
        uVar459 = auVar384._8_2_;
        auVar441._8_2_ = uVar459 >> local_88._0_8_;
        uVar461 = auVar384._10_2_;
        auVar441._10_2_ = uVar461 >> local_88._0_8_;
        uVar463 = auVar384._12_2_;
        uVar465 = auVar384._14_2_;
        auVar441._12_2_ = uVar463 >> local_88._0_8_;
        auVar441._14_2_ = uVar465 >> local_88._0_8_;
        auVar129 = psubusw(auVar19,auVar132);
        auVar279 = psubusw(auVar19,auVar441);
        sVar426 = auVar129._0_2_;
        sVar434 = auVar129._2_2_;
        sVar435 = auVar129._4_2_;
        sVar436 = auVar129._6_2_;
        sVar437 = auVar129._8_2_;
        sVar438 = auVar129._10_2_;
        sVar439 = auVar129._12_2_;
        sVar440 = auVar129._14_2_;
        sVar341 = auVar279._0_2_;
        sVar75 = auVar279._2_2_;
        sVar76 = auVar279._4_2_;
        sVar355 = auVar279._6_2_;
        sVar94 = auVar279._8_2_;
        sVar95 = auVar279._10_2_;
        sVar357 = auVar279._12_2_;
        sVar96 = auVar279._14_2_;
        auVar129 = psraw(auVar344,0xf);
        auVar428._0_2_ =
             (((short)uVar32 < sVar426) * uVar32 | (ushort)((short)uVar32 >= sVar426) * sVar426) +
             auVar129._0_2_;
        auVar428._2_2_ =
             (((short)uVar47 < sVar434) * uVar47 | (ushort)((short)uVar47 >= sVar434) * sVar434) +
             auVar129._2_2_;
        auVar428._4_2_ =
             (((short)uVar50 < sVar435) * uVar50 | (ushort)((short)uVar50 >= sVar435) * sVar435) +
             auVar129._4_2_;
        auVar428._6_2_ =
             (((short)uVar53 < sVar436) * uVar53 | (ushort)((short)uVar53 >= sVar436) * sVar436) +
             auVar129._6_2_;
        auVar428._8_2_ =
             (((short)uVar448 < sVar437) * uVar448 | (ushort)((short)uVar448 >= sVar437) * sVar437)
             + auVar129._8_2_;
        auVar428._10_2_ =
             (((short)uVar56 < sVar438) * uVar56 | (ushort)((short)uVar56 >= sVar438) * sVar438) +
             auVar129._10_2_;
        auVar428._12_2_ =
             (((short)uVar60 < sVar439) * uVar60 | (ushort)((short)uVar60 >= sVar439) * sVar439) +
             auVar129._12_2_;
        auVar428._14_2_ =
             (((short)uVar65 < sVar440) * uVar65 | (ushort)((short)uVar65 >= sVar440) * sVar440) +
             auVar129._14_2_;
        auVar428 = auVar428 ^ auVar129;
        local_98._0_2_ = auVar35._0_2_;
        local_98._2_2_ = auVar35._2_2_;
        auVar279 = psraw(auVar316,0xf);
        auVar416._0_2_ =
             (((short)uVar453 < sVar341) * uVar453 | (ushort)((short)uVar453 >= sVar341) * sVar341)
             + auVar279._0_2_;
        auVar416._2_2_ =
             (((short)uVar70 < sVar75) * uVar70 | (ushort)((short)uVar70 >= sVar75) * sVar75) +
             auVar279._2_2_;
        auVar416._4_2_ =
             (((short)uVar455 < sVar76) * uVar455 | (ushort)((short)uVar455 >= sVar76) * sVar76) +
             auVar279._4_2_;
        auVar416._6_2_ =
             (((short)uVar457 < sVar355) * uVar457 | (ushort)((short)uVar457 >= sVar355) * sVar355)
             + auVar279._6_2_;
        auVar416._8_2_ =
             (((short)uVar459 < sVar94) * uVar459 | (ushort)((short)uVar459 >= sVar94) * sVar94) +
             auVar279._8_2_;
        auVar416._10_2_ =
             (((short)uVar461 < sVar95) * uVar461 | (ushort)((short)uVar461 >= sVar95) * sVar95) +
             auVar279._10_2_;
        auVar416._12_2_ =
             (((short)uVar463 < sVar357) * uVar463 | (ushort)((short)uVar463 >= sVar357) * sVar357)
             + auVar279._12_2_;
        auVar416._14_2_ =
             (((short)uVar465 < sVar96) * uVar465 | (ushort)((short)uVar465 >= sVar96) * sVar96) +
             auVar279._14_2_;
        auVar416 = auVar416 ^ auVar279;
        local_a8 = auVar36._0_2_;
        sStack_a6 = auVar36._2_2_;
        auVar80._0_2_ = (ushort)(sVar97 < sVar340) * sVar97 | (ushort)(sVar97 >= sVar340) * sVar340;
        auVar80._2_2_ =
             (ushort)(sVar359 < sVar354) * sVar359 | (ushort)(sVar359 >= sVar354) * sVar354;
        auVar80._4_2_ = (ushort)(sVar98 < sVar356) * sVar98 | (ushort)(sVar98 >= sVar356) * sVar356;
        auVar80._6_2_ = (ushort)(sVar99 < sVar358) * sVar99 | (ushort)(sVar99 >= sVar358) * sVar358;
        auVar80._8_2_ =
             (ushort)(sVar362 < sVar361) * sVar362 | (ushort)(sVar362 >= sVar361) * sVar361;
        auVar80._10_2_ =
             (ushort)(sVar100 < sVar364) * sVar100 | (ushort)(sVar100 >= sVar364) * sVar364;
        auVar80._12_2_ =
             (ushort)(sVar101 < sVar367) * sVar101 | (ushort)(sVar101 >= sVar367) * sVar367;
        auVar80._14_2_ =
             (ushort)(sVar365 < sVar370) * sVar365 | (ushort)(sVar365 >= sVar370) * sVar370;
        bVar192 = auVar342[0];
        bVar122 = auVar252[0];
        bVar251 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar342[1];
        bVar122 = auVar252[1];
        bVar263 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar342[2];
        bVar122 = auVar252[2];
        bVar264 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar342[3];
        bVar122 = auVar252[3];
        bVar265 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar342[4];
        bVar122 = auVar252[4];
        bVar266 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar342[5];
        bVar122 = auVar252[5];
        bVar267 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar342[6];
        bVar122 = auVar252[6];
        bVar268 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar342[7];
        bVar122 = auVar252[7];
        bVar269 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar342[8];
        bVar122 = auVar252[8];
        bVar270 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar342[9];
        bVar122 = auVar252[9];
        bVar271 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar342[10];
        bVar122 = auVar252[10];
        bVar272 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar342[0xb];
        bVar122 = auVar252[0xb];
        bVar273 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar342[0xc];
        bVar122 = auVar252[0xc];
        bVar274 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar342[0xd];
        bVar122 = auVar252[0xd];
        bVar275 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar342[0xe];
        bVar122 = auVar252[0xe];
        bVar123 = auVar252[0xf];
        bVar276 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar342[0xf];
        bVar277 = (bVar123 < bVar192) * bVar192 | (bVar123 >= bVar192) * bVar123;
        auVar111._0_2_ =
             (ushort)(sVar102 < sVar215) * sVar102 | (ushort)(sVar102 >= sVar215) * sVar215;
        auVar111._2_2_ =
             (ushort)(sVar104 < sVar236) * sVar104 | (ushort)(sVar104 >= sVar236) * sVar236;
        auVar111._4_2_ =
             (ushort)(sVar106 < sVar238) * sVar106 | (ushort)(sVar106 >= sVar238) * sVar238;
        auVar111._6_2_ =
             (ushort)(sVar126 < sVar240) * sVar126 | (ushort)(sVar126 >= sVar240) * sVar240;
        auVar111._8_2_ =
             (ushort)(sVar154 < sVar242) * sVar154 | (ushort)(sVar154 >= sVar242) * sVar242;
        auVar111._10_2_ =
             (ushort)(sVar162 < sVar244) * sVar162 | (ushort)(sVar162 >= sVar244) * sVar244;
        auVar111._12_2_ =
             (ushort)(sVar175 < sVar246) * sVar175 | (ushort)(sVar175 >= sVar246) * sVar246;
        auVar111._14_2_ =
             (ushort)(sVar183 < sVar249) * sVar183 | (ushort)(sVar183 >= sVar249) * sVar249;
        bVar192 = auVar194[0];
        bVar122 = auVar127[0];
        bVar122 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar194[1];
        bVar123 = auVar127[1];
        bVar142 = (bVar123 < bVar192) * bVar192 | (bVar123 >= bVar192) * bVar123;
        bVar192 = auVar194[2];
        bVar123 = auVar127[2];
        bVar144 = (bVar123 < bVar192) * bVar192 | (bVar123 >= bVar192) * bVar123;
        bVar192 = auVar194[3];
        bVar123 = auVar127[3];
        bVar149 = (bVar123 < bVar192) * bVar192 | (bVar123 >= bVar192) * bVar123;
        bVar192 = auVar194[4];
        bVar123 = auVar127[4];
        bVar151 = (bVar123 < bVar192) * bVar192 | (bVar123 >= bVar192) * bVar123;
        bVar192 = auVar194[5];
        bVar123 = auVar127[5];
        bVar156 = (bVar123 < bVar192) * bVar192 | (bVar123 >= bVar192) * bVar123;
        bVar192 = auVar194[6];
        bVar123 = auVar127[6];
        bVar158 = (bVar123 < bVar192) * bVar192 | (bVar123 >= bVar192) * bVar123;
        bVar192 = auVar194[7];
        bVar123 = auVar127[7];
        bVar163 = (bVar123 < bVar192) * bVar192 | (bVar123 >= bVar192) * bVar123;
        bVar192 = auVar194[8];
        bVar123 = auVar127[8];
        bVar165 = (bVar123 < bVar192) * bVar192 | (bVar123 >= bVar192) * bVar123;
        bVar192 = auVar194[9];
        bVar123 = auVar127[9];
        bVar170 = (bVar123 < bVar192) * bVar192 | (bVar123 >= bVar192) * bVar123;
        bVar192 = auVar194[10];
        bVar123 = auVar127[10];
        bVar172 = (bVar123 < bVar192) * bVar192 | (bVar123 >= bVar192) * bVar123;
        bVar192 = auVar194[0xb];
        bVar123 = auVar127[0xb];
        bVar177 = (bVar123 < bVar192) * bVar192 | (bVar123 >= bVar192) * bVar123;
        bVar192 = auVar194[0xc];
        bVar123 = auVar127[0xc];
        bVar179 = (bVar123 < bVar192) * bVar192 | (bVar123 >= bVar192) * bVar123;
        bVar192 = auVar194[0xd];
        bVar123 = auVar127[0xd];
        bVar184 = (bVar123 < bVar192) * bVar192 | (bVar123 >= bVar192) * bVar123;
        bVar192 = auVar194[0xe];
        bVar123 = auVar127[0xe];
        bVar143 = auVar127[0xf];
        bVar186 = (bVar123 < bVar192) * bVar192 | (bVar123 >= bVar192) * bVar123;
        bVar192 = auVar194[0xf];
        bVar191 = (bVar143 < bVar192) * bVar192 | (bVar143 >= bVar192) * bVar143;
        uVar448 = (ushort)(sVar31 < sVar103) * sVar31 | (ushort)(sVar31 >= sVar103) * sVar103;
        uVar453 = (ushort)(sVar33 < sVar105) * sVar33 | (ushort)(sVar33 >= sVar105) * sVar105;
        uVar455 = (ushort)(sVar48 < sVar107) * sVar48 | (ushort)(sVar48 >= sVar107) * sVar107;
        uVar457 = (ushort)(sVar49 < sVar147) * sVar49 | (ushort)(sVar49 >= sVar147) * sVar147;
        uVar459 = (ushort)(sVar51 < sVar155) * sVar51 | (ushort)(sVar51 >= sVar155) * sVar155;
        uVar461 = (ushort)(sVar52 < sVar168) * sVar52 | (ushort)(sVar52 >= sVar168) * sVar168;
        uVar463 = (ushort)(sVar54 < sVar176) * sVar54 | (ushort)(sVar54 >= sVar176) * sVar176;
        uVar465 = (ushort)(sVar55 < sVar188) * sVar55 | (ushort)(sVar55 >= sVar188) * sVar188;
        bVar192 = auVar315[0];
        bVar123 = auVar216[0];
        bVar123 = (bVar123 < bVar192) * bVar192 | (bVar123 >= bVar192) * bVar123;
        bVar192 = auVar315[1];
        bVar143 = auVar216[1];
        bVar143 = (bVar143 < bVar192) * bVar192 | (bVar143 >= bVar192) * bVar143;
        bVar192 = auVar315[2];
        bVar145 = auVar216[2];
        bVar145 = (bVar145 < bVar192) * bVar192 | (bVar145 >= bVar192) * bVar145;
        bVar192 = auVar315[3];
        bVar150 = auVar216[3];
        bVar150 = (bVar150 < bVar192) * bVar192 | (bVar150 >= bVar192) * bVar150;
        bVar192 = auVar315[4];
        bVar152 = auVar216[4];
        bVar152 = (bVar152 < bVar192) * bVar192 | (bVar152 >= bVar192) * bVar152;
        bVar192 = auVar315[5];
        bVar157 = auVar216[5];
        bVar157 = (bVar157 < bVar192) * bVar192 | (bVar157 >= bVar192) * bVar157;
        bVar192 = auVar315[6];
        bVar159 = auVar216[6];
        bVar159 = (bVar159 < bVar192) * bVar192 | (bVar159 >= bVar192) * bVar159;
        bVar192 = auVar315[7];
        bVar164 = auVar216[7];
        bVar164 = (bVar164 < bVar192) * bVar192 | (bVar164 >= bVar192) * bVar164;
        bVar192 = auVar315[8];
        bVar166 = auVar216[8];
        bVar166 = (bVar166 < bVar192) * bVar192 | (bVar166 >= bVar192) * bVar166;
        bVar192 = auVar315[9];
        bVar171 = auVar216[9];
        bVar171 = (bVar171 < bVar192) * bVar192 | (bVar171 >= bVar192) * bVar171;
        bVar192 = auVar315[10];
        bVar173 = auVar216[10];
        bVar173 = (bVar173 < bVar192) * bVar192 | (bVar173 >= bVar192) * bVar173;
        bVar192 = auVar315[0xb];
        bVar178 = auVar216[0xb];
        bVar178 = (bVar178 < bVar192) * bVar192 | (bVar178 >= bVar192) * bVar178;
        bVar192 = auVar315[0xc];
        bVar180 = auVar216[0xc];
        bVar180 = (bVar180 < bVar192) * bVar192 | (bVar180 >= bVar192) * bVar180;
        bVar192 = auVar315[0xd];
        bVar185 = auVar216[0xd];
        bVar185 = (bVar185 < bVar192) * bVar192 | (bVar185 >= bVar192) * bVar185;
        bVar192 = auVar315[0xe];
        bVar187 = auVar216[0xe];
        bVar250 = auVar216[0xf];
        bVar187 = (bVar187 < bVar192) * bVar192 | (bVar187 >= bVar192) * bVar187;
        bVar192 = auVar315[0xf];
        bVar192 = (bVar250 < bVar192) * bVar192 | (bVar250 >= bVar192) * bVar250;
        local_1d8[1] = (bVar143 < bVar263) * bVar263 | (bVar143 >= bVar263) * bVar143;
        local_1d8[0] = (bVar123 < bVar251) * bVar251 | (bVar123 >= bVar251) * bVar123;
        local_1d8[2] = (bVar145 < bVar264) * bVar264 | (bVar145 >= bVar264) * bVar145;
        local_1d8[3] = (bVar150 < bVar265) * bVar265 | (bVar150 >= bVar265) * bVar150;
        local_1d8[4] = (bVar152 < bVar266) * bVar266 | (bVar152 >= bVar266) * bVar152;
        local_1d8[5] = (bVar157 < bVar267) * bVar267 | (bVar157 >= bVar267) * bVar157;
        local_1d8[6] = (bVar159 < bVar268) * bVar268 | (bVar159 >= bVar268) * bVar159;
        local_1d8[7] = (bVar164 < bVar269) * bVar269 | (bVar164 >= bVar269) * bVar164;
        local_1d8[8] = (bVar166 < bVar270) * bVar270 | (bVar166 >= bVar270) * bVar166;
        local_1d8[9] = (bVar171 < bVar271) * bVar271 | (bVar171 >= bVar271) * bVar171;
        local_1d8[10] = (bVar173 < bVar272) * bVar272 | (bVar173 >= bVar272) * bVar173;
        local_1d8[0xb] = (bVar178 < bVar273) * bVar273 | (bVar178 >= bVar273) * bVar178;
        local_1d8[0xc] = (bVar180 < bVar274) * bVar274 | (bVar180 >= bVar274) * bVar180;
        local_1d8[0xd] = (bVar185 < bVar275) * bVar275 | (bVar185 >= bVar275) * bVar185;
        local_1d8[0xe] = (bVar187 < bVar276) * bVar276 | (bVar187 >= bVar276) * bVar187;
        local_1d8[0xf] = (bVar192 < bVar277) * bVar277 | (bVar192 >= bVar277) * bVar192;
        uVar32 = (ushort)(sVar368 < sVar193) * sVar368 | (ushort)(sVar368 >= sVar193) * sVar193;
        uVar47 = (ushort)(sVar371 < sVar208) * sVar371 | (ushort)(sVar371 >= sVar208) * sVar208;
        uVar50 = (ushort)(sVar125 < sVar210) * sVar125 | (ushort)(sVar125 >= sVar210) * sVar210;
        uVar53 = (ushort)(sVar148 < sVar212) * sVar148 | (ushort)(sVar148 >= sVar212) * sVar212;
        uVar56 = (ushort)(sVar161 < sVar278) * sVar161 | (ushort)(sVar161 >= sVar278) * sVar278;
        uVar60 = (ushort)(sVar169 < sVar291) * sVar169 | (ushort)(sVar169 >= sVar291) * sVar291;
        uVar65 = (ushort)(sVar181 < sVar295) * sVar181 | (ushort)(sVar181 >= sVar295) * sVar295;
        uVar70 = (ushort)(sVar189 < sVar305) * sVar189 | (ushort)(sVar189 >= sVar305) * sVar305;
        bVar192 = auVar343[0];
        bVar123 = auVar109[0];
        bVar123 = (bVar123 < bVar192) * bVar192 | (bVar123 >= bVar192) * bVar123;
        bVar192 = auVar343[1];
        bVar143 = auVar109[1];
        bVar143 = (bVar143 < bVar192) * bVar192 | (bVar143 >= bVar192) * bVar143;
        bVar192 = auVar343[2];
        bVar145 = auVar109[2];
        bVar145 = (bVar145 < bVar192) * bVar192 | (bVar145 >= bVar192) * bVar145;
        bVar192 = auVar343[3];
        bVar150 = auVar109[3];
        bVar150 = (bVar150 < bVar192) * bVar192 | (bVar150 >= bVar192) * bVar150;
        bVar192 = auVar343[4];
        bVar152 = auVar109[4];
        bVar152 = (bVar152 < bVar192) * bVar192 | (bVar152 >= bVar192) * bVar152;
        bVar192 = auVar343[5];
        bVar157 = auVar109[5];
        bVar157 = (bVar157 < bVar192) * bVar192 | (bVar157 >= bVar192) * bVar157;
        bVar192 = auVar343[6];
        bVar159 = auVar109[6];
        bVar159 = (bVar159 < bVar192) * bVar192 | (bVar159 >= bVar192) * bVar159;
        bVar192 = auVar343[7];
        bVar164 = auVar109[7];
        bVar164 = (bVar164 < bVar192) * bVar192 | (bVar164 >= bVar192) * bVar164;
        bVar192 = auVar343[8];
        bVar166 = auVar109[8];
        bVar166 = (bVar166 < bVar192) * bVar192 | (bVar166 >= bVar192) * bVar166;
        bVar192 = auVar343[9];
        bVar171 = auVar109[9];
        bVar171 = (bVar171 < bVar192) * bVar192 | (bVar171 >= bVar192) * bVar171;
        bVar192 = auVar343[10];
        bVar173 = auVar109[10];
        bVar173 = (bVar173 < bVar192) * bVar192 | (bVar173 >= bVar192) * bVar173;
        bVar192 = auVar343[0xb];
        bVar178 = auVar109[0xb];
        bVar178 = (bVar178 < bVar192) * bVar192 | (bVar178 >= bVar192) * bVar178;
        bVar192 = auVar343[0xc];
        bVar180 = auVar109[0xc];
        bVar180 = (bVar180 < bVar192) * bVar192 | (bVar180 >= bVar192) * bVar180;
        bVar192 = auVar343[0xd];
        bVar185 = auVar109[0xd];
        bVar185 = (bVar185 < bVar192) * bVar192 | (bVar185 >= bVar192) * bVar185;
        bVar192 = auVar343[0xe];
        bVar187 = auVar109[0xe];
        bVar250 = auVar109[0xf];
        bVar187 = (bVar187 < bVar192) * bVar192 | (bVar187 >= bVar192) * bVar187;
        bVar192 = auVar343[0xf];
        bVar192 = (bVar250 < bVar192) * bVar192 | (bVar250 >= bVar192) * bVar250;
        local_188[1] = (bVar143 < bVar142) * bVar142 | (bVar143 >= bVar142) * bVar143;
        local_188[0] = (bVar123 < bVar122) * bVar122 | (bVar123 >= bVar122) * bVar123;
        local_188[2] = (bVar145 < bVar144) * bVar144 | (bVar145 >= bVar144) * bVar145;
        local_188[3] = (bVar150 < bVar149) * bVar149 | (bVar150 >= bVar149) * bVar150;
        local_188[4] = (bVar152 < bVar151) * bVar151 | (bVar152 >= bVar151) * bVar152;
        local_188[5] = (bVar157 < bVar156) * bVar156 | (bVar157 >= bVar156) * bVar157;
        local_188[6] = (bVar159 < bVar158) * bVar158 | (bVar159 >= bVar158) * bVar159;
        local_188[7] = (bVar164 < bVar163) * bVar163 | (bVar164 >= bVar163) * bVar164;
        local_188[8] = (bVar166 < bVar165) * bVar165 | (bVar166 >= bVar165) * bVar166;
        local_188[9] = (bVar171 < bVar170) * bVar170 | (bVar171 >= bVar170) * bVar171;
        local_188[10] = (bVar173 < bVar172) * bVar172 | (bVar173 >= bVar172) * bVar173;
        local_188[0xb] = (bVar178 < bVar177) * bVar177 | (bVar178 >= bVar177) * bVar178;
        local_188[0xc] = (bVar180 < bVar179) * bVar179 | (bVar180 >= bVar179) * bVar180;
        local_188[0xd] = (bVar185 < bVar184) * bVar184 | (bVar185 >= bVar184) * bVar185;
        local_188[0xe] = (bVar187 < bVar186) * bVar186 | (bVar187 >= bVar186) * bVar187;
        local_188[0xf] = (bVar192 < bVar191) * bVar191 | (bVar192 >= bVar191) * bVar192;
        uVar449 = ((short)auVar80._0_2_ < (short)uVar448) * auVar80._0_2_ |
                  ((short)auVar80._0_2_ >= (short)uVar448) * uVar448;
        uVar454 = ((short)auVar80._2_2_ < (short)uVar453) * auVar80._2_2_ |
                  ((short)auVar80._2_2_ >= (short)uVar453) * uVar453;
        uVar456 = ((short)auVar80._4_2_ < (short)uVar455) * auVar80._4_2_ |
                  ((short)auVar80._4_2_ >= (short)uVar455) * uVar455;
        uVar458 = ((short)auVar80._6_2_ < (short)uVar457) * auVar80._6_2_ |
                  ((short)auVar80._6_2_ >= (short)uVar457) * uVar457;
        uVar460 = ((short)auVar80._8_2_ < (short)uVar459) * auVar80._8_2_ |
                  ((short)auVar80._8_2_ >= (short)uVar459) * uVar459;
        uVar462 = ((short)auVar80._10_2_ < (short)uVar461) * auVar80._10_2_ |
                  ((short)auVar80._10_2_ >= (short)uVar461) * uVar461;
        uVar464 = ((short)auVar80._12_2_ < (short)uVar463) * auVar80._12_2_ |
                  ((short)auVar80._12_2_ >= (short)uVar463) * uVar463;
        uVar466 = ((short)auVar80._14_2_ < (short)uVar465) * auVar80._14_2_ |
                  ((short)auVar80._14_2_ >= (short)uVar465) * uVar465;
        uVar32 = ((short)auVar111._0_2_ < (short)uVar32) * auVar111._0_2_ |
                 ((short)auVar111._0_2_ >= (short)uVar32) * uVar32;
        uVar448 = ((short)auVar111._2_2_ < (short)uVar47) * auVar111._2_2_ |
                  ((short)auVar111._2_2_ >= (short)uVar47) * uVar47;
        uVar453 = ((short)auVar111._4_2_ < (short)uVar50) * auVar111._4_2_ |
                  ((short)auVar111._4_2_ >= (short)uVar50) * uVar50;
        uVar459 = ((short)auVar111._6_2_ < (short)uVar53) * auVar111._6_2_ |
                  ((short)auVar111._6_2_ >= (short)uVar53) * uVar53;
        uVar57 = ((short)auVar111._8_2_ < (short)uVar56) * auVar111._8_2_ |
                 ((short)auVar111._8_2_ >= (short)uVar56) * uVar56;
        uVar61 = ((short)auVar111._10_2_ < (short)uVar60) * auVar111._10_2_ |
                 ((short)auVar111._10_2_ >= (short)uVar60) * uVar60;
        uVar66 = ((short)auVar111._12_2_ < (short)uVar65) * auVar111._12_2_ |
                 ((short)auVar111._12_2_ >= (short)uVar65) * uVar65;
        uVar71 = ((short)auVar111._14_2_ < (short)uVar70) * auVar111._14_2_ |
                 ((short)auVar111._14_2_ >= (short)uVar70) * uVar70;
        auVar216 = lddqu(auVar80,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar25 * 2));
        auVar109 = lddqu(auVar111,*(undefined1 (*) [16])
                                   (*(undefined1 (*) [16])((long)in + 0x120) + lVar25 * 2));
        sVar341 = auVar216._0_2_;
        auVar253._0_2_ = sVar341 - sVar340;
        sVar75 = auVar216._2_2_;
        auVar253._2_2_ = sVar75 - sVar354;
        sVar76 = auVar216._4_2_;
        auVar253._4_2_ = sVar76 - sVar356;
        sVar355 = auVar216._6_2_;
        auVar253._6_2_ = sVar355 - sVar358;
        sVar94 = auVar216._8_2_;
        auVar253._8_2_ = sVar94 - sVar361;
        sVar95 = auVar216._10_2_;
        auVar253._10_2_ = sVar95 - sVar364;
        sVar357 = auVar216._12_2_;
        sVar96 = auVar216._14_2_;
        auVar253._12_2_ = sVar357 - sVar367;
        auVar253._14_2_ = sVar96 - sVar370;
        sVar97 = auVar109._0_2_;
        auVar282._0_2_ = sVar97 - sVar215;
        sVar359 = auVar109._2_2_;
        auVar282._2_2_ = sVar359 - sVar236;
        sVar98 = auVar109._4_2_;
        auVar282._4_2_ = sVar98 - sVar238;
        sVar99 = auVar109._6_2_;
        auVar282._6_2_ = sVar99 - sVar240;
        sVar362 = auVar109._8_2_;
        auVar282._8_2_ = sVar362 - sVar242;
        sVar100 = auVar109._10_2_;
        auVar282._10_2_ = sVar100 - sVar244;
        sVar101 = auVar109._12_2_;
        sVar365 = auVar109._14_2_;
        auVar282._12_2_ = sVar101 - sVar246;
        auVar282._14_2_ = sVar365 - sVar249;
        auVar279 = pabsw(auVar46,auVar253);
        uVar427 = (ulong)uVar28;
        uVar56 = auVar279._0_2_;
        auVar195._0_2_ = uVar56 >> uVar427;
        uVar70 = auVar279._2_2_;
        auVar195._2_2_ = uVar70 >> uVar427;
        uVar461 = auVar279._4_2_;
        auVar195._4_2_ = uVar461 >> uVar427;
        uVar465 = auVar279._6_2_;
        auVar195._6_2_ = uVar465 >> uVar427;
        uVar58 = auVar279._8_2_;
        auVar195._8_2_ = uVar58 >> uVar427;
        uVar59 = auVar279._10_2_;
        auVar195._10_2_ = uVar59 >> uVar427;
        uVar63 = auVar279._12_2_;
        uVar62 = auVar279._14_2_;
        auVar195._12_2_ = uVar63 >> uVar427;
        auVar195._14_2_ = uVar62 >> uVar427;
        auVar194 = pabsw(auVar129,auVar282);
        uVar64 = auVar194._0_2_;
        auVar374._0_2_ = uVar64 >> uVar427;
        uVar68 = auVar194._2_2_;
        auVar374._2_2_ = uVar68 >> uVar427;
        uVar67 = auVar194._4_2_;
        auVar374._4_2_ = uVar67 >> uVar427;
        uVar69 = auVar194._6_2_;
        auVar374._6_2_ = uVar69 >> uVar427;
        uVar73 = auVar194._8_2_;
        auVar374._8_2_ = uVar73 >> uVar427;
        uVar72 = auVar194._10_2_;
        auVar374._10_2_ = uVar72 >> uVar427;
        uVar74 = auVar194._12_2_;
        uVar247 = auVar194._14_2_;
        auVar374._12_2_ = uVar74 >> uVar427;
        auVar374._14_2_ = uVar247 >> uVar427;
        auVar127 = psubusw(local_108,auVar195);
        auVar279 = psubusw(local_108,auVar374);
        sVar102 = auVar127._0_2_;
        sVar103 = auVar127._2_2_;
        sVar368 = auVar127._4_2_;
        sVar104 = auVar127._6_2_;
        sVar105 = auVar127._8_2_;
        sVar371 = auVar127._10_2_;
        sVar106 = auVar127._12_2_;
        sVar107 = auVar127._14_2_;
        sVar31 = auVar279._0_2_;
        sVar33 = auVar279._2_2_;
        sVar48 = auVar279._4_2_;
        sVar49 = auVar279._6_2_;
        sVar51 = auVar279._8_2_;
        sVar52 = auVar279._10_2_;
        sVar54 = auVar279._12_2_;
        sVar55 = auVar279._14_2_;
        uVar47 = (ushort)(sVar341 < sVar415) * sVar341 | (ushort)(sVar341 >= sVar415) * sVar415;
        uVar50 = (ushort)(sVar75 < sVar423) * sVar75 | (ushort)(sVar75 >= sVar423) * sVar423;
        uVar53 = (ushort)(sVar76 < sVar424) * sVar76 | (ushort)(sVar76 >= sVar424) * sVar424;
        uVar60 = (ushort)(sVar355 < sVar425) * sVar355 | (ushort)(sVar355 >= sVar425) * sVar425;
        uVar65 = (ushort)(sVar94 < sVar360) * sVar94 | (ushort)(sVar94 >= sVar360) * sVar360;
        uVar455 = (ushort)(sVar95 < sVar363) * sVar95 | (ushort)(sVar95 >= sVar363) * sVar363;
        uVar457 = (ushort)(sVar357 < sVar366) * sVar357 | (ushort)(sVar357 >= sVar366) * sVar366;
        uVar463 = (ushort)(sVar96 < sVar369) * sVar96 | (ushort)(sVar96 >= sVar369) * sVar369;
        auVar127 = psraw(auVar253,0xf);
        auVar317._0_2_ =
             (((short)uVar56 < sVar102) * uVar56 | (ushort)((short)uVar56 >= sVar102) * sVar102) +
             auVar127._0_2_;
        auVar317._2_2_ =
             (((short)uVar70 < sVar103) * uVar70 | (ushort)((short)uVar70 >= sVar103) * sVar103) +
             auVar127._2_2_;
        auVar317._4_2_ =
             (((short)uVar461 < sVar368) * uVar461 | (ushort)((short)uVar461 >= sVar368) * sVar368)
             + auVar127._4_2_;
        auVar317._6_2_ =
             (((short)uVar465 < sVar104) * uVar465 | (ushort)((short)uVar465 >= sVar104) * sVar104)
             + auVar127._6_2_;
        auVar317._8_2_ =
             (((short)uVar58 < sVar105) * uVar58 | (ushort)((short)uVar58 >= sVar105) * sVar105) +
             auVar127._8_2_;
        auVar317._10_2_ =
             (((short)uVar59 < sVar371) * uVar59 | (ushort)((short)uVar59 >= sVar371) * sVar371) +
             auVar127._10_2_;
        auVar317._12_2_ =
             (((short)uVar63 < sVar106) * uVar63 | (ushort)((short)uVar63 >= sVar106) * sVar106) +
             auVar127._12_2_;
        auVar317._14_2_ =
             (((short)uVar62 < sVar107) * uVar62 | (ushort)((short)uVar62 >= sVar107) * sVar107) +
             auVar127._14_2_;
        auVar317 = auVar317 ^ auVar127;
        auVar279 = lddqu(auVar216,*(undefined1 (*) [16])((long)in + lVar25 * -2));
        auVar129 = psraw(auVar282,0xf);
        auVar196._0_2_ =
             (((short)uVar64 < sVar31) * uVar64 | (ushort)((short)uVar64 >= sVar31) * sVar31) +
             auVar129._0_2_;
        auVar196._2_2_ =
             (((short)uVar68 < sVar33) * uVar68 | (ushort)((short)uVar68 >= sVar33) * sVar33) +
             auVar129._2_2_;
        auVar196._4_2_ =
             (((short)uVar67 < sVar48) * uVar67 | (ushort)((short)uVar67 >= sVar48) * sVar48) +
             auVar129._4_2_;
        auVar196._6_2_ =
             (((short)uVar69 < sVar49) * uVar69 | (ushort)((short)uVar69 >= sVar49) * sVar49) +
             auVar129._6_2_;
        auVar196._8_2_ =
             (((short)uVar73 < sVar51) * uVar73 | (ushort)((short)uVar73 >= sVar51) * sVar51) +
             auVar129._8_2_;
        auVar196._10_2_ =
             (((short)uVar72 < sVar52) * uVar72 | (ushort)((short)uVar72 >= sVar52) * sVar52) +
             auVar129._10_2_;
        auVar196._12_2_ =
             (((short)uVar74 < sVar54) * uVar74 | (ushort)((short)uVar74 >= sVar54) * sVar54) +
             auVar129._12_2_;
        auVar196._14_2_ =
             (((short)uVar247 < sVar55) * uVar247 | (ushort)((short)uVar247 >= sVar55) * sVar55) +
             auVar129._14_2_;
        auVar196 = auVar196 ^ auVar129;
        bVar192 = auVar279[0];
        bVar122 = auVar216[0];
        bVar165 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[1];
        bVar122 = auVar216[1];
        bVar166 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[2];
        bVar122 = auVar216[2];
        bVar170 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[3];
        bVar122 = auVar216[3];
        bVar171 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[4];
        bVar122 = auVar216[4];
        bVar172 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[5];
        bVar122 = auVar216[5];
        bVar173 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[6];
        bVar122 = auVar216[6];
        bVar177 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[7];
        bVar122 = auVar216[7];
        bVar178 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[8];
        bVar122 = auVar216[8];
        bVar179 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[9];
        bVar122 = auVar216[9];
        bVar180 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[10];
        bVar122 = auVar216[10];
        bVar184 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[0xb];
        bVar122 = auVar216[0xb];
        bVar185 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[0xc];
        bVar122 = auVar216[0xc];
        bVar186 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[0xd];
        bVar122 = auVar216[0xd];
        bVar187 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[0xe];
        bVar122 = auVar216[0xe];
        bVar123 = auVar216[0xf];
        bVar191 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[0xf];
        bVar250 = (bVar123 < bVar192) * bVar192 | (bVar123 >= bVar192) * bVar123;
        sVar31 = auVar279._0_2_;
        uVar47 = (ushort)(sVar31 < (short)uVar47) * sVar31 | (sVar31 >= (short)uVar47) * uVar47;
        sVar33 = auVar279._2_2_;
        uVar56 = (ushort)(sVar33 < (short)uVar50) * sVar33 | (sVar33 >= (short)uVar50) * uVar50;
        sVar48 = auVar279._4_2_;
        uVar70 = (ushort)(sVar48 < (short)uVar53) * sVar48 | (sVar48 >= (short)uVar53) * uVar53;
        sVar49 = auVar279._6_2_;
        uVar461 = (ushort)(sVar49 < (short)uVar60) * sVar49 | (sVar49 >= (short)uVar60) * uVar60;
        sVar51 = auVar279._8_2_;
        uVar58 = (ushort)(sVar51 < (short)uVar65) * sVar51 | (sVar51 >= (short)uVar65) * uVar65;
        sVar52 = auVar279._10_2_;
        uVar62 = (ushort)(sVar52 < (short)uVar455) * sVar52 | (sVar52 >= (short)uVar455) * uVar455;
        sVar54 = auVar279._12_2_;
        uVar67 = (ushort)(sVar54 < (short)uVar457) * sVar54 | (sVar54 >= (short)uVar457) * uVar457;
        sVar55 = auVar279._14_2_;
        uVar72 = (ushort)(sVar55 < (short)uVar463) * sVar55 | (sVar55 >= (short)uVar463) * uVar463;
        auVar219._0_2_ = sVar31 - sVar340;
        auVar219._2_2_ = sVar33 - sVar354;
        auVar219._4_2_ = sVar48 - sVar356;
        auVar219._6_2_ = sVar49 - sVar358;
        auVar219._8_2_ = sVar51 - sVar361;
        auVar219._10_2_ = sVar52 - sVar364;
        auVar219._12_2_ = sVar54 - sVar367;
        auVar219._14_2_ = sVar55 - sVar370;
        auVar216 = pabsw(auVar127,auVar219);
        uVar247 = auVar216._0_2_;
        auVar283._0_2_ = uVar247 >> uVar427;
        uVar124 = auVar216._2_2_;
        auVar283._2_2_ = uVar124 >> uVar427;
        uVar146 = auVar216._4_2_;
        auVar283._4_2_ = uVar146 >> uVar427;
        uVar153 = auVar216._6_2_;
        auVar283._6_2_ = uVar153 >> uVar427;
        uVar160 = auVar216._8_2_;
        auVar283._8_2_ = uVar160 >> uVar427;
        uVar167 = auVar216._10_2_;
        auVar283._10_2_ = uVar167 >> uVar427;
        uVar174 = auVar216._12_2_;
        uVar182 = auVar216._14_2_;
        auVar283._12_2_ = uVar174 >> uVar427;
        auVar283._14_2_ = uVar182 >> uVar427;
        auVar216 = psubusw(local_108,auVar283);
        uVar50 = (ushort)(sVar97 < sVar207) * sVar97 | (ushort)(sVar97 >= sVar207) * sVar207;
        uVar53 = (ushort)(sVar359 < sVar209) * sVar359 | (ushort)(sVar359 >= sVar209) * sVar209;
        uVar65 = (ushort)(sVar98 < sVar211) * sVar98 | (ushort)(sVar98 >= sVar211) * sVar211;
        uVar457 = (ushort)(sVar99 < sVar213) * sVar99 | (ushort)(sVar99 >= sVar213) * sVar213;
        uVar465 = (ushort)(sVar362 < sVar290) * sVar362 | (ushort)(sVar362 >= sVar290) * sVar290;
        uVar63 = (ushort)(sVar100 < sVar292) * sVar100 | (ushort)(sVar100 >= sVar292) * sVar292;
        uVar68 = (ushort)(sVar101 < sVar300) * sVar101 | (ushort)(sVar101 >= sVar300) * sVar300;
        uVar73 = (ushort)(sVar365 < sVar310) * sVar365 | (ushort)(sVar365 >= sVar310) * sVar310;
        auVar279 = lddqu(auVar109,*(undefined1 (*) [16])((long)in + lVar25 * -2 + 0x120));
        bVar192 = auVar279[0];
        bVar122 = auVar109[0];
        bVar251 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[1];
        bVar122 = auVar109[1];
        bVar264 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[2];
        bVar122 = auVar109[2];
        bVar266 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[3];
        bVar122 = auVar109[3];
        bVar268 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[4];
        bVar122 = auVar109[4];
        bVar270 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[5];
        bVar122 = auVar109[5];
        bVar272 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[6];
        bVar122 = auVar109[6];
        bVar274 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[7];
        bVar122 = auVar109[7];
        bVar276 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[8];
        bVar122 = auVar109[8];
        bVar293 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[9];
        bVar122 = auVar109[9];
        bVar296 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[10];
        bVar122 = auVar109[10];
        bVar298 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[0xb];
        bVar122 = auVar109[0xb];
        bVar301 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[0xc];
        bVar122 = auVar109[0xc];
        bVar303 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[0xd];
        bVar122 = auVar109[0xd];
        bVar306 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[0xe];
        bVar122 = auVar109[0xe];
        bVar123 = auVar109[0xf];
        bVar308 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[0xf];
        bVar311 = (bVar123 < bVar192) * bVar192 | (bVar123 >= bVar192) * bVar123;
        sVar31 = auVar279._0_2_;
        uVar50 = (ushort)(sVar31 < (short)uVar50) * sVar31 | (sVar31 >= (short)uVar50) * uVar50;
        sVar33 = auVar279._2_2_;
        uVar60 = (ushort)(sVar33 < (short)uVar53) * sVar33 | (sVar33 >= (short)uVar53) * uVar53;
        sVar48 = auVar279._4_2_;
        uVar455 = (ushort)(sVar48 < (short)uVar65) * sVar48 | (sVar48 >= (short)uVar65) * uVar65;
        sVar49 = auVar279._6_2_;
        uVar463 = (ushort)(sVar49 < (short)uVar457) * sVar49 | (sVar49 >= (short)uVar457) * uVar457;
        sVar51 = auVar279._8_2_;
        uVar59 = (ushort)(sVar51 < (short)uVar465) * sVar51 | (sVar51 >= (short)uVar465) * uVar465;
        sVar52 = auVar279._10_2_;
        uVar64 = (ushort)(sVar52 < (short)uVar63) * sVar52 | (sVar52 >= (short)uVar63) * uVar63;
        sVar54 = auVar279._12_2_;
        uVar69 = (ushort)(sVar54 < (short)uVar68) * sVar54 | (sVar54 >= (short)uVar68) * uVar68;
        sVar55 = auVar279._14_2_;
        uVar74 = (ushort)(sVar55 < (short)uVar73) * sVar55 | (sVar55 >= (short)uVar73) * uVar73;
        auVar284._0_2_ = sVar31 - sVar215;
        auVar284._2_2_ = sVar33 - sVar236;
        auVar284._4_2_ = sVar48 - sVar238;
        auVar284._6_2_ = sVar49 - sVar240;
        auVar284._8_2_ = sVar51 - sVar242;
        auVar284._10_2_ = sVar52 - sVar244;
        auVar284._12_2_ = sVar54 - sVar246;
        auVar284._14_2_ = sVar55 - sVar249;
        auVar109 = pabsw(auVar194,auVar284);
        uVar53 = auVar109._0_2_;
        auVar375._0_2_ = uVar53 >> uVar427;
        uVar65 = auVar109._2_2_;
        auVar375._2_2_ = uVar65 >> uVar427;
        uVar457 = auVar109._4_2_;
        auVar375._4_2_ = uVar457 >> uVar427;
        uVar465 = auVar109._6_2_;
        auVar375._6_2_ = uVar465 >> uVar427;
        uVar63 = auVar109._8_2_;
        auVar375._8_2_ = uVar63 >> uVar427;
        uVar68 = auVar109._10_2_;
        auVar375._10_2_ = uVar68 >> uVar427;
        uVar73 = auVar109._12_2_;
        uVar190 = auVar109._14_2_;
        auVar375._12_2_ = uVar73 >> uVar427;
        auVar375._14_2_ = uVar190 >> uVar427;
        auVar279 = psubusw(local_108,auVar375);
        sVar31 = auVar216._0_2_;
        sVar33 = auVar216._2_2_;
        sVar48 = auVar216._4_2_;
        sVar49 = auVar216._6_2_;
        sVar51 = auVar216._8_2_;
        sVar52 = auVar216._10_2_;
        sVar54 = auVar216._12_2_;
        sVar55 = auVar216._14_2_;
        sVar341 = auVar279._0_2_;
        sVar75 = auVar279._2_2_;
        sVar76 = auVar279._4_2_;
        sVar355 = auVar279._6_2_;
        sVar94 = auVar279._8_2_;
        sVar95 = auVar279._10_2_;
        sVar357 = auVar279._12_2_;
        sVar96 = auVar279._14_2_;
        auVar216 = psraw(auVar219,0xf);
        auVar81._0_2_ =
             (((short)uVar247 < sVar31) * uVar247 | (ushort)((short)uVar247 >= sVar31) * sVar31) +
             auVar216._0_2_;
        auVar81._2_2_ =
             (((short)uVar124 < sVar33) * uVar124 | (ushort)((short)uVar124 >= sVar33) * sVar33) +
             auVar216._2_2_;
        auVar81._4_2_ =
             (((short)uVar146 < sVar48) * uVar146 | (ushort)((short)uVar146 >= sVar48) * sVar48) +
             auVar216._4_2_;
        auVar81._6_2_ =
             (((short)uVar153 < sVar49) * uVar153 | (ushort)((short)uVar153 >= sVar49) * sVar49) +
             auVar216._6_2_;
        auVar81._8_2_ =
             (((short)uVar160 < sVar51) * uVar160 | (ushort)((short)uVar160 >= sVar51) * sVar51) +
             auVar216._8_2_;
        auVar81._10_2_ =
             (((short)uVar167 < sVar52) * uVar167 | (ushort)((short)uVar167 >= sVar52) * sVar52) +
             auVar216._10_2_;
        auVar81._12_2_ =
             (((short)uVar174 < sVar54) * uVar174 | (ushort)((short)uVar174 >= sVar54) * sVar54) +
             auVar216._12_2_;
        auVar81._14_2_ =
             (((short)uVar182 < sVar55) * uVar182 | (ushort)((short)uVar182 >= sVar55) * sVar55) +
             auVar216._14_2_;
        auVar81 = auVar81 ^ auVar216;
        auVar279 = psraw(auVar284,0xf);
        auVar112._0_2_ =
             (((short)uVar53 < sVar341) * uVar53 | (ushort)((short)uVar53 >= sVar341) * sVar341) +
             auVar279._0_2_;
        auVar112._2_2_ =
             (((short)uVar65 < sVar75) * uVar65 | (ushort)((short)uVar65 >= sVar75) * sVar75) +
             auVar279._2_2_;
        auVar112._4_2_ =
             (((short)uVar457 < sVar76) * uVar457 | (ushort)((short)uVar457 >= sVar76) * sVar76) +
             auVar279._4_2_;
        auVar112._6_2_ =
             (((short)uVar465 < sVar355) * uVar465 | (ushort)((short)uVar465 >= sVar355) * sVar355)
             + auVar279._6_2_;
        auVar112._8_2_ =
             (((short)uVar63 < sVar94) * uVar63 | (ushort)((short)uVar63 >= sVar94) * sVar94) +
             auVar279._8_2_;
        auVar112._10_2_ =
             (((short)uVar68 < sVar95) * uVar68 | (ushort)((short)uVar68 >= sVar95) * sVar95) +
             auVar279._10_2_;
        auVar112._12_2_ =
             (((short)uVar73 < sVar357) * uVar73 | (ushort)((short)uVar73 >= sVar357) * sVar357) +
             auVar279._12_2_;
        auVar112._14_2_ =
             (((short)uVar190 < sVar96) * uVar190 | (ushort)((short)uVar190 >= sVar96) * sVar96) +
             auVar279._14_2_;
        auVar112 = auVar112 ^ auVar279;
        auVar216 = lddqu(auVar85,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar22 * 2));
        sVar341 = auVar216._0_2_;
        auVar220._0_2_ = sVar341 - sVar340;
        sVar75 = auVar216._2_2_;
        auVar220._2_2_ = sVar75 - sVar354;
        sVar76 = auVar216._4_2_;
        auVar220._4_2_ = sVar76 - sVar356;
        sVar355 = auVar216._6_2_;
        auVar220._6_2_ = sVar355 - sVar358;
        sVar94 = auVar216._8_2_;
        auVar220._8_2_ = sVar94 - sVar361;
        sVar95 = auVar216._10_2_;
        auVar220._10_2_ = sVar95 - sVar364;
        sVar357 = auVar216._12_2_;
        sVar96 = auVar216._14_2_;
        auVar220._12_2_ = sVar357 - sVar367;
        auVar220._14_2_ = sVar96 - sVar370;
        auVar279 = pabsw(auVar279,auVar220);
        uVar53 = auVar279._0_2_;
        auVar254._0_2_ = uVar53 >> uVar427;
        uVar65 = auVar279._2_2_;
        auVar254._2_2_ = uVar65 >> uVar427;
        uVar457 = auVar279._4_2_;
        auVar254._4_2_ = uVar457 >> uVar427;
        uVar465 = auVar279._6_2_;
        auVar254._6_2_ = uVar465 >> uVar427;
        uVar63 = auVar279._8_2_;
        auVar254._8_2_ = uVar63 >> uVar427;
        uVar68 = auVar279._10_2_;
        auVar254._10_2_ = uVar68 >> uVar427;
        uVar73 = auVar279._12_2_;
        uVar247 = auVar279._14_2_;
        auVar254._12_2_ = uVar73 >> uVar427;
        auVar254._14_2_ = uVar247 >> uVar427;
        auVar279 = psubusw(local_108,auVar254);
        auVar127 = lddqu(auVar384,*(undefined1 (*) [16])
                                   (*(undefined1 (*) [16])((long)in + 0x120) + lVar22 * 2));
        sVar102 = auVar127._0_2_;
        auVar318._0_2_ = sVar102 - sVar215;
        sVar103 = auVar127._2_2_;
        auVar318._2_2_ = sVar103 - sVar236;
        sVar368 = auVar127._4_2_;
        auVar318._4_2_ = sVar368 - sVar238;
        sVar104 = auVar127._6_2_;
        auVar318._6_2_ = sVar104 - sVar240;
        sVar105 = auVar127._8_2_;
        auVar318._8_2_ = sVar105 - sVar242;
        sVar371 = auVar127._10_2_;
        auVar318._10_2_ = sVar371 - sVar244;
        sVar106 = auVar127._12_2_;
        sVar107 = auVar127._14_2_;
        auVar318._12_2_ = sVar106 - sVar246;
        auVar318._14_2_ = sVar107 - sVar249;
        auVar109 = pabsw(auVar109,auVar318);
        uVar124 = auVar109._0_2_;
        auVar442._0_2_ = uVar124 >> uVar427;
        uVar146 = auVar109._2_2_;
        auVar442._2_2_ = uVar146 >> uVar427;
        uVar153 = auVar109._4_2_;
        auVar442._4_2_ = uVar153 >> uVar427;
        uVar160 = auVar109._6_2_;
        auVar442._6_2_ = uVar160 >> uVar427;
        uVar167 = auVar109._8_2_;
        auVar442._8_2_ = uVar167 >> uVar427;
        uVar174 = auVar109._10_2_;
        auVar442._10_2_ = uVar174 >> uVar427;
        uVar182 = auVar109._12_2_;
        uVar190 = auVar109._14_2_;
        auVar442._12_2_ = uVar182 >> uVar427;
        auVar442._14_2_ = uVar190 >> uVar427;
        auVar109 = psubusw(local_108,auVar442);
        sVar31 = auVar279._0_2_;
        sVar33 = auVar279._2_2_;
        sVar48 = auVar279._4_2_;
        sVar49 = auVar279._6_2_;
        sVar51 = auVar279._8_2_;
        sVar52 = auVar279._10_2_;
        sVar54 = auVar279._12_2_;
        sVar55 = auVar279._14_2_;
        sVar97 = auVar109._0_2_;
        sVar359 = auVar109._2_2_;
        sVar98 = auVar109._4_2_;
        sVar99 = auVar109._6_2_;
        sVar362 = auVar109._8_2_;
        sVar100 = auVar109._10_2_;
        sVar101 = auVar109._12_2_;
        sVar365 = auVar109._14_2_;
        auVar279 = psraw(auVar220,0xf);
        auVar197._0_2_ =
             (((short)uVar53 < sVar31) * uVar53 | (ushort)((short)uVar53 >= sVar31) * sVar31) +
             auVar279._0_2_;
        auVar197._2_2_ =
             (((short)uVar65 < sVar33) * uVar65 | (ushort)((short)uVar65 >= sVar33) * sVar33) +
             auVar279._2_2_;
        auVar197._4_2_ =
             (((short)uVar457 < sVar48) * uVar457 | (ushort)((short)uVar457 >= sVar48) * sVar48) +
             auVar279._4_2_;
        auVar197._6_2_ =
             (((short)uVar465 < sVar49) * uVar465 | (ushort)((short)uVar465 >= sVar49) * sVar49) +
             auVar279._6_2_;
        auVar197._8_2_ =
             (((short)uVar63 < sVar51) * uVar63 | (ushort)((short)uVar63 >= sVar51) * sVar51) +
             auVar279._8_2_;
        auVar197._10_2_ =
             (((short)uVar68 < sVar52) * uVar68 | (ushort)((short)uVar68 >= sVar52) * sVar52) +
             auVar279._10_2_;
        auVar197._12_2_ =
             (((short)uVar73 < sVar54) * uVar73 | (ushort)((short)uVar73 >= sVar54) * sVar54) +
             auVar279._12_2_;
        auVar197._14_2_ =
             (((short)uVar247 < sVar55) * uVar247 | (ushort)((short)uVar247 >= sVar55) * sVar55) +
             auVar279._14_2_;
        auVar197 = auVar197 ^ auVar279;
        auVar109 = psraw(auVar318,0xf);
        auVar255._0_2_ =
             (((short)uVar124 < sVar97) * uVar124 | (ushort)((short)uVar124 >= sVar97) * sVar97) +
             auVar109._0_2_;
        auVar255._2_2_ =
             (((short)uVar146 < sVar359) * uVar146 | (ushort)((short)uVar146 >= sVar359) * sVar359)
             + auVar109._2_2_;
        auVar255._4_2_ =
             (((short)uVar153 < sVar98) * uVar153 | (ushort)((short)uVar153 >= sVar98) * sVar98) +
             auVar109._4_2_;
        auVar255._6_2_ =
             (((short)uVar160 < sVar99) * uVar160 | (ushort)((short)uVar160 >= sVar99) * sVar99) +
             auVar109._6_2_;
        auVar255._8_2_ =
             (((short)uVar167 < sVar362) * uVar167 | (ushort)((short)uVar167 >= sVar362) * sVar362)
             + auVar109._8_2_;
        auVar255._10_2_ =
             (((short)uVar174 < sVar100) * uVar174 | (ushort)((short)uVar174 >= sVar100) * sVar100)
             + auVar109._10_2_;
        auVar255._12_2_ =
             (((short)uVar182 < sVar101) * uVar182 | (ushort)((short)uVar182 >= sVar101) * sVar101)
             + auVar109._12_2_;
        auVar255._14_2_ =
             (((short)uVar190 < sVar365) * uVar190 | (ushort)((short)uVar190 >= sVar365) * sVar365)
             + auVar109._14_2_;
        auVar255 = auVar255 ^ auVar109;
        auVar279 = lddqu(auVar279,*(undefined1 (*) [16])((long)in + lVar22 * -2));
        bVar192 = auVar279[0];
        bVar122 = auVar216[0];
        bVar263 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[1];
        bVar122 = auVar216[1];
        bVar265 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[2];
        bVar122 = auVar216[2];
        bVar267 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[3];
        bVar122 = auVar216[3];
        bVar269 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[4];
        bVar122 = auVar216[4];
        bVar271 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[5];
        bVar122 = auVar216[5];
        bVar273 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[6];
        bVar122 = auVar216[6];
        bVar275 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[7];
        bVar122 = auVar216[7];
        bVar277 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[8];
        bVar122 = auVar216[8];
        bVar294 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[9];
        bVar122 = auVar216[9];
        bVar297 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[10];
        bVar122 = auVar216[10];
        bVar299 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[0xb];
        bVar122 = auVar216[0xb];
        bVar302 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[0xc];
        bVar122 = auVar216[0xc];
        bVar304 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[0xd];
        bVar122 = auVar216[0xd];
        bVar307 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[0xe];
        bVar122 = auVar216[0xe];
        bVar123 = auVar216[0xf];
        bVar309 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar279[0xf];
        bVar312 = (bVar123 < bVar192) * bVar192 | (bVar123 >= bVar192) * bVar123;
        sVar31 = auVar279._0_2_;
        uVar124 = (ushort)(sVar31 < sVar341) * sVar31 | (ushort)(sVar31 >= sVar341) * sVar341;
        sVar33 = auVar279._2_2_;
        uVar146 = (ushort)(sVar33 < sVar75) * sVar33 | (ushort)(sVar33 >= sVar75) * sVar75;
        sVar48 = auVar279._4_2_;
        uVar153 = (ushort)(sVar48 < sVar76) * sVar48 | (ushort)(sVar48 >= sVar76) * sVar76;
        sVar49 = auVar279._6_2_;
        uVar160 = (ushort)(sVar49 < sVar355) * sVar49 | (ushort)(sVar49 >= sVar355) * sVar355;
        sVar51 = auVar279._8_2_;
        uVar167 = (ushort)(sVar51 < sVar94) * sVar51 | (ushort)(sVar51 >= sVar94) * sVar94;
        sVar52 = auVar279._10_2_;
        uVar174 = (ushort)(sVar52 < sVar95) * sVar52 | (ushort)(sVar52 >= sVar95) * sVar95;
        sVar54 = auVar279._12_2_;
        uVar182 = (ushort)(sVar54 < sVar357) * sVar54 | (ushort)(sVar54 >= sVar357) * sVar357;
        sVar55 = auVar279._14_2_;
        uVar190 = (ushort)(sVar55 < sVar96) * sVar55 | (ushort)(sVar55 >= sVar96) * sVar96;
        auVar443._0_2_ = sVar31 - sVar340;
        auVar443._2_2_ = sVar33 - sVar354;
        auVar443._4_2_ = sVar48 - sVar356;
        auVar443._6_2_ = sVar49 - sVar358;
        auVar443._8_2_ = sVar51 - sVar361;
        auVar443._10_2_ = sVar52 - sVar364;
        auVar443._12_2_ = sVar54 - sVar367;
        auVar443._14_2_ = sVar55 - sVar370;
        auVar216 = pabsw(auVar46,auVar443);
        uVar214 = auVar216._0_2_;
        auVar221._0_2_ = uVar214 >> uVar427;
        uVar235 = auVar216._2_2_;
        auVar221._2_2_ = uVar235 >> uVar427;
        uVar237 = auVar216._4_2_;
        auVar221._4_2_ = uVar237 >> uVar427;
        uVar239 = auVar216._6_2_;
        auVar221._6_2_ = uVar239 >> uVar427;
        uVar241 = auVar216._8_2_;
        auVar221._8_2_ = uVar241 >> uVar427;
        uVar243 = auVar216._10_2_;
        auVar221._10_2_ = uVar243 >> uVar427;
        uVar245 = auVar216._12_2_;
        uVar248 = auVar216._14_2_;
        auVar221._12_2_ = uVar245 >> uVar427;
        auVar221._14_2_ = uVar248 >> uVar427;
        auVar279 = psubusw(local_108,auVar221);
        auVar216 = lddqu(auVar109,*(undefined1 (*) [16])((long)in + lVar22 * -2 + 0x120));
        bVar192 = auVar216[0];
        bVar122 = auVar127[0];
        bVar122 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar216[1];
        bVar123 = auVar127[1];
        bVar123 = (bVar123 < bVar192) * bVar192 | (bVar123 >= bVar192) * bVar123;
        bVar192 = auVar216[2];
        bVar142 = auVar127[2];
        bVar142 = (bVar142 < bVar192) * bVar192 | (bVar142 >= bVar192) * bVar142;
        bVar192 = auVar216[3];
        bVar143 = auVar127[3];
        bVar143 = (bVar143 < bVar192) * bVar192 | (bVar143 >= bVar192) * bVar143;
        bVar192 = auVar216[4];
        bVar144 = auVar127[4];
        bVar144 = (bVar144 < bVar192) * bVar192 | (bVar144 >= bVar192) * bVar144;
        bVar192 = auVar216[5];
        bVar145 = auVar127[5];
        bVar145 = (bVar145 < bVar192) * bVar192 | (bVar145 >= bVar192) * bVar145;
        bVar192 = auVar216[6];
        bVar149 = auVar127[6];
        bVar149 = (bVar149 < bVar192) * bVar192 | (bVar149 >= bVar192) * bVar149;
        bVar192 = auVar216[7];
        bVar150 = auVar127[7];
        bVar150 = (bVar150 < bVar192) * bVar192 | (bVar150 >= bVar192) * bVar150;
        bVar192 = auVar216[8];
        bVar151 = auVar127[8];
        bVar151 = (bVar151 < bVar192) * bVar192 | (bVar151 >= bVar192) * bVar151;
        bVar192 = auVar216[9];
        bVar152 = auVar127[9];
        bVar152 = (bVar152 < bVar192) * bVar192 | (bVar152 >= bVar192) * bVar152;
        bVar192 = auVar216[10];
        bVar156 = auVar127[10];
        bVar156 = (bVar156 < bVar192) * bVar192 | (bVar156 >= bVar192) * bVar156;
        bVar192 = auVar216[0xb];
        bVar157 = auVar127[0xb];
        bVar157 = (bVar157 < bVar192) * bVar192 | (bVar157 >= bVar192) * bVar157;
        bVar192 = auVar216[0xc];
        bVar158 = auVar127[0xc];
        bVar158 = (bVar158 < bVar192) * bVar192 | (bVar158 >= bVar192) * bVar158;
        bVar192 = auVar216[0xd];
        bVar159 = auVar127[0xd];
        bVar159 = (bVar159 < bVar192) * bVar192 | (bVar159 >= bVar192) * bVar159;
        bVar192 = auVar216[0xe];
        bVar163 = auVar127[0xe];
        bVar164 = auVar127[0xf];
        bVar163 = (bVar163 < bVar192) * bVar192 | (bVar163 >= bVar192) * bVar163;
        bVar192 = auVar216[0xf];
        bVar164 = (bVar164 < bVar192) * bVar192 | (bVar164 >= bVar192) * bVar164;
        sVar31 = auVar216._0_2_;
        uVar383 = (ushort)(sVar31 < sVar102) * sVar31 | (ushort)(sVar31 >= sVar102) * sVar102;
        sVar33 = auVar216._2_2_;
        uVar391 = (ushort)(sVar33 < sVar103) * sVar33 | (ushort)(sVar33 >= sVar103) * sVar103;
        sVar48 = auVar216._4_2_;
        uVar394 = (ushort)(sVar48 < sVar368) * sVar48 | (ushort)(sVar48 >= sVar368) * sVar368;
        sVar49 = auVar216._6_2_;
        uVar397 = (ushort)(sVar49 < sVar104) * sVar49 | (ushort)(sVar49 >= sVar104) * sVar104;
        sVar51 = auVar216._8_2_;
        uVar400 = (ushort)(sVar51 < sVar105) * sVar51 | (ushort)(sVar51 >= sVar105) * sVar105;
        sVar52 = auVar216._10_2_;
        uVar404 = (ushort)(sVar52 < sVar371) * sVar52 | (ushort)(sVar52 >= sVar371) * sVar371;
        sVar54 = auVar216._12_2_;
        uVar408 = (ushort)(sVar54 < sVar106) * sVar54 | (ushort)(sVar54 >= sVar106) * sVar106;
        sVar55 = auVar216._14_2_;
        uVar412 = (ushort)(sVar55 < sVar107) * sVar55 | (ushort)(sVar55 >= sVar107) * sVar107;
        auVar319._0_2_ = sVar31 - sVar215;
        auVar319._2_2_ = sVar33 - sVar236;
        auVar319._4_2_ = sVar48 - sVar238;
        auVar319._6_2_ = sVar49 - sVar240;
        auVar319._8_2_ = sVar51 - sVar242;
        auVar319._10_2_ = sVar52 - sVar244;
        auVar319._12_2_ = sVar54 - sVar246;
        auVar319._14_2_ = sVar55 - sVar249;
        auVar216 = pabsw(auVar221,auVar319);
        uVar53 = auVar216._0_2_;
        auVar41._0_2_ = uVar53 >> uVar427;
        uVar65 = auVar216._2_2_;
        auVar41._2_2_ = uVar65 >> uVar427;
        uVar457 = auVar216._4_2_;
        auVar41._4_2_ = uVar457 >> uVar427;
        uVar465 = auVar216._6_2_;
        auVar41._6_2_ = uVar465 >> uVar427;
        uVar63 = auVar216._8_2_;
        auVar41._8_2_ = uVar63 >> uVar427;
        uVar68 = auVar216._10_2_;
        auVar41._10_2_ = uVar68 >> uVar427;
        uVar73 = auVar216._12_2_;
        uVar247 = auVar216._14_2_;
        auVar41._12_2_ = uVar73 >> uVar427;
        auVar41._14_2_ = uVar247 >> uVar427;
        auVar216 = psubusw(local_108,auVar41);
        sVar341 = auVar279._0_2_;
        sVar75 = auVar279._2_2_;
        sVar76 = auVar279._4_2_;
        sVar355 = auVar279._6_2_;
        sVar94 = auVar279._8_2_;
        sVar95 = auVar279._10_2_;
        sVar357 = auVar279._12_2_;
        sVar96 = auVar279._14_2_;
        sVar31 = auVar216._0_2_;
        sVar33 = auVar216._2_2_;
        sVar48 = auVar216._4_2_;
        sVar49 = auVar216._6_2_;
        sVar51 = auVar216._8_2_;
        sVar52 = auVar216._10_2_;
        sVar54 = auVar216._12_2_;
        sVar55 = auVar216._14_2_;
        auVar216 = psraw(auVar443,0xf);
        auVar376._0_2_ =
             (((short)uVar214 < sVar341) * uVar214 | (ushort)((short)uVar214 >= sVar341) * sVar341)
             + auVar216._0_2_;
        auVar376._2_2_ =
             (((short)uVar235 < sVar75) * uVar235 | (ushort)((short)uVar235 >= sVar75) * sVar75) +
             auVar216._2_2_;
        auVar376._4_2_ =
             (((short)uVar237 < sVar76) * uVar237 | (ushort)((short)uVar237 >= sVar76) * sVar76) +
             auVar216._4_2_;
        auVar376._6_2_ =
             (((short)uVar239 < sVar355) * uVar239 | (ushort)((short)uVar239 >= sVar355) * sVar355)
             + auVar216._6_2_;
        auVar376._8_2_ =
             (((short)uVar241 < sVar94) * uVar241 | (ushort)((short)uVar241 >= sVar94) * sVar94) +
             auVar216._8_2_;
        auVar376._10_2_ =
             (((short)uVar243 < sVar95) * uVar243 | (ushort)((short)uVar243 >= sVar95) * sVar95) +
             auVar216._10_2_;
        auVar376._12_2_ =
             (((short)uVar245 < sVar357) * uVar245 | (ushort)((short)uVar245 >= sVar357) * sVar357)
             + auVar216._12_2_;
        auVar376._14_2_ =
             (((short)uVar248 < sVar96) * uVar248 | (ushort)((short)uVar248 >= sVar96) * sVar96) +
             auVar216._14_2_;
        auVar376 = auVar376 ^ auVar216;
        auVar216 = psraw(auVar319,0xf);
        auVar285._0_2_ =
             (((short)uVar53 < sVar31) * uVar53 | (ushort)((short)uVar53 >= sVar31) * sVar31) +
             auVar216._0_2_;
        auVar285._2_2_ =
             (((short)uVar65 < sVar33) * uVar65 | (ushort)((short)uVar65 >= sVar33) * sVar33) +
             auVar216._2_2_;
        auVar285._4_2_ =
             (((short)uVar457 < sVar48) * uVar457 | (ushort)((short)uVar457 >= sVar48) * sVar48) +
             auVar216._4_2_;
        auVar285._6_2_ =
             (((short)uVar465 < sVar49) * uVar465 | (ushort)((short)uVar465 >= sVar49) * sVar49) +
             auVar216._6_2_;
        auVar285._8_2_ =
             (((short)uVar63 < sVar51) * uVar63 | (ushort)((short)uVar63 >= sVar51) * sVar51) +
             auVar216._8_2_;
        auVar285._10_2_ =
             (((short)uVar68 < sVar52) * uVar68 | (ushort)((short)uVar68 >= sVar52) * sVar52) +
             auVar216._10_2_;
        auVar285._12_2_ =
             (((short)uVar73 < sVar54) * uVar73 | (ushort)((short)uVar73 >= sVar54) * sVar54) +
             auVar216._12_2_;
        auVar285._14_2_ =
             (((short)uVar247 < sVar55) * uVar247 | (ushort)((short)uVar247 >= sVar55) * sVar55) +
             auVar216._14_2_;
        auVar285 = auVar285 ^ auVar216;
        in_XMM7._0_2_ =
             (auVar285._0_2_ + auVar255._0_2_ + auVar112._0_2_ + auVar196._0_2_) * local_b8 +
             (auVar416._0_2_ + auVar79._0_2_) * local_a8 +
             (auVar218._0_2_ + auVar39._0_2_) * (short)local_98;
        in_XMM7._2_2_ =
             (auVar285._2_2_ + auVar255._2_2_ + auVar112._2_2_ + auVar196._2_2_) * sStack_b6 +
             (auVar416._2_2_ + auVar79._2_2_) * sStack_a6 +
             (auVar218._2_2_ + auVar39._2_2_) * local_98._2_2_;
        in_XMM7._4_2_ =
             (auVar285._4_2_ + auVar255._4_2_ + auVar112._4_2_ + auVar196._4_2_) * local_b8 +
             (auVar416._4_2_ + auVar79._4_2_) * local_a8 +
             (auVar218._4_2_ + auVar39._4_2_) * (short)local_98;
        in_XMM7._6_2_ =
             (auVar285._6_2_ + auVar255._6_2_ + auVar112._6_2_ + auVar196._6_2_) * sStack_b6 +
             (auVar416._6_2_ + auVar79._6_2_) * sStack_a6 +
             (auVar218._6_2_ + auVar39._6_2_) * local_98._2_2_;
        in_XMM7._8_2_ =
             (auVar285._8_2_ + auVar255._8_2_ + auVar112._8_2_ + auVar196._8_2_) * local_b8 +
             (auVar416._8_2_ + auVar79._8_2_) * local_a8 +
             (auVar218._8_2_ + auVar39._8_2_) * (short)local_98;
        in_XMM7._10_2_ =
             (auVar285._10_2_ + auVar255._10_2_ + auVar112._10_2_ + auVar196._10_2_) * sStack_b6 +
             (auVar416._10_2_ + auVar79._10_2_) * sStack_a6 +
             (auVar218._10_2_ + auVar39._10_2_) * local_98._2_2_;
        in_XMM7._12_2_ =
             (auVar285._12_2_ + auVar255._12_2_ + auVar112._12_2_ + auVar196._12_2_) * local_b8 +
             (auVar416._12_2_ + auVar79._12_2_) * local_a8 +
             (auVar218._12_2_ + auVar39._12_2_) * (short)local_98;
        in_XMM7._14_2_ =
             (auVar285._14_2_ + auVar255._14_2_ + auVar112._14_2_ + auVar196._14_2_) * sStack_b6 +
             (auVar416._14_2_ + auVar79._14_2_) * sStack_a6 +
             (auVar218._14_2_ + auVar39._14_2_) * local_98._2_2_;
        auVar109 = lddqu(auVar197,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar26 * 2));
        sVar97 = auVar109._0_2_;
        auVar113._0_2_ = sVar97 - sVar340;
        sVar359 = auVar109._2_2_;
        auVar113._2_2_ = sVar359 - sVar354;
        sVar98 = auVar109._4_2_;
        auVar113._4_2_ = sVar98 - sVar356;
        sVar99 = auVar109._6_2_;
        auVar113._6_2_ = sVar99 - sVar358;
        sVar362 = auVar109._8_2_;
        auVar113._8_2_ = sVar362 - sVar361;
        sVar100 = auVar109._10_2_;
        auVar113._10_2_ = sVar100 - sVar364;
        sVar101 = auVar109._12_2_;
        sVar365 = auVar109._14_2_;
        auVar113._12_2_ = sVar101 - sVar367;
        auVar113._14_2_ = sVar365 - sVar370;
        auVar127 = lddqu(auVar216,*(undefined1 (*) [16])
                                   (*(undefined1 (*) [16])((long)in + 0x120) + lVar26 * 2));
        sVar102 = auVar127._0_2_;
        auVar222._0_2_ = sVar102 - sVar215;
        sVar103 = auVar127._2_2_;
        auVar222._2_2_ = sVar103 - sVar236;
        sVar368 = auVar127._4_2_;
        auVar222._4_2_ = sVar368 - sVar238;
        sVar104 = auVar127._6_2_;
        auVar222._6_2_ = sVar104 - sVar240;
        sVar105 = auVar127._8_2_;
        auVar222._8_2_ = sVar105 - sVar242;
        sVar371 = auVar127._10_2_;
        auVar222._10_2_ = sVar371 - sVar244;
        sVar106 = auVar127._12_2_;
        sVar107 = auVar127._14_2_;
        auVar222._12_2_ = sVar106 - sVar246;
        auVar222._14_2_ = sVar107 - sVar249;
        auVar216 = pabsw(auVar255,auVar113);
        uVar53 = auVar216._0_2_;
        auVar42._0_2_ = uVar53 >> uVar427;
        uVar65 = auVar216._2_2_;
        auVar42._2_2_ = uVar65 >> uVar427;
        uVar457 = auVar216._4_2_;
        auVar42._4_2_ = uVar457 >> uVar427;
        uVar465 = auVar216._6_2_;
        auVar42._6_2_ = uVar465 >> uVar427;
        uVar63 = auVar216._8_2_;
        auVar42._8_2_ = uVar63 >> uVar427;
        uVar68 = auVar216._10_2_;
        auVar42._10_2_ = uVar68 >> uVar427;
        uVar73 = auVar216._12_2_;
        uVar247 = auVar216._14_2_;
        auVar42._12_2_ = uVar73 >> uVar427;
        auVar42._14_2_ = uVar247 >> uVar427;
        auVar216 = pabsw(ZEXT416(uVar28),auVar222);
        uVar214 = auVar216._0_2_;
        auVar444._0_2_ = uVar214 >> uVar427;
        uVar235 = auVar216._2_2_;
        auVar444._2_2_ = uVar235 >> uVar427;
        uVar237 = auVar216._4_2_;
        auVar444._4_2_ = uVar237 >> uVar427;
        uVar239 = auVar216._6_2_;
        auVar444._6_2_ = uVar239 >> uVar427;
        uVar241 = auVar216._8_2_;
        auVar444._8_2_ = uVar241 >> uVar427;
        uVar243 = auVar216._10_2_;
        auVar444._10_2_ = uVar243 >> uVar427;
        uVar245 = auVar216._12_2_;
        uVar248 = auVar216._14_2_;
        auVar444._12_2_ = uVar245 >> uVar427;
        auVar444._14_2_ = uVar248 >> uVar427;
        auVar279 = psubusw(local_108,auVar42);
        auVar216 = psubusw(local_108,auVar444);
        sVar341 = auVar279._0_2_;
        sVar75 = auVar279._2_2_;
        sVar76 = auVar279._4_2_;
        sVar355 = auVar279._6_2_;
        sVar94 = auVar279._8_2_;
        sVar95 = auVar279._10_2_;
        sVar357 = auVar279._12_2_;
        sVar96 = auVar279._14_2_;
        sVar31 = auVar216._0_2_;
        sVar33 = auVar216._2_2_;
        sVar48 = auVar216._4_2_;
        sVar49 = auVar216._6_2_;
        sVar51 = auVar216._8_2_;
        sVar52 = auVar216._10_2_;
        sVar54 = auVar216._12_2_;
        sVar55 = auVar216._14_2_;
        auVar216 = psraw(auVar113,0xf);
        auVar82._0_2_ =
             (((short)uVar53 < sVar341) * uVar53 | (ushort)((short)uVar53 >= sVar341) * sVar341) +
             auVar216._0_2_;
        auVar82._2_2_ =
             (((short)uVar65 < sVar75) * uVar65 | (ushort)((short)uVar65 >= sVar75) * sVar75) +
             auVar216._2_2_;
        auVar82._4_2_ =
             (((short)uVar457 < sVar76) * uVar457 | (ushort)((short)uVar457 >= sVar76) * sVar76) +
             auVar216._4_2_;
        auVar82._6_2_ =
             (((short)uVar465 < sVar355) * uVar465 | (ushort)((short)uVar465 >= sVar355) * sVar355)
             + auVar216._6_2_;
        auVar82._8_2_ =
             (((short)uVar63 < sVar94) * uVar63 | (ushort)((short)uVar63 >= sVar94) * sVar94) +
             auVar216._8_2_;
        auVar82._10_2_ =
             (((short)uVar68 < sVar95) * uVar68 | (ushort)((short)uVar68 >= sVar95) * sVar95) +
             auVar216._10_2_;
        auVar82._12_2_ =
             (((short)uVar73 < sVar357) * uVar73 | (ushort)((short)uVar73 >= sVar357) * sVar357) +
             auVar216._12_2_;
        auVar82._14_2_ =
             (((short)uVar247 < sVar96) * uVar247 | (ushort)((short)uVar247 >= sVar96) * sVar96) +
             auVar216._14_2_;
        auVar82 = auVar82 ^ auVar216;
        auVar279 = psraw(auVar222,0xf);
        auVar43._0_2_ =
             (((short)uVar214 < sVar31) * uVar214 | (ushort)((short)uVar214 >= sVar31) * sVar31) +
             auVar279._0_2_;
        auVar43._2_2_ =
             (((short)uVar235 < sVar33) * uVar235 | (ushort)((short)uVar235 >= sVar33) * sVar33) +
             auVar279._2_2_;
        auVar43._4_2_ =
             (((short)uVar237 < sVar48) * uVar237 | (ushort)((short)uVar237 >= sVar48) * sVar48) +
             auVar279._4_2_;
        auVar43._6_2_ =
             (((short)uVar239 < sVar49) * uVar239 | (ushort)((short)uVar239 >= sVar49) * sVar49) +
             auVar279._6_2_;
        auVar43._8_2_ =
             (((short)uVar241 < sVar51) * uVar241 | (ushort)((short)uVar241 >= sVar51) * sVar51) +
             auVar279._8_2_;
        auVar43._10_2_ =
             (((short)uVar243 < sVar52) * uVar243 | (ushort)((short)uVar243 >= sVar52) * sVar52) +
             auVar279._10_2_;
        auVar43._12_2_ =
             (((short)uVar245 < sVar54) * uVar245 | (ushort)((short)uVar245 >= sVar54) * sVar54) +
             auVar279._12_2_;
        auVar43._14_2_ =
             (((short)uVar248 < sVar55) * uVar248 | (ushort)((short)uVar248 >= sVar55) * sVar55) +
             auVar279._14_2_;
        auVar43 = auVar43 ^ auVar279;
        uVar53 = (ushort)(sVar97 < (short)uVar124) * sVar97 | (sVar97 >= (short)uVar124) * uVar124;
        uVar65 = (ushort)(sVar359 < (short)uVar146) * sVar359 |
                 (sVar359 >= (short)uVar146) * uVar146;
        uVar457 = (ushort)(sVar98 < (short)uVar153) * sVar98 | (sVar98 >= (short)uVar153) * uVar153;
        uVar465 = (ushort)(sVar99 < (short)uVar160) * sVar99 | (sVar99 >= (short)uVar160) * uVar160;
        uVar63 = (ushort)(sVar362 < (short)uVar167) * sVar362 |
                 (sVar362 >= (short)uVar167) * uVar167;
        uVar68 = (ushort)(sVar100 < (short)uVar174) * sVar100 |
                 (sVar100 >= (short)uVar174) * uVar174;
        uVar73 = (ushort)(sVar101 < (short)uVar182) * sVar101 |
                 (sVar101 >= (short)uVar182) * uVar182;
        uVar247 = (ushort)(sVar365 < (short)uVar190) * sVar365 |
                  (sVar365 >= (short)uVar190) * uVar190;
        auVar216 = lddqu(auVar216,*(undefined1 (*) [16])((long)in + lVar26 * -2));
        bVar192 = auVar216[0];
        bVar313 = auVar109[0];
        bVar382 = (bVar313 < bVar192) * bVar192 | (bVar313 >= bVar192) * bVar313;
        bVar192 = auVar216[1];
        bVar313 = auVar109[1];
        bVar389 = (bVar313 < bVar192) * bVar192 | (bVar313 >= bVar192) * bVar313;
        bVar192 = auVar216[2];
        bVar313 = auVar109[2];
        bVar390 = (bVar313 < bVar192) * bVar192 | (bVar313 >= bVar192) * bVar313;
        bVar192 = auVar216[3];
        bVar313 = auVar109[3];
        bVar392 = (bVar313 < bVar192) * bVar192 | (bVar313 >= bVar192) * bVar313;
        bVar192 = auVar216[4];
        bVar313 = auVar109[4];
        bVar393 = (bVar313 < bVar192) * bVar192 | (bVar313 >= bVar192) * bVar313;
        bVar192 = auVar216[5];
        bVar313 = auVar109[5];
        bVar395 = (bVar313 < bVar192) * bVar192 | (bVar313 >= bVar192) * bVar313;
        bVar192 = auVar216[6];
        bVar313 = auVar109[6];
        bVar396 = (bVar313 < bVar192) * bVar192 | (bVar313 >= bVar192) * bVar313;
        bVar192 = auVar216[7];
        bVar313 = auVar109[7];
        bVar398 = (bVar313 < bVar192) * bVar192 | (bVar313 >= bVar192) * bVar313;
        bVar192 = auVar216[8];
        bVar313 = auVar109[8];
        bVar399 = (bVar313 < bVar192) * bVar192 | (bVar313 >= bVar192) * bVar313;
        bVar192 = auVar216[9];
        bVar313 = auVar109[9];
        bVar402 = (bVar313 < bVar192) * bVar192 | (bVar313 >= bVar192) * bVar313;
        bVar192 = auVar216[10];
        bVar313 = auVar109[10];
        bVar403 = (bVar313 < bVar192) * bVar192 | (bVar313 >= bVar192) * bVar313;
        bVar192 = auVar216[0xb];
        bVar313 = auVar109[0xb];
        bVar406 = (bVar313 < bVar192) * bVar192 | (bVar313 >= bVar192) * bVar313;
        bVar192 = auVar216[0xc];
        bVar313 = auVar109[0xc];
        bVar407 = (bVar313 < bVar192) * bVar192 | (bVar313 >= bVar192) * bVar313;
        bVar192 = auVar216[0xd];
        bVar313 = auVar109[0xd];
        bVar410 = (bVar313 < bVar192) * bVar192 | (bVar313 >= bVar192) * bVar313;
        bVar192 = auVar216[0xe];
        bVar313 = auVar109[0xe];
        bVar325 = auVar109[0xf];
        bVar411 = (bVar313 < bVar192) * bVar192 | (bVar313 >= bVar192) * bVar313;
        bVar192 = auVar216[0xf];
        bVar414 = (bVar325 < bVar192) * bVar192 | (bVar325 >= bVar192) * bVar325;
        sVar31 = auVar216._0_2_;
        uVar214 = (ushort)(sVar31 < (short)uVar53) * sVar31 | (sVar31 >= (short)uVar53) * uVar53;
        sVar33 = auVar216._2_2_;
        uVar235 = (ushort)(sVar33 < (short)uVar65) * sVar33 | (sVar33 >= (short)uVar65) * uVar65;
        sVar48 = auVar216._4_2_;
        uVar237 = (ushort)(sVar48 < (short)uVar457) * sVar48 | (sVar48 >= (short)uVar457) * uVar457;
        sVar49 = auVar216._6_2_;
        uVar239 = (ushort)(sVar49 < (short)uVar465) * sVar49 | (sVar49 >= (short)uVar465) * uVar465;
        sVar51 = auVar216._8_2_;
        uVar241 = (ushort)(sVar51 < (short)uVar63) * sVar51 | (sVar51 >= (short)uVar63) * uVar63;
        sVar52 = auVar216._10_2_;
        uVar243 = (ushort)(sVar52 < (short)uVar68) * sVar52 | (sVar52 >= (short)uVar68) * uVar68;
        sVar54 = auVar216._12_2_;
        uVar245 = (ushort)(sVar54 < (short)uVar73) * sVar54 | (sVar54 >= (short)uVar73) * uVar73;
        sVar55 = auVar216._14_2_;
        uVar248 = (ushort)(sVar55 < (short)uVar247) * sVar55 | (sVar55 >= (short)uVar247) * uVar247;
        auVar223._0_2_ = sVar31 - sVar340;
        auVar223._2_2_ = sVar33 - sVar354;
        auVar223._4_2_ = sVar48 - sVar356;
        auVar223._6_2_ = sVar49 - sVar358;
        auVar223._8_2_ = sVar51 - sVar361;
        auVar223._10_2_ = sVar52 - sVar364;
        auVar223._12_2_ = sVar54 - sVar367;
        auVar223._14_2_ = sVar55 - sVar370;
        auVar109 = pabsw(auVar46,auVar223);
        uVar124 = auVar109._0_2_;
        auVar429._0_2_ = uVar124 >> uVar427;
        uVar146 = auVar109._2_2_;
        auVar429._2_2_ = uVar146 >> uVar427;
        uVar153 = auVar109._4_2_;
        auVar429._4_2_ = uVar153 >> uVar427;
        uVar160 = auVar109._6_2_;
        auVar429._6_2_ = uVar160 >> uVar427;
        uVar167 = auVar109._8_2_;
        auVar429._8_2_ = uVar167 >> uVar427;
        uVar174 = auVar109._10_2_;
        auVar429._10_2_ = uVar174 >> uVar427;
        uVar182 = auVar109._12_2_;
        uVar190 = auVar109._14_2_;
        auVar429._12_2_ = uVar182 >> uVar427;
        auVar429._14_2_ = uVar190 >> uVar427;
        auVar216 = psubusw(local_108,auVar429);
        uVar53 = (ushort)(sVar102 < (short)uVar383) * sVar102 |
                 (sVar102 >= (short)uVar383) * uVar383;
        uVar65 = (ushort)(sVar103 < (short)uVar391) * sVar103 |
                 (sVar103 >= (short)uVar391) * uVar391;
        uVar457 = (ushort)(sVar368 < (short)uVar394) * sVar368 |
                  (sVar368 >= (short)uVar394) * uVar394;
        uVar465 = (ushort)(sVar104 < (short)uVar397) * sVar104 |
                  (sVar104 >= (short)uVar397) * uVar397;
        uVar63 = (ushort)(sVar105 < (short)uVar400) * sVar105 |
                 (sVar105 >= (short)uVar400) * uVar400;
        uVar68 = (ushort)(sVar371 < (short)uVar404) * sVar371 |
                 (sVar371 >= (short)uVar404) * uVar404;
        uVar73 = (ushort)(sVar106 < (short)uVar408) * sVar106 |
                 (sVar106 >= (short)uVar408) * uVar408;
        uVar247 = (ushort)(sVar107 < (short)uVar412) * sVar107 |
                  (sVar107 >= (short)uVar412) * uVar412;
        auVar279 = lddqu(auVar429,*(undefined1 (*) [16])((long)in + lVar26 * -2 + 0x120));
        bVar192 = auVar279[0];
        bVar313 = auVar127[0];
        bVar313 = (bVar313 < bVar192) * bVar192 | (bVar313 >= bVar192) * bVar313;
        bVar192 = auVar279[1];
        bVar325 = auVar127[1];
        bVar325 = (bVar325 < bVar192) * bVar192 | (bVar325 >= bVar192) * bVar325;
        bVar192 = auVar279[2];
        bVar326 = auVar127[2];
        bVar326 = (bVar326 < bVar192) * bVar192 | (bVar326 >= bVar192) * bVar326;
        bVar192 = auVar279[3];
        bVar327 = auVar127[3];
        bVar327 = (bVar327 < bVar192) * bVar192 | (bVar327 >= bVar192) * bVar327;
        bVar192 = auVar279[4];
        bVar328 = auVar127[4];
        bVar328 = (bVar328 < bVar192) * bVar192 | (bVar328 >= bVar192) * bVar328;
        bVar192 = auVar279[5];
        bVar329 = auVar127[5];
        bVar329 = (bVar329 < bVar192) * bVar192 | (bVar329 >= bVar192) * bVar329;
        bVar192 = auVar279[6];
        bVar330 = auVar127[6];
        bVar330 = (bVar330 < bVar192) * bVar192 | (bVar330 >= bVar192) * bVar330;
        bVar192 = auVar279[7];
        bVar331 = auVar127[7];
        bVar331 = (bVar331 < bVar192) * bVar192 | (bVar331 >= bVar192) * bVar331;
        bVar192 = auVar279[8];
        bVar332 = auVar127[8];
        bVar332 = (bVar332 < bVar192) * bVar192 | (bVar332 >= bVar192) * bVar332;
        bVar192 = auVar279[9];
        bVar333 = auVar127[9];
        bVar333 = (bVar333 < bVar192) * bVar192 | (bVar333 >= bVar192) * bVar333;
        bVar192 = auVar279[10];
        bVar334 = auVar127[10];
        bVar334 = (bVar334 < bVar192) * bVar192 | (bVar334 >= bVar192) * bVar334;
        bVar192 = auVar279[0xb];
        bVar335 = auVar127[0xb];
        bVar335 = (bVar335 < bVar192) * bVar192 | (bVar335 >= bVar192) * bVar335;
        bVar192 = auVar279[0xc];
        bVar336 = auVar127[0xc];
        bVar336 = (bVar336 < bVar192) * bVar192 | (bVar336 >= bVar192) * bVar336;
        bVar192 = auVar279[0xd];
        bVar337 = auVar127[0xd];
        bVar337 = (bVar337 < bVar192) * bVar192 | (bVar337 >= bVar192) * bVar337;
        bVar192 = auVar279[0xe];
        bVar338 = auVar127[0xe];
        bVar339 = auVar127[0xf];
        bVar338 = (bVar338 < bVar192) * bVar192 | (bVar338 >= bVar192) * bVar338;
        bVar192 = auVar279[0xf];
        bVar339 = (bVar339 < bVar192) * bVar192 | (bVar339 >= bVar192) * bVar339;
        sVar31 = auVar279._0_2_;
        auVar198._0_2_ =
             (ushort)(sVar31 < (short)uVar53) * sVar31 | (sVar31 >= (short)uVar53) * uVar53;
        sVar33 = auVar279._2_2_;
        auVar198._2_2_ =
             (ushort)(sVar33 < (short)uVar65) * sVar33 | (sVar33 >= (short)uVar65) * uVar65;
        sVar48 = auVar279._4_2_;
        auVar198._4_2_ =
             (ushort)(sVar48 < (short)uVar457) * sVar48 | (sVar48 >= (short)uVar457) * uVar457;
        sVar49 = auVar279._6_2_;
        auVar198._6_2_ =
             (ushort)(sVar49 < (short)uVar465) * sVar49 | (sVar49 >= (short)uVar465) * uVar465;
        sVar51 = auVar279._8_2_;
        auVar198._8_2_ =
             (ushort)(sVar51 < (short)uVar63) * sVar51 | (sVar51 >= (short)uVar63) * uVar63;
        sVar52 = auVar279._10_2_;
        auVar198._10_2_ =
             (ushort)(sVar52 < (short)uVar68) * sVar52 | (sVar52 >= (short)uVar68) * uVar68;
        sVar54 = auVar279._12_2_;
        auVar198._12_2_ =
             (ushort)(sVar54 < (short)uVar73) * sVar54 | (sVar54 >= (short)uVar73) * uVar73;
        sVar55 = auVar279._14_2_;
        auVar198._14_2_ =
             (ushort)(sVar55 < (short)uVar247) * sVar55 | (sVar55 >= (short)uVar247) * uVar247;
        auVar430._0_2_ = sVar31 - sVar215;
        auVar430._2_2_ = sVar33 - sVar236;
        auVar430._4_2_ = sVar48 - sVar238;
        auVar430._6_2_ = sVar49 - sVar240;
        auVar430._8_2_ = sVar51 - sVar242;
        auVar430._10_2_ = sVar52 - sVar244;
        auVar430._12_2_ = sVar54 - sVar246;
        auVar430._14_2_ = sVar55 - sVar249;
        auVar279 = pabsw(auVar198,auVar430);
        uVar53 = auVar279._0_2_;
        auVar445._0_2_ = uVar53 >> uVar427;
        uVar65 = auVar279._2_2_;
        auVar445._2_2_ = uVar65 >> uVar427;
        uVar457 = auVar279._4_2_;
        auVar445._4_2_ = uVar457 >> uVar427;
        uVar465 = auVar279._6_2_;
        auVar445._6_2_ = uVar465 >> uVar427;
        uVar63 = auVar279._8_2_;
        auVar445._8_2_ = uVar63 >> uVar427;
        uVar68 = auVar279._10_2_;
        auVar445._10_2_ = uVar68 >> uVar427;
        uVar73 = auVar279._12_2_;
        uVar247 = auVar279._14_2_;
        auVar445._12_2_ = uVar73 >> uVar427;
        auVar445._14_2_ = uVar247 >> uVar427;
        auVar279 = psubusw(local_108,auVar445);
        sVar31 = auVar216._0_2_;
        sVar33 = auVar216._2_2_;
        sVar48 = auVar216._4_2_;
        sVar49 = auVar216._6_2_;
        sVar51 = auVar216._8_2_;
        sVar52 = auVar216._10_2_;
        sVar54 = auVar216._12_2_;
        sVar55 = auVar216._14_2_;
        sVar341 = auVar279._0_2_;
        sVar75 = auVar279._2_2_;
        sVar76 = auVar279._4_2_;
        sVar355 = auVar279._6_2_;
        sVar94 = auVar279._8_2_;
        sVar95 = auVar279._10_2_;
        sVar357 = auVar279._12_2_;
        sVar96 = auVar279._14_2_;
        auVar216 = psraw(auVar223,0xf);
        auVar133._0_2_ =
             (((short)uVar124 < sVar31) * uVar124 | (ushort)((short)uVar124 >= sVar31) * sVar31) +
             auVar216._0_2_;
        auVar133._2_2_ =
             (((short)uVar146 < sVar33) * uVar146 | (ushort)((short)uVar146 >= sVar33) * sVar33) +
             auVar216._2_2_;
        auVar133._4_2_ =
             (((short)uVar153 < sVar48) * uVar153 | (ushort)((short)uVar153 >= sVar48) * sVar48) +
             auVar216._4_2_;
        auVar133._6_2_ =
             (((short)uVar160 < sVar49) * uVar160 | (ushort)((short)uVar160 >= sVar49) * sVar49) +
             auVar216._6_2_;
        auVar133._8_2_ =
             (((short)uVar167 < sVar51) * uVar167 | (ushort)((short)uVar167 >= sVar51) * sVar51) +
             auVar216._8_2_;
        auVar133._10_2_ =
             (((short)uVar174 < sVar52) * uVar174 | (ushort)((short)uVar174 >= sVar52) * sVar52) +
             auVar216._10_2_;
        auVar133._12_2_ =
             (((short)uVar182 < sVar54) * uVar182 | (ushort)((short)uVar182 >= sVar54) * sVar54) +
             auVar216._12_2_;
        auVar133._14_2_ =
             (((short)uVar190 < sVar55) * uVar190 | (ushort)((short)uVar190 >= sVar55) * sVar55) +
             auVar216._14_2_;
        auVar133 = auVar133 ^ auVar216;
        auVar127 = psraw(auVar430,0xf);
        auVar450._0_2_ =
             (((short)uVar53 < sVar341) * uVar53 | (ushort)((short)uVar53 >= sVar341) * sVar341) +
             auVar127._0_2_;
        auVar450._2_2_ =
             (((short)uVar65 < sVar75) * uVar65 | (ushort)((short)uVar65 >= sVar75) * sVar75) +
             auVar127._2_2_;
        auVar450._4_2_ =
             (((short)uVar457 < sVar76) * uVar457 | (ushort)((short)uVar457 >= sVar76) * sVar76) +
             auVar127._4_2_;
        auVar450._6_2_ =
             (((short)uVar465 < sVar355) * uVar465 | (ushort)((short)uVar465 >= sVar355) * sVar355)
             + auVar127._6_2_;
        auVar450._8_2_ =
             (((short)uVar63 < sVar94) * uVar63 | (ushort)((short)uVar63 >= sVar94) * sVar94) +
             auVar127._8_2_;
        auVar450._10_2_ =
             (((short)uVar68 < sVar95) * uVar68 | (ushort)((short)uVar68 >= sVar95) * sVar95) +
             auVar127._10_2_;
        auVar450._12_2_ =
             (((short)uVar73 < sVar357) * uVar73 | (ushort)((short)uVar73 >= sVar357) * sVar357) +
             auVar127._12_2_;
        auVar450._14_2_ =
             (((short)uVar247 < sVar96) * uVar247 | (ushort)((short)uVar247 >= sVar96) * sVar96) +
             auVar127._14_2_;
        auVar450 = auVar450 ^ auVar127;
        auVar216 = lddqu(auVar43,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar27 * 2));
        sVar97 = auVar216._0_2_;
        auVar224._0_2_ = sVar97 - sVar340;
        sVar359 = auVar216._2_2_;
        auVar224._2_2_ = sVar359 - sVar354;
        sVar98 = auVar216._4_2_;
        auVar224._4_2_ = sVar98 - sVar356;
        sVar99 = auVar216._6_2_;
        auVar224._6_2_ = sVar99 - sVar358;
        sVar362 = auVar216._8_2_;
        auVar224._8_2_ = sVar362 - sVar361;
        sVar100 = auVar216._10_2_;
        auVar224._10_2_ = sVar100 - sVar364;
        sVar101 = auVar216._12_2_;
        sVar365 = auVar216._14_2_;
        auVar224._12_2_ = sVar101 - sVar367;
        auVar224._14_2_ = sVar365 - sVar370;
        auVar279 = pabsw(auVar109,auVar224);
        local_1b8 = (ulong)uVar28;
        uVar53 = auVar279._0_2_;
        auVar44._0_2_ = uVar53 >> local_1b8;
        uVar65 = auVar279._2_2_;
        auVar44._2_2_ = uVar65 >> local_1b8;
        uVar457 = auVar279._4_2_;
        auVar44._4_2_ = uVar457 >> local_1b8;
        uVar465 = auVar279._6_2_;
        auVar44._6_2_ = uVar465 >> local_1b8;
        uVar63 = auVar279._8_2_;
        auVar44._8_2_ = uVar63 >> local_1b8;
        uVar68 = auVar279._10_2_;
        auVar44._10_2_ = uVar68 >> local_1b8;
        uVar73 = auVar279._12_2_;
        uVar247 = auVar279._14_2_;
        auVar44._12_2_ = uVar73 >> local_1b8;
        auVar44._14_2_ = uVar247 >> local_1b8;
        auVar109 = psubusw(local_108,auVar44);
        auVar127 = lddqu(auVar127,*(undefined1 (*) [16])
                                   (*(undefined1 (*) [16])((long)in + 0x120) + lVar27 * 2));
        sVar102 = auVar127._0_2_;
        auVar431._0_2_ = sVar102 - sVar215;
        sVar103 = auVar127._2_2_;
        auVar431._2_2_ = sVar103 - sVar236;
        sVar368 = auVar127._4_2_;
        auVar431._4_2_ = sVar368 - sVar238;
        sVar104 = auVar127._6_2_;
        auVar431._6_2_ = sVar104 - sVar240;
        sVar105 = auVar127._8_2_;
        auVar431._8_2_ = sVar105 - sVar242;
        sVar371 = auVar127._10_2_;
        auVar431._10_2_ = sVar371 - sVar244;
        sVar106 = auVar127._12_2_;
        sVar107 = auVar127._14_2_;
        auVar431._12_2_ = sVar106 - sVar246;
        auVar431._14_2_ = sVar107 - sVar249;
        auVar279 = pabsw(auVar85,auVar431);
        uVar124 = auVar279._0_2_;
        auVar199._0_2_ = uVar124 >> local_1b8;
        uVar146 = auVar279._2_2_;
        auVar199._2_2_ = uVar146 >> local_1b8;
        uVar153 = auVar279._4_2_;
        auVar199._4_2_ = uVar153 >> local_1b8;
        uVar160 = auVar279._6_2_;
        auVar199._6_2_ = uVar160 >> local_1b8;
        uVar167 = auVar279._8_2_;
        auVar199._8_2_ = uVar167 >> local_1b8;
        uVar174 = auVar279._10_2_;
        auVar199._10_2_ = uVar174 >> local_1b8;
        uVar182 = auVar279._12_2_;
        uVar190 = auVar279._14_2_;
        auVar199._12_2_ = uVar182 >> local_1b8;
        auVar199._14_2_ = uVar190 >> local_1b8;
        auVar279 = psubusw(local_108,auVar199);
        sVar341 = auVar109._0_2_;
        sVar75 = auVar109._2_2_;
        sVar76 = auVar109._4_2_;
        sVar355 = auVar109._6_2_;
        sVar94 = auVar109._8_2_;
        sVar95 = auVar109._10_2_;
        sVar357 = auVar109._12_2_;
        sVar96 = auVar109._14_2_;
        sVar31 = auVar279._0_2_;
        sVar33 = auVar279._2_2_;
        sVar48 = auVar279._4_2_;
        sVar49 = auVar279._6_2_;
        sVar51 = auVar279._8_2_;
        sVar52 = auVar279._10_2_;
        sVar54 = auVar279._12_2_;
        sVar55 = auVar279._14_2_;
        auVar279 = psraw(auVar224,0xf);
        auVar83._0_2_ =
             (((short)uVar53 < sVar341) * uVar53 | (ushort)((short)uVar53 >= sVar341) * sVar341) +
             auVar279._0_2_;
        auVar83._2_2_ =
             (((short)uVar65 < sVar75) * uVar65 | (ushort)((short)uVar65 >= sVar75) * sVar75) +
             auVar279._2_2_;
        auVar83._4_2_ =
             (((short)uVar457 < sVar76) * uVar457 | (ushort)((short)uVar457 >= sVar76) * sVar76) +
             auVar279._4_2_;
        auVar83._6_2_ =
             (((short)uVar465 < sVar355) * uVar465 | (ushort)((short)uVar465 >= sVar355) * sVar355)
             + auVar279._6_2_;
        auVar83._8_2_ =
             (((short)uVar63 < sVar94) * uVar63 | (ushort)((short)uVar63 >= sVar94) * sVar94) +
             auVar279._8_2_;
        auVar83._10_2_ =
             (((short)uVar68 < sVar95) * uVar68 | (ushort)((short)uVar68 >= sVar95) * sVar95) +
             auVar279._10_2_;
        auVar83._12_2_ =
             (((short)uVar73 < sVar357) * uVar73 | (ushort)((short)uVar73 >= sVar357) * sVar357) +
             auVar279._12_2_;
        auVar83._14_2_ =
             (((short)uVar247 < sVar96) * uVar247 | (ushort)((short)uVar247 >= sVar96) * sVar96) +
             auVar279._14_2_;
        auVar83 = auVar83 ^ auVar279;
        auVar200[0] = (bVar263 < bVar165) * bVar165 | (bVar263 >= bVar165) * bVar263;
        auVar200[1] = (bVar265 < bVar166) * bVar166 | (bVar265 >= bVar166) * bVar265;
        auVar200[2] = (bVar267 < bVar170) * bVar170 | (bVar267 >= bVar170) * bVar267;
        auVar200[3] = (bVar269 < bVar171) * bVar171 | (bVar269 >= bVar171) * bVar269;
        auVar200[4] = (bVar271 < bVar172) * bVar172 | (bVar271 >= bVar172) * bVar271;
        auVar200[5] = (bVar273 < bVar173) * bVar173 | (bVar273 >= bVar173) * bVar273;
        auVar200[6] = (bVar275 < bVar177) * bVar177 | (bVar275 >= bVar177) * bVar275;
        auVar200[7] = (bVar277 < bVar178) * bVar178 | (bVar277 >= bVar178) * bVar277;
        auVar200[8] = (bVar294 < bVar179) * bVar179 | (bVar294 >= bVar179) * bVar294;
        auVar200[9] = (bVar297 < bVar180) * bVar180 | (bVar297 >= bVar180) * bVar297;
        auVar200[10] = (bVar299 < bVar184) * bVar184 | (bVar299 >= bVar184) * bVar299;
        auVar200[0xb] = (bVar302 < bVar185) * bVar185 | (bVar302 >= bVar185) * bVar302;
        auVar200[0xc] = (bVar304 < bVar186) * bVar186 | (bVar304 >= bVar186) * bVar304;
        auVar200[0xd] = (bVar307 < bVar187) * bVar187 | (bVar307 >= bVar187) * bVar307;
        auVar200[0xe] = (bVar309 < bVar191) * bVar191 | (bVar309 >= bVar191) * bVar309;
        auVar200[0xf] = (bVar312 < bVar250) * bVar250 | (bVar312 >= bVar250) * bVar312;
        bVar192 = auVar216[0];
        bVar165 = (bVar382 < bVar192) * bVar192 | (bVar382 >= bVar192) * bVar382;
        bVar192 = auVar216[1];
        bVar166 = (bVar389 < bVar192) * bVar192 | (bVar389 >= bVar192) * bVar389;
        bVar192 = auVar216[2];
        bVar170 = (bVar390 < bVar192) * bVar192 | (bVar390 >= bVar192) * bVar390;
        bVar192 = auVar216[3];
        bVar171 = (bVar392 < bVar192) * bVar192 | (bVar392 >= bVar192) * bVar392;
        bVar192 = auVar216[4];
        bVar172 = (bVar393 < bVar192) * bVar192 | (bVar393 >= bVar192) * bVar393;
        bVar192 = auVar216[5];
        bVar173 = (bVar395 < bVar192) * bVar192 | (bVar395 >= bVar192) * bVar395;
        bVar192 = auVar216[6];
        bVar177 = (bVar396 < bVar192) * bVar192 | (bVar396 >= bVar192) * bVar396;
        bVar192 = auVar216[7];
        bVar178 = (bVar398 < bVar192) * bVar192 | (bVar398 >= bVar192) * bVar398;
        bVar192 = auVar216[8];
        bVar179 = (bVar399 < bVar192) * bVar192 | (bVar399 >= bVar192) * bVar399;
        bVar192 = auVar216[9];
        bVar180 = (bVar402 < bVar192) * bVar192 | (bVar402 >= bVar192) * bVar402;
        bVar192 = auVar216[10];
        bVar184 = (bVar403 < bVar192) * bVar192 | (bVar403 >= bVar192) * bVar403;
        bVar192 = auVar216[0xb];
        bVar185 = (bVar406 < bVar192) * bVar192 | (bVar406 >= bVar192) * bVar406;
        bVar192 = auVar216[0xc];
        bVar186 = (bVar407 < bVar192) * bVar192 | (bVar407 >= bVar192) * bVar407;
        bVar192 = auVar216[0xd];
        bVar187 = (bVar410 < bVar192) * bVar192 | (bVar410 >= bVar192) * bVar410;
        bVar192 = auVar216[0xe];
        bVar191 = (bVar411 < bVar192) * bVar192 | (bVar411 >= bVar192) * bVar411;
        bVar192 = auVar216[0xf];
        bVar192 = (bVar414 < bVar192) * bVar192 | (bVar414 >= bVar192) * bVar414;
        bVar165 = (bVar165 < auVar200[0]) * auVar200[0] | (bVar165 >= auVar200[0]) * bVar165;
        bVar166 = (bVar166 < auVar200[1]) * auVar200[1] | (bVar166 >= auVar200[1]) * bVar166;
        bVar170 = (bVar170 < auVar200[2]) * auVar200[2] | (bVar170 >= auVar200[2]) * bVar170;
        bVar171 = (bVar171 < auVar200[3]) * auVar200[3] | (bVar171 >= auVar200[3]) * bVar171;
        bVar172 = (bVar172 < auVar200[4]) * auVar200[4] | (bVar172 >= auVar200[4]) * bVar172;
        bVar173 = (bVar173 < auVar200[5]) * auVar200[5] | (bVar173 >= auVar200[5]) * bVar173;
        bVar177 = (bVar177 < auVar200[6]) * auVar200[6] | (bVar177 >= auVar200[6]) * bVar177;
        bVar178 = (bVar178 < auVar200[7]) * auVar200[7] | (bVar178 >= auVar200[7]) * bVar178;
        bVar179 = (bVar179 < auVar200[8]) * auVar200[8] | (bVar179 >= auVar200[8]) * bVar179;
        bVar180 = (bVar180 < auVar200[9]) * auVar200[9] | (bVar180 >= auVar200[9]) * bVar180;
        bVar184 = (bVar184 < auVar200[10]) * auVar200[10] | (bVar184 >= auVar200[10]) * bVar184;
        bVar185 = (bVar185 < auVar200[0xb]) * auVar200[0xb] | (bVar185 >= auVar200[0xb]) * bVar185;
        bVar186 = (bVar186 < auVar200[0xc]) * auVar200[0xc] | (bVar186 >= auVar200[0xc]) * bVar186;
        bVar187 = (bVar187 < auVar200[0xd]) * auVar200[0xd] | (bVar187 >= auVar200[0xd]) * bVar187;
        bVar191 = (bVar191 < auVar200[0xe]) * auVar200[0xe] | (bVar191 >= auVar200[0xe]) * bVar191;
        bVar250 = (bVar192 < auVar200[0xf]) * auVar200[0xf] | (bVar192 >= auVar200[0xf]) * bVar192;
        auVar109 = psraw(auVar431,0xf);
        auVar45._0_2_ =
             (((short)uVar124 < sVar31) * uVar124 | (ushort)((short)uVar124 >= sVar31) * sVar31) +
             auVar109._0_2_;
        auVar45._2_2_ =
             (((short)uVar146 < sVar33) * uVar146 | (ushort)((short)uVar146 >= sVar33) * sVar33) +
             auVar109._2_2_;
        auVar45._4_2_ =
             (((short)uVar153 < sVar48) * uVar153 | (ushort)((short)uVar153 >= sVar48) * sVar48) +
             auVar109._4_2_;
        auVar45._6_2_ =
             (((short)uVar160 < sVar49) * uVar160 | (ushort)((short)uVar160 >= sVar49) * sVar49) +
             auVar109._6_2_;
        auVar45._8_2_ =
             (((short)uVar167 < sVar51) * uVar167 | (ushort)((short)uVar167 >= sVar51) * sVar51) +
             auVar109._8_2_;
        auVar45._10_2_ =
             (((short)uVar174 < sVar52) * uVar174 | (ushort)((short)uVar174 >= sVar52) * sVar52) +
             auVar109._10_2_;
        auVar45._12_2_ =
             (((short)uVar182 < sVar54) * uVar182 | (ushort)((short)uVar182 >= sVar54) * sVar54) +
             auVar109._12_2_;
        auVar45._14_2_ =
             (((short)uVar190 < sVar55) * uVar190 | (ushort)((short)uVar190 >= sVar55) * sVar55) +
             auVar109._14_2_;
        auVar279 = lddqu(auVar200,*(undefined1 (*) [16])((long)in + lVar27 * -2));
        bVar192 = auVar279[0];
        auVar385[0] = (bVar165 < bVar192) * bVar192 | (bVar165 >= bVar192) * bVar165;
        bVar192 = auVar279[1];
        auVar385[1] = (bVar166 < bVar192) * bVar192 | (bVar166 >= bVar192) * bVar166;
        bVar192 = auVar279[2];
        auVar385[2] = (bVar170 < bVar192) * bVar192 | (bVar170 >= bVar192) * bVar170;
        bVar192 = auVar279[3];
        auVar385[3] = (bVar171 < bVar192) * bVar192 | (bVar171 >= bVar192) * bVar171;
        bVar192 = auVar279[4];
        auVar385[4] = (bVar172 < bVar192) * bVar192 | (bVar172 >= bVar192) * bVar172;
        bVar192 = auVar279[5];
        auVar385[5] = (bVar173 < bVar192) * bVar192 | (bVar173 >= bVar192) * bVar173;
        bVar192 = auVar279[6];
        auVar385[6] = (bVar177 < bVar192) * bVar192 | (bVar177 >= bVar192) * bVar177;
        bVar192 = auVar279[7];
        auVar385[7] = (bVar178 < bVar192) * bVar192 | (bVar178 >= bVar192) * bVar178;
        bVar192 = auVar279[8];
        auVar385[8] = (bVar179 < bVar192) * bVar192 | (bVar179 >= bVar192) * bVar179;
        bVar192 = auVar279[9];
        auVar385[9] = (bVar180 < bVar192) * bVar192 | (bVar180 >= bVar192) * bVar180;
        bVar192 = auVar279[10];
        auVar385[10] = (bVar184 < bVar192) * bVar192 | (bVar184 >= bVar192) * bVar184;
        bVar192 = auVar279[0xb];
        auVar385[0xb] = (bVar185 < bVar192) * bVar192 | (bVar185 >= bVar192) * bVar185;
        bVar192 = auVar279[0xc];
        auVar385[0xc] = (bVar186 < bVar192) * bVar192 | (bVar186 >= bVar192) * bVar186;
        bVar192 = auVar279[0xd];
        auVar385[0xd] = (bVar187 < bVar192) * bVar192 | (bVar187 >= bVar192) * bVar187;
        bVar192 = auVar279[0xe];
        auVar385[0xe] = (bVar191 < bVar192) * bVar192 | (bVar191 >= bVar192) * bVar191;
        bVar192 = auVar279[0xf];
        auVar385[0xf] = (bVar250 < bVar192) * bVar192 | (bVar250 >= bVar192) * bVar250;
        sVar31 = auVar279._0_2_;
        uVar124 = (ushort)(sVar31 < sVar97) * sVar31 | (ushort)(sVar31 >= sVar97) * sVar97;
        sVar33 = auVar279._2_2_;
        uVar146 = (ushort)(sVar33 < sVar359) * sVar33 | (ushort)(sVar33 >= sVar359) * sVar359;
        sVar48 = auVar279._4_2_;
        uVar153 = (ushort)(sVar48 < sVar98) * sVar48 | (ushort)(sVar48 >= sVar98) * sVar98;
        sVar49 = auVar279._6_2_;
        uVar160 = (ushort)(sVar49 < sVar99) * sVar49 | (ushort)(sVar49 >= sVar99) * sVar99;
        sVar51 = auVar279._8_2_;
        uVar167 = (ushort)(sVar51 < sVar362) * sVar51 | (ushort)(sVar51 >= sVar362) * sVar362;
        sVar52 = auVar279._10_2_;
        uVar174 = (ushort)(sVar52 < sVar100) * sVar52 | (ushort)(sVar52 >= sVar100) * sVar100;
        sVar54 = auVar279._12_2_;
        uVar182 = (ushort)(sVar54 < sVar101) * sVar54 | (ushort)(sVar54 >= sVar101) * sVar101;
        sVar55 = auVar279._14_2_;
        uVar190 = (ushort)(sVar55 < sVar365) * sVar55 | (ushort)(sVar55 >= sVar365) * sVar365;
        auVar201._0_2_ = sVar31 - sVar340;
        auVar201._2_2_ = sVar33 - sVar354;
        auVar201._4_2_ = sVar48 - sVar356;
        auVar201._6_2_ = sVar49 - sVar358;
        auVar201._8_2_ = sVar51 - sVar361;
        auVar201._10_2_ = sVar52 - sVar364;
        auVar201._12_2_ = sVar54 - sVar367;
        auVar201._14_2_ = sVar55 - sVar370;
        auVar216 = pabsw(auVar216,auVar201);
        uVar53 = auVar216._0_2_;
        auVar225._0_2_ = uVar53 >> local_1b8;
        uVar65 = auVar216._2_2_;
        auVar225._2_2_ = uVar65 >> local_1b8;
        uVar457 = auVar216._4_2_;
        auVar225._4_2_ = uVar457 >> local_1b8;
        uVar465 = auVar216._6_2_;
        auVar225._6_2_ = uVar465 >> local_1b8;
        uVar63 = auVar216._8_2_;
        auVar225._8_2_ = uVar63 >> local_1b8;
        uVar68 = auVar216._10_2_;
        auVar225._10_2_ = uVar68 >> local_1b8;
        uVar73 = auVar216._12_2_;
        uVar247 = auVar216._14_2_;
        auVar225._12_2_ = uVar73 >> local_1b8;
        auVar225._14_2_ = uVar247 >> local_1b8;
        auVar45 = auVar45 ^ auVar109;
        auVar279 = psubusw(local_108,auVar225);
        auVar226[0] = (bVar122 < bVar251) * bVar251 | (bVar122 >= bVar251) * bVar122;
        auVar226[1] = (bVar123 < bVar264) * bVar264 | (bVar123 >= bVar264) * bVar123;
        auVar226[2] = (bVar142 < bVar266) * bVar266 | (bVar142 >= bVar266) * bVar142;
        auVar226[3] = (bVar143 < bVar268) * bVar268 | (bVar143 >= bVar268) * bVar143;
        auVar226[4] = (bVar144 < bVar270) * bVar270 | (bVar144 >= bVar270) * bVar144;
        auVar226[5] = (bVar145 < bVar272) * bVar272 | (bVar145 >= bVar272) * bVar145;
        auVar226[6] = (bVar149 < bVar274) * bVar274 | (bVar149 >= bVar274) * bVar149;
        auVar226[7] = (bVar150 < bVar276) * bVar276 | (bVar150 >= bVar276) * bVar150;
        auVar226[8] = (bVar151 < bVar293) * bVar293 | (bVar151 >= bVar293) * bVar151;
        auVar226[9] = (bVar152 < bVar296) * bVar296 | (bVar152 >= bVar296) * bVar152;
        auVar226[10] = (bVar156 < bVar298) * bVar298 | (bVar156 >= bVar298) * bVar156;
        auVar226[0xb] = (bVar157 < bVar301) * bVar301 | (bVar157 >= bVar301) * bVar157;
        auVar226[0xc] = (bVar158 < bVar303) * bVar303 | (bVar158 >= bVar303) * bVar158;
        auVar226[0xd] = (bVar159 < bVar306) * bVar306 | (bVar159 >= bVar306) * bVar159;
        auVar226[0xe] = (bVar163 < bVar308) * bVar308 | (bVar163 >= bVar308) * bVar163;
        auVar226[0xf] = (bVar164 < bVar311) * bVar311 | (bVar164 >= bVar311) * bVar164;
        bVar192 = auVar127[0];
        bVar122 = (bVar313 < bVar192) * bVar192 | (bVar313 >= bVar192) * bVar313;
        bVar192 = auVar127[1];
        bVar123 = (bVar325 < bVar192) * bVar192 | (bVar325 >= bVar192) * bVar325;
        bVar192 = auVar127[2];
        bVar142 = (bVar326 < bVar192) * bVar192 | (bVar326 >= bVar192) * bVar326;
        bVar192 = auVar127[3];
        bVar143 = (bVar327 < bVar192) * bVar192 | (bVar327 >= bVar192) * bVar327;
        bVar192 = auVar127[4];
        bVar144 = (bVar328 < bVar192) * bVar192 | (bVar328 >= bVar192) * bVar328;
        bVar192 = auVar127[5];
        bVar145 = (bVar329 < bVar192) * bVar192 | (bVar329 >= bVar192) * bVar329;
        bVar192 = auVar127[6];
        bVar149 = (bVar330 < bVar192) * bVar192 | (bVar330 >= bVar192) * bVar330;
        bVar192 = auVar127[7];
        bVar150 = (bVar331 < bVar192) * bVar192 | (bVar331 >= bVar192) * bVar331;
        bVar192 = auVar127[8];
        bVar151 = (bVar332 < bVar192) * bVar192 | (bVar332 >= bVar192) * bVar332;
        bVar192 = auVar127[9];
        bVar152 = (bVar333 < bVar192) * bVar192 | (bVar333 >= bVar192) * bVar333;
        bVar192 = auVar127[10];
        bVar156 = (bVar334 < bVar192) * bVar192 | (bVar334 >= bVar192) * bVar334;
        bVar192 = auVar127[0xb];
        bVar157 = (bVar335 < bVar192) * bVar192 | (bVar335 >= bVar192) * bVar335;
        bVar192 = auVar127[0xc];
        bVar158 = (bVar336 < bVar192) * bVar192 | (bVar336 >= bVar192) * bVar336;
        bVar192 = auVar127[0xd];
        bVar159 = (bVar337 < bVar192) * bVar192 | (bVar337 >= bVar192) * bVar337;
        bVar192 = auVar127[0xe];
        bVar163 = (bVar338 < bVar192) * bVar192 | (bVar338 >= bVar192) * bVar338;
        bVar192 = auVar127[0xf];
        bVar192 = (bVar339 < bVar192) * bVar192 | (bVar339 >= bVar192) * bVar339;
        bVar122 = (bVar122 < auVar226[0]) * auVar226[0] | (bVar122 >= auVar226[0]) * bVar122;
        bVar123 = (bVar123 < auVar226[1]) * auVar226[1] | (bVar123 >= auVar226[1]) * bVar123;
        bVar142 = (bVar142 < auVar226[2]) * auVar226[2] | (bVar142 >= auVar226[2]) * bVar142;
        bVar143 = (bVar143 < auVar226[3]) * auVar226[3] | (bVar143 >= auVar226[3]) * bVar143;
        bVar144 = (bVar144 < auVar226[4]) * auVar226[4] | (bVar144 >= auVar226[4]) * bVar144;
        bVar145 = (bVar145 < auVar226[5]) * auVar226[5] | (bVar145 >= auVar226[5]) * bVar145;
        bVar149 = (bVar149 < auVar226[6]) * auVar226[6] | (bVar149 >= auVar226[6]) * bVar149;
        bVar150 = (bVar150 < auVar226[7]) * auVar226[7] | (bVar150 >= auVar226[7]) * bVar150;
        bVar151 = (bVar151 < auVar226[8]) * auVar226[8] | (bVar151 >= auVar226[8]) * bVar151;
        bVar152 = (bVar152 < auVar226[9]) * auVar226[9] | (bVar152 >= auVar226[9]) * bVar152;
        bVar156 = (bVar156 < auVar226[10]) * auVar226[10] | (bVar156 >= auVar226[10]) * bVar156;
        bVar157 = (bVar157 < auVar226[0xb]) * auVar226[0xb] | (bVar157 >= auVar226[0xb]) * bVar157;
        bVar158 = (bVar158 < auVar226[0xc]) * auVar226[0xc] | (bVar158 >= auVar226[0xc]) * bVar158;
        bVar159 = (bVar159 < auVar226[0xd]) * auVar226[0xd] | (bVar159 >= auVar226[0xd]) * bVar159;
        bVar163 = (bVar163 < auVar226[0xe]) * auVar226[0xe] | (bVar163 >= auVar226[0xe]) * bVar163;
        bVar164 = (bVar192 < auVar226[0xf]) * auVar226[0xf] | (bVar192 >= auVar226[0xf]) * bVar192;
        auVar216 = lddqu(auVar226,*(undefined1 (*) [16])((long)in + lVar27 * -2 + 0x120));
        bVar192 = auVar216[0];
        auVar320[0] = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = auVar216[1];
        auVar320[1] = (bVar123 < bVar192) * bVar192 | (bVar123 >= bVar192) * bVar123;
        bVar192 = auVar216[2];
        auVar320[2] = (bVar142 < bVar192) * bVar192 | (bVar142 >= bVar192) * bVar142;
        bVar192 = auVar216[3];
        auVar320[3] = (bVar143 < bVar192) * bVar192 | (bVar143 >= bVar192) * bVar143;
        bVar192 = auVar216[4];
        auVar320[4] = (bVar144 < bVar192) * bVar192 | (bVar144 >= bVar192) * bVar144;
        bVar192 = auVar216[5];
        auVar320[5] = (bVar145 < bVar192) * bVar192 | (bVar145 >= bVar192) * bVar145;
        bVar192 = auVar216[6];
        auVar320[6] = (bVar149 < bVar192) * bVar192 | (bVar149 >= bVar192) * bVar149;
        bVar192 = auVar216[7];
        auVar320[7] = (bVar150 < bVar192) * bVar192 | (bVar150 >= bVar192) * bVar150;
        bVar192 = auVar216[8];
        auVar320[8] = (bVar151 < bVar192) * bVar192 | (bVar151 >= bVar192) * bVar151;
        bVar192 = auVar216[9];
        auVar320[9] = (bVar152 < bVar192) * bVar192 | (bVar152 >= bVar192) * bVar152;
        bVar192 = auVar216[10];
        auVar320[10] = (bVar156 < bVar192) * bVar192 | (bVar156 >= bVar192) * bVar156;
        bVar192 = auVar216[0xb];
        auVar320[0xb] = (bVar157 < bVar192) * bVar192 | (bVar157 >= bVar192) * bVar157;
        bVar192 = auVar216[0xc];
        auVar320[0xc] = (bVar158 < bVar192) * bVar192 | (bVar158 >= bVar192) * bVar158;
        bVar192 = auVar216[0xd];
        auVar320[0xd] = (bVar159 < bVar192) * bVar192 | (bVar159 >= bVar192) * bVar159;
        bVar192 = auVar216[0xe];
        auVar320[0xe] = (bVar163 < bVar192) * bVar192 | (bVar163 >= bVar192) * bVar163;
        bVar192 = auVar216[0xf];
        auVar320[0xf] = (bVar164 < bVar192) * bVar192 | (bVar164 >= bVar192) * bVar164;
        sVar31 = auVar216._0_2_;
        auVar114._0_2_ = (ushort)(sVar31 < sVar102) * sVar31 | (ushort)(sVar31 >= sVar102) * sVar102
        ;
        sVar33 = auVar216._2_2_;
        auVar114._2_2_ = (ushort)(sVar33 < sVar103) * sVar33 | (ushort)(sVar33 >= sVar103) * sVar103
        ;
        sVar48 = auVar216._4_2_;
        auVar114._4_2_ = (ushort)(sVar48 < sVar368) * sVar48 | (ushort)(sVar48 >= sVar368) * sVar368
        ;
        sVar49 = auVar216._6_2_;
        auVar114._6_2_ = (ushort)(sVar49 < sVar104) * sVar49 | (ushort)(sVar49 >= sVar104) * sVar104
        ;
        sVar51 = auVar216._8_2_;
        auVar114._8_2_ = (ushort)(sVar51 < sVar105) * sVar51 | (ushort)(sVar51 >= sVar105) * sVar105
        ;
        sVar52 = auVar216._10_2_;
        auVar114._10_2_ =
             (ushort)(sVar52 < sVar371) * sVar52 | (ushort)(sVar52 >= sVar371) * sVar371;
        sVar54 = auVar216._12_2_;
        auVar114._12_2_ =
             (ushort)(sVar54 < sVar106) * sVar54 | (ushort)(sVar54 >= sVar106) * sVar106;
        sVar55 = auVar216._14_2_;
        auVar114._14_2_ =
             (ushort)(sVar55 < sVar107) * sVar55 | (ushort)(sVar55 >= sVar107) * sVar107;
        auVar432._0_2_ = sVar31 - sVar215;
        auVar432._2_2_ = sVar33 - sVar236;
        auVar432._4_2_ = sVar48 - sVar238;
        auVar432._6_2_ = sVar49 - sVar240;
        auVar432._8_2_ = sVar51 - sVar242;
        auVar432._10_2_ = sVar52 - sVar244;
        auVar432._12_2_ = sVar54 - sVar246;
        auVar432._14_2_ = sVar55 - sVar249;
        auVar216 = pabsw(auVar114,auVar432);
        uVar383 = auVar216._0_2_;
        auVar256._0_2_ = uVar383 >> local_1b8;
        uVar391 = auVar216._2_2_;
        auVar256._2_2_ = uVar391 >> local_1b8;
        uVar394 = auVar216._4_2_;
        auVar256._4_2_ = uVar394 >> local_1b8;
        uVar397 = auVar216._6_2_;
        auVar256._6_2_ = uVar397 >> local_1b8;
        uVar400 = auVar216._8_2_;
        auVar256._8_2_ = uVar400 >> local_1b8;
        uVar404 = auVar216._10_2_;
        auVar256._10_2_ = uVar404 >> local_1b8;
        uVar408 = auVar216._12_2_;
        uVar412 = auVar216._14_2_;
        auVar256._12_2_ = uVar408 >> local_1b8;
        auVar256._14_2_ = uVar412 >> local_1b8;
        auVar216 = psubusw(local_108,auVar256);
        sVar341 = auVar279._0_2_;
        sVar75 = auVar279._2_2_;
        sVar76 = auVar279._4_2_;
        sVar355 = auVar279._6_2_;
        sVar94 = auVar279._8_2_;
        sVar95 = auVar279._10_2_;
        sVar357 = auVar279._12_2_;
        sVar96 = auVar279._14_2_;
        sVar31 = auVar216._0_2_;
        sVar33 = auVar216._2_2_;
        sVar48 = auVar216._4_2_;
        sVar49 = auVar216._6_2_;
        sVar51 = auVar216._8_2_;
        sVar52 = auVar216._10_2_;
        sVar54 = auVar216._12_2_;
        sVar55 = auVar216._14_2_;
        auVar216 = psraw(auVar201,0xf);
        auVar345._0_2_ =
             (((short)uVar53 < sVar341) * uVar53 | (ushort)((short)uVar53 >= sVar341) * sVar341) +
             auVar216._0_2_;
        auVar345._2_2_ =
             (((short)uVar65 < sVar75) * uVar65 | (ushort)((short)uVar65 >= sVar75) * sVar75) +
             auVar216._2_2_;
        auVar345._4_2_ =
             (((short)uVar457 < sVar76) * uVar457 | (ushort)((short)uVar457 >= sVar76) * sVar76) +
             auVar216._4_2_;
        auVar345._6_2_ =
             (((short)uVar465 < sVar355) * uVar465 | (ushort)((short)uVar465 >= sVar355) * sVar355)
             + auVar216._6_2_;
        auVar345._8_2_ =
             (((short)uVar63 < sVar94) * uVar63 | (ushort)((short)uVar63 >= sVar94) * sVar94) +
             auVar216._8_2_;
        auVar345._10_2_ =
             (((short)uVar68 < sVar95) * uVar68 | (ushort)((short)uVar68 >= sVar95) * sVar95) +
             auVar216._10_2_;
        auVar345._12_2_ =
             (((short)uVar73 < sVar357) * uVar73 | (ushort)((short)uVar73 >= sVar357) * sVar357) +
             auVar216._12_2_;
        auVar345._14_2_ =
             (((short)uVar247 < sVar96) * uVar247 | (ushort)((short)uVar247 >= sVar96) * sVar96) +
             auVar216._14_2_;
        auVar345 = auVar345 ^ auVar216;
        auVar216 = psraw(auVar432,0xf);
        auVar227._0_2_ =
             (((short)uVar383 < sVar31) * uVar383 | (ushort)((short)uVar383 >= sVar31) * sVar31) +
             auVar216._0_2_;
        auVar227._2_2_ =
             (((short)uVar391 < sVar33) * uVar391 | (ushort)((short)uVar391 >= sVar33) * sVar33) +
             auVar216._2_2_;
        auVar227._4_2_ =
             (((short)uVar394 < sVar48) * uVar394 | (ushort)((short)uVar394 >= sVar48) * sVar48) +
             auVar216._4_2_;
        auVar227._6_2_ =
             (((short)uVar397 < sVar49) * uVar397 | (ushort)((short)uVar397 >= sVar49) * sVar49) +
             auVar216._6_2_;
        auVar227._8_2_ =
             (((short)uVar400 < sVar51) * uVar400 | (ushort)((short)uVar400 >= sVar51) * sVar51) +
             auVar216._8_2_;
        auVar227._10_2_ =
             (((short)uVar404 < sVar52) * uVar404 | (ushort)((short)uVar404 >= sVar52) * sVar52) +
             auVar216._10_2_;
        auVar227._12_2_ =
             (((short)uVar408 < sVar54) * uVar408 | (ushort)((short)uVar408 >= sVar54) * sVar54) +
             auVar216._12_2_;
        auVar227._14_2_ =
             (((short)uVar412 < sVar55) * uVar412 | (ushort)((short)uVar412 >= sVar55) * sVar55) +
             auVar216._14_2_;
        auVar227 = auVar227 ^ auVar216;
        local_c8 = auVar37._0_2_;
        sStack_c6 = auVar37._2_2_;
        auVar346._0_2_ =
             (auVar345._0_2_ + auVar83._0_2_ + auVar133._0_2_ + auVar82._0_2_) * local_c8 +
             (auVar376._0_2_ + auVar197._0_2_ + auVar81._0_2_ + auVar317._0_2_) * local_b8 +
             (auVar428._0_2_ + auVar281._0_2_) * local_a8 +
             (auVar110._0_2_ + auVar77._0_2_) * (short)local_98;
        auVar346._2_2_ =
             (auVar345._2_2_ + auVar83._2_2_ + auVar133._2_2_ + auVar82._2_2_) * sStack_c6 +
             (auVar376._2_2_ + auVar197._2_2_ + auVar81._2_2_ + auVar317._2_2_) * sStack_b6 +
             (auVar428._2_2_ + auVar281._2_2_) * sStack_a6 +
             (auVar110._2_2_ + auVar77._2_2_) * local_98._2_2_;
        auVar346._4_2_ =
             (auVar345._4_2_ + auVar83._4_2_ + auVar133._4_2_ + auVar82._4_2_) * local_c8 +
             (auVar376._4_2_ + auVar197._4_2_ + auVar81._4_2_ + auVar317._4_2_) * local_b8 +
             (auVar428._4_2_ + auVar281._4_2_) * local_a8 +
             (auVar110._4_2_ + auVar77._4_2_) * (short)local_98;
        auVar346._6_2_ =
             (auVar345._6_2_ + auVar83._6_2_ + auVar133._6_2_ + auVar82._6_2_) * sStack_c6 +
             (auVar376._6_2_ + auVar197._6_2_ + auVar81._6_2_ + auVar317._6_2_) * sStack_b6 +
             (auVar428._6_2_ + auVar281._6_2_) * sStack_a6 +
             (auVar110._6_2_ + auVar77._6_2_) * local_98._2_2_;
        auVar346._8_2_ =
             (auVar345._8_2_ + auVar83._8_2_ + auVar133._8_2_ + auVar82._8_2_) * local_c8 +
             (auVar376._8_2_ + auVar197._8_2_ + auVar81._8_2_ + auVar317._8_2_) * local_b8 +
             (auVar428._8_2_ + auVar281._8_2_) * local_a8 +
             (auVar110._8_2_ + auVar77._8_2_) * (short)local_98;
        auVar346._10_2_ =
             (auVar345._10_2_ + auVar83._10_2_ + auVar133._10_2_ + auVar82._10_2_) * sStack_c6 +
             (auVar376._10_2_ + auVar197._10_2_ + auVar81._10_2_ + auVar317._10_2_) * sStack_b6 +
             (auVar428._10_2_ + auVar281._10_2_) * sStack_a6 +
             (auVar110._10_2_ + auVar77._10_2_) * local_98._2_2_;
        auVar346._12_2_ =
             (auVar345._12_2_ + auVar83._12_2_ + auVar133._12_2_ + auVar82._12_2_) * local_c8 +
             (auVar376._12_2_ + auVar197._12_2_ + auVar81._12_2_ + auVar317._12_2_) * local_b8 +
             (auVar428._12_2_ + auVar281._12_2_) * local_a8 +
             (auVar110._12_2_ + auVar77._12_2_) * (short)local_98;
        auVar346._14_2_ =
             (auVar345._14_2_ + auVar83._14_2_ + auVar133._14_2_ + auVar82._14_2_) * sStack_c6 +
             (auVar376._14_2_ + auVar197._14_2_ + auVar81._14_2_ + auVar317._14_2_) * sStack_b6 +
             (auVar428._14_2_ + auVar281._14_2_) * sStack_a6 +
             (auVar110._14_2_ + auVar77._14_2_) * local_98._2_2_;
        auVar228._0_2_ =
             (auVar227._0_2_ + auVar45._0_2_ + auVar450._0_2_ + auVar43._0_2_) * local_c8 +
             in_XMM7._0_2_;
        auVar228._2_2_ =
             (auVar227._2_2_ + auVar45._2_2_ + auVar450._2_2_ + auVar43._2_2_) * sStack_c6 +
             in_XMM7._2_2_;
        auVar228._4_2_ =
             (auVar227._4_2_ + auVar45._4_2_ + auVar450._4_2_ + auVar43._4_2_) * local_c8 +
             in_XMM7._4_2_;
        auVar228._6_2_ =
             (auVar227._6_2_ + auVar45._6_2_ + auVar450._6_2_ + auVar43._6_2_) * sStack_c6 +
             in_XMM7._6_2_;
        auVar228._8_2_ =
             (auVar227._8_2_ + auVar45._8_2_ + auVar450._8_2_ + auVar43._8_2_) * local_c8 +
             in_XMM7._8_2_;
        auVar228._10_2_ =
             (auVar227._10_2_ + auVar45._10_2_ + auVar450._10_2_ + auVar43._10_2_) * sStack_c6 +
             in_XMM7._10_2_;
        auVar228._12_2_ =
             (auVar227._12_2_ + auVar45._12_2_ + auVar450._12_2_ + auVar43._12_2_) * local_c8 +
             in_XMM7._12_2_;
        auVar228._14_2_ =
             (auVar227._14_2_ + auVar45._14_2_ + auVar450._14_2_ + auVar43._14_2_) * sStack_c6 +
             in_XMM7._14_2_;
        local_1d8 = local_1d8 & _DAT_00566860;
        sVar31 = local_1d8._0_2_;
        uVar53 = (ushort)(sVar31 < sVar340) * sVar340 | (ushort)(sVar31 >= sVar340) * sVar31;
        sVar31 = local_1d8._2_2_;
        uVar65 = (ushort)(sVar31 < sVar354) * sVar354 | (ushort)(sVar31 >= sVar354) * sVar31;
        sVar31 = local_1d8._4_2_;
        uVar457 = (ushort)(sVar31 < sVar356) * sVar356 | (ushort)(sVar31 >= sVar356) * sVar31;
        sVar31 = local_1d8._6_2_;
        uVar465 = (ushort)(sVar31 < sVar358) * sVar358 | (ushort)(sVar31 >= sVar358) * sVar31;
        sVar31 = local_1d8._8_2_;
        uVar63 = (ushort)(sVar31 < sVar361) * sVar361 | (ushort)(sVar31 >= sVar361) * sVar31;
        sVar31 = local_1d8._10_2_;
        uVar68 = (ushort)(sVar31 < sVar364) * sVar364 | (ushort)(sVar31 >= sVar364) * sVar31;
        sVar31 = local_1d8._12_2_;
        sVar33 = local_1d8._14_2_;
        uVar73 = (ushort)(sVar31 < sVar367) * sVar367 | (ushort)(sVar31 >= sVar367) * sVar31;
        uVar247 = (ushort)(sVar33 < sVar370) * sVar370 | (ushort)(sVar33 >= sVar370) * sVar33;
        auVar385 = auVar385 & _DAT_00566860;
        sVar31 = auVar385._0_2_;
        uVar400 = (sVar31 < (short)uVar53) * uVar53 | (ushort)(sVar31 >= (short)uVar53) * sVar31;
        sVar31 = auVar385._2_2_;
        uVar404 = (sVar31 < (short)uVar65) * uVar65 | (ushort)(sVar31 >= (short)uVar65) * sVar31;
        sVar31 = auVar385._4_2_;
        uVar408 = (sVar31 < (short)uVar457) * uVar457 | (ushort)(sVar31 >= (short)uVar457) * sVar31;
        sVar31 = auVar385._6_2_;
        uVar412 = (sVar31 < (short)uVar465) * uVar465 | (ushort)(sVar31 >= (short)uVar465) * sVar31;
        sVar31 = auVar385._8_2_;
        uVar401 = (sVar31 < (short)uVar63) * uVar63 | (ushort)(sVar31 >= (short)uVar63) * sVar31;
        sVar31 = auVar385._10_2_;
        uVar405 = (sVar31 < (short)uVar68) * uVar68 | (ushort)(sVar31 >= (short)uVar68) * sVar31;
        sVar31 = auVar385._12_2_;
        sVar33 = auVar385._14_2_;
        uVar409 = (sVar31 < (short)uVar73) * uVar73 | (ushort)(sVar31 >= (short)uVar73) * sVar31;
        uVar413 = (sVar33 < (short)uVar247) * uVar247 | (ushort)(sVar33 >= (short)uVar247) * sVar33;
        local_188 = local_188 & _DAT_00566860;
        sVar31 = local_188._0_2_;
        uVar53 = (ushort)(sVar31 < sVar215) * sVar215 | (ushort)(sVar31 >= sVar215) * sVar31;
        sVar31 = local_188._2_2_;
        uVar65 = (ushort)(sVar31 < sVar236) * sVar236 | (ushort)(sVar31 >= sVar236) * sVar31;
        sVar31 = local_188._4_2_;
        uVar457 = (ushort)(sVar31 < sVar238) * sVar238 | (ushort)(sVar31 >= sVar238) * sVar31;
        sVar31 = local_188._6_2_;
        uVar465 = (ushort)(sVar31 < sVar240) * sVar240 | (ushort)(sVar31 >= sVar240) * sVar31;
        sVar31 = local_188._8_2_;
        uVar63 = (ushort)(sVar31 < sVar242) * sVar242 | (ushort)(sVar31 >= sVar242) * sVar31;
        sVar31 = local_188._10_2_;
        uVar68 = (ushort)(sVar31 < sVar244) * sVar244 | (ushort)(sVar31 >= sVar244) * sVar31;
        sVar31 = local_188._12_2_;
        sVar33 = local_188._14_2_;
        uVar73 = (ushort)(sVar31 < sVar246) * sVar246 | (ushort)(sVar31 >= sVar246) * sVar31;
        uVar247 = (ushort)(sVar33 < sVar249) * sVar249 | (ushort)(sVar33 >= sVar249) * sVar33;
        auVar320 = auVar320 & _DAT_00566860;
        sVar31 = auVar320._0_2_;
        uVar383 = (sVar31 < (short)uVar53) * uVar53 | (ushort)(sVar31 >= (short)uVar53) * sVar31;
        sVar31 = auVar320._2_2_;
        uVar391 = (sVar31 < (short)uVar65) * uVar65 | (ushort)(sVar31 >= (short)uVar65) * sVar31;
        sVar31 = auVar320._4_2_;
        uVar394 = (sVar31 < (short)uVar457) * uVar457 | (ushort)(sVar31 >= (short)uVar457) * sVar31;
        sVar31 = auVar320._6_2_;
        uVar397 = (sVar31 < (short)uVar465) * uVar465 | (ushort)(sVar31 >= (short)uVar465) * sVar31;
        sVar31 = auVar320._8_2_;
        uVar63 = (sVar31 < (short)uVar63) * uVar63 | (ushort)(sVar31 >= (short)uVar63) * sVar31;
        sVar31 = auVar320._10_2_;
        uVar68 = (sVar31 < (short)uVar68) * uVar68 | (ushort)(sVar31 >= (short)uVar68) * sVar31;
        sVar31 = auVar320._12_2_;
        sVar33 = auVar320._14_2_;
        uVar73 = (sVar31 < (short)uVar73) * uVar73 | (ushort)(sVar31 >= (short)uVar73) * sVar31;
        uVar247 = (sVar33 < (short)uVar247) * uVar247 | (ushort)(sVar33 >= (short)uVar247) * sVar33;
        uVar47 = ((short)uVar449 < (short)uVar47) * uVar449 |
                 ((short)uVar449 >= (short)uVar47) * uVar47;
        uVar53 = ((short)uVar454 < (short)uVar56) * uVar454 |
                 ((short)uVar454 >= (short)uVar56) * uVar56;
        uVar56 = ((short)uVar456 < (short)uVar70) * uVar456 |
                 ((short)uVar456 >= (short)uVar70) * uVar70;
        uVar65 = ((short)uVar458 < (short)uVar461) * uVar458 |
                 ((short)uVar458 >= (short)uVar461) * uVar461;
        uVar70 = ((short)uVar460 < (short)uVar58) * uVar460 |
                 ((short)uVar460 >= (short)uVar58) * uVar58;
        uVar457 = ((short)uVar462 < (short)uVar62) * uVar462 |
                  ((short)uVar462 >= (short)uVar62) * uVar62;
        uVar461 = ((short)uVar464 < (short)uVar67) * uVar464 |
                  ((short)uVar464 >= (short)uVar67) * uVar67;
        uVar465 = ((short)uVar466 < (short)uVar72) * uVar466 |
                  ((short)uVar466 >= (short)uVar72) * uVar72;
        auVar84._0_2_ =
             ((short)uVar32 < (short)uVar50) * uVar32 | ((short)uVar32 >= (short)uVar50) * uVar50;
        auVar84._2_2_ =
             ((short)uVar448 < (short)uVar60) * uVar448 | ((short)uVar448 >= (short)uVar60) * uVar60
        ;
        auVar84._4_2_ =
             ((short)uVar453 < (short)uVar455) * uVar453 |
             ((short)uVar453 >= (short)uVar455) * uVar455;
        auVar84._6_2_ =
             ((short)uVar459 < (short)uVar463) * uVar459 |
             ((short)uVar459 >= (short)uVar463) * uVar463;
        auVar84._8_2_ =
             ((short)uVar57 < (short)uVar59) * uVar57 | ((short)uVar57 >= (short)uVar59) * uVar59;
        auVar84._10_2_ =
             ((short)uVar61 < (short)uVar64) * uVar61 | ((short)uVar61 >= (short)uVar64) * uVar64;
        auVar84._12_2_ =
             ((short)uVar66 < (short)uVar69) * uVar66 | ((short)uVar66 >= (short)uVar69) * uVar69;
        auVar84._14_2_ =
             ((short)uVar71 < (short)uVar74) * uVar71 | ((short)uVar71 >= (short)uVar74) * uVar74;
        uVar453 = ((short)uVar47 < (short)uVar214) * uVar47 |
                  ((short)uVar47 >= (short)uVar214) * uVar214;
        uVar455 = ((short)uVar53 < (short)uVar235) * uVar53 |
                  ((short)uVar53 >= (short)uVar235) * uVar235;
        uVar459 = ((short)uVar56 < (short)uVar237) * uVar56 |
                  ((short)uVar56 >= (short)uVar237) * uVar237;
        uVar463 = ((short)uVar65 < (short)uVar239) * uVar65 |
                  ((short)uVar65 >= (short)uVar239) * uVar239;
        uVar70 = ((short)uVar70 < (short)uVar241) * uVar70 |
                 ((short)uVar70 >= (short)uVar241) * uVar241;
        uVar457 = ((short)uVar457 < (short)uVar243) * uVar457 |
                  ((short)uVar457 >= (short)uVar243) * uVar243;
        uVar461 = ((short)uVar461 < (short)uVar245) * uVar461 |
                  ((short)uVar461 >= (short)uVar245) * uVar245;
        uVar465 = ((short)uVar465 < (short)uVar248) * uVar465 |
                  ((short)uVar465 >= (short)uVar248) * uVar248;
        uVar32 = ((short)auVar84._0_2_ < (short)auVar198._0_2_) * auVar84._0_2_ |
                 ((short)auVar84._0_2_ >= (short)auVar198._0_2_) * auVar198._0_2_;
        uVar47 = ((short)auVar84._2_2_ < (short)auVar198._2_2_) * auVar84._2_2_ |
                 ((short)auVar84._2_2_ >= (short)auVar198._2_2_) * auVar198._2_2_;
        uVar50 = ((short)auVar84._4_2_ < (short)auVar198._4_2_) * auVar84._4_2_ |
                 ((short)auVar84._4_2_ >= (short)auVar198._4_2_) * auVar198._4_2_;
        uVar53 = ((short)auVar84._6_2_ < (short)auVar198._6_2_) * auVar84._6_2_ |
                 ((short)auVar84._6_2_ >= (short)auVar198._6_2_) * auVar198._6_2_;
        uVar448 = ((short)auVar84._8_2_ < (short)auVar198._8_2_) * auVar84._8_2_ |
                  ((short)auVar84._8_2_ >= (short)auVar198._8_2_) * auVar198._8_2_;
        uVar56 = ((short)auVar84._10_2_ < (short)auVar198._10_2_) * auVar84._10_2_ |
                 ((short)auVar84._10_2_ >= (short)auVar198._10_2_) * auVar198._10_2_;
        uVar60 = ((short)auVar84._12_2_ < (short)auVar198._12_2_) * auVar84._12_2_ |
                 ((short)auVar84._12_2_ >= (short)auVar198._12_2_) * auVar198._12_2_;
        uVar65 = ((short)auVar84._14_2_ < (short)auVar198._14_2_) * auVar84._14_2_ |
                 ((short)auVar84._14_2_ >= (short)auVar198._14_2_) * auVar198._14_2_;
        in_XMM6._0_2_ =
             ((short)uVar453 < (short)uVar124) * uVar453 |
             ((short)uVar453 >= (short)uVar124) * uVar124;
        in_XMM6._2_2_ =
             ((short)uVar455 < (short)uVar146) * uVar455 |
             ((short)uVar455 >= (short)uVar146) * uVar146;
        in_XMM6._4_2_ =
             ((short)uVar459 < (short)uVar153) * uVar459 |
             ((short)uVar459 >= (short)uVar153) * uVar153;
        in_XMM6._6_2_ =
             ((short)uVar463 < (short)uVar160) * uVar463 |
             ((short)uVar463 >= (short)uVar160) * uVar160;
        in_XMM6._8_2_ =
             ((short)uVar70 < (short)uVar167) * uVar70 | ((short)uVar70 >= (short)uVar167) * uVar167
        ;
        in_XMM6._10_2_ =
             ((short)uVar457 < (short)uVar174) * uVar457 |
             ((short)uVar457 >= (short)uVar174) * uVar174;
        in_XMM6._12_2_ =
             ((short)uVar461 < (short)uVar182) * uVar461 |
             ((short)uVar461 >= (short)uVar182) * uVar182;
        in_XMM6._14_2_ =
             ((short)uVar465 < (short)uVar190) * uVar465 |
             ((short)uVar465 >= (short)uVar190) * uVar190;
        uVar32 = ((short)uVar32 < (short)auVar114._0_2_) * uVar32 |
                 ((short)uVar32 >= (short)auVar114._0_2_) * auVar114._0_2_;
        uVar47 = ((short)uVar47 < (short)auVar114._2_2_) * uVar47 |
                 ((short)uVar47 >= (short)auVar114._2_2_) * auVar114._2_2_;
        uVar50 = ((short)uVar50 < (short)auVar114._4_2_) * uVar50 |
                 ((short)uVar50 >= (short)auVar114._4_2_) * auVar114._4_2_;
        uVar53 = ((short)uVar53 < (short)auVar114._6_2_) * uVar53 |
                 ((short)uVar53 >= (short)auVar114._6_2_) * auVar114._6_2_;
        uVar448 = ((short)uVar448 < (short)auVar114._8_2_) * uVar448 |
                  ((short)uVar448 >= (short)auVar114._8_2_) * auVar114._8_2_;
        uVar56 = ((short)uVar56 < (short)auVar114._10_2_) * uVar56 |
                 ((short)uVar56 >= (short)auVar114._10_2_) * auVar114._10_2_;
        uVar60 = ((short)uVar60 < (short)auVar114._12_2_) * uVar60 |
                 ((short)uVar60 >= (short)auVar114._12_2_) * auVar114._12_2_;
        uVar65 = ((short)uVar65 < (short)auVar114._14_2_) * uVar65 |
                 ((short)uVar65 >= (short)auVar114._14_2_) * auVar114._14_2_;
        auVar216 = psraw(auVar346,0xf);
        auVar279 = pmovsxbw(auVar84,0x808080808080808);
        auVar347._0_2_ = auVar346._0_2_ + auVar279._0_2_ + auVar216._0_2_;
        auVar347._2_2_ = auVar346._2_2_ + auVar279._2_2_ + auVar216._2_2_;
        auVar347._4_2_ = auVar346._4_2_ + auVar279._4_2_ + auVar216._4_2_;
        auVar347._6_2_ = auVar346._6_2_ + auVar279._6_2_ + auVar216._6_2_;
        auVar347._8_2_ = auVar346._8_2_ + auVar279._8_2_ + auVar216._8_2_;
        auVar347._10_2_ = auVar346._10_2_ + auVar279._10_2_ + auVar216._10_2_;
        auVar347._12_2_ = auVar346._12_2_ + auVar279._12_2_ + auVar216._12_2_;
        auVar347._14_2_ = auVar346._14_2_ + auVar279._14_2_ + auVar216._14_2_;
        auVar216 = psraw(auVar228,0xf);
        auVar229._0_2_ = auVar228._0_2_ + auVar279._0_2_ + auVar216._0_2_;
        auVar229._2_2_ = auVar228._2_2_ + auVar279._2_2_ + auVar216._2_2_;
        auVar229._4_2_ = auVar228._4_2_ + auVar279._4_2_ + auVar216._4_2_;
        auVar229._6_2_ = auVar228._6_2_ + auVar279._6_2_ + auVar216._6_2_;
        auVar229._8_2_ = auVar228._8_2_ + auVar279._8_2_ + auVar216._8_2_;
        auVar229._10_2_ = auVar228._10_2_ + auVar279._10_2_ + auVar216._10_2_;
        auVar229._12_2_ = auVar228._12_2_ + auVar279._12_2_ + auVar216._12_2_;
        auVar229._14_2_ = auVar228._14_2_ + auVar279._14_2_ + auVar216._14_2_;
        auVar216 = psraw(auVar347,4);
        sVar340 = auVar216._0_2_ + sVar340;
        sVar354 = auVar216._2_2_ + sVar354;
        sVar356 = auVar216._4_2_ + sVar356;
        sVar358 = auVar216._6_2_ + sVar358;
        sVar361 = auVar216._8_2_ + sVar361;
        sVar364 = auVar216._10_2_ + sVar364;
        sVar367 = auVar216._12_2_ + sVar367;
        sVar370 = auVar216._14_2_ + sVar370;
        uVar453 = (sVar340 < (short)in_XMM6._0_2_) * in_XMM6._0_2_ |
                  (ushort)(sVar340 >= (short)in_XMM6._0_2_) * sVar340;
        uVar70 = (sVar354 < (short)in_XMM6._2_2_) * in_XMM6._2_2_ |
                 (ushort)(sVar354 >= (short)in_XMM6._2_2_) * sVar354;
        uVar455 = (sVar356 < (short)in_XMM6._4_2_) * in_XMM6._4_2_ |
                  (ushort)(sVar356 >= (short)in_XMM6._4_2_) * sVar356;
        uVar457 = (sVar358 < (short)in_XMM6._6_2_) * in_XMM6._6_2_ |
                  (ushort)(sVar358 >= (short)in_XMM6._6_2_) * sVar358;
        uVar459 = (sVar361 < (short)in_XMM6._8_2_) * in_XMM6._8_2_ |
                  (ushort)(sVar361 >= (short)in_XMM6._8_2_) * sVar361;
        uVar461 = (sVar364 < (short)in_XMM6._10_2_) * in_XMM6._10_2_ |
                  (ushort)(sVar364 >= (short)in_XMM6._10_2_) * sVar364;
        uVar463 = (sVar367 < (short)in_XMM6._12_2_) * in_XMM6._12_2_ |
                  (ushort)(sVar367 >= (short)in_XMM6._12_2_) * sVar367;
        uVar465 = (sVar370 < (short)in_XMM6._14_2_) * in_XMM6._14_2_ |
                  (ushort)(sVar370 >= (short)in_XMM6._14_2_) * sVar370;
        in_XMM9._0_2_ =
             ((short)uVar400 < (short)uVar453) * uVar400 |
             ((short)uVar400 >= (short)uVar453) * uVar453;
        in_XMM9._2_2_ =
             ((short)uVar404 < (short)uVar70) * uVar404 | ((short)uVar404 >= (short)uVar70) * uVar70
        ;
        in_XMM9._4_2_ =
             ((short)uVar408 < (short)uVar455) * uVar408 |
             ((short)uVar408 >= (short)uVar455) * uVar455;
        in_XMM9._6_2_ =
             ((short)uVar412 < (short)uVar457) * uVar412 |
             ((short)uVar412 >= (short)uVar457) * uVar457;
        in_XMM9._8_2_ =
             ((short)uVar401 < (short)uVar459) * uVar401 |
             ((short)uVar401 >= (short)uVar459) * uVar459;
        in_XMM9._10_2_ =
             ((short)uVar405 < (short)uVar461) * uVar405 |
             ((short)uVar405 >= (short)uVar461) * uVar461;
        in_XMM9._12_2_ =
             ((short)uVar409 < (short)uVar463) * uVar409 |
             ((short)uVar409 >= (short)uVar463) * uVar463;
        in_XMM9._14_2_ =
             ((short)uVar413 < (short)uVar465) * uVar413 |
             ((short)uVar413 >= (short)uVar465) * uVar465;
        auVar216 = psraw(auVar229,4);
        sVar215 = auVar216._0_2_ + sVar215;
        sVar236 = auVar216._2_2_ + sVar236;
        sVar238 = auVar216._4_2_ + sVar238;
        sVar240 = auVar216._6_2_ + sVar240;
        sVar242 = auVar216._8_2_ + sVar242;
        sVar244 = auVar216._10_2_ + sVar244;
        sVar246 = auVar216._12_2_ + sVar246;
        sVar249 = auVar216._14_2_ + sVar249;
        uVar32 = (sVar215 < (short)uVar32) * uVar32 | (ushort)(sVar215 >= (short)uVar32) * sVar215;
        uVar47 = (sVar236 < (short)uVar47) * uVar47 | (ushort)(sVar236 >= (short)uVar47) * sVar236;
        uVar50 = (sVar238 < (short)uVar50) * uVar50 | (ushort)(sVar238 >= (short)uVar50) * sVar238;
        uVar53 = (sVar240 < (short)uVar53) * uVar53 | (ushort)(sVar240 >= (short)uVar53) * sVar240;
        uVar448 = (sVar242 < (short)uVar448) * uVar448 |
                  (ushort)(sVar242 >= (short)uVar448) * sVar242;
        uVar56 = (sVar244 < (short)uVar56) * uVar56 | (ushort)(sVar244 >= (short)uVar56) * sVar244;
        uVar60 = (sVar246 < (short)uVar60) * uVar60 | (ushort)(sVar246 >= (short)uVar60) * sVar246;
        uVar65 = (sVar249 < (short)uVar65) * uVar65 | (ushort)(sVar249 >= (short)uVar65) * sVar249;
        uVar32 = ((short)uVar383 < (short)uVar32) * uVar383 |
                 ((short)uVar383 >= (short)uVar32) * uVar32;
        uVar47 = ((short)uVar391 < (short)uVar47) * uVar391 |
                 ((short)uVar391 >= (short)uVar47) * uVar47;
        uVar50 = ((short)uVar394 < (short)uVar50) * uVar394 |
                 ((short)uVar394 >= (short)uVar50) * uVar50;
        uVar53 = ((short)uVar397 < (short)uVar53) * uVar397 |
                 ((short)uVar397 >= (short)uVar53) * uVar53;
        uVar448 = ((short)uVar63 < (short)uVar448) * uVar63 |
                  ((short)uVar63 >= (short)uVar448) * uVar448;
        uVar56 = ((short)uVar68 < (short)uVar56) * uVar68 |
                 ((short)uVar68 >= (short)uVar56) * uVar56;
        uVar60 = ((short)uVar73 < (short)uVar60) * uVar73 |
                 ((short)uVar73 >= (short)uVar60) * uVar60;
        uVar65 = ((short)uVar247 < (short)uVar65) * uVar247 |
                 ((short)uVar247 >= (short)uVar65) * uVar65;
        in_XMM5._0_8_ =
             CONCAT17((0 < (short)uVar65) * ((short)uVar65 < 0x100) * (char)uVar65 -
                      (0xff < (short)uVar65),
                      CONCAT16((0 < (short)uVar60) * ((short)uVar60 < 0x100) * (char)uVar60 -
                               (0xff < (short)uVar60),
                               CONCAT15((0 < (short)uVar56) * ((short)uVar56 < 0x100) * (char)uVar56
                                        - (0xff < (short)uVar56),
                                        CONCAT14((0 < (short)uVar448) * ((short)uVar448 < 0x100) *
                                                 (char)uVar448 - (0xff < (short)uVar448),
                                                 CONCAT13((0 < (short)uVar53) *
                                                          ((short)uVar53 < 0x100) * (char)uVar53 -
                                                          (0xff < (short)uVar53),
                                                          CONCAT12((0 < (short)uVar50) *
                                                                   ((short)uVar50 < 0x100) *
                                                                   (char)uVar50 -
                                                                   (0xff < (short)uVar50),
                                                                   CONCAT11((0 < (short)uVar47) *
                                                                            ((short)uVar47 < 0x100)
                                                                            * (char)uVar47 -
                                                                            (0xff < (short)uVar47),
                                                                            (0 < (short)uVar32) *
                                                                            ((short)uVar32 < 0x100)
                                                                            * (char)uVar32 -
                                                                            (0xff < (short)uVar32)))
                                                         )))));
        in_XMM5[8] = (0 < (short)in_XMM9._0_2_) * ((short)in_XMM9._0_2_ < 0x100) *
                     (char)in_XMM9._0_2_ - (0xff < (short)in_XMM9._0_2_);
        in_XMM5[9] = (0 < (short)in_XMM9._2_2_) * ((short)in_XMM9._2_2_ < 0x100) *
                     (char)in_XMM9._2_2_ - (0xff < (short)in_XMM9._2_2_);
        in_XMM5[10] = (0 < (short)in_XMM9._4_2_) * ((short)in_XMM9._4_2_ < 0x100) *
                      (char)in_XMM9._4_2_ - (0xff < (short)in_XMM9._4_2_);
        in_XMM5[0xb] = (0 < (short)in_XMM9._6_2_) * ((short)in_XMM9._6_2_ < 0x100) *
                       (char)in_XMM9._6_2_ - (0xff < (short)in_XMM9._6_2_);
        in_XMM5[0xc] = (0 < (short)in_XMM9._8_2_) * ((short)in_XMM9._8_2_ < 0x100) *
                       (char)in_XMM9._8_2_ - (0xff < (short)in_XMM9._8_2_);
        in_XMM5[0xd] = (0 < (short)in_XMM9._10_2_) * ((short)in_XMM9._10_2_ < 0x100) *
                       (char)in_XMM9._10_2_ - (0xff < (short)in_XMM9._10_2_);
        in_XMM5[0xe] = (0 < (short)in_XMM9._12_2_) * ((short)in_XMM9._12_2_ < 0x100) *
                       (char)in_XMM9._12_2_ - (0xff < (short)in_XMM9._12_2_);
        in_XMM5[0xf] = (0 < (short)in_XMM9._14_2_) * ((short)in_XMM9._14_2_ < 0x100) *
                       (char)in_XMM9._14_2_ - (0xff < (short)in_XMM9._14_2_);
        *(long *)dest = in_XMM5._8_8_;
        *(undefined8 *)((long)dest + (long)dstride) = in_XMM5._0_8_;
        uVar20 = uVar20 + 2;
        in = (uint16_t *)((long)in + 0x240);
        dest = (void *)((long)dest + (long)dstride * 2);
        in_XMM3 = auVar46;
        in_XMM4 = auVar85;
      } while (uVar20 < (uint)block_height);
    }
  }
  else {
    uVar28 = pri_damping;
    if (pri_strength != 0) {
      iVar18 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar18 == 0; iVar18 = iVar18 + -1) {
        }
      }
      uVar28 = pri_damping - iVar18;
      if (pri_damping < iVar18) {
        uVar28 = 0;
      }
    }
    uVar29 = sec_damping;
    if (sec_strength != 0) {
      iVar18 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar18 == 0; iVar18 = iVar18 + -1) {
        }
      }
      uVar29 = sec_damping - iVar18;
      if (sec_damping < iVar18) {
        uVar29 = 0;
      }
    }
    if (0 < block_height) {
      auVar34 = pshuflw(ZEXT416((uint)pri_strength),ZEXT416((uint)pri_strength),0);
      local_88._4_4_ = auVar34._0_4_;
      local_88._0_4_ = local_88._4_4_;
      local_88._8_4_ = local_88._4_4_;
      local_88._12_4_ = local_88._4_4_;
      auVar34 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar30][0]),
                        ZEXT416((uint)cdef_pri_taps[bVar30][0]),0);
      auVar35 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar30][1]),
                        ZEXT416((uint)cdef_pri_taps[bVar30][1]),0);
      sStack_b4 = auVar35._0_2_;
      sStack_b2 = auVar35._2_2_;
      auVar36 = pshuflw(ZEXT416((uint)sec_strength),ZEXT416((uint)sec_strength),0);
      local_e8._4_4_ = auVar36._0_4_;
      local_e8._0_4_ = local_e8._4_4_;
      local_e8._8_4_ = local_e8._4_4_;
      local_e8._12_4_ = local_e8._4_4_;
      auVar36 = pshuflw(ZEXT416((uint)2),ZEXT416((uint)2),0);
      auVar37 = pshuflw(ZEXT416((uint)1),ZEXT416((uint)1),0);
      lVar21 = (long)dstride;
      uVar20 = 0;
      do {
        uVar2 = *(undefined8 *)in;
        uVar3 = *(undefined8 *)(in + 0x90);
        auVar342._8_8_ = uVar2;
        auVar342._0_8_ = uVar3;
        uVar4 = *(undefined8 *)(in + 0x120);
        uVar5 = *(undefined8 *)(in + 0x1b0);
        uVar6 = *(undefined8 *)(in + lVar23);
        uVar7 = *(undefined8 *)(in + lVar23 + 0x90);
        uVar8 = *(undefined8 *)(in + lVar23 + 0x120);
        uVar9 = *(undefined8 *)(in + lVar23 + 0x1b0);
        sVar31 = (short)uVar7;
        sVar341 = (short)uVar3;
        auVar85._0_2_ = sVar31 - sVar341;
        sVar48 = (short)((ulong)uVar7 >> 0x10);
        sVar355 = (short)((ulong)uVar3 >> 0x10);
        auVar85._2_2_ = sVar48 - sVar355;
        sVar51 = (short)((ulong)uVar7 >> 0x20);
        sVar357 = (short)((ulong)uVar3 >> 0x20);
        auVar85._4_2_ = sVar51 - sVar357;
        sVar54 = (short)((ulong)uVar7 >> 0x30);
        sVar359 = (short)((ulong)uVar3 >> 0x30);
        auVar85._6_2_ = sVar54 - sVar359;
        sVar215 = (short)uVar6;
        sVar362 = (short)uVar2;
        auVar85._8_2_ = sVar215 - sVar362;
        sVar238 = (short)((ulong)uVar6 >> 0x10);
        sVar365 = (short)((ulong)uVar2 >> 0x10);
        auVar85._10_2_ = sVar238 - sVar365;
        sVar242 = (short)((ulong)uVar6 >> 0x20);
        sVar246 = (short)((ulong)uVar6 >> 0x30);
        sVar368 = (short)((ulong)uVar2 >> 0x20);
        auVar85._12_2_ = sVar242 - sVar368;
        sVar371 = (short)((ulong)uVar2 >> 0x30);
        auVar85._14_2_ = sVar246 - sVar371;
        sVar125 = (short)uVar9;
        sVar415 = (short)uVar5;
        auVar134._0_2_ = sVar125 - sVar415;
        sVar147 = (short)((ulong)uVar9 >> 0x10);
        sVar340 = (short)((ulong)uVar5 >> 0x10);
        auVar134._2_2_ = sVar147 - sVar340;
        sVar154 = (short)((ulong)uVar9 >> 0x20);
        sVar423 = (short)((ulong)uVar5 >> 0x20);
        auVar134._4_2_ = sVar154 - sVar423;
        sVar161 = (short)((ulong)uVar9 >> 0x30);
        sVar354 = (short)((ulong)uVar5 >> 0x30);
        auVar134._6_2_ = sVar161 - sVar354;
        sVar168 = (short)uVar8;
        sVar424 = (short)uVar4;
        auVar134._8_2_ = sVar168 - sVar424;
        sVar175 = (short)((ulong)uVar8 >> 0x10);
        sVar356 = (short)((ulong)uVar4 >> 0x10);
        auVar134._10_2_ = sVar175 - sVar356;
        sVar181 = (short)((ulong)uVar8 >> 0x20);
        sVar188 = (short)((ulong)uVar8 >> 0x30);
        sVar425 = (short)((ulong)uVar4 >> 0x20);
        auVar134._12_2_ = sVar181 - sVar425;
        sVar358 = (short)((ulong)uVar4 >> 0x30);
        auVar134._14_2_ = sVar188 - sVar358;
        auVar216 = pabsw(in_XMM4,auVar85);
        auVar46 = psraw(auVar85,0xf);
        local_98 = (ulong)uVar28;
        uVar32 = auVar216._0_2_;
        auVar343._0_2_ = uVar32 >> local_98;
        uVar47 = auVar216._2_2_;
        auVar343._2_2_ = uVar47 >> local_98;
        uVar50 = auVar216._4_2_;
        auVar343._4_2_ = uVar50 >> local_98;
        uVar53 = auVar216._6_2_;
        auVar343._6_2_ = uVar53 >> local_98;
        uVar448 = auVar216._8_2_;
        auVar343._8_2_ = uVar448 >> local_98;
        uVar56 = auVar216._10_2_;
        auVar343._10_2_ = uVar56 >> local_98;
        uVar60 = auVar216._12_2_;
        uVar65 = auVar216._14_2_;
        auVar343._12_2_ = uVar60 >> local_98;
        auVar343._14_2_ = uVar65 >> local_98;
        auVar109 = pabsw(in_XMM5,auVar134);
        uVar453 = auVar109._0_2_;
        auVar257._0_2_ = uVar453 >> local_98;
        uVar70 = auVar109._2_2_;
        auVar257._2_2_ = uVar70 >> local_98;
        uVar455 = auVar109._4_2_;
        auVar257._4_2_ = uVar455 >> local_98;
        uVar457 = auVar109._6_2_;
        auVar257._6_2_ = uVar457 >> local_98;
        uVar459 = auVar109._8_2_;
        auVar257._8_2_ = uVar459 >> local_98;
        uVar461 = auVar109._10_2_;
        auVar257._10_2_ = uVar461 >> local_98;
        uVar463 = auVar109._12_2_;
        uVar465 = auVar109._14_2_;
        auVar257._12_2_ = uVar463 >> local_98;
        auVar257._14_2_ = uVar465 >> local_98;
        auVar279 = psraw(auVar134,0xf);
        auVar216 = psubusw(local_88,auVar343);
        auVar85 = psubusw(local_88,auVar257);
        sVar75 = auVar216._0_2_;
        sVar76 = auVar216._2_2_;
        sVar94 = auVar216._4_2_;
        sVar95 = auVar216._6_2_;
        sVar96 = auVar216._8_2_;
        sVar97 = auVar216._10_2_;
        sVar98 = auVar216._12_2_;
        sVar99 = auVar216._14_2_;
        sVar33 = auVar85._0_2_;
        sVar49 = auVar85._2_2_;
        sVar52 = auVar85._4_2_;
        sVar55 = auVar85._6_2_;
        sVar236 = auVar85._8_2_;
        sVar240 = auVar85._10_2_;
        sVar244 = auVar85._12_2_;
        sVar249 = auVar85._14_2_;
        auVar115._0_2_ =
             (((short)uVar32 < sVar75) * uVar32 | (ushort)((short)uVar32 >= sVar75) * sVar75) +
             auVar46._0_2_;
        auVar115._2_2_ =
             (((short)uVar47 < sVar76) * uVar47 | (ushort)((short)uVar47 >= sVar76) * sVar76) +
             auVar46._2_2_;
        auVar115._4_2_ =
             (((short)uVar50 < sVar94) * uVar50 | (ushort)((short)uVar50 >= sVar94) * sVar94) +
             auVar46._4_2_;
        auVar115._6_2_ =
             (((short)uVar53 < sVar95) * uVar53 | (ushort)((short)uVar53 >= sVar95) * sVar95) +
             auVar46._6_2_;
        auVar115._8_2_ =
             (((short)uVar448 < sVar96) * uVar448 | (ushort)((short)uVar448 >= sVar96) * sVar96) +
             auVar46._8_2_;
        auVar115._10_2_ =
             (((short)uVar56 < sVar97) * uVar56 | (ushort)((short)uVar56 >= sVar97) * sVar97) +
             auVar46._10_2_;
        auVar115._12_2_ =
             (((short)uVar60 < sVar98) * uVar60 | (ushort)((short)uVar60 >= sVar98) * sVar98) +
             auVar46._12_2_;
        auVar115._14_2_ =
             (((short)uVar65 < sVar99) * uVar65 | (ushort)((short)uVar65 >= sVar99) * sVar99) +
             auVar46._14_2_;
        auVar384._0_2_ =
             (((short)uVar453 < sVar33) * uVar453 | (ushort)((short)uVar453 >= sVar33) * sVar33) +
             auVar279._0_2_;
        auVar384._2_2_ =
             (((short)uVar70 < sVar49) * uVar70 | (ushort)((short)uVar70 >= sVar49) * sVar49) +
             auVar279._2_2_;
        auVar384._4_2_ =
             (((short)uVar455 < sVar52) * uVar455 | (ushort)((short)uVar455 >= sVar52) * sVar52) +
             auVar279._4_2_;
        auVar384._6_2_ =
             (((short)uVar457 < sVar55) * uVar457 | (ushort)((short)uVar457 >= sVar55) * sVar55) +
             auVar279._6_2_;
        auVar384._8_2_ =
             (((short)uVar459 < sVar236) * uVar459 | (ushort)((short)uVar459 >= sVar236) * sVar236)
             + auVar279._8_2_;
        auVar384._10_2_ =
             (((short)uVar461 < sVar240) * uVar461 | (ushort)((short)uVar461 >= sVar240) * sVar240)
             + auVar279._10_2_;
        auVar384._12_2_ =
             (((short)uVar463 < sVar244) * uVar463 | (ushort)((short)uVar463 >= sVar244) * sVar244)
             + auVar279._12_2_;
        auVar384._14_2_ =
             (((short)uVar465 < sVar249) * uVar465 | (ushort)((short)uVar465 >= sVar249) * sVar249)
             + auVar279._14_2_;
        auVar115 = auVar115 ^ auVar46;
        auVar384 = auVar384 ^ auVar279;
        uVar2 = *(undefined8 *)(in + -lVar23);
        uVar3 = *(undefined8 *)(in + (0x90 - lVar23));
        uVar4 = *(undefined8 *)(in + (0x120 - lVar23));
        uVar5 = *(undefined8 *)(in + (0x1b0 - lVar23));
        sVar126 = (short)uVar3;
        auVar135._0_2_ = sVar126 - sVar341;
        sVar148 = (short)((ulong)uVar3 >> 0x10);
        auVar135._2_2_ = sVar148 - sVar355;
        sVar155 = (short)((ulong)uVar3 >> 0x20);
        auVar135._4_2_ = sVar155 - sVar357;
        sVar162 = (short)((ulong)uVar3 >> 0x30);
        auVar135._6_2_ = sVar162 - sVar359;
        sVar169 = (short)uVar2;
        auVar135._8_2_ = sVar169 - sVar362;
        sVar176 = (short)((ulong)uVar2 >> 0x10);
        auVar135._10_2_ = sVar176 - sVar365;
        sVar183 = (short)((ulong)uVar2 >> 0x20);
        sVar189 = (short)((ulong)uVar2 >> 0x30);
        auVar135._12_2_ = sVar183 - sVar368;
        auVar135._14_2_ = sVar189 - sVar371;
        sVar193 = (short)uVar5;
        auVar202._0_2_ = sVar193 - sVar415;
        sVar207 = (short)((ulong)uVar5 >> 0x10);
        auVar202._2_2_ = sVar207 - sVar340;
        sVar208 = (short)((ulong)uVar5 >> 0x20);
        auVar202._4_2_ = sVar208 - sVar423;
        sVar209 = (short)((ulong)uVar5 >> 0x30);
        auVar202._6_2_ = sVar209 - sVar354;
        sVar210 = (short)uVar4;
        auVar202._8_2_ = sVar210 - sVar424;
        sVar211 = (short)((ulong)uVar4 >> 0x10);
        auVar202._10_2_ = sVar211 - sVar356;
        sVar212 = (short)((ulong)uVar4 >> 0x20);
        sVar213 = (short)((ulong)uVar4 >> 0x30);
        auVar202._12_2_ = sVar212 - sVar425;
        auVar202._14_2_ = sVar213 - sVar358;
        auVar46 = pabsw(auVar109,auVar135);
        auVar85 = psraw(auVar135,0xf);
        auVar279 = pabsw(auVar342,auVar202);
        auVar109 = psraw(auVar202,0xf);
        uVar32 = auVar46._0_2_;
        auVar216._0_2_ = uVar32 >> local_98;
        uVar47 = auVar46._2_2_;
        auVar216._2_2_ = uVar47 >> local_98;
        uVar50 = auVar46._4_2_;
        auVar216._4_2_ = uVar50 >> local_98;
        uVar53 = auVar46._6_2_;
        auVar216._6_2_ = uVar53 >> local_98;
        uVar448 = auVar46._8_2_;
        auVar216._8_2_ = uVar448 >> local_98;
        uVar56 = auVar46._10_2_;
        auVar216._10_2_ = uVar56 >> local_98;
        uVar60 = auVar46._12_2_;
        uVar65 = auVar46._14_2_;
        auVar216._12_2_ = uVar60 >> local_98;
        auVar216._14_2_ = uVar65 >> local_98;
        uVar453 = auVar279._0_2_;
        auVar321._0_2_ = uVar453 >> local_98;
        uVar70 = auVar279._2_2_;
        auVar321._2_2_ = uVar70 >> local_98;
        uVar455 = auVar279._4_2_;
        auVar321._4_2_ = uVar455 >> local_98;
        uVar457 = auVar279._6_2_;
        auVar321._6_2_ = uVar457 >> local_98;
        uVar459 = auVar279._8_2_;
        auVar321._8_2_ = uVar459 >> local_98;
        uVar461 = auVar279._10_2_;
        auVar321._10_2_ = uVar461 >> local_98;
        uVar463 = auVar279._12_2_;
        uVar465 = auVar279._14_2_;
        auVar321._12_2_ = uVar463 >> local_98;
        auVar321._14_2_ = uVar465 >> local_98;
        auVar216 = psubusw(local_88,auVar216);
        auVar46 = psubusw(local_88,auVar321);
        sVar75 = auVar216._0_2_;
        sVar76 = auVar216._2_2_;
        sVar94 = auVar216._4_2_;
        sVar95 = auVar216._6_2_;
        sVar96 = auVar216._8_2_;
        sVar97 = auVar216._10_2_;
        sVar98 = auVar216._12_2_;
        sVar99 = auVar216._14_2_;
        sVar33 = auVar46._0_2_;
        sVar49 = auVar46._2_2_;
        sVar52 = auVar46._4_2_;
        sVar55 = auVar46._6_2_;
        sVar236 = auVar46._8_2_;
        sVar240 = auVar46._10_2_;
        sVar244 = auVar46._12_2_;
        sVar249 = auVar46._14_2_;
        auVar417._0_2_ =
             (((short)uVar32 < sVar75) * uVar32 | (ushort)((short)uVar32 >= sVar75) * sVar75) +
             auVar85._0_2_;
        auVar417._2_2_ =
             (((short)uVar47 < sVar76) * uVar47 | (ushort)((short)uVar47 >= sVar76) * sVar76) +
             auVar85._2_2_;
        auVar417._4_2_ =
             (((short)uVar50 < sVar94) * uVar50 | (ushort)((short)uVar50 >= sVar94) * sVar94) +
             auVar85._4_2_;
        auVar417._6_2_ =
             (((short)uVar53 < sVar95) * uVar53 | (ushort)((short)uVar53 >= sVar95) * sVar95) +
             auVar85._6_2_;
        auVar417._8_2_ =
             (((short)uVar448 < sVar96) * uVar448 | (ushort)((short)uVar448 >= sVar96) * sVar96) +
             auVar85._8_2_;
        auVar417._10_2_ =
             (((short)uVar56 < sVar97) * uVar56 | (ushort)((short)uVar56 >= sVar97) * sVar97) +
             auVar85._10_2_;
        auVar417._12_2_ =
             (((short)uVar60 < sVar98) * uVar60 | (ushort)((short)uVar60 >= sVar98) * sVar98) +
             auVar85._12_2_;
        auVar417._14_2_ =
             (((short)uVar65 < sVar99) * uVar65 | (ushort)((short)uVar65 >= sVar99) * sVar99) +
             auVar85._14_2_;
        auVar279._0_2_ =
             (((short)uVar453 < sVar33) * uVar453 | (ushort)((short)uVar453 >= sVar33) * sVar33) +
             auVar109._0_2_;
        auVar279._2_2_ =
             (((short)uVar70 < sVar49) * uVar70 | (ushort)((short)uVar70 >= sVar49) * sVar49) +
             auVar109._2_2_;
        auVar279._4_2_ =
             (((short)uVar455 < sVar52) * uVar455 | (ushort)((short)uVar455 >= sVar52) * sVar52) +
             auVar109._4_2_;
        auVar279._6_2_ =
             (((short)uVar457 < sVar55) * uVar457 | (ushort)((short)uVar457 >= sVar55) * sVar55) +
             auVar109._6_2_;
        auVar279._8_2_ =
             (((short)uVar459 < sVar236) * uVar459 | (ushort)((short)uVar459 >= sVar236) * sVar236)
             + auVar109._8_2_;
        auVar279._10_2_ =
             (((short)uVar461 < sVar240) * uVar461 | (ushort)((short)uVar461 >= sVar240) * sVar240)
             + auVar109._10_2_;
        auVar279._12_2_ =
             (((short)uVar463 < sVar244) * uVar463 | (ushort)((short)uVar463 >= sVar244) * sVar244)
             + auVar109._12_2_;
        auVar279._14_2_ =
             (((short)uVar465 < sVar249) * uVar465 | (ushort)((short)uVar465 >= sVar249) * sVar249)
             + auVar109._14_2_;
        auVar417 = auVar417 ^ auVar85;
        auVar279 = auVar279 ^ auVar109;
        uVar10 = *(undefined8 *)(in + lVar24);
        uVar11 = *(undefined8 *)(in + lVar24 + 0x90);
        uVar12 = *(undefined8 *)(in + lVar24 + 0x120);
        uVar13 = *(undefined8 *)(in + lVar24 + 0x1b0);
        sVar75 = (short)uVar11;
        auVar86._0_2_ = sVar75 - sVar341;
        sVar76 = (short)((ulong)uVar11 >> 0x10);
        auVar86._2_2_ = sVar76 - sVar355;
        sVar94 = (short)((ulong)uVar11 >> 0x20);
        auVar86._4_2_ = sVar94 - sVar357;
        sVar95 = (short)((ulong)uVar11 >> 0x30);
        auVar86._6_2_ = sVar95 - sVar359;
        sVar96 = (short)uVar10;
        auVar86._8_2_ = sVar96 - sVar362;
        sVar97 = (short)((ulong)uVar10 >> 0x10);
        auVar86._10_2_ = sVar97 - sVar365;
        sVar98 = (short)((ulong)uVar10 >> 0x20);
        sVar99 = (short)((ulong)uVar10 >> 0x30);
        auVar86._12_2_ = sVar98 - sVar368;
        auVar86._14_2_ = sVar99 - sVar371;
        sVar100 = (short)uVar13;
        auVar116._0_2_ = sVar100 - sVar415;
        sVar101 = (short)((ulong)uVar13 >> 0x10);
        auVar116._2_2_ = sVar101 - sVar340;
        sVar102 = (short)((ulong)uVar13 >> 0x20);
        auVar116._4_2_ = sVar102 - sVar423;
        sVar103 = (short)((ulong)uVar13 >> 0x30);
        auVar116._6_2_ = sVar103 - sVar354;
        sVar104 = (short)uVar12;
        auVar116._8_2_ = sVar104 - sVar424;
        sVar105 = (short)((ulong)uVar12 >> 0x10);
        auVar116._10_2_ = sVar105 - sVar356;
        sVar106 = (short)((ulong)uVar12 >> 0x20);
        sVar107 = (short)((ulong)uVar12 >> 0x30);
        auVar116._12_2_ = sVar106 - sVar425;
        auVar116._14_2_ = sVar107 - sVar358;
        auVar46 = pabsw(auVar85,auVar86);
        auVar127 = pabsw(auVar109,auVar116);
        uVar32 = auVar46._0_2_;
        auVar230._0_2_ = uVar32 >> local_98;
        uVar50 = auVar46._2_2_;
        auVar230._2_2_ = uVar50 >> local_98;
        uVar448 = auVar46._4_2_;
        auVar230._4_2_ = uVar448 >> local_98;
        uVar60 = auVar46._6_2_;
        auVar230._6_2_ = uVar60 >> local_98;
        uVar453 = auVar46._8_2_;
        auVar230._8_2_ = uVar453 >> local_98;
        uVar455 = auVar46._10_2_;
        auVar230._10_2_ = uVar455 >> local_98;
        uVar459 = auVar46._12_2_;
        uVar463 = auVar46._14_2_;
        auVar230._12_2_ = uVar459 >> local_98;
        auVar230._14_2_ = uVar463 >> local_98;
        auVar109 = psubusw(local_88,auVar230);
        uVar47 = auVar127._0_2_;
        auVar231._0_2_ = uVar47 >> local_98;
        uVar53 = auVar127._2_2_;
        auVar231._2_2_ = uVar53 >> local_98;
        uVar56 = auVar127._4_2_;
        auVar231._4_2_ = uVar56 >> local_98;
        uVar65 = auVar127._6_2_;
        auVar231._6_2_ = uVar65 >> local_98;
        uVar70 = auVar127._8_2_;
        auVar231._8_2_ = uVar70 >> local_98;
        uVar457 = auVar127._10_2_;
        auVar231._10_2_ = uVar457 >> local_98;
        uVar461 = auVar127._12_2_;
        uVar465 = auVar127._14_2_;
        auVar231._12_2_ = uVar461 >> local_98;
        auVar231._14_2_ = uVar465 >> local_98;
        auVar46 = psubusw(local_88,auVar231);
        auVar85 = psraw(auVar86,0xf);
        auVar216 = psraw(auVar116,0xf);
        sVar278 = auVar109._0_2_;
        sVar290 = auVar109._2_2_;
        sVar291 = auVar109._4_2_;
        sVar292 = auVar109._6_2_;
        sVar295 = auVar109._8_2_;
        sVar300 = auVar109._10_2_;
        sVar305 = auVar109._12_2_;
        sVar310 = auVar109._14_2_;
        sVar33 = auVar46._0_2_;
        sVar49 = auVar46._2_2_;
        sVar52 = auVar46._4_2_;
        sVar55 = auVar46._6_2_;
        sVar236 = auVar46._8_2_;
        sVar240 = auVar46._10_2_;
        sVar244 = auVar46._12_2_;
        sVar249 = auVar46._14_2_;
        auVar286._0_2_ =
             (((short)uVar32 < sVar278) * uVar32 | (ushort)((short)uVar32 >= sVar278) * sVar278) +
             auVar85._0_2_;
        auVar286._2_2_ =
             (((short)uVar50 < sVar290) * uVar50 | (ushort)((short)uVar50 >= sVar290) * sVar290) +
             auVar85._2_2_;
        auVar286._4_2_ =
             (((short)uVar448 < sVar291) * uVar448 | (ushort)((short)uVar448 >= sVar291) * sVar291)
             + auVar85._4_2_;
        auVar286._6_2_ =
             (((short)uVar60 < sVar292) * uVar60 | (ushort)((short)uVar60 >= sVar292) * sVar292) +
             auVar85._6_2_;
        auVar286._8_2_ =
             (((short)uVar453 < sVar295) * uVar453 | (ushort)((short)uVar453 >= sVar295) * sVar295)
             + auVar85._8_2_;
        auVar286._10_2_ =
             (((short)uVar455 < sVar300) * uVar455 | (ushort)((short)uVar455 >= sVar300) * sVar300)
             + auVar85._10_2_;
        auVar286._12_2_ =
             (((short)uVar459 < sVar305) * uVar459 | (ushort)((short)uVar459 >= sVar305) * sVar305)
             + auVar85._12_2_;
        auVar286._14_2_ =
             (((short)uVar463 < sVar310) * uVar463 | (ushort)((short)uVar463 >= sVar310) * sVar310)
             + auVar85._14_2_;
        auVar109._0_2_ =
             (((short)uVar47 < sVar33) * uVar47 | (ushort)((short)uVar47 >= sVar33) * sVar33) +
             auVar216._0_2_;
        auVar109._2_2_ =
             (((short)uVar53 < sVar49) * uVar53 | (ushort)((short)uVar53 >= sVar49) * sVar49) +
             auVar216._2_2_;
        auVar109._4_2_ =
             (((short)uVar56 < sVar52) * uVar56 | (ushort)((short)uVar56 >= sVar52) * sVar52) +
             auVar216._4_2_;
        auVar109._6_2_ =
             (((short)uVar65 < sVar55) * uVar65 | (ushort)((short)uVar65 >= sVar55) * sVar55) +
             auVar216._6_2_;
        auVar109._8_2_ =
             (((short)uVar70 < sVar236) * uVar70 | (ushort)((short)uVar70 >= sVar236) * sVar236) +
             auVar216._8_2_;
        auVar109._10_2_ =
             (((short)uVar457 < sVar240) * uVar457 | (ushort)((short)uVar457 >= sVar240) * sVar240)
             + auVar216._10_2_;
        auVar109._12_2_ =
             (((short)uVar461 < sVar244) * uVar461 | (ushort)((short)uVar461 >= sVar244) * sVar244)
             + auVar216._12_2_;
        auVar109._14_2_ =
             (((short)uVar465 < sVar249) * uVar465 | (ushort)((short)uVar465 >= sVar249) * sVar249)
             + auVar216._14_2_;
        auVar286 = auVar286 ^ auVar85;
        auVar109 = auVar109 ^ auVar216;
        uVar14 = *(undefined8 *)(in + -lVar24);
        uVar15 = *(undefined8 *)(in + (0x90 - lVar24));
        local_168._8_8_ = *(undefined8 *)(in + (0x120 - lVar24));
        local_168._0_8_ = *(undefined8 *)(in + (0x1b0 - lVar24));
        uVar16 = *(undefined8 *)(in + lVar25);
        uVar17 = *(undefined8 *)(in + lVar25 + 0x90);
        uVar32 = (ushort)(sVar31 < sVar341) * sVar31 | (ushort)(sVar31 >= sVar341) * sVar341;
        uVar47 = (ushort)(sVar48 < sVar355) * sVar48 | (ushort)(sVar48 >= sVar355) * sVar355;
        uVar50 = (ushort)(sVar51 < sVar357) * sVar51 | (ushort)(sVar51 >= sVar357) * sVar357;
        uVar53 = (ushort)(sVar54 < sVar359) * sVar54 | (ushort)(sVar54 >= sVar359) * sVar359;
        uVar448 = (ushort)(sVar215 < sVar362) * sVar215 | (ushort)(sVar215 >= sVar362) * sVar362;
        uVar56 = (ushort)(sVar238 < sVar365) * sVar238 | (ushort)(sVar238 >= sVar365) * sVar365;
        uVar60 = (ushort)(sVar242 < sVar368) * sVar242 | (ushort)(sVar242 >= sVar368) * sVar368;
        uVar65 = (ushort)(sVar246 < sVar371) * sVar246 | (ushort)(sVar246 >= sVar371) * sVar371;
        bVar192 = (byte)uVar3;
        bVar122 = (byte)uVar7;
        bVar293 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar3 >> 8);
        bVar122 = (byte)((ulong)uVar7 >> 8);
        bVar294 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar3 >> 0x10);
        bVar122 = (byte)((ulong)uVar7 >> 0x10);
        bVar296 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar3 >> 0x18);
        bVar122 = (byte)((ulong)uVar7 >> 0x18);
        bVar297 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar3 >> 0x20);
        bVar122 = (byte)((ulong)uVar7 >> 0x20);
        bVar298 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar3 >> 0x28);
        bVar122 = (byte)((ulong)uVar7 >> 0x28);
        bVar299 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar3 >> 0x30);
        bVar122 = (byte)((ulong)uVar7 >> 0x30);
        bVar301 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar3 >> 0x38);
        bVar122 = (byte)((ulong)uVar7 >> 0x38);
        bVar302 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)uVar2;
        bVar122 = (byte)uVar6;
        bVar303 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar2 >> 8);
        bVar122 = (byte)((ulong)uVar6 >> 8);
        bVar304 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar2 >> 0x10);
        bVar122 = (byte)((ulong)uVar6 >> 0x10);
        bVar306 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar2 >> 0x18);
        bVar122 = (byte)((ulong)uVar6 >> 0x18);
        bVar307 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar2 >> 0x20);
        bVar122 = (byte)((ulong)uVar6 >> 0x20);
        bVar308 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar2 >> 0x28);
        bVar122 = (byte)((ulong)uVar6 >> 0x28);
        bVar309 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar2 >> 0x30);
        bVar122 = (byte)((ulong)uVar6 >> 0x30);
        bVar123 = (byte)((ulong)uVar6 >> 0x38);
        bVar311 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar2 >> 0x38);
        bVar312 = (bVar123 < bVar192) * bVar192 | (bVar123 >= bVar192) * bVar123;
        uVar73 = (ushort)(sVar75 < sVar126) * sVar75 | (ushort)(sVar75 >= sVar126) * sVar126;
        uVar71 = (ushort)(sVar76 < sVar148) * sVar76 | (ushort)(sVar76 >= sVar148) * sVar148;
        uVar72 = (ushort)(sVar94 < sVar155) * sVar94 | (ushort)(sVar94 >= sVar155) * sVar155;
        uVar124 = (ushort)(sVar95 < sVar162) * sVar95 | (ushort)(sVar95 >= sVar162) * sVar162;
        uVar153 = (ushort)(sVar96 < sVar169) * sVar96 | (ushort)(sVar96 >= sVar169) * sVar169;
        uVar167 = (ushort)(sVar97 < sVar176) * sVar97 | (ushort)(sVar97 >= sVar176) * sVar176;
        uVar182 = (ushort)(sVar98 < sVar183) * sVar98 | (ushort)(sVar98 >= sVar183) * sVar183;
        uVar248 = (ushort)(sVar99 < sVar189) * sVar99 | (ushort)(sVar99 >= sVar189) * sVar189;
        bVar192 = (byte)uVar15;
        bVar122 = (byte)uVar11;
        bVar251 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar15 >> 8);
        bVar122 = (byte)((ulong)uVar11 >> 8);
        bVar263 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar15 >> 0x10);
        bVar122 = (byte)((ulong)uVar11 >> 0x10);
        bVar264 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar15 >> 0x18);
        bVar122 = (byte)((ulong)uVar11 >> 0x18);
        bVar265 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar15 >> 0x20);
        bVar122 = (byte)((ulong)uVar11 >> 0x20);
        bVar266 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar15 >> 0x28);
        bVar122 = (byte)((ulong)uVar11 >> 0x28);
        bVar267 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar15 >> 0x30);
        bVar122 = (byte)((ulong)uVar11 >> 0x30);
        bVar268 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar15 >> 0x38);
        bVar122 = (byte)((ulong)uVar11 >> 0x38);
        bVar269 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)uVar14;
        bVar122 = (byte)uVar10;
        bVar270 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar14 >> 8);
        bVar122 = (byte)((ulong)uVar10 >> 8);
        bVar271 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar14 >> 0x10);
        bVar122 = (byte)((ulong)uVar10 >> 0x10);
        bVar272 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar14 >> 0x18);
        bVar122 = (byte)((ulong)uVar10 >> 0x18);
        bVar273 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar14 >> 0x20);
        bVar122 = (byte)((ulong)uVar10 >> 0x20);
        bVar274 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar14 >> 0x28);
        bVar122 = (byte)((ulong)uVar10 >> 0x28);
        bVar275 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar14 >> 0x30);
        bVar122 = (byte)((ulong)uVar10 >> 0x30);
        bVar123 = (byte)((ulong)uVar10 >> 0x38);
        bVar276 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar14 >> 0x38);
        bVar277 = (bVar123 < bVar192) * bVar192 | (bVar123 >= bVar192) * bVar123;
        sVar31 = (short)uVar15;
        sVar75 = (short)uVar17;
        uVar401 = (ushort)(sVar31 < sVar75) * sVar31 | (ushort)(sVar31 >= sVar75) * sVar75;
        sVar33 = (short)((ulong)uVar15 >> 0x10);
        sVar76 = (short)((ulong)uVar17 >> 0x10);
        uVar405 = (ushort)(sVar33 < sVar76) * sVar33 | (ushort)(sVar33 >= sVar76) * sVar76;
        sVar48 = (short)((ulong)uVar15 >> 0x20);
        sVar94 = (short)((ulong)uVar17 >> 0x20);
        uVar409 = (ushort)(sVar48 < sVar94) * sVar48 | (ushort)(sVar48 >= sVar94) * sVar94;
        sVar49 = (short)((ulong)uVar15 >> 0x30);
        sVar95 = (short)((ulong)uVar17 >> 0x30);
        uVar413 = (ushort)(sVar49 < sVar95) * sVar49 | (ushort)(sVar49 >= sVar95) * sVar95;
        sVar51 = (short)uVar14;
        sVar96 = (short)uVar16;
        uVar449 = (ushort)(sVar51 < sVar96) * sVar51 | (ushort)(sVar51 >= sVar96) * sVar96;
        sVar52 = (short)((ulong)uVar14 >> 0x10);
        sVar97 = (short)((ulong)uVar16 >> 0x10);
        uVar454 = (ushort)(sVar52 < sVar97) * sVar52 | (ushort)(sVar52 >= sVar97) * sVar97;
        sVar54 = (short)((ulong)uVar14 >> 0x20);
        sVar98 = (short)((ulong)uVar16 >> 0x20);
        sVar99 = (short)((ulong)uVar16 >> 0x30);
        uVar456 = (ushort)(sVar54 < sVar98) * sVar54 | (ushort)(sVar54 >= sVar98) * sVar98;
        sVar55 = (short)((ulong)uVar14 >> 0x30);
        uVar458 = (ushort)(sVar55 < sVar99) * sVar55 | (ushort)(sVar55 >= sVar99) * sVar99;
        auVar136._0_2_ = sVar31 - sVar341;
        auVar136._2_2_ = sVar33 - sVar355;
        auVar136._4_2_ = sVar48 - sVar357;
        auVar136._6_2_ = sVar49 - sVar359;
        auVar136._8_2_ = sVar51 - sVar362;
        auVar136._10_2_ = sVar52 - sVar365;
        auVar136._12_2_ = sVar54 - sVar368;
        auVar136._14_2_ = sVar55 - sVar371;
        auVar46 = pabsw(auVar127,auVar136);
        uVar453 = auVar46._0_2_;
        auVar87._0_2_ = uVar453 >> local_98;
        uVar70 = auVar46._2_2_;
        auVar87._2_2_ = uVar70 >> local_98;
        uVar455 = auVar46._4_2_;
        auVar87._4_2_ = uVar455 >> local_98;
        uVar457 = auVar46._6_2_;
        auVar87._6_2_ = uVar457 >> local_98;
        uVar459 = auVar46._8_2_;
        auVar87._8_2_ = uVar459 >> local_98;
        uVar461 = auVar46._10_2_;
        auVar87._10_2_ = uVar461 >> local_98;
        uVar463 = auVar46._12_2_;
        uVar465 = auVar46._14_2_;
        auVar87._12_2_ = uVar463 >> local_98;
        auVar87._14_2_ = uVar465 >> local_98;
        auVar85 = psubusw(local_88,auVar87);
        uVar2 = *(undefined8 *)(in + lVar25 + 0x120);
        uVar3 = *(undefined8 *)(in + lVar25 + 0x1b0);
        uVar66 = (ushort)(sVar125 < sVar415) * sVar125 | (ushort)(sVar125 >= sVar415) * sVar415;
        uVar67 = (ushort)(sVar147 < sVar340) * sVar147 | (ushort)(sVar147 >= sVar340) * sVar340;
        uVar69 = (ushort)(sVar154 < sVar423) * sVar154 | (ushort)(sVar154 >= sVar423) * sVar423;
        uVar74 = (ushort)(sVar161 < sVar354) * sVar161 | (ushort)(sVar161 >= sVar354) * sVar354;
        uVar247 = (ushort)(sVar168 < sVar424) * sVar168 | (ushort)(sVar168 >= sVar424) * sVar424;
        uVar146 = (ushort)(sVar175 < sVar356) * sVar175 | (ushort)(sVar175 >= sVar356) * sVar356;
        uVar160 = (ushort)(sVar181 < sVar425) * sVar181 | (ushort)(sVar181 >= sVar425) * sVar425;
        uVar174 = (ushort)(sVar188 < sVar358) * sVar188 | (ushort)(sVar188 >= sVar358) * sVar358;
        bVar192 = (byte)uVar5;
        bVar122 = (byte)uVar9;
        bVar122 = (bVar122 < bVar192) * bVar192 | (bVar122 >= bVar192) * bVar122;
        bVar192 = (byte)((ulong)uVar5 >> 8);
        bVar123 = (byte)((ulong)uVar9 >> 8);
        bVar123 = (bVar123 < bVar192) * bVar192 | (bVar123 >= bVar192) * bVar123;
        bVar192 = (byte)((ulong)uVar5 >> 0x10);
        bVar142 = (byte)((ulong)uVar9 >> 0x10);
        bVar142 = (bVar142 < bVar192) * bVar192 | (bVar142 >= bVar192) * bVar142;
        bVar192 = (byte)((ulong)uVar5 >> 0x18);
        bVar143 = (byte)((ulong)uVar9 >> 0x18);
        bVar143 = (bVar143 < bVar192) * bVar192 | (bVar143 >= bVar192) * bVar143;
        bVar192 = (byte)((ulong)uVar5 >> 0x20);
        bVar144 = (byte)((ulong)uVar9 >> 0x20);
        bVar144 = (bVar144 < bVar192) * bVar192 | (bVar144 >= bVar192) * bVar144;
        bVar192 = (byte)((ulong)uVar5 >> 0x28);
        bVar145 = (byte)((ulong)uVar9 >> 0x28);
        bVar145 = (bVar145 < bVar192) * bVar192 | (bVar145 >= bVar192) * bVar145;
        bVar192 = (byte)((ulong)uVar5 >> 0x30);
        bVar149 = (byte)((ulong)uVar9 >> 0x30);
        bVar149 = (bVar149 < bVar192) * bVar192 | (bVar149 >= bVar192) * bVar149;
        bVar192 = (byte)((ulong)uVar5 >> 0x38);
        bVar150 = (byte)((ulong)uVar9 >> 0x38);
        bVar150 = (bVar150 < bVar192) * bVar192 | (bVar150 >= bVar192) * bVar150;
        bVar192 = (byte)uVar4;
        bVar151 = (byte)uVar8;
        bVar151 = (bVar151 < bVar192) * bVar192 | (bVar151 >= bVar192) * bVar151;
        bVar192 = (byte)((ulong)uVar4 >> 8);
        bVar152 = (byte)((ulong)uVar8 >> 8);
        bVar152 = (bVar152 < bVar192) * bVar192 | (bVar152 >= bVar192) * bVar152;
        bVar192 = (byte)((ulong)uVar4 >> 0x10);
        bVar156 = (byte)((ulong)uVar8 >> 0x10);
        bVar156 = (bVar156 < bVar192) * bVar192 | (bVar156 >= bVar192) * bVar156;
        bVar192 = (byte)((ulong)uVar4 >> 0x18);
        bVar157 = (byte)((ulong)uVar8 >> 0x18);
        bVar157 = (bVar157 < bVar192) * bVar192 | (bVar157 >= bVar192) * bVar157;
        bVar192 = (byte)((ulong)uVar4 >> 0x20);
        bVar158 = (byte)((ulong)uVar8 >> 0x20);
        bVar158 = (bVar158 < bVar192) * bVar192 | (bVar158 >= bVar192) * bVar158;
        bVar192 = (byte)((ulong)uVar4 >> 0x28);
        bVar159 = (byte)((ulong)uVar8 >> 0x28);
        bVar159 = (bVar159 < bVar192) * bVar192 | (bVar159 >= bVar192) * bVar159;
        bVar192 = (byte)((ulong)uVar4 >> 0x30);
        bVar163 = (byte)((ulong)uVar8 >> 0x30);
        bVar164 = (byte)((ulong)uVar8 >> 0x38);
        bVar163 = (bVar163 < bVar192) * bVar192 | (bVar163 >= bVar192) * bVar163;
        bVar192 = (byte)((ulong)uVar4 >> 0x38);
        bVar164 = (bVar164 < bVar192) * bVar192 | (bVar164 >= bVar192) * bVar164;
        uVar57 = (ushort)(sVar100 < sVar193) * sVar100 | (ushort)(sVar100 >= sVar193) * sVar193;
        uVar58 = (ushort)(sVar101 < sVar207) * sVar101 | (ushort)(sVar101 >= sVar207) * sVar207;
        uVar59 = (ushort)(sVar102 < sVar208) * sVar102 | (ushort)(sVar102 >= sVar208) * sVar208;
        uVar63 = (ushort)(sVar103 < sVar209) * sVar103 | (ushort)(sVar103 >= sVar209) * sVar209;
        uVar61 = (ushort)(sVar104 < sVar210) * sVar104 | (ushort)(sVar104 >= sVar210) * sVar210;
        uVar62 = (ushort)(sVar105 < sVar211) * sVar105 | (ushort)(sVar105 >= sVar211) * sVar211;
        uVar64 = (ushort)(sVar106 < sVar212) * sVar106 | (ushort)(sVar106 >= sVar212) * sVar212;
        uVar68 = (ushort)(sVar107 < sVar213) * sVar107 | (ushort)(sVar107 >= sVar213) * sVar213;
        bVar192 = (byte)local_168._0_8_;
        bVar165 = (byte)uVar13;
        bVar165 = (bVar165 < bVar192) * bVar192 | (bVar165 >= bVar192) * bVar165;
        bVar192 = (byte)((ulong)local_168._0_8_ >> 8);
        bVar166 = (byte)((ulong)uVar13 >> 8);
        bVar166 = (bVar166 < bVar192) * bVar192 | (bVar166 >= bVar192) * bVar166;
        bVar192 = (byte)((ulong)local_168._0_8_ >> 0x10);
        bVar170 = (byte)((ulong)uVar13 >> 0x10);
        bVar170 = (bVar170 < bVar192) * bVar192 | (bVar170 >= bVar192) * bVar170;
        bVar192 = (byte)((ulong)local_168._0_8_ >> 0x18);
        bVar171 = (byte)((ulong)uVar13 >> 0x18);
        bVar171 = (bVar171 < bVar192) * bVar192 | (bVar171 >= bVar192) * bVar171;
        bVar192 = (byte)((ulong)local_168._0_8_ >> 0x20);
        bVar172 = (byte)((ulong)uVar13 >> 0x20);
        bVar172 = (bVar172 < bVar192) * bVar192 | (bVar172 >= bVar192) * bVar172;
        bVar192 = (byte)((ulong)local_168._0_8_ >> 0x28);
        bVar173 = (byte)((ulong)uVar13 >> 0x28);
        bVar173 = (bVar173 < bVar192) * bVar192 | (bVar173 >= bVar192) * bVar173;
        bVar192 = (byte)((ulong)local_168._0_8_ >> 0x30);
        bVar177 = (byte)((ulong)uVar13 >> 0x30);
        bVar177 = (bVar177 < bVar192) * bVar192 | (bVar177 >= bVar192) * bVar177;
        bVar192 = (byte)((ulong)local_168._0_8_ >> 0x38);
        bVar178 = (byte)((ulong)uVar13 >> 0x38);
        bVar178 = (bVar178 < bVar192) * bVar192 | (bVar178 >= bVar192) * bVar178;
        bVar192 = (byte)local_168._8_8_;
        bVar179 = (byte)uVar12;
        bVar179 = (bVar179 < bVar192) * bVar192 | (bVar179 >= bVar192) * bVar179;
        bVar192 = (byte)((ulong)local_168._8_8_ >> 8);
        bVar180 = (byte)((ulong)uVar12 >> 8);
        bVar180 = (bVar180 < bVar192) * bVar192 | (bVar180 >= bVar192) * bVar180;
        bVar192 = (byte)((ulong)local_168._8_8_ >> 0x10);
        bVar184 = (byte)((ulong)uVar12 >> 0x10);
        bVar184 = (bVar184 < bVar192) * bVar192 | (bVar184 >= bVar192) * bVar184;
        bVar192 = (byte)((ulong)local_168._8_8_ >> 0x18);
        bVar185 = (byte)((ulong)uVar12 >> 0x18);
        bVar185 = (bVar185 < bVar192) * bVar192 | (bVar185 >= bVar192) * bVar185;
        bVar192 = (byte)((ulong)local_168._8_8_ >> 0x20);
        bVar186 = (byte)((ulong)uVar12 >> 0x20);
        bVar186 = (bVar186 < bVar192) * bVar192 | (bVar186 >= bVar192) * bVar186;
        bVar192 = (byte)((ulong)local_168._8_8_ >> 0x28);
        bVar187 = (byte)((ulong)uVar12 >> 0x28);
        bVar187 = (bVar187 < bVar192) * bVar192 | (bVar187 >= bVar192) * bVar187;
        bVar192 = (byte)((ulong)local_168._8_8_ >> 0x30);
        bVar191 = (byte)((ulong)uVar12 >> 0x30);
        bVar250 = (byte)((ulong)uVar12 >> 0x38);
        bVar191 = (bVar191 < bVar192) * bVar192 | (bVar191 >= bVar192) * bVar191;
        bVar192 = (byte)((ulong)local_168._8_8_ >> 0x38);
        bVar192 = (bVar250 < bVar192) * bVar192 | (bVar250 >= bVar192) * bVar250;
        sVar31 = (short)local_168._0_8_;
        sVar215 = (short)uVar3;
        uVar190 = (ushort)(sVar31 < sVar215) * sVar31 | (ushort)(sVar31 >= sVar215) * sVar215;
        sVar33 = (short)((ulong)local_168._0_8_ >> 0x10);
        sVar236 = (short)((ulong)uVar3 >> 0x10);
        uVar214 = (ushort)(sVar33 < sVar236) * sVar33 | (ushort)(sVar33 >= sVar236) * sVar236;
        sVar48 = (short)((ulong)local_168._0_8_ >> 0x20);
        sVar238 = (short)((ulong)uVar3 >> 0x20);
        uVar235 = (ushort)(sVar48 < sVar238) * sVar48 | (ushort)(sVar48 >= sVar238) * sVar238;
        sVar49 = (short)((ulong)local_168._0_8_ >> 0x30);
        sVar240 = (short)((ulong)uVar3 >> 0x30);
        uVar237 = (ushort)(sVar49 < sVar240) * sVar49 | (ushort)(sVar49 >= sVar240) * sVar240;
        sVar51 = (short)local_168._8_8_;
        sVar242 = (short)uVar2;
        uVar239 = (ushort)(sVar51 < sVar242) * sVar51 | (ushort)(sVar51 >= sVar242) * sVar242;
        sVar52 = (short)((ulong)local_168._8_8_ >> 0x10);
        sVar244 = (short)((ulong)uVar2 >> 0x10);
        uVar241 = (ushort)(sVar52 < sVar244) * sVar52 | (ushort)(sVar52 >= sVar244) * sVar244;
        sVar54 = (short)((ulong)local_168._8_8_ >> 0x20);
        sVar246 = (short)((ulong)uVar2 >> 0x20);
        sVar249 = (short)((ulong)uVar2 >> 0x30);
        uVar243 = (ushort)(sVar54 < sVar246) * sVar54 | (ushort)(sVar54 >= sVar246) * sVar246;
        sVar55 = (short)((ulong)local_168._8_8_ >> 0x30);
        uVar245 = (ushort)(sVar55 < sVar249) * sVar55 | (ushort)(sVar55 >= sVar249) * sVar249;
        auVar377._0_2_ = sVar31 - sVar415;
        auVar377._2_2_ = sVar33 - sVar340;
        auVar377._4_2_ = sVar48 - sVar423;
        auVar377._6_2_ = sVar49 - sVar354;
        auVar377._8_2_ = sVar51 - sVar424;
        auVar377._10_2_ = sVar52 - sVar356;
        auVar377._12_2_ = sVar54 - sVar425;
        auVar377._14_2_ = sVar55 - sVar358;
        auVar46 = pabsw(local_168,auVar377);
        uVar383 = auVar46._0_2_;
        auVar418._0_2_ = uVar383 >> local_98;
        uVar391 = auVar46._2_2_;
        auVar418._2_2_ = uVar391 >> local_98;
        uVar394 = auVar46._4_2_;
        auVar418._4_2_ = uVar394 >> local_98;
        uVar397 = auVar46._6_2_;
        auVar418._6_2_ = uVar397 >> local_98;
        uVar400 = auVar46._8_2_;
        auVar418._8_2_ = uVar400 >> local_98;
        uVar404 = auVar46._10_2_;
        auVar418._10_2_ = uVar404 >> local_98;
        uVar408 = auVar46._12_2_;
        uVar412 = auVar46._14_2_;
        auVar418._12_2_ = uVar408 >> local_98;
        auVar418._14_2_ = uVar412 >> local_98;
        auVar46 = psubusw(local_88,auVar418);
        sVar31 = auVar85._0_2_;
        sVar33 = auVar85._2_2_;
        sVar48 = auVar85._4_2_;
        sVar49 = auVar85._6_2_;
        sVar51 = auVar85._8_2_;
        sVar52 = auVar85._10_2_;
        sVar54 = auVar85._12_2_;
        sVar55 = auVar85._14_2_;
        sVar100 = auVar46._0_2_;
        sVar101 = auVar46._2_2_;
        sVar102 = auVar46._4_2_;
        sVar103 = auVar46._6_2_;
        sVar104 = auVar46._8_2_;
        sVar105 = auVar46._10_2_;
        sVar106 = auVar46._12_2_;
        sVar107 = auVar46._14_2_;
        auVar46 = psraw(auVar136,0xf);
        auVar446._0_2_ =
             (((short)uVar453 < sVar31) * uVar453 | (ushort)((short)uVar453 >= sVar31) * sVar31) +
             auVar46._0_2_;
        auVar446._2_2_ =
             (((short)uVar70 < sVar33) * uVar70 | (ushort)((short)uVar70 >= sVar33) * sVar33) +
             auVar46._2_2_;
        auVar446._4_2_ =
             (((short)uVar455 < sVar48) * uVar455 | (ushort)((short)uVar455 >= sVar48) * sVar48) +
             auVar46._4_2_;
        auVar446._6_2_ =
             (((short)uVar457 < sVar49) * uVar457 | (ushort)((short)uVar457 >= sVar49) * sVar49) +
             auVar46._6_2_;
        auVar446._8_2_ =
             (((short)uVar459 < sVar51) * uVar459 | (ushort)((short)uVar459 >= sVar51) * sVar51) +
             auVar46._8_2_;
        auVar446._10_2_ =
             (((short)uVar461 < sVar52) * uVar461 | (ushort)((short)uVar461 >= sVar52) * sVar52) +
             auVar46._10_2_;
        auVar446._12_2_ =
             (((short)uVar463 < sVar54) * uVar463 | (ushort)((short)uVar463 >= sVar54) * sVar54) +
             auVar46._12_2_;
        auVar446._14_2_ =
             (((short)uVar465 < sVar55) * uVar465 | (ushort)((short)uVar465 >= sVar55) * sVar55) +
             auVar46._14_2_;
        auVar446 = auVar446 ^ auVar46;
        local_108._0_2_ = auVar286._0_2_;
        local_108._2_2_ = auVar286._2_2_;
        local_108._4_2_ = auVar286._4_2_;
        local_108._6_2_ = auVar286._6_2_;
        local_108._8_2_ = auVar286._8_2_;
        local_108._10_2_ = auVar286._10_2_;
        local_108._12_2_ = auVar286._12_2_;
        local_108._14_2_ = auVar286._14_2_;
        auVar46 = psraw(auVar377,0xf);
        auVar451._0_2_ =
             (((short)uVar383 < sVar100) * uVar383 | (ushort)((short)uVar383 >= sVar100) * sVar100)
             + auVar46._0_2_;
        auVar451._2_2_ =
             (((short)uVar391 < sVar101) * uVar391 | (ushort)((short)uVar391 >= sVar101) * sVar101)
             + auVar46._2_2_;
        auVar451._4_2_ =
             (((short)uVar394 < sVar102) * uVar394 | (ushort)((short)uVar394 >= sVar102) * sVar102)
             + auVar46._4_2_;
        auVar451._6_2_ =
             (((short)uVar397 < sVar103) * uVar397 | (ushort)((short)uVar397 >= sVar103) * sVar103)
             + auVar46._6_2_;
        auVar451._8_2_ =
             (((short)uVar400 < sVar104) * uVar400 | (ushort)((short)uVar400 >= sVar104) * sVar104)
             + auVar46._8_2_;
        auVar451._10_2_ =
             (((short)uVar404 < sVar105) * uVar404 | (ushort)((short)uVar404 >= sVar105) * sVar105)
             + auVar46._10_2_;
        auVar451._12_2_ =
             (((short)uVar408 < sVar106) * uVar408 | (ushort)((short)uVar408 >= sVar106) * sVar106)
             + auVar46._12_2_;
        auVar451._14_2_ =
             (((short)uVar412 < sVar107) * uVar412 | (ushort)((short)uVar412 >= sVar107) * sVar107)
             + auVar46._14_2_;
        auVar451 = auVar451 ^ auVar46;
        local_58 = auVar109._0_2_;
        sStack_56 = auVar109._2_2_;
        sStack_54 = auVar109._4_2_;
        sStack_52 = auVar109._6_2_;
        sStack_50 = auVar109._8_2_;
        sStack_4e = auVar109._10_2_;
        sStack_4c = auVar109._12_2_;
        sStack_4a = auVar109._14_2_;
        local_a8 = auVar34._0_2_;
        sStack_a6 = auVar34._2_2_;
        auVar46._4_2_ = sStack_b4;
        auVar46._0_4_ = auVar35._0_4_;
        auVar46._6_2_ = sStack_b2;
        auVar46._8_2_ = sStack_b4;
        auVar46._10_2_ = sStack_b2;
        auVar46._12_2_ = sStack_b4;
        auVar46._14_2_ = sStack_b2;
        local_148[1] = (bVar263 < bVar294) * bVar294 | (bVar263 >= bVar294) * bVar263;
        local_148[0] = (bVar251 < bVar293) * bVar293 | (bVar251 >= bVar293) * bVar251;
        local_148[2] = (bVar264 < bVar296) * bVar296 | (bVar264 >= bVar296) * bVar264;
        local_148[3] = (bVar265 < bVar297) * bVar297 | (bVar265 >= bVar297) * bVar265;
        local_148[4] = (bVar266 < bVar298) * bVar298 | (bVar266 >= bVar298) * bVar266;
        local_148[5] = (bVar267 < bVar299) * bVar299 | (bVar267 >= bVar299) * bVar267;
        local_148[6] = (bVar268 < bVar301) * bVar301 | (bVar268 >= bVar301) * bVar268;
        local_148[7] = (bVar269 < bVar302) * bVar302 | (bVar269 >= bVar302) * bVar269;
        local_148[8] = (bVar270 < bVar303) * bVar303 | (bVar270 >= bVar303) * bVar270;
        local_148[9] = (bVar271 < bVar304) * bVar304 | (bVar271 >= bVar304) * bVar271;
        local_148[10] = (bVar272 < bVar306) * bVar306 | (bVar272 >= bVar306) * bVar272;
        local_148[0xb] = (bVar273 < bVar307) * bVar307 | (bVar273 >= bVar307) * bVar273;
        local_148[0xc] = (bVar274 < bVar308) * bVar308 | (bVar274 >= bVar308) * bVar274;
        local_148[0xd] = (bVar275 < bVar309) * bVar309 | (bVar275 >= bVar309) * bVar275;
        local_148[0xe] = (bVar276 < bVar311) * bVar311 | (bVar276 >= bVar311) * bVar276;
        local_148[0xf] = (bVar277 < bVar312) * bVar312 | (bVar277 >= bVar312) * bVar277;
        local_198[1] = (bVar166 < bVar123) * bVar123 | (bVar166 >= bVar123) * bVar166;
        local_198[0] = (bVar165 < bVar122) * bVar122 | (bVar165 >= bVar122) * bVar165;
        local_198[2] = (bVar170 < bVar142) * bVar142 | (bVar170 >= bVar142) * bVar170;
        local_198[3] = (bVar171 < bVar143) * bVar143 | (bVar171 >= bVar143) * bVar171;
        local_198[4] = (bVar172 < bVar144) * bVar144 | (bVar172 >= bVar144) * bVar172;
        local_198[5] = (bVar173 < bVar145) * bVar145 | (bVar173 >= bVar145) * bVar173;
        local_198[6] = (bVar177 < bVar149) * bVar149 | (bVar177 >= bVar149) * bVar177;
        local_198[7] = (bVar178 < bVar150) * bVar150 | (bVar178 >= bVar150) * bVar178;
        local_198[8] = (bVar179 < bVar151) * bVar151 | (bVar179 >= bVar151) * bVar179;
        local_198[9] = (bVar180 < bVar152) * bVar152 | (bVar180 >= bVar152) * bVar180;
        local_198[10] = (bVar184 < bVar156) * bVar156 | (bVar184 >= bVar156) * bVar184;
        local_198[0xb] = (bVar185 < bVar157) * bVar157 | (bVar185 >= bVar157) * bVar185;
        local_198[0xc] = (bVar186 < bVar158) * bVar158 | (bVar186 >= bVar158) * bVar186;
        local_198[0xd] = (bVar187 < bVar159) * bVar159 | (bVar187 >= bVar159) * bVar187;
        local_198[0xe] = (bVar191 < bVar163) * bVar163 | (bVar191 >= bVar163) * bVar191;
        local_198[0xf] = (bVar192 < bVar164) * bVar164 | (bVar192 >= bVar164) * bVar192;
        auVar127._0_2_ =
             ((short)uVar32 < (short)uVar73) * uVar32 | ((short)uVar32 >= (short)uVar73) * uVar73;
        auVar127._2_2_ =
             ((short)uVar47 < (short)uVar71) * uVar47 | ((short)uVar47 >= (short)uVar71) * uVar71;
        auVar127._4_2_ =
             ((short)uVar50 < (short)uVar72) * uVar50 | ((short)uVar50 >= (short)uVar72) * uVar72;
        auVar127._6_2_ =
             ((short)uVar53 < (short)uVar124) * uVar53 | ((short)uVar53 >= (short)uVar124) * uVar124
        ;
        auVar127._8_2_ =
             ((short)uVar448 < (short)uVar153) * uVar448 |
             ((short)uVar448 >= (short)uVar153) * uVar153;
        auVar127._10_2_ =
             ((short)uVar56 < (short)uVar167) * uVar56 | ((short)uVar56 >= (short)uVar167) * uVar167
        ;
        auVar127._12_2_ =
             ((short)uVar60 < (short)uVar182) * uVar60 | ((short)uVar60 >= (short)uVar182) * uVar182
        ;
        auVar127._14_2_ =
             ((short)uVar65 < (short)uVar248) * uVar65 | ((short)uVar65 >= (short)uVar248) * uVar248
        ;
        uVar73 = ((short)uVar66 < (short)uVar57) * uVar66 |
                 ((short)uVar66 >= (short)uVar57) * uVar57;
        uVar71 = ((short)uVar67 < (short)uVar58) * uVar67 |
                 ((short)uVar67 >= (short)uVar58) * uVar58;
        uVar72 = ((short)uVar69 < (short)uVar59) * uVar69 |
                 ((short)uVar69 >= (short)uVar59) * uVar59;
        uVar74 = ((short)uVar74 < (short)uVar63) * uVar74 |
                 ((short)uVar74 >= (short)uVar63) * uVar63;
        uVar124 = ((short)uVar247 < (short)uVar61) * uVar247 |
                  ((short)uVar247 >= (short)uVar61) * uVar61;
        uVar153 = ((short)uVar146 < (short)uVar62) * uVar146 |
                  ((short)uVar146 >= (short)uVar62) * uVar62;
        uVar167 = ((short)uVar160 < (short)uVar64) * uVar160 |
                  ((short)uVar160 >= (short)uVar64) * uVar64;
        uVar182 = ((short)uVar174 < (short)uVar68) * uVar174 |
                  ((short)uVar174 >= (short)uVar68) * uVar68;
        auVar287._0_2_ = sVar75 - sVar341;
        auVar287._2_2_ = sVar76 - sVar355;
        auVar287._4_2_ = sVar94 - sVar357;
        auVar287._6_2_ = sVar95 - sVar359;
        auVar287._8_2_ = sVar96 - sVar362;
        auVar287._10_2_ = sVar97 - sVar365;
        auVar287._12_2_ = sVar98 - sVar368;
        auVar287._14_2_ = sVar99 - sVar371;
        auVar88._0_2_ = sVar215 - sVar415;
        auVar88._2_2_ = sVar236 - sVar340;
        auVar88._4_2_ = sVar238 - sVar423;
        auVar88._6_2_ = sVar240 - sVar354;
        auVar88._8_2_ = sVar242 - sVar424;
        auVar88._10_2_ = sVar244 - sVar356;
        auVar88._12_2_ = sVar246 - sVar425;
        auVar88._14_2_ = sVar249 - sVar358;
        auVar85 = pabsw(auVar127,auVar287);
        local_1c8 = (ulong)uVar29;
        uVar32 = auVar85._0_2_;
        auVar117._0_2_ = uVar32 >> local_1c8;
        uVar47 = auVar85._2_2_;
        auVar117._2_2_ = uVar47 >> local_1c8;
        uVar50 = auVar85._4_2_;
        auVar117._4_2_ = uVar50 >> local_1c8;
        uVar53 = auVar85._6_2_;
        auVar117._6_2_ = uVar53 >> local_1c8;
        uVar448 = auVar85._8_2_;
        auVar117._8_2_ = uVar448 >> local_1c8;
        uVar56 = auVar85._10_2_;
        auVar117._10_2_ = uVar56 >> local_1c8;
        uVar60 = auVar85._12_2_;
        uVar65 = auVar85._14_2_;
        auVar117._12_2_ = uVar60 >> local_1c8;
        auVar117._14_2_ = uVar65 >> local_1c8;
        auVar46 = pabsw(auVar46,auVar88);
        uVar453 = auVar46._0_2_;
        auVar258._0_2_ = uVar453 >> local_1c8;
        uVar70 = auVar46._2_2_;
        auVar258._2_2_ = uVar70 >> local_1c8;
        uVar455 = auVar46._4_2_;
        auVar258._4_2_ = uVar455 >> local_1c8;
        uVar457 = auVar46._6_2_;
        auVar258._6_2_ = uVar457 >> local_1c8;
        uVar459 = auVar46._8_2_;
        auVar258._8_2_ = uVar459 >> local_1c8;
        uVar461 = auVar46._10_2_;
        auVar258._10_2_ = uVar461 >> local_1c8;
        uVar463 = auVar46._12_2_;
        uVar465 = auVar46._14_2_;
        auVar258._12_2_ = uVar463 >> local_1c8;
        auVar258._14_2_ = uVar465 >> local_1c8;
        auVar85 = psubusw(local_e8,auVar117);
        auVar46 = psubusw(local_e8,auVar258);
        sVar215 = auVar85._0_2_;
        sVar236 = auVar85._2_2_;
        sVar238 = auVar85._4_2_;
        sVar240 = auVar85._6_2_;
        sVar242 = auVar85._8_2_;
        sVar244 = auVar85._10_2_;
        sVar246 = auVar85._12_2_;
        sVar249 = auVar85._14_2_;
        sVar31 = auVar46._0_2_;
        sVar33 = auVar46._2_2_;
        sVar48 = auVar46._4_2_;
        sVar49 = auVar46._6_2_;
        sVar51 = auVar46._8_2_;
        sVar52 = auVar46._10_2_;
        sVar54 = auVar46._12_2_;
        sVar55 = auVar46._14_2_;
        auVar85 = psraw(auVar287,0xf);
        auVar46 = psraw(auVar88,0xf);
        auVar137._0_2_ =
             (((short)uVar32 < sVar215) * uVar32 | (ushort)((short)uVar32 >= sVar215) * sVar215) +
             auVar85._0_2_;
        auVar137._2_2_ =
             (((short)uVar47 < sVar236) * uVar47 | (ushort)((short)uVar47 >= sVar236) * sVar236) +
             auVar85._2_2_;
        auVar137._4_2_ =
             (((short)uVar50 < sVar238) * uVar50 | (ushort)((short)uVar50 >= sVar238) * sVar238) +
             auVar85._4_2_;
        auVar137._6_2_ =
             (((short)uVar53 < sVar240) * uVar53 | (ushort)((short)uVar53 >= sVar240) * sVar240) +
             auVar85._6_2_;
        auVar137._8_2_ =
             (((short)uVar448 < sVar242) * uVar448 | (ushort)((short)uVar448 >= sVar242) * sVar242)
             + auVar85._8_2_;
        auVar137._10_2_ =
             (((short)uVar56 < sVar244) * uVar56 | (ushort)((short)uVar56 >= sVar244) * sVar244) +
             auVar85._10_2_;
        auVar137._12_2_ =
             (((short)uVar60 < sVar246) * uVar60 | (ushort)((short)uVar60 >= sVar246) * sVar246) +
             auVar85._12_2_;
        auVar137._14_2_ =
             (((short)uVar65 < sVar249) * uVar65 | (ushort)((short)uVar65 >= sVar249) * sVar249) +
             auVar85._14_2_;
        auVar118._0_2_ =
             (((short)uVar453 < sVar31) * uVar453 | (ushort)((short)uVar453 >= sVar31) * sVar31) +
             auVar46._0_2_;
        auVar118._2_2_ =
             (((short)uVar70 < sVar33) * uVar70 | (ushort)((short)uVar70 >= sVar33) * sVar33) +
             auVar46._2_2_;
        auVar118._4_2_ =
             (((short)uVar455 < sVar48) * uVar455 | (ushort)((short)uVar455 >= sVar48) * sVar48) +
             auVar46._4_2_;
        auVar118._6_2_ =
             (((short)uVar457 < sVar49) * uVar457 | (ushort)((short)uVar457 >= sVar49) * sVar49) +
             auVar46._6_2_;
        auVar118._8_2_ =
             (((short)uVar459 < sVar51) * uVar459 | (ushort)((short)uVar459 >= sVar51) * sVar51) +
             auVar46._8_2_;
        auVar118._10_2_ =
             (((short)uVar461 < sVar52) * uVar461 | (ushort)((short)uVar461 >= sVar52) * sVar52) +
             auVar46._10_2_;
        auVar118._12_2_ =
             (((short)uVar463 < sVar54) * uVar463 | (ushort)((short)uVar463 >= sVar54) * sVar54) +
             auVar46._12_2_;
        auVar118._14_2_ =
             (((short)uVar465 < sVar55) * uVar465 | (ushort)((short)uVar465 >= sVar55) * sVar55) +
             auVar46._14_2_;
        auVar137 = auVar137 ^ auVar85;
        auVar118 = auVar118 ^ auVar46;
        uVar4 = *(undefined8 *)(in + -lVar25);
        uVar5 = *(undefined8 *)(in + (0x90 - lVar25));
        local_1a8[0] = (byte)uVar17;
        local_1a8[1] = (byte)((ulong)uVar17 >> 8);
        local_1a8[2] = (byte)((ulong)uVar17 >> 0x10);
        local_1a8[3] = (byte)((ulong)uVar17 >> 0x18);
        local_1a8[4] = (byte)((ulong)uVar17 >> 0x20);
        local_1a8[5] = (byte)((ulong)uVar17 >> 0x28);
        local_1a8[6] = (byte)((ulong)uVar17 >> 0x30);
        local_1a8[7] = (byte)((ulong)uVar17 >> 0x38);
        local_1a8[8] = (byte)uVar16;
        local_1a8[9] = (byte)((ulong)uVar16 >> 8);
        local_1a8[10] = (byte)((ulong)uVar16 >> 0x10);
        local_1a8[0xb] = (byte)((ulong)uVar16 >> 0x18);
        local_1a8[0xc] = (byte)((ulong)uVar16 >> 0x20);
        local_1a8[0xd] = (byte)((ulong)uVar16 >> 0x28);
        local_1a8[0xe] = (byte)((ulong)uVar16 >> 0x30);
        local_1a8[0xf] = (byte)((ulong)uVar16 >> 0x38);
        bVar192 = (byte)uVar5;
        bVar122 = (local_1a8[0] < bVar192) * bVar192 | (local_1a8[0] >= bVar192) * local_1a8[0];
        bVar192 = (byte)((ulong)uVar5 >> 8);
        bVar142 = (local_1a8[1] < bVar192) * bVar192 | (local_1a8[1] >= bVar192) * local_1a8[1];
        bVar192 = (byte)((ulong)uVar5 >> 0x10);
        bVar144 = (local_1a8[2] < bVar192) * bVar192 | (local_1a8[2] >= bVar192) * local_1a8[2];
        bVar192 = (byte)((ulong)uVar5 >> 0x18);
        bVar149 = (local_1a8[3] < bVar192) * bVar192 | (local_1a8[3] >= bVar192) * local_1a8[3];
        bVar192 = (byte)((ulong)uVar5 >> 0x20);
        bVar151 = (local_1a8[4] < bVar192) * bVar192 | (local_1a8[4] >= bVar192) * local_1a8[4];
        bVar192 = (byte)((ulong)uVar5 >> 0x28);
        bVar156 = (local_1a8[5] < bVar192) * bVar192 | (local_1a8[5] >= bVar192) * local_1a8[5];
        bVar192 = (byte)((ulong)uVar5 >> 0x30);
        bVar158 = (local_1a8[6] < bVar192) * bVar192 | (local_1a8[6] >= bVar192) * local_1a8[6];
        bVar192 = (byte)((ulong)uVar5 >> 0x38);
        bVar163 = (local_1a8[7] < bVar192) * bVar192 | (local_1a8[7] >= bVar192) * local_1a8[7];
        bVar192 = (byte)uVar4;
        bVar165 = (local_1a8[8] < bVar192) * bVar192 | (local_1a8[8] >= bVar192) * local_1a8[8];
        bVar192 = (byte)((ulong)uVar4 >> 8);
        bVar170 = (local_1a8[9] < bVar192) * bVar192 | (local_1a8[9] >= bVar192) * local_1a8[9];
        bVar192 = (byte)((ulong)uVar4 >> 0x10);
        bVar172 = (local_1a8[10] < bVar192) * bVar192 | (local_1a8[10] >= bVar192) * local_1a8[10];
        bVar192 = (byte)((ulong)uVar4 >> 0x18);
        bVar177 = (local_1a8[0xb] < bVar192) * bVar192 |
                  (local_1a8[0xb] >= bVar192) * local_1a8[0xb];
        bVar192 = (byte)((ulong)uVar4 >> 0x20);
        bVar179 = (local_1a8[0xc] < bVar192) * bVar192 |
                  (local_1a8[0xc] >= bVar192) * local_1a8[0xc];
        bVar192 = (byte)((ulong)uVar4 >> 0x28);
        bVar184 = (local_1a8[0xd] < bVar192) * bVar192 |
                  (local_1a8[0xd] >= bVar192) * local_1a8[0xd];
        bVar192 = (byte)((ulong)uVar4 >> 0x30);
        bVar186 = (local_1a8[0xe] < bVar192) * bVar192 |
                  (local_1a8[0xe] >= bVar192) * local_1a8[0xe];
        bVar192 = (byte)((ulong)uVar4 >> 0x38);
        bVar191 = (local_1a8[0xf] < bVar192) * bVar192 |
                  (local_1a8[0xf] >= bVar192) * local_1a8[0xf];
        sVar31 = (short)uVar5;
        uVar248 = (ushort)(sVar31 < (short)uVar401) * sVar31 | (sVar31 >= (short)uVar401) * uVar401;
        sVar33 = (short)((ulong)uVar5 >> 0x10);
        uVar383 = (ushort)(sVar33 < (short)uVar405) * sVar33 | (sVar33 >= (short)uVar405) * uVar405;
        sVar48 = (short)((ulong)uVar5 >> 0x20);
        uVar391 = (ushort)(sVar48 < (short)uVar409) * sVar48 | (sVar48 >= (short)uVar409) * uVar409;
        sVar49 = (short)((ulong)uVar5 >> 0x30);
        uVar394 = (ushort)(sVar49 < (short)uVar413) * sVar49 | (sVar49 >= (short)uVar413) * uVar413;
        sVar51 = (short)uVar4;
        uVar397 = (ushort)(sVar51 < (short)uVar449) * sVar51 | (sVar51 >= (short)uVar449) * uVar449;
        sVar52 = (short)((ulong)uVar4 >> 0x10);
        uVar400 = (ushort)(sVar52 < (short)uVar454) * sVar52 | (sVar52 >= (short)uVar454) * uVar454;
        sVar54 = (short)((ulong)uVar4 >> 0x20);
        uVar404 = (ushort)(sVar54 < (short)uVar456) * sVar54 | (sVar54 >= (short)uVar456) * uVar456;
        sVar55 = (short)((ulong)uVar4 >> 0x30);
        uVar408 = (ushort)(sVar55 < (short)uVar458) * sVar55 | (sVar55 >= (short)uVar458) * uVar458;
        auVar203._0_2_ = sVar31 - sVar341;
        auVar203._2_2_ = sVar33 - sVar355;
        auVar203._4_2_ = sVar48 - sVar357;
        auVar203._6_2_ = sVar49 - sVar359;
        auVar203._8_2_ = sVar51 - sVar362;
        auVar203._10_2_ = sVar52 - sVar365;
        auVar203._12_2_ = sVar54 - sVar368;
        auVar203._14_2_ = sVar55 - sVar371;
        auVar46 = pabsw(auVar258,auVar203);
        uVar32 = auVar46._0_2_;
        auVar89._0_2_ = uVar32 >> local_1c8;
        uVar47 = auVar46._2_2_;
        auVar89._2_2_ = uVar47 >> local_1c8;
        uVar50 = auVar46._4_2_;
        auVar89._4_2_ = uVar50 >> local_1c8;
        uVar53 = auVar46._6_2_;
        auVar89._6_2_ = uVar53 >> local_1c8;
        uVar448 = auVar46._8_2_;
        auVar89._8_2_ = uVar448 >> local_1c8;
        uVar56 = auVar46._10_2_;
        auVar89._10_2_ = uVar56 >> local_1c8;
        uVar60 = auVar46._12_2_;
        uVar65 = auVar46._14_2_;
        auVar89._12_2_ = uVar60 >> local_1c8;
        auVar89._14_2_ = uVar65 >> local_1c8;
        uVar4 = *(undefined8 *)(in + (0x120 - lVar25));
        uVar5 = *(undefined8 *)(in + (0x1b0 - lVar25));
        auVar85 = psubusw(local_e8,auVar89);
        local_1f8 = (byte)uVar3;
        bStack_1f7 = (byte)((ulong)uVar3 >> 8);
        bStack_1f6 = (byte)((ulong)uVar3 >> 0x10);
        bStack_1f5 = (byte)((ulong)uVar3 >> 0x18);
        bStack_1f4 = (byte)((ulong)uVar3 >> 0x20);
        bStack_1f3 = (byte)((ulong)uVar3 >> 0x28);
        bStack_1f2 = (byte)((ulong)uVar3 >> 0x30);
        bStack_1f1 = (byte)((ulong)uVar3 >> 0x38);
        bStack_1f0 = (byte)uVar2;
        bStack_1ef = (byte)((ulong)uVar2 >> 8);
        bStack_1ee = (byte)((ulong)uVar2 >> 0x10);
        bStack_1ed = (byte)((ulong)uVar2 >> 0x18);
        bStack_1ec = (byte)((ulong)uVar2 >> 0x20);
        bStack_1eb = (byte)((ulong)uVar2 >> 0x28);
        bStack_1ea = (byte)((ulong)uVar2 >> 0x30);
        bStack_1e9 = (byte)((ulong)uVar2 >> 0x38);
        bVar192 = (byte)uVar5;
        bVar123 = (local_1f8 < bVar192) * bVar192 | (local_1f8 >= bVar192) * local_1f8;
        bVar192 = (byte)((ulong)uVar5 >> 8);
        bVar143 = (bStack_1f7 < bVar192) * bVar192 | (bStack_1f7 >= bVar192) * bStack_1f7;
        bVar192 = (byte)((ulong)uVar5 >> 0x10);
        bVar145 = (bStack_1f6 < bVar192) * bVar192 | (bStack_1f6 >= bVar192) * bStack_1f6;
        bVar192 = (byte)((ulong)uVar5 >> 0x18);
        bVar150 = (bStack_1f5 < bVar192) * bVar192 | (bStack_1f5 >= bVar192) * bStack_1f5;
        bVar192 = (byte)((ulong)uVar5 >> 0x20);
        bVar152 = (bStack_1f4 < bVar192) * bVar192 | (bStack_1f4 >= bVar192) * bStack_1f4;
        bVar192 = (byte)((ulong)uVar5 >> 0x28);
        bVar157 = (bStack_1f3 < bVar192) * bVar192 | (bStack_1f3 >= bVar192) * bStack_1f3;
        bVar192 = (byte)((ulong)uVar5 >> 0x30);
        bVar159 = (bStack_1f2 < bVar192) * bVar192 | (bStack_1f2 >= bVar192) * bStack_1f2;
        bVar192 = (byte)((ulong)uVar5 >> 0x38);
        bVar164 = (bStack_1f1 < bVar192) * bVar192 | (bStack_1f1 >= bVar192) * bStack_1f1;
        bVar192 = (byte)uVar4;
        bVar166 = (bStack_1f0 < bVar192) * bVar192 | (bStack_1f0 >= bVar192) * bStack_1f0;
        bVar192 = (byte)((ulong)uVar4 >> 8);
        bVar171 = (bStack_1ef < bVar192) * bVar192 | (bStack_1ef >= bVar192) * bStack_1ef;
        bVar192 = (byte)((ulong)uVar4 >> 0x10);
        bVar173 = (bStack_1ee < bVar192) * bVar192 | (bStack_1ee >= bVar192) * bStack_1ee;
        bVar192 = (byte)((ulong)uVar4 >> 0x18);
        bVar178 = (bStack_1ed < bVar192) * bVar192 | (bStack_1ed >= bVar192) * bStack_1ed;
        bVar192 = (byte)((ulong)uVar4 >> 0x20);
        bVar180 = (bStack_1ec < bVar192) * bVar192 | (bStack_1ec >= bVar192) * bStack_1ec;
        bVar192 = (byte)((ulong)uVar4 >> 0x28);
        bVar185 = (bStack_1eb < bVar192) * bVar192 | (bStack_1eb >= bVar192) * bStack_1eb;
        bVar192 = (byte)((ulong)uVar4 >> 0x30);
        bVar187 = (bStack_1ea < bVar192) * bVar192 | (bStack_1ea >= bVar192) * bStack_1ea;
        bVar192 = (byte)((ulong)uVar4 >> 0x38);
        bVar250 = (bStack_1e9 < bVar192) * bVar192 | (bStack_1e9 >= bVar192) * bStack_1e9;
        sVar31 = (short)uVar5;
        auVar322._0_2_ =
             (ushort)(sVar31 < (short)uVar190) * sVar31 | (sVar31 >= (short)uVar190) * uVar190;
        sVar33 = (short)((ulong)uVar5 >> 0x10);
        auVar322._2_2_ =
             (ushort)(sVar33 < (short)uVar214) * sVar33 | (sVar33 >= (short)uVar214) * uVar214;
        sVar48 = (short)((ulong)uVar5 >> 0x20);
        auVar322._4_2_ =
             (ushort)(sVar48 < (short)uVar235) * sVar48 | (sVar48 >= (short)uVar235) * uVar235;
        sVar49 = (short)((ulong)uVar5 >> 0x30);
        auVar322._6_2_ =
             (ushort)(sVar49 < (short)uVar237) * sVar49 | (sVar49 >= (short)uVar237) * uVar237;
        sVar51 = (short)uVar4;
        auVar322._8_2_ =
             (ushort)(sVar51 < (short)uVar239) * sVar51 | (sVar51 >= (short)uVar239) * uVar239;
        sVar52 = (short)((ulong)uVar4 >> 0x10);
        auVar322._10_2_ =
             (ushort)(sVar52 < (short)uVar241) * sVar52 | (sVar52 >= (short)uVar241) * uVar241;
        sVar54 = (short)((ulong)uVar4 >> 0x20);
        auVar322._12_2_ =
             (ushort)(sVar54 < (short)uVar243) * sVar54 | (sVar54 >= (short)uVar243) * uVar243;
        sVar55 = (short)((ulong)uVar4 >> 0x30);
        auVar322._14_2_ =
             (ushort)(sVar55 < (short)uVar245) * sVar55 | (sVar55 >= (short)uVar245) * uVar245;
        auVar288._0_2_ = sVar31 - sVar415;
        auVar288._2_2_ = sVar33 - sVar340;
        auVar288._4_2_ = sVar48 - sVar423;
        auVar288._6_2_ = sVar49 - sVar354;
        auVar288._8_2_ = sVar51 - sVar424;
        auVar288._10_2_ = sVar52 - sVar356;
        auVar288._12_2_ = sVar54 - sVar425;
        auVar288._14_2_ = sVar55 - sVar358;
        auVar46 = pabsw(auVar322,auVar288);
        uVar453 = auVar46._0_2_;
        auVar348._0_2_ = uVar453 >> local_1c8;
        uVar70 = auVar46._2_2_;
        auVar348._2_2_ = uVar70 >> local_1c8;
        uVar455 = auVar46._4_2_;
        auVar348._4_2_ = uVar455 >> local_1c8;
        uVar457 = auVar46._6_2_;
        auVar348._6_2_ = uVar457 >> local_1c8;
        uVar459 = auVar46._8_2_;
        auVar348._8_2_ = uVar459 >> local_1c8;
        uVar461 = auVar46._10_2_;
        auVar348._10_2_ = uVar461 >> local_1c8;
        uVar463 = auVar46._12_2_;
        uVar465 = auVar46._14_2_;
        auVar348._12_2_ = uVar463 >> local_1c8;
        auVar348._14_2_ = uVar465 >> local_1c8;
        auVar46 = psubusw(local_e8,auVar348);
        sVar215 = auVar85._0_2_;
        sVar236 = auVar85._2_2_;
        sVar238 = auVar85._4_2_;
        sVar240 = auVar85._6_2_;
        sVar242 = auVar85._8_2_;
        sVar244 = auVar85._10_2_;
        sVar246 = auVar85._12_2_;
        sVar249 = auVar85._14_2_;
        sVar31 = auVar46._0_2_;
        sVar33 = auVar46._2_2_;
        sVar48 = auVar46._4_2_;
        sVar49 = auVar46._6_2_;
        sVar51 = auVar46._8_2_;
        sVar52 = auVar46._10_2_;
        sVar54 = auVar46._12_2_;
        sVar55 = auVar46._14_2_;
        auVar46 = psraw(auVar203,0xf);
        auVar386._0_2_ =
             (((short)uVar32 < sVar215) * uVar32 | (ushort)((short)uVar32 >= sVar215) * sVar215) +
             auVar46._0_2_;
        auVar386._2_2_ =
             (((short)uVar47 < sVar236) * uVar47 | (ushort)((short)uVar47 >= sVar236) * sVar236) +
             auVar46._2_2_;
        auVar386._4_2_ =
             (((short)uVar50 < sVar238) * uVar50 | (ushort)((short)uVar50 >= sVar238) * sVar238) +
             auVar46._4_2_;
        auVar386._6_2_ =
             (((short)uVar53 < sVar240) * uVar53 | (ushort)((short)uVar53 >= sVar240) * sVar240) +
             auVar46._6_2_;
        auVar386._8_2_ =
             (((short)uVar448 < sVar242) * uVar448 | (ushort)((short)uVar448 >= sVar242) * sVar242)
             + auVar46._8_2_;
        auVar386._10_2_ =
             (((short)uVar56 < sVar244) * uVar56 | (ushort)((short)uVar56 >= sVar244) * sVar244) +
             auVar46._10_2_;
        auVar386._12_2_ =
             (((short)uVar60 < sVar246) * uVar60 | (ushort)((short)uVar60 >= sVar246) * sVar246) +
             auVar46._12_2_;
        auVar386._14_2_ =
             (((short)uVar65 < sVar249) * uVar65 | (ushort)((short)uVar65 >= sVar249) * sVar249) +
             auVar46._14_2_;
        auVar386 = auVar386 ^ auVar46;
        auVar46 = psraw(auVar288,0xf);
        auVar378._0_2_ =
             (((short)uVar453 < sVar31) * uVar453 | (ushort)((short)uVar453 >= sVar31) * sVar31) +
             auVar46._0_2_;
        auVar378._2_2_ =
             (((short)uVar70 < sVar33) * uVar70 | (ushort)((short)uVar70 >= sVar33) * sVar33) +
             auVar46._2_2_;
        auVar378._4_2_ =
             (((short)uVar455 < sVar48) * uVar455 | (ushort)((short)uVar455 >= sVar48) * sVar48) +
             auVar46._4_2_;
        auVar378._6_2_ =
             (((short)uVar457 < sVar49) * uVar457 | (ushort)((short)uVar457 >= sVar49) * sVar49) +
             auVar46._6_2_;
        auVar378._8_2_ =
             (((short)uVar459 < sVar51) * uVar459 | (ushort)((short)uVar459 >= sVar51) * sVar51) +
             auVar46._8_2_;
        auVar378._10_2_ =
             (((short)uVar461 < sVar52) * uVar461 | (ushort)((short)uVar461 >= sVar52) * sVar52) +
             auVar46._10_2_;
        auVar378._12_2_ =
             (((short)uVar463 < sVar54) * uVar463 | (ushort)((short)uVar463 >= sVar54) * sVar54) +
             auVar46._12_2_;
        auVar378._14_2_ =
             (((short)uVar465 < sVar55) * uVar465 | (ushort)((short)uVar465 >= sVar55) * sVar55) +
             auVar46._14_2_;
        auVar378 = auVar378 ^ auVar46;
        uVar2 = *(undefined8 *)(in + lVar22);
        uVar3 = *(undefined8 *)(in + lVar22 + 0x90);
        uVar4 = *(undefined8 *)(in + lVar22 + 0x120);
        uVar5 = *(undefined8 *)(in + lVar22 + 0x1b0);
        uVar6 = *(undefined8 *)(in + -lVar22);
        uVar7 = *(undefined8 *)(in + (0x90 - lVar22));
        uVar8 = *(undefined8 *)(in + (0x120 - lVar22));
        uVar9 = *(undefined8 *)(in + (0x1b0 - lVar22));
        bVar192 = (byte)uVar7;
        bVar251 = (byte)uVar3;
        bVar251 = (bVar251 < bVar192) * bVar192 | (bVar251 >= bVar192) * bVar251;
        bVar192 = (byte)((ulong)uVar7 >> 8);
        bVar263 = (byte)((ulong)uVar3 >> 8);
        bVar263 = (bVar263 < bVar192) * bVar192 | (bVar263 >= bVar192) * bVar263;
        bVar192 = (byte)((ulong)uVar7 >> 0x10);
        bVar264 = (byte)((ulong)uVar3 >> 0x10);
        bVar264 = (bVar264 < bVar192) * bVar192 | (bVar264 >= bVar192) * bVar264;
        bVar192 = (byte)((ulong)uVar7 >> 0x18);
        bVar265 = (byte)((ulong)uVar3 >> 0x18);
        bVar265 = (bVar265 < bVar192) * bVar192 | (bVar265 >= bVar192) * bVar265;
        bVar192 = (byte)((ulong)uVar7 >> 0x20);
        bVar266 = (byte)((ulong)uVar3 >> 0x20);
        bVar266 = (bVar266 < bVar192) * bVar192 | (bVar266 >= bVar192) * bVar266;
        bVar192 = (byte)((ulong)uVar7 >> 0x28);
        bVar267 = (byte)((ulong)uVar3 >> 0x28);
        bVar267 = (bVar267 < bVar192) * bVar192 | (bVar267 >= bVar192) * bVar267;
        bVar192 = (byte)((ulong)uVar7 >> 0x30);
        bVar268 = (byte)((ulong)uVar3 >> 0x30);
        bVar268 = (bVar268 < bVar192) * bVar192 | (bVar268 >= bVar192) * bVar268;
        bVar192 = (byte)((ulong)uVar7 >> 0x38);
        bVar269 = (byte)((ulong)uVar3 >> 0x38);
        bVar269 = (bVar269 < bVar192) * bVar192 | (bVar269 >= bVar192) * bVar269;
        bVar192 = (byte)uVar6;
        bVar270 = (byte)uVar2;
        bVar270 = (bVar270 < bVar192) * bVar192 | (bVar270 >= bVar192) * bVar270;
        bVar192 = (byte)((ulong)uVar6 >> 8);
        bVar271 = (byte)((ulong)uVar2 >> 8);
        bVar271 = (bVar271 < bVar192) * bVar192 | (bVar271 >= bVar192) * bVar271;
        bVar192 = (byte)((ulong)uVar6 >> 0x10);
        bVar272 = (byte)((ulong)uVar2 >> 0x10);
        bVar272 = (bVar272 < bVar192) * bVar192 | (bVar272 >= bVar192) * bVar272;
        bVar192 = (byte)((ulong)uVar6 >> 0x18);
        bVar273 = (byte)((ulong)uVar2 >> 0x18);
        bVar273 = (bVar273 < bVar192) * bVar192 | (bVar273 >= bVar192) * bVar273;
        bVar192 = (byte)((ulong)uVar6 >> 0x20);
        bVar274 = (byte)((ulong)uVar2 >> 0x20);
        bVar274 = (bVar274 < bVar192) * bVar192 | (bVar274 >= bVar192) * bVar274;
        bVar192 = (byte)((ulong)uVar6 >> 0x28);
        bVar275 = (byte)((ulong)uVar2 >> 0x28);
        bVar275 = (bVar275 < bVar192) * bVar192 | (bVar275 >= bVar192) * bVar275;
        bVar192 = (byte)((ulong)uVar6 >> 0x30);
        bVar276 = (byte)((ulong)uVar2 >> 0x30);
        bVar277 = (byte)((ulong)uVar2 >> 0x38);
        bVar276 = (bVar276 < bVar192) * bVar192 | (bVar276 >= bVar192) * bVar276;
        bVar192 = (byte)((ulong)uVar6 >> 0x38);
        bVar277 = (bVar277 < bVar192) * bVar192 | (bVar277 >= bVar192) * bVar277;
        sVar31 = (short)uVar3;
        sVar215 = (short)uVar7;
        uVar32 = (ushort)(sVar31 < sVar215) * sVar31 | (ushort)(sVar31 >= sVar215) * sVar215;
        sVar33 = (short)((ulong)uVar3 >> 0x10);
        sVar236 = (short)((ulong)uVar7 >> 0x10);
        uVar47 = (ushort)(sVar33 < sVar236) * sVar33 | (ushort)(sVar33 >= sVar236) * sVar236;
        sVar48 = (short)((ulong)uVar3 >> 0x20);
        sVar238 = (short)((ulong)uVar7 >> 0x20);
        uVar50 = (ushort)(sVar48 < sVar238) * sVar48 | (ushort)(sVar48 >= sVar238) * sVar238;
        sVar49 = (short)((ulong)uVar3 >> 0x30);
        sVar240 = (short)((ulong)uVar7 >> 0x30);
        uVar53 = (ushort)(sVar49 < sVar240) * sVar49 | (ushort)(sVar49 >= sVar240) * sVar240;
        sVar51 = (short)uVar2;
        sVar242 = (short)uVar6;
        uVar56 = (ushort)(sVar51 < sVar242) * sVar51 | (ushort)(sVar51 >= sVar242) * sVar242;
        sVar52 = (short)((ulong)uVar2 >> 0x10);
        sVar244 = (short)((ulong)uVar6 >> 0x10);
        uVar60 = (ushort)(sVar52 < sVar244) * sVar52 | (ushort)(sVar52 >= sVar244) * sVar244;
        sVar54 = (short)((ulong)uVar2 >> 0x20);
        sVar246 = (short)((ulong)uVar6 >> 0x20);
        sVar249 = (short)((ulong)uVar6 >> 0x30);
        uVar453 = (ushort)(sVar54 < sVar246) * sVar54 | (ushort)(sVar54 >= sVar246) * sVar246;
        sVar55 = (short)((ulong)uVar2 >> 0x30);
        uVar70 = (ushort)(sVar55 < sVar249) * sVar55 | (ushort)(sVar55 >= sVar249) * sVar249;
        auVar259._0_2_ = sVar31 - sVar341;
        auVar259._2_2_ = sVar33 - sVar355;
        auVar259._4_2_ = sVar48 - sVar357;
        auVar259._6_2_ = sVar49 - sVar359;
        auVar259._8_2_ = sVar51 - sVar362;
        auVar259._10_2_ = sVar52 - sVar365;
        auVar259._12_2_ = sVar54 - sVar368;
        auVar259._14_2_ = sVar55 - sVar371;
        bVar192 = (byte)uVar9;
        bVar293 = (byte)uVar5;
        bVar293 = (bVar293 < bVar192) * bVar192 | (bVar293 >= bVar192) * bVar293;
        bVar192 = (byte)((ulong)uVar9 >> 8);
        bVar294 = (byte)((ulong)uVar5 >> 8);
        bVar294 = (bVar294 < bVar192) * bVar192 | (bVar294 >= bVar192) * bVar294;
        bVar192 = (byte)((ulong)uVar9 >> 0x10);
        bVar296 = (byte)((ulong)uVar5 >> 0x10);
        bVar296 = (bVar296 < bVar192) * bVar192 | (bVar296 >= bVar192) * bVar296;
        bVar192 = (byte)((ulong)uVar9 >> 0x18);
        bVar297 = (byte)((ulong)uVar5 >> 0x18);
        bVar297 = (bVar297 < bVar192) * bVar192 | (bVar297 >= bVar192) * bVar297;
        bVar192 = (byte)((ulong)uVar9 >> 0x20);
        bVar298 = (byte)((ulong)uVar5 >> 0x20);
        bVar298 = (bVar298 < bVar192) * bVar192 | (bVar298 >= bVar192) * bVar298;
        bVar192 = (byte)((ulong)uVar9 >> 0x28);
        bVar299 = (byte)((ulong)uVar5 >> 0x28);
        bVar299 = (bVar299 < bVar192) * bVar192 | (bVar299 >= bVar192) * bVar299;
        bVar192 = (byte)((ulong)uVar9 >> 0x30);
        bVar301 = (byte)((ulong)uVar5 >> 0x30);
        bVar301 = (bVar301 < bVar192) * bVar192 | (bVar301 >= bVar192) * bVar301;
        bVar192 = (byte)((ulong)uVar9 >> 0x38);
        bVar302 = (byte)((ulong)uVar5 >> 0x38);
        bVar302 = (bVar302 < bVar192) * bVar192 | (bVar302 >= bVar192) * bVar302;
        bVar192 = (byte)uVar8;
        bVar303 = (byte)uVar4;
        bVar303 = (bVar303 < bVar192) * bVar192 | (bVar303 >= bVar192) * bVar303;
        bVar192 = (byte)((ulong)uVar8 >> 8);
        bVar304 = (byte)((ulong)uVar4 >> 8);
        bVar304 = (bVar304 < bVar192) * bVar192 | (bVar304 >= bVar192) * bVar304;
        bVar192 = (byte)((ulong)uVar8 >> 0x10);
        bVar306 = (byte)((ulong)uVar4 >> 0x10);
        bVar306 = (bVar306 < bVar192) * bVar192 | (bVar306 >= bVar192) * bVar306;
        bVar192 = (byte)((ulong)uVar8 >> 0x18);
        bVar307 = (byte)((ulong)uVar4 >> 0x18);
        bVar307 = (bVar307 < bVar192) * bVar192 | (bVar307 >= bVar192) * bVar307;
        bVar192 = (byte)((ulong)uVar8 >> 0x20);
        bVar308 = (byte)((ulong)uVar4 >> 0x20);
        bVar308 = (bVar308 < bVar192) * bVar192 | (bVar308 >= bVar192) * bVar308;
        bVar192 = (byte)((ulong)uVar8 >> 0x28);
        bVar309 = (byte)((ulong)uVar4 >> 0x28);
        bVar309 = (bVar309 < bVar192) * bVar192 | (bVar309 >= bVar192) * bVar309;
        bVar192 = (byte)((ulong)uVar8 >> 0x30);
        bVar311 = (byte)((ulong)uVar4 >> 0x30);
        bVar312 = (byte)((ulong)uVar4 >> 0x38);
        bVar311 = (bVar311 < bVar192) * bVar192 | (bVar311 >= bVar192) * bVar311;
        bVar192 = (byte)((ulong)uVar8 >> 0x38);
        bVar312 = (bVar312 < bVar192) * bVar192 | (bVar312 >= bVar192) * bVar312;
        sVar31 = (short)uVar5;
        sVar75 = (short)uVar9;
        uVar457 = (ushort)(sVar31 < sVar75) * sVar31 | (ushort)(sVar31 >= sVar75) * sVar75;
        sVar33 = (short)((ulong)uVar5 >> 0x10);
        sVar94 = (short)((ulong)uVar9 >> 0x10);
        uVar463 = (ushort)(sVar33 < sVar94) * sVar33 | (ushort)(sVar33 >= sVar94) * sVar94;
        sVar48 = (short)((ulong)uVar5 >> 0x20);
        sVar96 = (short)((ulong)uVar9 >> 0x20);
        uVar58 = (ushort)(sVar48 < sVar96) * sVar48 | (ushort)(sVar48 >= sVar96) * sVar96;
        sVar49 = (short)((ulong)uVar5 >> 0x30);
        sVar98 = (short)((ulong)uVar9 >> 0x30);
        uVar61 = (ushort)(sVar49 < sVar98) * sVar49 | (ushort)(sVar49 >= sVar98) * sVar98;
        sVar51 = (short)uVar4;
        sVar100 = (short)uVar8;
        uVar68 = (ushort)(sVar51 < sVar100) * sVar51 | (ushort)(sVar51 >= sVar100) * sVar100;
        sVar52 = (short)((ulong)uVar4 >> 0x10);
        sVar102 = (short)((ulong)uVar8 >> 0x10);
        uVar66 = (ushort)(sVar52 < sVar102) * sVar52 | (ushort)(sVar52 >= sVar102) * sVar102;
        sVar54 = (short)((ulong)uVar4 >> 0x20);
        sVar104 = (short)((ulong)uVar8 >> 0x20);
        sVar106 = (short)((ulong)uVar8 >> 0x30);
        uVar67 = (ushort)(sVar54 < sVar104) * sVar54 | (ushort)(sVar54 >= sVar104) * sVar104;
        sVar55 = (short)((ulong)uVar4 >> 0x30);
        uVar69 = (ushort)(sVar55 < sVar106) * sVar55 | (ushort)(sVar55 >= sVar106) * sVar106;
        auVar204._0_2_ = sVar31 - sVar415;
        auVar204._2_2_ = sVar33 - sVar340;
        auVar204._4_2_ = sVar48 - sVar423;
        auVar204._6_2_ = sVar49 - sVar354;
        auVar204._8_2_ = sVar51 - sVar424;
        auVar204._10_2_ = sVar52 - sVar356;
        auVar204._12_2_ = sVar54 - sVar425;
        auVar204._14_2_ = sVar55 - sVar358;
        auVar85 = pabsw(auVar348,auVar259);
        uVar63 = auVar85._0_2_;
        auVar323._0_2_ = uVar63 >> local_1c8;
        uVar62 = auVar85._2_2_;
        auVar323._2_2_ = uVar62 >> local_1c8;
        uVar64 = auVar85._4_2_;
        auVar323._4_2_ = uVar64 >> local_1c8;
        uVar247 = auVar85._6_2_;
        auVar323._6_2_ = uVar247 >> local_1c8;
        uVar146 = auVar85._8_2_;
        auVar323._8_2_ = uVar146 >> local_1c8;
        uVar160 = auVar85._10_2_;
        auVar323._10_2_ = uVar160 >> local_1c8;
        uVar174 = auVar85._12_2_;
        uVar190 = auVar85._14_2_;
        auVar323._12_2_ = uVar174 >> local_1c8;
        auVar323._14_2_ = uVar190 >> local_1c8;
        auVar46 = pabsw(auVar46,auVar204);
        uVar448 = auVar46._0_2_;
        auVar232._0_2_ = uVar448 >> local_1c8;
        uVar65 = auVar46._2_2_;
        auVar232._2_2_ = uVar65 >> local_1c8;
        uVar455 = auVar46._4_2_;
        auVar232._4_2_ = uVar455 >> local_1c8;
        uVar459 = auVar46._6_2_;
        auVar232._6_2_ = uVar459 >> local_1c8;
        uVar461 = auVar46._8_2_;
        auVar232._8_2_ = uVar461 >> local_1c8;
        uVar465 = auVar46._10_2_;
        auVar232._10_2_ = uVar465 >> local_1c8;
        uVar57 = auVar46._12_2_;
        uVar59 = auVar46._14_2_;
        auVar232._12_2_ = uVar57 >> local_1c8;
        auVar232._14_2_ = uVar59 >> local_1c8;
        auVar46 = psubusw(local_e8,auVar323);
        auVar85 = psubusw(local_e8,auVar232);
        sVar31 = auVar46._0_2_;
        sVar33 = auVar46._2_2_;
        sVar48 = auVar46._4_2_;
        sVar49 = auVar46._6_2_;
        sVar51 = auVar46._8_2_;
        sVar52 = auVar46._10_2_;
        sVar54 = auVar46._12_2_;
        sVar55 = auVar46._14_2_;
        sVar76 = auVar85._0_2_;
        sVar95 = auVar85._2_2_;
        sVar97 = auVar85._4_2_;
        sVar99 = auVar85._6_2_;
        sVar101 = auVar85._8_2_;
        sVar103 = auVar85._10_2_;
        sVar105 = auVar85._12_2_;
        sVar107 = auVar85._14_2_;
        auVar46 = psraw(auVar259,0xf);
        auVar129._0_2_ =
             (((short)uVar63 < sVar31) * uVar63 | (ushort)((short)uVar63 >= sVar31) * sVar31) +
             auVar46._0_2_;
        auVar129._2_2_ =
             (((short)uVar62 < sVar33) * uVar62 | (ushort)((short)uVar62 >= sVar33) * sVar33) +
             auVar46._2_2_;
        auVar129._4_2_ =
             (((short)uVar64 < sVar48) * uVar64 | (ushort)((short)uVar64 >= sVar48) * sVar48) +
             auVar46._4_2_;
        auVar129._6_2_ =
             (((short)uVar247 < sVar49) * uVar247 | (ushort)((short)uVar247 >= sVar49) * sVar49) +
             auVar46._6_2_;
        auVar129._8_2_ =
             (((short)uVar146 < sVar51) * uVar146 | (ushort)((short)uVar146 >= sVar51) * sVar51) +
             auVar46._8_2_;
        auVar129._10_2_ =
             (((short)uVar160 < sVar52) * uVar160 | (ushort)((short)uVar160 >= sVar52) * sVar52) +
             auVar46._10_2_;
        auVar129._12_2_ =
             (((short)uVar174 < sVar54) * uVar174 | (ushort)((short)uVar174 >= sVar54) * sVar54) +
             auVar46._12_2_;
        auVar129._14_2_ =
             (((short)uVar190 < sVar55) * uVar190 | (ushort)((short)uVar190 >= sVar55) * sVar55) +
             auVar46._14_2_;
        auVar129 = auVar129 ^ auVar46;
        auVar46 = psraw(auVar204,0xf);
        auVar90._0_2_ =
             (((short)uVar448 < sVar76) * uVar448 | (ushort)((short)uVar448 >= sVar76) * sVar76) +
             auVar46._0_2_;
        auVar90._2_2_ =
             (((short)uVar65 < sVar95) * uVar65 | (ushort)((short)uVar65 >= sVar95) * sVar95) +
             auVar46._2_2_;
        auVar90._4_2_ =
             (((short)uVar455 < sVar97) * uVar455 | (ushort)((short)uVar455 >= sVar97) * sVar97) +
             auVar46._4_2_;
        auVar90._6_2_ =
             (((short)uVar459 < sVar99) * uVar459 | (ushort)((short)uVar459 >= sVar99) * sVar99) +
             auVar46._6_2_;
        auVar90._8_2_ =
             (((short)uVar461 < sVar101) * uVar461 | (ushort)((short)uVar461 >= sVar101) * sVar101)
             + auVar46._8_2_;
        auVar90._10_2_ =
             (((short)uVar465 < sVar103) * uVar465 | (ushort)((short)uVar465 >= sVar103) * sVar103)
             + auVar46._10_2_;
        auVar90._12_2_ =
             (((short)uVar57 < sVar105) * uVar57 | (ushort)((short)uVar57 >= sVar105) * sVar105) +
             auVar46._12_2_;
        auVar90._14_2_ =
             (((short)uVar59 < sVar107) * uVar59 | (ushort)((short)uVar59 >= sVar107) * sVar107) +
             auVar46._14_2_;
        auVar90 = auVar90 ^ auVar46;
        auVar119._0_2_ = sVar215 - sVar341;
        auVar119._2_2_ = sVar236 - sVar355;
        auVar119._4_2_ = sVar238 - sVar357;
        auVar119._6_2_ = sVar240 - sVar359;
        auVar119._8_2_ = sVar242 - sVar362;
        auVar119._10_2_ = sVar244 - sVar365;
        auVar119._12_2_ = sVar246 - sVar368;
        auVar119._14_2_ = sVar249 - sVar371;
        auVar46 = pabsw(auVar46,auVar119);
        uVar448 = auVar46._0_2_;
        auVar233._0_2_ = uVar448 >> local_1c8;
        uVar65 = auVar46._2_2_;
        auVar233._2_2_ = uVar65 >> local_1c8;
        uVar455 = auVar46._4_2_;
        auVar233._4_2_ = uVar455 >> local_1c8;
        uVar459 = auVar46._6_2_;
        auVar233._6_2_ = uVar459 >> local_1c8;
        uVar461 = auVar46._8_2_;
        auVar233._8_2_ = uVar461 >> local_1c8;
        uVar465 = auVar46._10_2_;
        auVar233._10_2_ = uVar465 >> local_1c8;
        uVar57 = auVar46._12_2_;
        uVar59 = auVar46._14_2_;
        auVar233._12_2_ = uVar57 >> local_1c8;
        auVar233._14_2_ = uVar59 >> local_1c8;
        auVar85 = psubusw(local_e8,auVar233);
        auVar138._0_2_ = sVar75 - sVar415;
        auVar138._2_2_ = sVar94 - sVar340;
        auVar138._4_2_ = sVar96 - sVar423;
        auVar138._6_2_ = sVar98 - sVar354;
        auVar138._8_2_ = sVar100 - sVar424;
        auVar138._10_2_ = sVar102 - sVar356;
        auVar138._12_2_ = sVar104 - sVar425;
        auVar138._14_2_ = sVar106 - sVar358;
        auVar46 = pabsw(auVar233,auVar138);
        uVar63 = auVar46._0_2_;
        auVar260._0_2_ = uVar63 >> local_1c8;
        uVar62 = auVar46._2_2_;
        auVar260._2_2_ = uVar62 >> local_1c8;
        uVar64 = auVar46._4_2_;
        auVar260._4_2_ = uVar64 >> local_1c8;
        uVar247 = auVar46._6_2_;
        auVar260._6_2_ = uVar247 >> local_1c8;
        uVar146 = auVar46._8_2_;
        auVar260._8_2_ = uVar146 >> local_1c8;
        uVar160 = auVar46._10_2_;
        auVar260._10_2_ = uVar160 >> local_1c8;
        uVar174 = auVar46._12_2_;
        uVar190 = auVar46._14_2_;
        auVar260._12_2_ = uVar174 >> local_1c8;
        auVar260._14_2_ = uVar190 >> local_1c8;
        auVar46 = psubusw(local_e8,auVar260);
        sVar215 = auVar85._0_2_;
        sVar236 = auVar85._2_2_;
        sVar238 = auVar85._4_2_;
        sVar240 = auVar85._6_2_;
        sVar242 = auVar85._8_2_;
        sVar244 = auVar85._10_2_;
        sVar246 = auVar85._12_2_;
        sVar249 = auVar85._14_2_;
        sVar31 = auVar46._0_2_;
        sVar33 = auVar46._2_2_;
        sVar48 = auVar46._4_2_;
        sVar49 = auVar46._6_2_;
        sVar51 = auVar46._8_2_;
        sVar52 = auVar46._10_2_;
        sVar54 = auVar46._12_2_;
        sVar55 = auVar46._14_2_;
        auVar46 = psraw(auVar119,0xf);
        auVar433._0_2_ =
             (((short)uVar448 < sVar215) * uVar448 | (ushort)((short)uVar448 >= sVar215) * sVar215)
             + auVar46._0_2_;
        auVar433._2_2_ =
             (((short)uVar65 < sVar236) * uVar65 | (ushort)((short)uVar65 >= sVar236) * sVar236) +
             auVar46._2_2_;
        auVar433._4_2_ =
             (((short)uVar455 < sVar238) * uVar455 | (ushort)((short)uVar455 >= sVar238) * sVar238)
             + auVar46._4_2_;
        auVar433._6_2_ =
             (((short)uVar459 < sVar240) * uVar459 | (ushort)((short)uVar459 >= sVar240) * sVar240)
             + auVar46._6_2_;
        auVar433._8_2_ =
             (((short)uVar461 < sVar242) * uVar461 | (ushort)((short)uVar461 >= sVar242) * sVar242)
             + auVar46._8_2_;
        auVar433._10_2_ =
             (((short)uVar465 < sVar244) * uVar465 | (ushort)((short)uVar465 >= sVar244) * sVar244)
             + auVar46._10_2_;
        auVar433._12_2_ =
             (((short)uVar57 < sVar246) * uVar57 | (ushort)((short)uVar57 >= sVar246) * sVar246) +
             auVar46._12_2_;
        auVar433._14_2_ =
             (((short)uVar59 < sVar249) * uVar59 | (ushort)((short)uVar59 >= sVar249) * sVar249) +
             auVar46._14_2_;
        auVar433 = auVar433 ^ auVar46;
        auVar85 = psraw(auVar138,0xf);
        auVar324._0_2_ =
             (((short)uVar63 < sVar31) * uVar63 | (ushort)((short)uVar63 >= sVar31) * sVar31) +
             auVar85._0_2_;
        auVar324._2_2_ =
             (((short)uVar62 < sVar33) * uVar62 | (ushort)((short)uVar62 >= sVar33) * sVar33) +
             auVar85._2_2_;
        auVar324._4_2_ =
             (((short)uVar64 < sVar48) * uVar64 | (ushort)((short)uVar64 >= sVar48) * sVar48) +
             auVar85._4_2_;
        auVar324._6_2_ =
             (((short)uVar247 < sVar49) * uVar247 | (ushort)((short)uVar247 >= sVar49) * sVar49) +
             auVar85._6_2_;
        auVar324._8_2_ =
             (((short)uVar146 < sVar51) * uVar146 | (ushort)((short)uVar146 >= sVar51) * sVar51) +
             auVar85._8_2_;
        auVar324._10_2_ =
             (((short)uVar160 < sVar52) * uVar160 | (ushort)((short)uVar160 >= sVar52) * sVar52) +
             auVar85._10_2_;
        auVar324._12_2_ =
             (((short)uVar174 < sVar54) * uVar174 | (ushort)((short)uVar174 >= sVar54) * sVar54) +
             auVar85._12_2_;
        auVar324._14_2_ =
             (((short)uVar190 < sVar55) * uVar190 | (ushort)((short)uVar190 >= sVar55) * sVar55) +
             auVar85._14_2_;
        auVar324 = auVar324 ^ auVar85;
        local_c8 = auVar36._0_2_;
        sStack_c6 = auVar36._2_2_;
        uVar2 = *(undefined8 *)(in + lVar26);
        uVar3 = *(undefined8 *)(in + lVar26 + 0x90);
        uVar4 = *(undefined8 *)(in + lVar26 + 0x120);
        uVar5 = *(undefined8 *)(in + lVar26 + 0x1b0);
        auVar379._8_8_ = uVar4;
        auVar379._0_8_ = uVar5;
        sVar31 = (short)uVar3;
        auVar194._0_2_ = sVar31 - sVar341;
        sVar33 = (short)((ulong)uVar3 >> 0x10);
        auVar194._2_2_ = sVar33 - sVar355;
        sVar48 = (short)((ulong)uVar3 >> 0x20);
        auVar194._4_2_ = sVar48 - sVar357;
        sVar49 = (short)((ulong)uVar3 >> 0x30);
        auVar194._6_2_ = sVar49 - sVar359;
        sVar51 = (short)uVar2;
        auVar194._8_2_ = sVar51 - sVar362;
        sVar52 = (short)((ulong)uVar2 >> 0x10);
        auVar194._10_2_ = sVar52 - sVar365;
        sVar54 = (short)((ulong)uVar2 >> 0x20);
        sVar55 = (short)((ulong)uVar2 >> 0x30);
        auVar194._12_2_ = sVar54 - sVar368;
        auVar194._14_2_ = sVar55 - sVar371;
        sVar215 = (short)uVar5;
        auVar91._0_2_ = sVar215 - sVar415;
        sVar236 = (short)((ulong)uVar5 >> 0x10);
        auVar91._2_2_ = sVar236 - sVar340;
        sVar238 = (short)((ulong)uVar5 >> 0x20);
        auVar91._4_2_ = sVar238 - sVar423;
        sVar240 = (short)((ulong)uVar5 >> 0x30);
        auVar91._6_2_ = sVar240 - sVar354;
        sVar242 = (short)uVar4;
        auVar91._8_2_ = sVar242 - sVar424;
        sVar244 = (short)((ulong)uVar4 >> 0x10);
        auVar91._10_2_ = sVar244 - sVar356;
        sVar246 = (short)((ulong)uVar4 >> 0x20);
        sVar249 = (short)((ulong)uVar4 >> 0x30);
        auVar91._12_2_ = sVar246 - sVar425;
        auVar91._14_2_ = sVar249 - sVar358;
        auVar46 = pabsw(auVar46,auVar194);
        local_1c8 = (ulong)uVar29;
        uVar448 = auVar46._0_2_;
        auVar139._0_2_ = uVar448 >> local_1c8;
        uVar65 = auVar46._2_2_;
        auVar139._2_2_ = uVar65 >> local_1c8;
        uVar455 = auVar46._4_2_;
        auVar139._4_2_ = uVar455 >> local_1c8;
        uVar459 = auVar46._6_2_;
        auVar139._6_2_ = uVar459 >> local_1c8;
        uVar461 = auVar46._8_2_;
        auVar139._8_2_ = uVar461 >> local_1c8;
        uVar465 = auVar46._10_2_;
        auVar139._10_2_ = uVar465 >> local_1c8;
        uVar57 = auVar46._12_2_;
        uVar59 = auVar46._14_2_;
        auVar139._12_2_ = uVar57 >> local_1c8;
        auVar139._14_2_ = uVar59 >> local_1c8;
        auVar46 = pabsw(auVar260,auVar91);
        uVar63 = auVar46._0_2_;
        auVar349._0_2_ = uVar63 >> local_1c8;
        uVar62 = auVar46._2_2_;
        auVar349._2_2_ = uVar62 >> local_1c8;
        uVar64 = auVar46._4_2_;
        auVar349._4_2_ = uVar64 >> local_1c8;
        uVar247 = auVar46._6_2_;
        auVar349._6_2_ = uVar247 >> local_1c8;
        uVar146 = auVar46._8_2_;
        auVar349._8_2_ = uVar146 >> local_1c8;
        uVar160 = auVar46._10_2_;
        auVar349._10_2_ = uVar160 >> local_1c8;
        uVar174 = auVar46._12_2_;
        uVar190 = auVar46._14_2_;
        auVar349._12_2_ = uVar174 >> local_1c8;
        auVar349._14_2_ = uVar190 >> local_1c8;
        auVar85 = psubusw(local_e8,auVar139);
        auVar46 = psubusw(local_e8,auVar349);
        sVar100 = auVar85._0_2_;
        sVar101 = auVar85._2_2_;
        sVar102 = auVar85._4_2_;
        sVar103 = auVar85._6_2_;
        sVar104 = auVar85._8_2_;
        sVar105 = auVar85._10_2_;
        sVar106 = auVar85._12_2_;
        sVar107 = auVar85._14_2_;
        sVar75 = auVar46._0_2_;
        sVar76 = auVar46._2_2_;
        sVar94 = auVar46._4_2_;
        sVar95 = auVar46._6_2_;
        sVar96 = auVar46._8_2_;
        sVar97 = auVar46._10_2_;
        sVar98 = auVar46._12_2_;
        sVar99 = auVar46._14_2_;
        auVar46 = psraw(auVar194,0xf);
        auVar205._0_2_ =
             (((short)uVar448 < sVar100) * uVar448 | (ushort)((short)uVar448 >= sVar100) * sVar100)
             + auVar46._0_2_;
        auVar205._2_2_ =
             (((short)uVar65 < sVar101) * uVar65 | (ushort)((short)uVar65 >= sVar101) * sVar101) +
             auVar46._2_2_;
        auVar205._4_2_ =
             (((short)uVar455 < sVar102) * uVar455 | (ushort)((short)uVar455 >= sVar102) * sVar102)
             + auVar46._4_2_;
        auVar205._6_2_ =
             (((short)uVar459 < sVar103) * uVar459 | (ushort)((short)uVar459 >= sVar103) * sVar103)
             + auVar46._6_2_;
        auVar205._8_2_ =
             (((short)uVar461 < sVar104) * uVar461 | (ushort)((short)uVar461 >= sVar104) * sVar104)
             + auVar46._8_2_;
        auVar205._10_2_ =
             (((short)uVar465 < sVar105) * uVar465 | (ushort)((short)uVar465 >= sVar105) * sVar105)
             + auVar46._10_2_;
        auVar205._12_2_ =
             (((short)uVar57 < sVar106) * uVar57 | (ushort)((short)uVar57 >= sVar106) * sVar106) +
             auVar46._12_2_;
        auVar205._14_2_ =
             (((short)uVar59 < sVar107) * uVar59 | (ushort)((short)uVar59 >= sVar107) * sVar107) +
             auVar46._14_2_;
        auVar205 = auVar205 ^ auVar46;
        auVar46 = psraw(auVar91,0xf);
        auVar140._0_2_ =
             (((short)uVar63 < sVar75) * uVar63 | (ushort)((short)uVar63 >= sVar75) * sVar75) +
             auVar46._0_2_;
        auVar140._2_2_ =
             (((short)uVar62 < sVar76) * uVar62 | (ushort)((short)uVar62 >= sVar76) * sVar76) +
             auVar46._2_2_;
        auVar140._4_2_ =
             (((short)uVar64 < sVar94) * uVar64 | (ushort)((short)uVar64 >= sVar94) * sVar94) +
             auVar46._4_2_;
        auVar140._6_2_ =
             (((short)uVar247 < sVar95) * uVar247 | (ushort)((short)uVar247 >= sVar95) * sVar95) +
             auVar46._6_2_;
        auVar140._8_2_ =
             (((short)uVar146 < sVar96) * uVar146 | (ushort)((short)uVar146 >= sVar96) * sVar96) +
             auVar46._8_2_;
        auVar140._10_2_ =
             (((short)uVar160 < sVar97) * uVar160 | (ushort)((short)uVar160 >= sVar97) * sVar97) +
             auVar46._10_2_;
        auVar140._12_2_ =
             (((short)uVar174 < sVar98) * uVar174 | (ushort)((short)uVar174 >= sVar98) * sVar98) +
             auVar46._12_2_;
        auVar140._14_2_ =
             (((short)uVar190 < sVar99) * uVar190 | (ushort)((short)uVar190 >= sVar99) * sVar99) +
             auVar46._14_2_;
        auVar140 = auVar140 ^ auVar46;
        uVar6 = *(undefined8 *)(in + -lVar26);
        uVar7 = *(undefined8 *)(in + (0x90 - lVar26));
        uVar8 = *(undefined8 *)(in + (0x120 - lVar26));
        uVar9 = *(undefined8 *)(in + (0x1b0 - lVar26));
        uVar32 = (ushort)(sVar31 < (short)uVar32) * sVar31 | (sVar31 >= (short)uVar32) * uVar32;
        uVar47 = (ushort)(sVar33 < (short)uVar47) * sVar33 | (sVar33 >= (short)uVar47) * uVar47;
        uVar50 = (ushort)(sVar48 < (short)uVar50) * sVar48 | (sVar48 >= (short)uVar50) * uVar50;
        uVar448 = (ushort)(sVar49 < (short)uVar53) * sVar49 | (sVar49 >= (short)uVar53) * uVar53;
        uVar56 = (ushort)(sVar51 < (short)uVar56) * sVar51 | (sVar51 >= (short)uVar56) * uVar56;
        uVar65 = (ushort)(sVar52 < (short)uVar60) * sVar52 | (sVar52 >= (short)uVar60) * uVar60;
        uVar453 = (ushort)(sVar54 < (short)uVar453) * sVar54 | (sVar54 >= (short)uVar453) * uVar453;
        uVar455 = (ushort)(sVar55 < (short)uVar70) * sVar55 | (sVar55 >= (short)uVar70) * uVar70;
        bVar192 = (byte)uVar7;
        bVar313 = (byte)uVar3;
        bVar313 = (bVar313 < bVar192) * bVar192 | (bVar313 >= bVar192) * bVar313;
        bVar192 = (byte)((ulong)uVar7 >> 8);
        bVar325 = (byte)((ulong)uVar3 >> 8);
        bVar325 = (bVar325 < bVar192) * bVar192 | (bVar325 >= bVar192) * bVar325;
        bVar192 = (byte)((ulong)uVar7 >> 0x10);
        bVar326 = (byte)((ulong)uVar3 >> 0x10);
        bVar326 = (bVar326 < bVar192) * bVar192 | (bVar326 >= bVar192) * bVar326;
        bVar192 = (byte)((ulong)uVar7 >> 0x18);
        bVar327 = (byte)((ulong)uVar3 >> 0x18);
        bVar327 = (bVar327 < bVar192) * bVar192 | (bVar327 >= bVar192) * bVar327;
        bVar192 = (byte)((ulong)uVar7 >> 0x20);
        bVar328 = (byte)((ulong)uVar3 >> 0x20);
        bVar328 = (bVar328 < bVar192) * bVar192 | (bVar328 >= bVar192) * bVar328;
        bVar192 = (byte)((ulong)uVar7 >> 0x28);
        bVar329 = (byte)((ulong)uVar3 >> 0x28);
        bVar329 = (bVar329 < bVar192) * bVar192 | (bVar329 >= bVar192) * bVar329;
        bVar192 = (byte)((ulong)uVar7 >> 0x30);
        bVar330 = (byte)((ulong)uVar3 >> 0x30);
        bVar330 = (bVar330 < bVar192) * bVar192 | (bVar330 >= bVar192) * bVar330;
        bVar192 = (byte)((ulong)uVar7 >> 0x38);
        bVar331 = (byte)((ulong)uVar3 >> 0x38);
        bVar331 = (bVar331 < bVar192) * bVar192 | (bVar331 >= bVar192) * bVar331;
        bVar192 = (byte)uVar6;
        bVar332 = (byte)uVar2;
        bVar332 = (bVar332 < bVar192) * bVar192 | (bVar332 >= bVar192) * bVar332;
        bVar192 = (byte)((ulong)uVar6 >> 8);
        bVar333 = (byte)((ulong)uVar2 >> 8);
        bVar333 = (bVar333 < bVar192) * bVar192 | (bVar333 >= bVar192) * bVar333;
        bVar192 = (byte)((ulong)uVar6 >> 0x10);
        bVar334 = (byte)((ulong)uVar2 >> 0x10);
        bVar334 = (bVar334 < bVar192) * bVar192 | (bVar334 >= bVar192) * bVar334;
        bVar192 = (byte)((ulong)uVar6 >> 0x18);
        bVar335 = (byte)((ulong)uVar2 >> 0x18);
        bVar335 = (bVar335 < bVar192) * bVar192 | (bVar335 >= bVar192) * bVar335;
        bVar192 = (byte)((ulong)uVar6 >> 0x20);
        bVar336 = (byte)((ulong)uVar2 >> 0x20);
        bVar336 = (bVar336 < bVar192) * bVar192 | (bVar336 >= bVar192) * bVar336;
        bVar192 = (byte)((ulong)uVar6 >> 0x28);
        bVar337 = (byte)((ulong)uVar2 >> 0x28);
        bVar337 = (bVar337 < bVar192) * bVar192 | (bVar337 >= bVar192) * bVar337;
        bVar192 = (byte)((ulong)uVar6 >> 0x30);
        bVar338 = (byte)((ulong)uVar2 >> 0x30);
        bVar339 = (byte)((ulong)uVar2 >> 0x38);
        bVar338 = (bVar338 < bVar192) * bVar192 | (bVar338 >= bVar192) * bVar338;
        bVar192 = (byte)((ulong)uVar6 >> 0x38);
        bVar339 = (bVar339 < bVar192) * bVar192 | (bVar339 >= bVar192) * bVar339;
        sVar31 = (short)uVar7;
        uVar32 = (ushort)(sVar31 < (short)uVar32) * sVar31 | (sVar31 >= (short)uVar32) * uVar32;
        sVar33 = (short)((ulong)uVar7 >> 0x10);
        uVar53 = (ushort)(sVar33 < (short)uVar47) * sVar33 | (sVar33 >= (short)uVar47) * uVar47;
        sVar48 = (short)((ulong)uVar7 >> 0x20);
        uVar60 = (ushort)(sVar48 < (short)uVar50) * sVar48 | (sVar48 >= (short)uVar50) * uVar50;
        sVar49 = (short)((ulong)uVar7 >> 0x30);
        uVar70 = (ushort)(sVar49 < (short)uVar448) * sVar49 | (sVar49 >= (short)uVar448) * uVar448;
        sVar51 = (short)uVar6;
        uVar459 = (ushort)(sVar51 < (short)uVar56) * sVar51 | (sVar51 >= (short)uVar56) * uVar56;
        sVar52 = (short)((ulong)uVar6 >> 0x10);
        uVar465 = (ushort)(sVar52 < (short)uVar65) * sVar52 | (sVar52 >= (short)uVar65) * uVar65;
        sVar54 = (short)((ulong)uVar6 >> 0x20);
        uVar59 = (ushort)(sVar54 < (short)uVar453) * sVar54 | (sVar54 >= (short)uVar453) * uVar453;
        sVar55 = (short)((ulong)uVar6 >> 0x30);
        uVar62 = (ushort)(sVar55 < (short)uVar455) * sVar55 | (sVar55 >= (short)uVar455) * uVar455;
        auVar261._0_2_ = sVar31 - sVar341;
        auVar261._2_2_ = sVar33 - sVar355;
        auVar261._4_2_ = sVar48 - sVar357;
        auVar261._6_2_ = sVar49 - sVar359;
        auVar261._8_2_ = sVar51 - sVar362;
        auVar261._10_2_ = sVar52 - sVar365;
        auVar261._12_2_ = sVar54 - sVar368;
        auVar261._14_2_ = sVar55 - sVar371;
        auVar46 = pabsw(auVar349,auVar261);
        uVar47 = auVar46._0_2_;
        auVar315._0_2_ = uVar47 >> local_1c8;
        uVar448 = auVar46._2_2_;
        auVar315._2_2_ = uVar448 >> local_1c8;
        uVar65 = auVar46._4_2_;
        auVar315._4_2_ = uVar65 >> local_1c8;
        uVar455 = auVar46._6_2_;
        auVar315._6_2_ = uVar455 >> local_1c8;
        uVar461 = auVar46._8_2_;
        auVar315._8_2_ = uVar461 >> local_1c8;
        uVar57 = auVar46._10_2_;
        auVar315._10_2_ = uVar57 >> local_1c8;
        uVar63 = auVar46._12_2_;
        uVar64 = auVar46._14_2_;
        auVar315._12_2_ = uVar63 >> local_1c8;
        auVar315._14_2_ = uVar64 >> local_1c8;
        auVar85 = psubusw(local_e8,auVar315);
        uVar50 = (ushort)(sVar215 < (short)uVar457) * sVar215 |
                 (sVar215 >= (short)uVar457) * uVar457;
        uVar56 = (ushort)(sVar236 < (short)uVar463) * sVar236 |
                 (sVar236 >= (short)uVar463) * uVar463;
        uVar453 = (ushort)(sVar238 < (short)uVar58) * sVar238 | (sVar238 >= (short)uVar58) * uVar58;
        uVar457 = (ushort)(sVar240 < (short)uVar61) * sVar240 | (sVar240 >= (short)uVar61) * uVar61;
        uVar463 = (ushort)(sVar242 < (short)uVar68) * sVar242 | (sVar242 >= (short)uVar68) * uVar68;
        uVar58 = (ushort)(sVar244 < (short)uVar66) * sVar244 | (sVar244 >= (short)uVar66) * uVar66;
        uVar61 = (ushort)(sVar246 < (short)uVar67) * sVar246 | (sVar246 >= (short)uVar67) * uVar67;
        uVar68 = (ushort)(sVar249 < (short)uVar69) * sVar249 | (sVar249 >= (short)uVar69) * uVar69;
        bVar192 = (byte)uVar9;
        bVar382 = (byte)uVar5;
        bVar382 = (bVar382 < bVar192) * bVar192 | (bVar382 >= bVar192) * bVar382;
        bVar192 = (byte)((ulong)uVar9 >> 8);
        bVar389 = (byte)((ulong)uVar5 >> 8);
        bVar389 = (bVar389 < bVar192) * bVar192 | (bVar389 >= bVar192) * bVar389;
        bVar192 = (byte)((ulong)uVar9 >> 0x10);
        bVar390 = (byte)((ulong)uVar5 >> 0x10);
        bVar390 = (bVar390 < bVar192) * bVar192 | (bVar390 >= bVar192) * bVar390;
        bVar192 = (byte)((ulong)uVar9 >> 0x18);
        bVar392 = (byte)((ulong)uVar5 >> 0x18);
        bVar392 = (bVar392 < bVar192) * bVar192 | (bVar392 >= bVar192) * bVar392;
        bVar192 = (byte)((ulong)uVar9 >> 0x20);
        bVar393 = (byte)((ulong)uVar5 >> 0x20);
        bVar393 = (bVar393 < bVar192) * bVar192 | (bVar393 >= bVar192) * bVar393;
        bVar192 = (byte)((ulong)uVar9 >> 0x28);
        bVar395 = (byte)((ulong)uVar5 >> 0x28);
        bVar395 = (bVar395 < bVar192) * bVar192 | (bVar395 >= bVar192) * bVar395;
        bVar192 = (byte)((ulong)uVar9 >> 0x30);
        bVar396 = (byte)((ulong)uVar5 >> 0x30);
        bVar396 = (bVar396 < bVar192) * bVar192 | (bVar396 >= bVar192) * bVar396;
        bVar192 = (byte)((ulong)uVar9 >> 0x38);
        bVar398 = (byte)((ulong)uVar5 >> 0x38);
        bVar398 = (bVar398 < bVar192) * bVar192 | (bVar398 >= bVar192) * bVar398;
        bVar192 = (byte)uVar8;
        bVar399 = (byte)uVar4;
        bVar399 = (bVar399 < bVar192) * bVar192 | (bVar399 >= bVar192) * bVar399;
        bVar192 = (byte)((ulong)uVar8 >> 8);
        bVar402 = (byte)((ulong)uVar4 >> 8);
        bVar402 = (bVar402 < bVar192) * bVar192 | (bVar402 >= bVar192) * bVar402;
        bVar192 = (byte)((ulong)uVar8 >> 0x10);
        bVar403 = (byte)((ulong)uVar4 >> 0x10);
        bVar403 = (bVar403 < bVar192) * bVar192 | (bVar403 >= bVar192) * bVar403;
        bVar192 = (byte)((ulong)uVar8 >> 0x18);
        bVar406 = (byte)((ulong)uVar4 >> 0x18);
        bVar406 = (bVar406 < bVar192) * bVar192 | (bVar406 >= bVar192) * bVar406;
        bVar192 = (byte)((ulong)uVar8 >> 0x20);
        bVar407 = (byte)((ulong)uVar4 >> 0x20);
        bVar407 = (bVar407 < bVar192) * bVar192 | (bVar407 >= bVar192) * bVar407;
        bVar192 = (byte)((ulong)uVar8 >> 0x28);
        bVar410 = (byte)((ulong)uVar4 >> 0x28);
        bVar410 = (bVar410 < bVar192) * bVar192 | (bVar410 >= bVar192) * bVar410;
        bVar192 = (byte)((ulong)uVar8 >> 0x30);
        bVar411 = (byte)((ulong)uVar4 >> 0x30);
        bVar414 = (byte)((ulong)uVar4 >> 0x38);
        bVar411 = (bVar411 < bVar192) * bVar192 | (bVar411 >= bVar192) * bVar411;
        bVar192 = (byte)((ulong)uVar8 >> 0x38);
        bVar414 = (bVar414 < bVar192) * bVar192 | (bVar414 >= bVar192) * bVar414;
        sVar31 = (short)uVar9;
        uVar50 = (ushort)(sVar31 < (short)uVar50) * sVar31 | (sVar31 >= (short)uVar50) * uVar50;
        sVar33 = (short)((ulong)uVar9 >> 0x10);
        uVar56 = (ushort)(sVar33 < (short)uVar56) * sVar33 | (sVar33 >= (short)uVar56) * uVar56;
        sVar48 = (short)((ulong)uVar9 >> 0x20);
        uVar453 = (ushort)(sVar48 < (short)uVar453) * sVar48 | (sVar48 >= (short)uVar453) * uVar453;
        sVar49 = (short)((ulong)uVar9 >> 0x30);
        uVar457 = (ushort)(sVar49 < (short)uVar457) * sVar49 | (sVar49 >= (short)uVar457) * uVar457;
        sVar51 = (short)uVar8;
        uVar463 = (ushort)(sVar51 < (short)uVar463) * sVar51 | (sVar51 >= (short)uVar463) * uVar463;
        sVar52 = (short)((ulong)uVar8 >> 0x10);
        uVar58 = (ushort)(sVar52 < (short)uVar58) * sVar52 | (sVar52 >= (short)uVar58) * uVar58;
        sVar54 = (short)((ulong)uVar8 >> 0x20);
        uVar61 = (ushort)(sVar54 < (short)uVar61) * sVar54 | (sVar54 >= (short)uVar61) * uVar61;
        sVar55 = (short)((ulong)uVar8 >> 0x30);
        uVar68 = (ushort)(sVar55 < (short)uVar68) * sVar55 | (sVar55 >= (short)uVar68) * uVar68;
        auVar120._0_2_ = sVar31 - sVar415;
        auVar120._2_2_ = sVar33 - sVar340;
        auVar120._4_2_ = sVar48 - sVar423;
        auVar120._6_2_ = sVar49 - sVar354;
        auVar120._8_2_ = sVar51 - sVar424;
        auVar120._10_2_ = sVar52 - sVar356;
        auVar120._12_2_ = sVar54 - sVar425;
        auVar120._14_2_ = sVar55 - sVar358;
        auVar46 = pabsw(auVar379,auVar120);
        uVar66 = auVar46._0_2_;
        auVar387._0_2_ = uVar66 >> local_1c8;
        uVar67 = auVar46._2_2_;
        auVar387._2_2_ = uVar67 >> local_1c8;
        uVar69 = auVar46._4_2_;
        auVar387._4_2_ = uVar69 >> local_1c8;
        uVar247 = auVar46._6_2_;
        auVar387._6_2_ = uVar247 >> local_1c8;
        uVar146 = auVar46._8_2_;
        auVar387._8_2_ = uVar146 >> local_1c8;
        uVar160 = auVar46._10_2_;
        auVar387._10_2_ = uVar160 >> local_1c8;
        uVar174 = auVar46._12_2_;
        uVar190 = auVar46._14_2_;
        auVar387._12_2_ = uVar174 >> local_1c8;
        auVar387._14_2_ = uVar190 >> local_1c8;
        auVar46 = psubusw(local_e8,auVar387);
        sVar215 = auVar85._0_2_;
        sVar236 = auVar85._2_2_;
        sVar238 = auVar85._4_2_;
        sVar240 = auVar85._6_2_;
        sVar242 = auVar85._8_2_;
        sVar244 = auVar85._10_2_;
        sVar246 = auVar85._12_2_;
        sVar249 = auVar85._14_2_;
        sVar31 = auVar46._0_2_;
        sVar33 = auVar46._2_2_;
        sVar48 = auVar46._4_2_;
        sVar49 = auVar46._6_2_;
        sVar51 = auVar46._8_2_;
        sVar52 = auVar46._10_2_;
        sVar54 = auVar46._12_2_;
        sVar55 = auVar46._14_2_;
        auVar46 = psraw(auVar261,0xf);
        auVar289._0_2_ =
             (((short)uVar47 < sVar215) * uVar47 | (ushort)((short)uVar47 >= sVar215) * sVar215) +
             auVar46._0_2_;
        auVar289._2_2_ =
             (((short)uVar448 < sVar236) * uVar448 | (ushort)((short)uVar448 >= sVar236) * sVar236)
             + auVar46._2_2_;
        auVar289._4_2_ =
             (((short)uVar65 < sVar238) * uVar65 | (ushort)((short)uVar65 >= sVar238) * sVar238) +
             auVar46._4_2_;
        auVar289._6_2_ =
             (((short)uVar455 < sVar240) * uVar455 | (ushort)((short)uVar455 >= sVar240) * sVar240)
             + auVar46._6_2_;
        auVar289._8_2_ =
             (((short)uVar461 < sVar242) * uVar461 | (ushort)((short)uVar461 >= sVar242) * sVar242)
             + auVar46._8_2_;
        auVar289._10_2_ =
             (((short)uVar57 < sVar244) * uVar57 | (ushort)((short)uVar57 >= sVar244) * sVar244) +
             auVar46._10_2_;
        auVar289._12_2_ =
             (((short)uVar63 < sVar246) * uVar63 | (ushort)((short)uVar63 >= sVar246) * sVar246) +
             auVar46._12_2_;
        auVar289._14_2_ =
             (((short)uVar64 < sVar249) * uVar64 | (ushort)((short)uVar64 >= sVar249) * sVar249) +
             auVar46._14_2_;
        auVar289 = auVar289 ^ auVar46;
        auVar46 = psraw(auVar120,0xf);
        auVar234._0_2_ =
             (((short)uVar66 < sVar31) * uVar66 | (ushort)((short)uVar66 >= sVar31) * sVar31) +
             auVar46._0_2_;
        auVar234._2_2_ =
             (((short)uVar67 < sVar33) * uVar67 | (ushort)((short)uVar67 >= sVar33) * sVar33) +
             auVar46._2_2_;
        auVar234._4_2_ =
             (((short)uVar69 < sVar48) * uVar69 | (ushort)((short)uVar69 >= sVar48) * sVar48) +
             auVar46._4_2_;
        auVar234._6_2_ =
             (((short)uVar247 < sVar49) * uVar247 | (ushort)((short)uVar247 >= sVar49) * sVar49) +
             auVar46._6_2_;
        auVar234._8_2_ =
             (((short)uVar146 < sVar51) * uVar146 | (ushort)((short)uVar146 >= sVar51) * sVar51) +
             auVar46._8_2_;
        auVar234._10_2_ =
             (((short)uVar160 < sVar52) * uVar160 | (ushort)((short)uVar160 >= sVar52) * sVar52) +
             auVar46._10_2_;
        auVar234._12_2_ =
             (((short)uVar174 < sVar54) * uVar174 | (ushort)((short)uVar174 >= sVar54) * sVar54) +
             auVar46._12_2_;
        auVar234._14_2_ =
             (((short)uVar190 < sVar55) * uVar190 | (ushort)((short)uVar190 >= sVar55) * sVar55) +
             auVar46._14_2_;
        auVar234 = auVar234 ^ auVar46;
        uVar2 = *(undefined8 *)(in + lVar27);
        uVar3 = *(undefined8 *)(in + lVar27 + 0x90);
        uVar4 = *(undefined8 *)(in + lVar27 + 0x120);
        uVar5 = *(undefined8 *)(in + lVar27 + 0x1b0);
        uVar6 = *(undefined8 *)(in + -lVar27);
        uVar7 = *(undefined8 *)(in + (0x90 - lVar27));
        uVar8 = *(undefined8 *)(in + (0x120 - lVar27));
        uVar9 = *(undefined8 *)(in + (0x1b0 - lVar27));
        bVar122 = (bVar251 < bVar122) * bVar122 | (bVar251 >= bVar122) * bVar251;
        bVar142 = (bVar263 < bVar142) * bVar142 | (bVar263 >= bVar142) * bVar263;
        bVar144 = (bVar264 < bVar144) * bVar144 | (bVar264 >= bVar144) * bVar264;
        bVar149 = (bVar265 < bVar149) * bVar149 | (bVar265 >= bVar149) * bVar265;
        bVar151 = (bVar266 < bVar151) * bVar151 | (bVar266 >= bVar151) * bVar266;
        bVar156 = (bVar267 < bVar156) * bVar156 | (bVar267 >= bVar156) * bVar267;
        bVar158 = (bVar268 < bVar158) * bVar158 | (bVar268 >= bVar158) * bVar268;
        bVar163 = (bVar269 < bVar163) * bVar163 | (bVar269 >= bVar163) * bVar269;
        bVar165 = (bVar270 < bVar165) * bVar165 | (bVar270 >= bVar165) * bVar270;
        bVar170 = (bVar271 < bVar170) * bVar170 | (bVar271 >= bVar170) * bVar271;
        bVar172 = (bVar272 < bVar172) * bVar172 | (bVar272 >= bVar172) * bVar272;
        bVar177 = (bVar273 < bVar177) * bVar177 | (bVar273 >= bVar177) * bVar273;
        bVar179 = (bVar274 < bVar179) * bVar179 | (bVar274 >= bVar179) * bVar274;
        bVar184 = (bVar275 < bVar184) * bVar184 | (bVar275 >= bVar184) * bVar275;
        bVar186 = (bVar276 < bVar186) * bVar186 | (bVar276 >= bVar186) * bVar276;
        bVar191 = (bVar277 < bVar191) * bVar191 | (bVar277 >= bVar191) * bVar277;
        bVar123 = (bVar293 < bVar123) * bVar123 | (bVar293 >= bVar123) * bVar293;
        bVar143 = (bVar294 < bVar143) * bVar143 | (bVar294 >= bVar143) * bVar294;
        bVar145 = (bVar296 < bVar145) * bVar145 | (bVar296 >= bVar145) * bVar296;
        bVar150 = (bVar297 < bVar150) * bVar150 | (bVar297 >= bVar150) * bVar297;
        bVar152 = (bVar298 < bVar152) * bVar152 | (bVar298 >= bVar152) * bVar298;
        bVar157 = (bVar299 < bVar157) * bVar157 | (bVar299 >= bVar157) * bVar299;
        bVar159 = (bVar301 < bVar159) * bVar159 | (bVar301 >= bVar159) * bVar301;
        bVar164 = (bVar302 < bVar164) * bVar164 | (bVar302 >= bVar164) * bVar302;
        bVar166 = (bVar303 < bVar166) * bVar166 | (bVar303 >= bVar166) * bVar303;
        bVar171 = (bVar304 < bVar171) * bVar171 | (bVar304 >= bVar171) * bVar304;
        bVar173 = (bVar306 < bVar173) * bVar173 | (bVar306 >= bVar173) * bVar306;
        bVar178 = (bVar307 < bVar178) * bVar178 | (bVar307 >= bVar178) * bVar307;
        bVar180 = (bVar308 < bVar180) * bVar180 | (bVar308 >= bVar180) * bVar308;
        bVar185 = (bVar309 < bVar185) * bVar185 | (bVar309 >= bVar185) * bVar309;
        bVar187 = (bVar311 < bVar187) * bVar187 | (bVar311 >= bVar187) * bVar311;
        bVar250 = (bVar312 < bVar250) * bVar250 | (bVar312 >= bVar250) * bVar312;
        bVar192 = (byte)uVar3;
        bVar251 = (bVar313 < bVar192) * bVar192 | (bVar313 >= bVar192) * bVar313;
        bVar192 = (byte)((ulong)uVar3 >> 8);
        bVar263 = (bVar325 < bVar192) * bVar192 | (bVar325 >= bVar192) * bVar325;
        bVar192 = (byte)((ulong)uVar3 >> 0x10);
        bVar264 = (bVar326 < bVar192) * bVar192 | (bVar326 >= bVar192) * bVar326;
        bVar192 = (byte)((ulong)uVar3 >> 0x18);
        bVar265 = (bVar327 < bVar192) * bVar192 | (bVar327 >= bVar192) * bVar327;
        bVar192 = (byte)((ulong)uVar3 >> 0x20);
        bVar266 = (bVar328 < bVar192) * bVar192 | (bVar328 >= bVar192) * bVar328;
        bVar192 = (byte)((ulong)uVar3 >> 0x28);
        bVar267 = (bVar329 < bVar192) * bVar192 | (bVar329 >= bVar192) * bVar329;
        bVar192 = (byte)((ulong)uVar3 >> 0x30);
        bVar268 = (bVar330 < bVar192) * bVar192 | (bVar330 >= bVar192) * bVar330;
        bVar192 = (byte)((ulong)uVar3 >> 0x38);
        bVar269 = (bVar331 < bVar192) * bVar192 | (bVar331 >= bVar192) * bVar331;
        bVar192 = (byte)uVar2;
        bVar270 = (bVar332 < bVar192) * bVar192 | (bVar332 >= bVar192) * bVar332;
        bVar192 = (byte)((ulong)uVar2 >> 8);
        bVar271 = (bVar333 < bVar192) * bVar192 | (bVar333 >= bVar192) * bVar333;
        bVar192 = (byte)((ulong)uVar2 >> 0x10);
        bVar272 = (bVar334 < bVar192) * bVar192 | (bVar334 >= bVar192) * bVar334;
        bVar192 = (byte)((ulong)uVar2 >> 0x18);
        bVar273 = (bVar335 < bVar192) * bVar192 | (bVar335 >= bVar192) * bVar335;
        bVar192 = (byte)((ulong)uVar2 >> 0x20);
        bVar274 = (bVar336 < bVar192) * bVar192 | (bVar336 >= bVar192) * bVar336;
        bVar192 = (byte)((ulong)uVar2 >> 0x28);
        bVar275 = (bVar337 < bVar192) * bVar192 | (bVar337 >= bVar192) * bVar337;
        bVar192 = (byte)((ulong)uVar2 >> 0x30);
        bVar276 = (bVar338 < bVar192) * bVar192 | (bVar338 >= bVar192) * bVar338;
        bVar192 = (byte)((ulong)uVar2 >> 0x38);
        bVar192 = (bVar339 < bVar192) * bVar192 | (bVar339 >= bVar192) * bVar339;
        bVar251 = (bVar251 < bVar122) * bVar122 | (bVar251 >= bVar122) * bVar251;
        bVar263 = (bVar263 < bVar142) * bVar142 | (bVar263 >= bVar142) * bVar263;
        bVar264 = (bVar264 < bVar144) * bVar144 | (bVar264 >= bVar144) * bVar264;
        bVar265 = (bVar265 < bVar149) * bVar149 | (bVar265 >= bVar149) * bVar265;
        bVar266 = (bVar266 < bVar151) * bVar151 | (bVar266 >= bVar151) * bVar266;
        bVar267 = (bVar267 < bVar156) * bVar156 | (bVar267 >= bVar156) * bVar267;
        bVar268 = (bVar268 < bVar158) * bVar158 | (bVar268 >= bVar158) * bVar268;
        bVar269 = (bVar269 < bVar163) * bVar163 | (bVar269 >= bVar163) * bVar269;
        bVar165 = (bVar270 < bVar165) * bVar165 | (bVar270 >= bVar165) * bVar270;
        bVar170 = (bVar271 < bVar170) * bVar170 | (bVar271 >= bVar170) * bVar271;
        bVar172 = (bVar272 < bVar172) * bVar172 | (bVar272 >= bVar172) * bVar272;
        bVar177 = (bVar273 < bVar177) * bVar177 | (bVar273 >= bVar177) * bVar273;
        bVar179 = (bVar274 < bVar179) * bVar179 | (bVar274 >= bVar179) * bVar274;
        bVar184 = (bVar275 < bVar184) * bVar184 | (bVar275 >= bVar184) * bVar275;
        bVar186 = (bVar276 < bVar186) * bVar186 | (bVar276 >= bVar186) * bVar276;
        bVar191 = (bVar192 < bVar191) * bVar191 | (bVar192 >= bVar191) * bVar192;
        bVar192 = (byte)uVar5;
        bVar122 = (bVar382 < bVar192) * bVar192 | (bVar382 >= bVar192) * bVar382;
        bVar192 = (byte)((ulong)uVar5 >> 8);
        bVar142 = (bVar389 < bVar192) * bVar192 | (bVar389 >= bVar192) * bVar389;
        bVar192 = (byte)((ulong)uVar5 >> 0x10);
        bVar144 = (bVar390 < bVar192) * bVar192 | (bVar390 >= bVar192) * bVar390;
        bVar192 = (byte)((ulong)uVar5 >> 0x18);
        bVar149 = (bVar392 < bVar192) * bVar192 | (bVar392 >= bVar192) * bVar392;
        bVar192 = (byte)((ulong)uVar5 >> 0x20);
        bVar151 = (bVar393 < bVar192) * bVar192 | (bVar393 >= bVar192) * bVar393;
        bVar192 = (byte)((ulong)uVar5 >> 0x28);
        bVar156 = (bVar395 < bVar192) * bVar192 | (bVar395 >= bVar192) * bVar395;
        bVar192 = (byte)((ulong)uVar5 >> 0x30);
        bVar158 = (bVar396 < bVar192) * bVar192 | (bVar396 >= bVar192) * bVar396;
        bVar192 = (byte)((ulong)uVar5 >> 0x38);
        bVar163 = (bVar398 < bVar192) * bVar192 | (bVar398 >= bVar192) * bVar398;
        bVar192 = (byte)uVar4;
        bVar277 = (bVar399 < bVar192) * bVar192 | (bVar399 >= bVar192) * bVar399;
        bVar192 = (byte)((ulong)uVar4 >> 8);
        bVar293 = (bVar402 < bVar192) * bVar192 | (bVar402 >= bVar192) * bVar402;
        bVar192 = (byte)((ulong)uVar4 >> 0x10);
        bVar294 = (bVar403 < bVar192) * bVar192 | (bVar403 >= bVar192) * bVar403;
        bVar192 = (byte)((ulong)uVar4 >> 0x18);
        bVar296 = (bVar406 < bVar192) * bVar192 | (bVar406 >= bVar192) * bVar406;
        bVar192 = (byte)((ulong)uVar4 >> 0x20);
        bVar297 = (bVar407 < bVar192) * bVar192 | (bVar407 >= bVar192) * bVar407;
        bVar192 = (byte)((ulong)uVar4 >> 0x28);
        bVar298 = (bVar410 < bVar192) * bVar192 | (bVar410 >= bVar192) * bVar410;
        bVar192 = (byte)((ulong)uVar4 >> 0x30);
        bVar299 = (bVar411 < bVar192) * bVar192 | (bVar411 >= bVar192) * bVar411;
        bVar192 = (byte)((ulong)uVar4 >> 0x38);
        bVar192 = (bVar414 < bVar192) * bVar192 | (bVar414 >= bVar192) * bVar414;
        bVar270 = (bVar122 < bVar123) * bVar123 | (bVar122 >= bVar123) * bVar122;
        bVar271 = (bVar142 < bVar143) * bVar143 | (bVar142 >= bVar143) * bVar142;
        bVar272 = (bVar144 < bVar145) * bVar145 | (bVar144 >= bVar145) * bVar144;
        bVar273 = (bVar149 < bVar150) * bVar150 | (bVar149 >= bVar150) * bVar149;
        bVar274 = (bVar151 < bVar152) * bVar152 | (bVar151 >= bVar152) * bVar151;
        bVar275 = (bVar156 < bVar157) * bVar157 | (bVar156 >= bVar157) * bVar156;
        bVar276 = (bVar158 < bVar159) * bVar159 | (bVar158 >= bVar159) * bVar158;
        bVar164 = (bVar163 < bVar164) * bVar164 | (bVar163 >= bVar164) * bVar163;
        bVar166 = (bVar277 < bVar166) * bVar166 | (bVar277 >= bVar166) * bVar277;
        bVar171 = (bVar293 < bVar171) * bVar171 | (bVar293 >= bVar171) * bVar293;
        bVar173 = (bVar294 < bVar173) * bVar173 | (bVar294 >= bVar173) * bVar294;
        bVar178 = (bVar296 < bVar178) * bVar178 | (bVar296 >= bVar178) * bVar296;
        bVar180 = (bVar297 < bVar180) * bVar180 | (bVar297 >= bVar180) * bVar297;
        bVar185 = (bVar298 < bVar185) * bVar185 | (bVar298 >= bVar185) * bVar298;
        bVar187 = (bVar299 < bVar187) * bVar187 | (bVar299 >= bVar187) * bVar299;
        bVar250 = (bVar192 < bVar250) * bVar250 | (bVar192 >= bVar250) * bVar192;
        bVar192 = (byte)uVar7;
        bVar122 = (byte)((ulong)uVar7 >> 8);
        bVar123 = (byte)((ulong)uVar7 >> 0x10);
        bVar142 = (byte)((ulong)uVar7 >> 0x18);
        bVar143 = (byte)((ulong)uVar7 >> 0x20);
        bVar144 = (byte)((ulong)uVar7 >> 0x28);
        bVar145 = (byte)((ulong)uVar7 >> 0x30);
        bVar149 = (byte)((ulong)uVar7 >> 0x38);
        bVar150 = (byte)uVar6;
        bVar151 = (byte)((ulong)uVar6 >> 8);
        bVar152 = (byte)((ulong)uVar6 >> 0x10);
        bVar156 = (byte)((ulong)uVar6 >> 0x18);
        bVar157 = (byte)((ulong)uVar6 >> 0x20);
        bVar158 = (byte)((ulong)uVar6 >> 0x28);
        bVar159 = (byte)((ulong)uVar6 >> 0x30);
        bVar163 = (byte)((ulong)uVar6 >> 0x38);
        local_1a8[1] = (bVar263 < bVar122) * bVar122 | (bVar263 >= bVar122) * bVar263;
        local_1a8[0] = (bVar251 < bVar192) * bVar192 | (bVar251 >= bVar192) * bVar251;
        local_1a8[2] = (bVar264 < bVar123) * bVar123 | (bVar264 >= bVar123) * bVar264;
        local_1a8[3] = (bVar265 < bVar142) * bVar142 | (bVar265 >= bVar142) * bVar265;
        local_1a8[4] = (bVar266 < bVar143) * bVar143 | (bVar266 >= bVar143) * bVar266;
        local_1a8[5] = (bVar267 < bVar144) * bVar144 | (bVar267 >= bVar144) * bVar267;
        local_1a8[6] = (bVar268 < bVar145) * bVar145 | (bVar268 >= bVar145) * bVar268;
        local_1a8[7] = (bVar269 < bVar149) * bVar149 | (bVar269 >= bVar149) * bVar269;
        local_1a8[8] = (bVar165 < bVar150) * bVar150 | (bVar165 >= bVar150) * bVar165;
        local_1a8[9] = (bVar170 < bVar151) * bVar151 | (bVar170 >= bVar151) * bVar170;
        local_1a8[10] = (bVar172 < bVar152) * bVar152 | (bVar172 >= bVar152) * bVar172;
        local_1a8[0xb] = (bVar177 < bVar156) * bVar156 | (bVar177 >= bVar156) * bVar177;
        local_1a8[0xc] = (bVar179 < bVar157) * bVar157 | (bVar179 >= bVar157) * bVar179;
        local_1a8[0xd] = (bVar184 < bVar158) * bVar158 | (bVar184 >= bVar158) * bVar184;
        local_1a8[0xe] = (bVar186 < bVar159) * bVar159 | (bVar186 >= bVar159) * bVar186;
        local_1a8[0xf] = (bVar191 < bVar163) * bVar163 | (bVar191 >= bVar163) * bVar191;
        sVar31 = (short)uVar3;
        sVar100 = (short)uVar7;
        auVar262._0_2_ = (ushort)(sVar31 < sVar100) * sVar31 | (ushort)(sVar31 >= sVar100) * sVar100
        ;
        sVar33 = (short)((ulong)uVar3 >> 0x10);
        sVar101 = (short)((ulong)uVar7 >> 0x10);
        auVar262._2_2_ = (ushort)(sVar33 < sVar101) * sVar33 | (ushort)(sVar33 >= sVar101) * sVar101
        ;
        sVar48 = (short)((ulong)uVar3 >> 0x20);
        sVar102 = (short)((ulong)uVar7 >> 0x20);
        auVar262._4_2_ = (ushort)(sVar48 < sVar102) * sVar48 | (ushort)(sVar48 >= sVar102) * sVar102
        ;
        sVar49 = (short)((ulong)uVar3 >> 0x30);
        sVar103 = (short)((ulong)uVar7 >> 0x30);
        auVar262._6_2_ = (ushort)(sVar49 < sVar103) * sVar49 | (ushort)(sVar49 >= sVar103) * sVar103
        ;
        sVar51 = (short)uVar2;
        sVar104 = (short)uVar6;
        auVar262._8_2_ = (ushort)(sVar51 < sVar104) * sVar51 | (ushort)(sVar51 >= sVar104) * sVar104
        ;
        sVar52 = (short)((ulong)uVar2 >> 0x10);
        sVar105 = (short)((ulong)uVar6 >> 0x10);
        auVar262._10_2_ =
             (ushort)(sVar52 < sVar105) * sVar52 | (ushort)(sVar52 >= sVar105) * sVar105;
        sVar54 = (short)((ulong)uVar2 >> 0x20);
        sVar106 = (short)((ulong)uVar6 >> 0x20);
        sVar107 = (short)((ulong)uVar6 >> 0x30);
        auVar262._12_2_ =
             (ushort)(sVar54 < sVar106) * sVar54 | (ushort)(sVar54 >= sVar106) * sVar106;
        sVar55 = (short)((ulong)uVar2 >> 0x30);
        auVar262._14_2_ =
             (ushort)(sVar55 < sVar107) * sVar55 | (ushort)(sVar55 >= sVar107) * sVar107;
        auVar380._0_2_ = sVar31 - sVar341;
        auVar380._2_2_ = sVar33 - sVar355;
        auVar380._4_2_ = sVar48 - sVar357;
        auVar380._6_2_ = sVar49 - sVar359;
        auVar380._8_2_ = sVar51 - sVar362;
        auVar380._10_2_ = sVar52 - sVar365;
        auVar380._12_2_ = sVar54 - sVar368;
        auVar380._14_2_ = sVar55 - sVar371;
        bVar192 = (byte)uVar9;
        auVar452[0] = (bVar270 < bVar192) * bVar192 | (bVar270 >= bVar192) * bVar270;
        bVar192 = (byte)((ulong)uVar9 >> 8);
        auVar452[1] = (bVar271 < bVar192) * bVar192 | (bVar271 >= bVar192) * bVar271;
        bVar192 = (byte)((ulong)uVar9 >> 0x10);
        auVar452[2] = (bVar272 < bVar192) * bVar192 | (bVar272 >= bVar192) * bVar272;
        bVar192 = (byte)((ulong)uVar9 >> 0x18);
        auVar452[3] = (bVar273 < bVar192) * bVar192 | (bVar273 >= bVar192) * bVar273;
        bVar192 = (byte)((ulong)uVar9 >> 0x20);
        auVar452[4] = (bVar274 < bVar192) * bVar192 | (bVar274 >= bVar192) * bVar274;
        bVar192 = (byte)((ulong)uVar9 >> 0x28);
        auVar452[5] = (bVar275 < bVar192) * bVar192 | (bVar275 >= bVar192) * bVar275;
        bVar192 = (byte)((ulong)uVar9 >> 0x30);
        auVar452[6] = (bVar276 < bVar192) * bVar192 | (bVar276 >= bVar192) * bVar276;
        bVar192 = (byte)((ulong)uVar9 >> 0x38);
        auVar452[7] = (bVar164 < bVar192) * bVar192 | (bVar164 >= bVar192) * bVar164;
        bVar192 = (byte)uVar8;
        auVar452[8] = (bVar166 < bVar192) * bVar192 | (bVar166 >= bVar192) * bVar166;
        bVar192 = (byte)((ulong)uVar8 >> 8);
        auVar452[9] = (bVar171 < bVar192) * bVar192 | (bVar171 >= bVar192) * bVar171;
        bVar192 = (byte)((ulong)uVar8 >> 0x10);
        auVar452[10] = (bVar173 < bVar192) * bVar192 | (bVar173 >= bVar192) * bVar173;
        bVar192 = (byte)((ulong)uVar8 >> 0x18);
        auVar452[0xb] = (bVar178 < bVar192) * bVar192 | (bVar178 >= bVar192) * bVar178;
        bVar192 = (byte)((ulong)uVar8 >> 0x20);
        auVar452[0xc] = (bVar180 < bVar192) * bVar192 | (bVar180 >= bVar192) * bVar180;
        bVar192 = (byte)((ulong)uVar8 >> 0x28);
        auVar452[0xd] = (bVar185 < bVar192) * bVar192 | (bVar185 >= bVar192) * bVar185;
        bVar192 = (byte)((ulong)uVar8 >> 0x30);
        auVar452[0xe] = (bVar187 < bVar192) * bVar192 | (bVar187 >= bVar192) * bVar187;
        bVar192 = (byte)((ulong)uVar8 >> 0x38);
        auVar452[0xf] = (bVar250 < bVar192) * bVar192 | (bVar250 >= bVar192) * bVar250;
        sVar31 = (short)uVar5;
        sVar75 = (short)uVar9;
        auVar121._0_2_ = (ushort)(sVar31 < sVar75) * sVar31 | (ushort)(sVar31 >= sVar75) * sVar75;
        sVar33 = (short)((ulong)uVar5 >> 0x10);
        sVar76 = (short)((ulong)uVar9 >> 0x10);
        auVar121._2_2_ = (ushort)(sVar33 < sVar76) * sVar33 | (ushort)(sVar33 >= sVar76) * sVar76;
        sVar48 = (short)((ulong)uVar5 >> 0x20);
        sVar94 = (short)((ulong)uVar9 >> 0x20);
        auVar121._4_2_ = (ushort)(sVar48 < sVar94) * sVar48 | (ushort)(sVar48 >= sVar94) * sVar94;
        sVar49 = (short)((ulong)uVar5 >> 0x30);
        sVar95 = (short)((ulong)uVar9 >> 0x30);
        auVar121._6_2_ = (ushort)(sVar49 < sVar95) * sVar49 | (ushort)(sVar49 >= sVar95) * sVar95;
        sVar51 = (short)uVar4;
        sVar96 = (short)uVar8;
        auVar121._8_2_ = (ushort)(sVar51 < sVar96) * sVar51 | (ushort)(sVar51 >= sVar96) * sVar96;
        sVar52 = (short)((ulong)uVar4 >> 0x10);
        sVar97 = (short)((ulong)uVar8 >> 0x10);
        auVar121._10_2_ = (ushort)(sVar52 < sVar97) * sVar52 | (ushort)(sVar52 >= sVar97) * sVar97;
        sVar54 = (short)((ulong)uVar4 >> 0x20);
        sVar98 = (short)((ulong)uVar8 >> 0x20);
        sVar99 = (short)((ulong)uVar8 >> 0x30);
        auVar121._12_2_ = (ushort)(sVar54 < sVar98) * sVar54 | (ushort)(sVar54 >= sVar98) * sVar98;
        sVar55 = (short)((ulong)uVar4 >> 0x30);
        auVar121._14_2_ = (ushort)(sVar55 < sVar99) * sVar55 | (ushort)(sVar55 >= sVar99) * sVar99;
        auVar350._0_2_ = sVar31 - sVar415;
        auVar350._2_2_ = sVar33 - sVar340;
        auVar350._4_2_ = sVar48 - sVar423;
        auVar350._6_2_ = sVar49 - sVar354;
        auVar350._8_2_ = sVar51 - sVar424;
        auVar350._10_2_ = sVar52 - sVar356;
        auVar350._12_2_ = sVar54 - sVar425;
        auVar350._14_2_ = sVar55 - sVar358;
        auVar46 = pabsw(auVar387,auVar380);
        uVar47 = auVar46._0_2_;
        auVar419._0_2_ = uVar47 >> local_1c8;
        uVar448 = auVar46._2_2_;
        auVar419._2_2_ = uVar448 >> local_1c8;
        uVar65 = auVar46._4_2_;
        auVar419._4_2_ = uVar65 >> local_1c8;
        uVar455 = auVar46._6_2_;
        auVar419._6_2_ = uVar455 >> local_1c8;
        uVar461 = auVar46._8_2_;
        auVar419._8_2_ = uVar461 >> local_1c8;
        uVar57 = auVar46._10_2_;
        auVar419._10_2_ = uVar57 >> local_1c8;
        uVar63 = auVar46._12_2_;
        uVar64 = auVar46._14_2_;
        auVar419._12_2_ = uVar63 >> local_1c8;
        auVar419._14_2_ = uVar64 >> local_1c8;
        auVar46 = pabsw(auVar121,auVar350);
        uVar66 = auVar46._0_2_;
        auVar447._0_2_ = uVar66 >> local_1c8;
        uVar67 = auVar46._2_2_;
        auVar447._2_2_ = uVar67 >> local_1c8;
        uVar69 = auVar46._4_2_;
        auVar447._4_2_ = uVar69 >> local_1c8;
        uVar247 = auVar46._6_2_;
        auVar447._6_2_ = uVar247 >> local_1c8;
        uVar146 = auVar46._8_2_;
        auVar447._8_2_ = uVar146 >> local_1c8;
        uVar160 = auVar46._10_2_;
        auVar447._10_2_ = uVar160 >> local_1c8;
        uVar174 = auVar46._12_2_;
        uVar190 = auVar46._14_2_;
        auVar447._12_2_ = uVar174 >> local_1c8;
        auVar447._14_2_ = uVar190 >> local_1c8;
        auVar46 = psubusw(local_e8,auVar419);
        auVar85 = psubusw(local_e8,auVar447);
        sVar31 = auVar46._0_2_;
        sVar33 = auVar46._2_2_;
        sVar48 = auVar46._4_2_;
        sVar49 = auVar46._6_2_;
        sVar51 = auVar46._8_2_;
        sVar52 = auVar46._10_2_;
        sVar54 = auVar46._12_2_;
        sVar55 = auVar46._14_2_;
        sVar215 = auVar85._0_2_;
        sVar236 = auVar85._2_2_;
        sVar238 = auVar85._4_2_;
        sVar240 = auVar85._6_2_;
        sVar242 = auVar85._8_2_;
        sVar244 = auVar85._10_2_;
        sVar246 = auVar85._12_2_;
        sVar249 = auVar85._14_2_;
        auVar46 = psraw(auVar380,0xf);
        auVar252._0_2_ =
             (((short)uVar47 < sVar31) * uVar47 | (ushort)((short)uVar47 >= sVar31) * sVar31) +
             auVar46._0_2_;
        auVar252._2_2_ =
             (((short)uVar448 < sVar33) * uVar448 | (ushort)((short)uVar448 >= sVar33) * sVar33) +
             auVar46._2_2_;
        auVar252._4_2_ =
             (((short)uVar65 < sVar48) * uVar65 | (ushort)((short)uVar65 >= sVar48) * sVar48) +
             auVar46._4_2_;
        auVar252._6_2_ =
             (((short)uVar455 < sVar49) * uVar455 | (ushort)((short)uVar455 >= sVar49) * sVar49) +
             auVar46._6_2_;
        auVar252._8_2_ =
             (((short)uVar461 < sVar51) * uVar461 | (ushort)((short)uVar461 >= sVar51) * sVar51) +
             auVar46._8_2_;
        auVar252._10_2_ =
             (((short)uVar57 < sVar52) * uVar57 | (ushort)((short)uVar57 >= sVar52) * sVar52) +
             auVar46._10_2_;
        auVar252._12_2_ =
             (((short)uVar63 < sVar54) * uVar63 | (ushort)((short)uVar63 >= sVar54) * sVar54) +
             auVar46._12_2_;
        auVar252._14_2_ =
             (((short)uVar64 < sVar55) * uVar64 | (ushort)((short)uVar64 >= sVar55) * sVar55) +
             auVar46._14_2_;
        auVar252 = auVar252 ^ auVar46;
        auVar46 = psraw(auVar350,0xf);
        auVar92._0_2_ =
             (((short)uVar66 < sVar215) * uVar66 | (ushort)((short)uVar66 >= sVar215) * sVar215) +
             auVar46._0_2_;
        auVar92._2_2_ =
             (((short)uVar67 < sVar236) * uVar67 | (ushort)((short)uVar67 >= sVar236) * sVar236) +
             auVar46._2_2_;
        auVar92._4_2_ =
             (((short)uVar69 < sVar238) * uVar69 | (ushort)((short)uVar69 >= sVar238) * sVar238) +
             auVar46._4_2_;
        auVar92._6_2_ =
             (((short)uVar247 < sVar240) * uVar247 | (ushort)((short)uVar247 >= sVar240) * sVar240)
             + auVar46._6_2_;
        auVar92._8_2_ =
             (((short)uVar146 < sVar242) * uVar146 | (ushort)((short)uVar146 >= sVar242) * sVar242)
             + auVar46._8_2_;
        auVar92._10_2_ =
             (((short)uVar160 < sVar244) * uVar160 | (ushort)((short)uVar160 >= sVar244) * sVar244)
             + auVar46._10_2_;
        auVar92._12_2_ =
             (((short)uVar174 < sVar246) * uVar174 | (ushort)((short)uVar174 >= sVar246) * sVar246)
             + auVar46._12_2_;
        auVar92._14_2_ =
             (((short)uVar190 < sVar249) * uVar190 | (ushort)((short)uVar190 >= sVar249) * sVar249)
             + auVar46._14_2_;
        auVar92 = auVar92 ^ auVar46;
        auVar206._0_2_ = sVar100 - sVar341;
        auVar206._2_2_ = sVar101 - sVar355;
        auVar206._4_2_ = sVar102 - sVar357;
        auVar206._6_2_ = sVar103 - sVar359;
        auVar206._8_2_ = sVar104 - sVar362;
        auVar206._10_2_ = sVar105 - sVar365;
        auVar206._12_2_ = sVar106 - sVar368;
        auVar206._14_2_ = sVar107 - sVar371;
        auVar46 = pabsw(auVar262,auVar206);
        uVar47 = auVar46._0_2_;
        auVar381._0_2_ = uVar47 >> local_1c8;
        uVar448 = auVar46._2_2_;
        auVar381._2_2_ = uVar448 >> local_1c8;
        uVar65 = auVar46._4_2_;
        auVar381._4_2_ = uVar65 >> local_1c8;
        uVar455 = auVar46._6_2_;
        auVar381._6_2_ = uVar455 >> local_1c8;
        uVar461 = auVar46._8_2_;
        auVar381._8_2_ = uVar461 >> local_1c8;
        uVar57 = auVar46._10_2_;
        auVar381._10_2_ = uVar57 >> local_1c8;
        uVar63 = auVar46._12_2_;
        uVar64 = auVar46._14_2_;
        auVar381._12_2_ = uVar63 >> local_1c8;
        auVar381._14_2_ = uVar64 >> local_1c8;
        auVar46 = psubusw(local_e8,auVar381);
        auVar141._0_2_ = sVar75 - sVar415;
        auVar141._2_2_ = sVar76 - sVar340;
        auVar141._4_2_ = sVar94 - sVar423;
        auVar141._6_2_ = sVar95 - sVar354;
        auVar141._8_2_ = sVar96 - sVar424;
        auVar141._10_2_ = sVar97 - sVar356;
        auVar141._12_2_ = sVar98 - sVar425;
        auVar141._14_2_ = sVar99 - sVar358;
        auVar85 = pabsw(auVar381,auVar141);
        uVar66 = auVar85._0_2_;
        auVar388._0_2_ = uVar66 >> local_1c8;
        uVar67 = auVar85._2_2_;
        auVar388._2_2_ = uVar67 >> local_1c8;
        uVar69 = auVar85._4_2_;
        auVar388._4_2_ = uVar69 >> local_1c8;
        uVar247 = auVar85._6_2_;
        auVar388._6_2_ = uVar247 >> local_1c8;
        uVar146 = auVar85._8_2_;
        auVar388._8_2_ = uVar146 >> local_1c8;
        uVar160 = auVar85._10_2_;
        auVar388._10_2_ = uVar160 >> local_1c8;
        uVar174 = auVar85._12_2_;
        uVar190 = auVar85._14_2_;
        auVar388._12_2_ = uVar174 >> local_1c8;
        auVar388._14_2_ = uVar190 >> local_1c8;
        auVar85 = psubusw(local_e8,auVar388);
        sVar31 = auVar46._0_2_;
        sVar33 = auVar46._2_2_;
        sVar48 = auVar46._4_2_;
        sVar49 = auVar46._6_2_;
        sVar51 = auVar46._8_2_;
        sVar52 = auVar46._10_2_;
        sVar54 = auVar46._12_2_;
        sVar55 = auVar46._14_2_;
        sVar215 = auVar85._0_2_;
        sVar236 = auVar85._2_2_;
        sVar238 = auVar85._4_2_;
        sVar240 = auVar85._6_2_;
        sVar242 = auVar85._8_2_;
        sVar244 = auVar85._10_2_;
        sVar246 = auVar85._12_2_;
        sVar249 = auVar85._14_2_;
        auVar46 = psraw(auVar206,0xf);
        auVar351._0_2_ =
             (((short)uVar47 < sVar31) * uVar47 | (ushort)((short)uVar47 >= sVar31) * sVar31) +
             auVar46._0_2_;
        auVar351._2_2_ =
             (((short)uVar448 < sVar33) * uVar448 | (ushort)((short)uVar448 >= sVar33) * sVar33) +
             auVar46._2_2_;
        auVar351._4_2_ =
             (((short)uVar65 < sVar48) * uVar65 | (ushort)((short)uVar65 >= sVar48) * sVar48) +
             auVar46._4_2_;
        auVar351._6_2_ =
             (((short)uVar455 < sVar49) * uVar455 | (ushort)((short)uVar455 >= sVar49) * sVar49) +
             auVar46._6_2_;
        auVar351._8_2_ =
             (((short)uVar461 < sVar51) * uVar461 | (ushort)((short)uVar461 >= sVar51) * sVar51) +
             auVar46._8_2_;
        auVar351._10_2_ =
             (((short)uVar57 < sVar52) * uVar57 | (ushort)((short)uVar57 >= sVar52) * sVar52) +
             auVar46._10_2_;
        auVar351._12_2_ =
             (((short)uVar63 < sVar54) * uVar63 | (ushort)((short)uVar63 >= sVar54) * sVar54) +
             auVar46._12_2_;
        auVar351._14_2_ =
             (((short)uVar64 < sVar55) * uVar64 | (ushort)((short)uVar64 >= sVar55) * sVar55) +
             auVar46._14_2_;
        auVar351 = auVar351 ^ auVar46;
        auVar46 = psraw(auVar141,0xf);
        auVar420._0_2_ =
             (((short)uVar66 < sVar215) * uVar66 | (ushort)((short)uVar66 >= sVar215) * sVar215) +
             auVar46._0_2_;
        auVar420._2_2_ =
             (((short)uVar67 < sVar236) * uVar67 | (ushort)((short)uVar67 >= sVar236) * sVar236) +
             auVar46._2_2_;
        auVar420._4_2_ =
             (((short)uVar69 < sVar238) * uVar69 | (ushort)((short)uVar69 >= sVar238) * sVar238) +
             auVar46._4_2_;
        auVar420._6_2_ =
             (((short)uVar247 < sVar240) * uVar247 | (ushort)((short)uVar247 >= sVar240) * sVar240)
             + auVar46._6_2_;
        auVar420._8_2_ =
             (((short)uVar146 < sVar242) * uVar146 | (ushort)((short)uVar146 >= sVar242) * sVar242)
             + auVar46._8_2_;
        auVar420._10_2_ =
             (((short)uVar160 < sVar244) * uVar160 | (ushort)((short)uVar160 >= sVar244) * sVar244)
             + auVar46._10_2_;
        auVar420._12_2_ =
             (((short)uVar174 < sVar246) * uVar174 | (ushort)((short)uVar174 >= sVar246) * sVar246)
             + auVar46._12_2_;
        auVar420._14_2_ =
             (((short)uVar190 < sVar249) * uVar190 | (ushort)((short)uVar190 >= sVar249) * sVar249)
             + auVar46._14_2_;
        auVar420 = auVar420 ^ auVar46;
        local_d8 = auVar37._0_2_;
        sStack_d6 = auVar37._2_2_;
        auVar352._0_2_ =
             (auVar351._0_2_ + auVar252._0_2_ + auVar289._0_2_ + auVar205._0_2_) * local_d8 +
             (auVar433._0_2_ + auVar129._0_2_ + auVar386._0_2_ + auVar137._0_2_) * local_c8 +
             (auVar446._0_2_ + local_108._0_2_) * sStack_b4 +
             (auVar417._0_2_ + auVar115._0_2_) * local_a8;
        auVar352._2_2_ =
             (auVar351._2_2_ + auVar252._2_2_ + auVar289._2_2_ + auVar205._2_2_) * sStack_d6 +
             (auVar433._2_2_ + auVar129._2_2_ + auVar386._2_2_ + auVar137._2_2_) * sStack_c6 +
             (auVar446._2_2_ + local_108._2_2_) * sStack_b2 +
             (auVar417._2_2_ + auVar115._2_2_) * sStack_a6;
        auVar352._4_2_ =
             (auVar351._4_2_ + auVar252._4_2_ + auVar289._4_2_ + auVar205._4_2_) * local_d8 +
             (auVar433._4_2_ + auVar129._4_2_ + auVar386._4_2_ + auVar137._4_2_) * local_c8 +
             (auVar446._4_2_ + local_108._4_2_) * sStack_b4 +
             (auVar417._4_2_ + auVar115._4_2_) * local_a8;
        auVar352._6_2_ =
             (auVar351._6_2_ + auVar252._6_2_ + auVar289._6_2_ + auVar205._6_2_) * sStack_d6 +
             (auVar433._6_2_ + auVar129._6_2_ + auVar386._6_2_ + auVar137._6_2_) * sStack_c6 +
             (auVar446._6_2_ + local_108._6_2_) * sStack_b2 +
             (auVar417._6_2_ + auVar115._6_2_) * sStack_a6;
        auVar352._8_2_ =
             (auVar351._8_2_ + auVar252._8_2_ + auVar289._8_2_ + auVar205._8_2_) * local_d8 +
             (auVar433._8_2_ + auVar129._8_2_ + auVar386._8_2_ + auVar137._8_2_) * local_c8 +
             (auVar446._8_2_ + local_108._8_2_) * sStack_b4 +
             (auVar417._8_2_ + auVar115._8_2_) * local_a8;
        auVar352._10_2_ =
             (auVar351._10_2_ + auVar252._10_2_ + auVar289._10_2_ + auVar205._10_2_) * sStack_d6 +
             (auVar433._10_2_ + auVar129._10_2_ + auVar386._10_2_ + auVar137._10_2_) * sStack_c6 +
             (auVar446._10_2_ + local_108._10_2_) * sStack_b2 +
             (auVar417._10_2_ + auVar115._10_2_) * sStack_a6;
        auVar352._12_2_ =
             (auVar351._12_2_ + auVar252._12_2_ + auVar289._12_2_ + auVar205._12_2_) * local_d8 +
             (auVar433._12_2_ + auVar129._12_2_ + auVar386._12_2_ + auVar137._12_2_) * local_c8 +
             (auVar446._12_2_ + local_108._12_2_) * sStack_b4 +
             (auVar417._12_2_ + auVar115._12_2_) * local_a8;
        auVar352._14_2_ =
             (auVar351._14_2_ + auVar252._14_2_ + auVar289._14_2_ + auVar205._14_2_) * sStack_d6 +
             (auVar433._14_2_ + auVar129._14_2_ + auVar386._14_2_ + auVar137._14_2_) * sStack_c6 +
             (auVar446._14_2_ + local_108._14_2_) * sStack_b2 +
             (auVar417._14_2_ + auVar115._14_2_) * sStack_a6;
        auVar421._0_2_ =
             (auVar420._0_2_ + auVar92._0_2_ + auVar234._0_2_ + auVar140._0_2_) * local_d8 +
             (auVar324._0_2_ + auVar90._0_2_ + auVar378._0_2_ + auVar118._0_2_) * local_c8 +
             (auVar451._0_2_ + local_58) * sStack_b4 + (auVar279._0_2_ + auVar384._0_2_) * local_a8;
        auVar421._2_2_ =
             (auVar420._2_2_ + auVar92._2_2_ + auVar234._2_2_ + auVar140._2_2_) * sStack_d6 +
             (auVar324._2_2_ + auVar90._2_2_ + auVar378._2_2_ + auVar118._2_2_) * sStack_c6 +
             (auVar451._2_2_ + sStack_56) * sStack_b2 +
             (auVar279._2_2_ + auVar384._2_2_) * sStack_a6;
        auVar421._4_2_ =
             (auVar420._4_2_ + auVar92._4_2_ + auVar234._4_2_ + auVar140._4_2_) * local_d8 +
             (auVar324._4_2_ + auVar90._4_2_ + auVar378._4_2_ + auVar118._4_2_) * local_c8 +
             (auVar451._4_2_ + sStack_54) * sStack_b4 + (auVar279._4_2_ + auVar384._4_2_) * local_a8
        ;
        auVar421._6_2_ =
             (auVar420._6_2_ + auVar92._6_2_ + auVar234._6_2_ + auVar140._6_2_) * sStack_d6 +
             (auVar324._6_2_ + auVar90._6_2_ + auVar378._6_2_ + auVar118._6_2_) * sStack_c6 +
             (auVar451._6_2_ + sStack_52) * sStack_b2 +
             (auVar279._6_2_ + auVar384._6_2_) * sStack_a6;
        auVar421._8_2_ =
             (auVar420._8_2_ + auVar92._8_2_ + auVar234._8_2_ + auVar140._8_2_) * local_d8 +
             (auVar324._8_2_ + auVar90._8_2_ + auVar378._8_2_ + auVar118._8_2_) * local_c8 +
             (auVar451._8_2_ + sStack_50) * sStack_b4 + (auVar279._8_2_ + auVar384._8_2_) * local_a8
        ;
        auVar421._10_2_ =
             (auVar420._10_2_ + auVar92._10_2_ + auVar234._10_2_ + auVar140._10_2_) * sStack_d6 +
             (auVar324._10_2_ + auVar90._10_2_ + auVar378._10_2_ + auVar118._10_2_) * sStack_c6 +
             (auVar451._10_2_ + sStack_4e) * sStack_b2 +
             (auVar279._10_2_ + auVar384._10_2_) * sStack_a6;
        auVar421._12_2_ =
             (auVar420._12_2_ + auVar92._12_2_ + auVar234._12_2_ + auVar140._12_2_) * local_d8 +
             (auVar324._12_2_ + auVar90._12_2_ + auVar378._12_2_ + auVar118._12_2_) * local_c8 +
             (auVar451._12_2_ + sStack_4c) * sStack_b4 +
             (auVar279._12_2_ + auVar384._12_2_) * local_a8;
        auVar421._14_2_ =
             (auVar420._14_2_ + auVar92._14_2_ + auVar234._14_2_ + auVar140._14_2_) * sStack_d6 +
             (auVar324._14_2_ + auVar90._14_2_ + auVar378._14_2_ + auVar118._14_2_) * sStack_c6 +
             (auVar451._14_2_ + sStack_4a) * sStack_b2 +
             (auVar279._14_2_ + auVar384._14_2_) * sStack_a6;
        local_148 = local_148 & _DAT_00566860;
        sVar31 = local_148._0_2_;
        uVar47 = (ushort)(sVar31 < sVar341) * sVar341 | (ushort)(sVar31 >= sVar341) * sVar31;
        sVar31 = local_148._2_2_;
        uVar448 = (ushort)(sVar31 < sVar355) * sVar355 | (ushort)(sVar31 >= sVar355) * sVar31;
        sVar31 = local_148._4_2_;
        uVar65 = (ushort)(sVar31 < sVar357) * sVar357 | (ushort)(sVar31 >= sVar357) * sVar31;
        sVar31 = local_148._6_2_;
        uVar455 = (ushort)(sVar31 < sVar359) * sVar359 | (ushort)(sVar31 >= sVar359) * sVar31;
        sVar31 = local_148._8_2_;
        uVar461 = (ushort)(sVar31 < sVar362) * sVar362 | (ushort)(sVar31 >= sVar362) * sVar31;
        sVar31 = local_148._10_2_;
        uVar57 = (ushort)(sVar31 < sVar365) * sVar365 | (ushort)(sVar31 >= sVar365) * sVar31;
        sVar31 = local_148._12_2_;
        sVar33 = local_148._14_2_;
        uVar63 = (ushort)(sVar31 < sVar368) * sVar368 | (ushort)(sVar31 >= sVar368) * sVar31;
        uVar64 = (ushort)(sVar33 < sVar371) * sVar371 | (ushort)(sVar33 >= sVar371) * sVar33;
        local_1a8 = local_1a8 & _DAT_00566860;
        sVar31 = local_1a8._0_2_;
        in_XMM5._0_2_ =
             (sVar31 < (short)uVar47) * uVar47 | (ushort)(sVar31 >= (short)uVar47) * sVar31;
        sVar31 = local_1a8._2_2_;
        in_XMM5._2_2_ =
             (sVar31 < (short)uVar448) * uVar448 | (ushort)(sVar31 >= (short)uVar448) * sVar31;
        sVar31 = local_1a8._4_2_;
        in_XMM5._4_2_ =
             (sVar31 < (short)uVar65) * uVar65 | (ushort)(sVar31 >= (short)uVar65) * sVar31;
        sVar31 = local_1a8._6_2_;
        in_XMM5._6_2_ =
             (sVar31 < (short)uVar455) * uVar455 | (ushort)(sVar31 >= (short)uVar455) * sVar31;
        sVar31 = local_1a8._8_2_;
        in_XMM5._8_2_ =
             (sVar31 < (short)uVar461) * uVar461 | (ushort)(sVar31 >= (short)uVar461) * sVar31;
        sVar31 = local_1a8._10_2_;
        in_XMM5._10_2_ =
             (sVar31 < (short)uVar57) * uVar57 | (ushort)(sVar31 >= (short)uVar57) * sVar31;
        sVar31 = local_1a8._12_2_;
        sVar33 = local_1a8._14_2_;
        in_XMM5._12_2_ =
             (sVar31 < (short)uVar63) * uVar63 | (ushort)(sVar31 >= (short)uVar63) * sVar31;
        in_XMM5._14_2_ =
             (sVar33 < (short)uVar64) * uVar64 | (ushort)(sVar33 >= (short)uVar64) * sVar33;
        local_198 = local_198 & _DAT_00566860;
        sVar31 = local_198._0_2_;
        uVar47 = (ushort)(sVar31 < sVar415) * sVar415 | (ushort)(sVar31 >= sVar415) * sVar31;
        sVar31 = local_198._2_2_;
        uVar448 = (ushort)(sVar31 < sVar340) * sVar340 | (ushort)(sVar31 >= sVar340) * sVar31;
        sVar31 = local_198._4_2_;
        uVar65 = (ushort)(sVar31 < sVar423) * sVar423 | (ushort)(sVar31 >= sVar423) * sVar31;
        sVar31 = local_198._6_2_;
        uVar455 = (ushort)(sVar31 < sVar354) * sVar354 | (ushort)(sVar31 >= sVar354) * sVar31;
        sVar31 = local_198._8_2_;
        uVar461 = (ushort)(sVar31 < sVar424) * sVar424 | (ushort)(sVar31 >= sVar424) * sVar31;
        sVar31 = local_198._10_2_;
        uVar57 = (ushort)(sVar31 < sVar356) * sVar356 | (ushort)(sVar31 >= sVar356) * sVar31;
        sVar31 = local_198._12_2_;
        sVar33 = local_198._14_2_;
        uVar63 = (ushort)(sVar31 < sVar425) * sVar425 | (ushort)(sVar31 >= sVar425) * sVar31;
        uVar64 = (ushort)(sVar33 < sVar358) * sVar358 | (ushort)(sVar33 >= sVar358) * sVar33;
        auVar452 = auVar452 & _DAT_00566860;
        sVar31 = auVar452._0_2_;
        uVar247 = (sVar31 < (short)uVar47) * uVar47 | (ushort)(sVar31 >= (short)uVar47) * sVar31;
        sVar31 = auVar452._2_2_;
        uVar146 = (sVar31 < (short)uVar448) * uVar448 | (ushort)(sVar31 >= (short)uVar448) * sVar31;
        sVar31 = auVar452._4_2_;
        uVar160 = (sVar31 < (short)uVar65) * uVar65 | (ushort)(sVar31 >= (short)uVar65) * sVar31;
        sVar31 = auVar452._6_2_;
        uVar174 = (sVar31 < (short)uVar455) * uVar455 | (ushort)(sVar31 >= (short)uVar455) * sVar31;
        sVar31 = auVar452._8_2_;
        uVar190 = (sVar31 < (short)uVar461) * uVar461 | (ushort)(sVar31 >= (short)uVar461) * sVar31;
        sVar31 = auVar452._10_2_;
        uVar214 = (sVar31 < (short)uVar57) * uVar57 | (ushort)(sVar31 >= (short)uVar57) * sVar31;
        sVar31 = auVar452._12_2_;
        sVar33 = auVar452._14_2_;
        uVar235 = (sVar31 < (short)uVar63) * uVar63 | (ushort)(sVar31 >= (short)uVar63) * sVar31;
        uVar237 = (sVar33 < (short)uVar64) * uVar64 | (ushort)(sVar33 >= (short)uVar64) * sVar33;
        uVar47 = ((short)auVar127._0_2_ < (short)uVar248) * auVar127._0_2_ |
                 ((short)auVar127._0_2_ >= (short)uVar248) * uVar248;
        uVar448 = ((short)auVar127._2_2_ < (short)uVar383) * auVar127._2_2_ |
                  ((short)auVar127._2_2_ >= (short)uVar383) * uVar383;
        uVar65 = ((short)auVar127._4_2_ < (short)uVar391) * auVar127._4_2_ |
                 ((short)auVar127._4_2_ >= (short)uVar391) * uVar391;
        uVar455 = ((short)auVar127._6_2_ < (short)uVar394) * auVar127._6_2_ |
                  ((short)auVar127._6_2_ >= (short)uVar394) * uVar394;
        uVar461 = ((short)auVar127._8_2_ < (short)uVar397) * auVar127._8_2_ |
                  ((short)auVar127._8_2_ >= (short)uVar397) * uVar397;
        uVar57 = ((short)auVar127._10_2_ < (short)uVar400) * auVar127._10_2_ |
                 ((short)auVar127._10_2_ >= (short)uVar400) * uVar400;
        uVar63 = ((short)auVar127._12_2_ < (short)uVar404) * auVar127._12_2_ |
                 ((short)auVar127._12_2_ >= (short)uVar404) * uVar404;
        uVar64 = ((short)auVar127._14_2_ < (short)uVar408) * auVar127._14_2_ |
                 ((short)auVar127._14_2_ >= (short)uVar408) * uVar408;
        auVar93._0_2_ =
             ((short)uVar73 < (short)auVar322._0_2_) * uVar73 |
             ((short)uVar73 >= (short)auVar322._0_2_) * auVar322._0_2_;
        auVar93._2_2_ =
             ((short)uVar71 < (short)auVar322._2_2_) * uVar71 |
             ((short)uVar71 >= (short)auVar322._2_2_) * auVar322._2_2_;
        auVar93._4_2_ =
             ((short)uVar72 < (short)auVar322._4_2_) * uVar72 |
             ((short)uVar72 >= (short)auVar322._4_2_) * auVar322._4_2_;
        auVar93._6_2_ =
             ((short)uVar74 < (short)auVar322._6_2_) * uVar74 |
             ((short)uVar74 >= (short)auVar322._6_2_) * auVar322._6_2_;
        auVar93._8_2_ =
             ((short)uVar124 < (short)auVar322._8_2_) * uVar124 |
             ((short)uVar124 >= (short)auVar322._8_2_) * auVar322._8_2_;
        auVar93._10_2_ =
             ((short)uVar153 < (short)auVar322._10_2_) * uVar153 |
             ((short)uVar153 >= (short)auVar322._10_2_) * auVar322._10_2_;
        auVar93._12_2_ =
             ((short)uVar167 < (short)auVar322._12_2_) * uVar167 |
             ((short)uVar167 >= (short)auVar322._12_2_) * auVar322._12_2_;
        auVar93._14_2_ =
             ((short)uVar182 < (short)auVar322._14_2_) * uVar182 |
             ((short)uVar182 >= (short)auVar322._14_2_) * auVar322._14_2_;
        uVar66 = ((short)uVar47 < (short)uVar32) * uVar47 |
                 ((short)uVar47 >= (short)uVar32) * uVar32;
        uVar67 = ((short)uVar448 < (short)uVar53) * uVar448 |
                 ((short)uVar448 >= (short)uVar53) * uVar53;
        uVar69 = ((short)uVar65 < (short)uVar60) * uVar65 |
                 ((short)uVar65 >= (short)uVar60) * uVar60;
        uVar70 = ((short)uVar455 < (short)uVar70) * uVar455 |
                 ((short)uVar455 >= (short)uVar70) * uVar70;
        uVar455 = ((short)uVar461 < (short)uVar459) * uVar461 |
                  ((short)uVar461 >= (short)uVar459) * uVar459;
        uVar459 = ((short)uVar57 < (short)uVar465) * uVar57 |
                  ((short)uVar57 >= (short)uVar465) * uVar465;
        uVar461 = ((short)uVar63 < (short)uVar59) * uVar63 |
                  ((short)uVar63 >= (short)uVar59) * uVar59;
        uVar465 = ((short)uVar64 < (short)uVar62) * uVar64 |
                  ((short)uVar64 >= (short)uVar62) * uVar62;
        uVar32 = ((short)auVar93._0_2_ < (short)uVar50) * auVar93._0_2_ |
                 ((short)auVar93._0_2_ >= (short)uVar50) * uVar50;
        uVar47 = ((short)auVar93._2_2_ < (short)uVar56) * auVar93._2_2_ |
                 ((short)auVar93._2_2_ >= (short)uVar56) * uVar56;
        uVar50 = ((short)auVar93._4_2_ < (short)uVar453) * auVar93._4_2_ |
                 ((short)auVar93._4_2_ >= (short)uVar453) * uVar453;
        uVar53 = ((short)auVar93._6_2_ < (short)uVar457) * auVar93._6_2_ |
                 ((short)auVar93._6_2_ >= (short)uVar457) * uVar457;
        uVar448 = ((short)auVar93._8_2_ < (short)uVar463) * auVar93._8_2_ |
                  ((short)auVar93._8_2_ >= (short)uVar463) * uVar463;
        uVar56 = ((short)auVar93._10_2_ < (short)uVar58) * auVar93._10_2_ |
                 ((short)auVar93._10_2_ >= (short)uVar58) * uVar58;
        uVar60 = ((short)auVar93._12_2_ < (short)uVar61) * auVar93._12_2_ |
                 ((short)auVar93._12_2_ >= (short)uVar61) * uVar61;
        uVar65 = ((short)auVar93._14_2_ < (short)uVar68) * auVar93._14_2_ |
                 ((short)auVar93._14_2_ >= (short)uVar68) * uVar68;
        uVar453 = ((short)uVar66 < (short)auVar262._0_2_) * uVar66 |
                  ((short)uVar66 >= (short)auVar262._0_2_) * auVar262._0_2_;
        uVar457 = ((short)uVar67 < (short)auVar262._2_2_) * uVar67 |
                  ((short)uVar67 >= (short)auVar262._2_2_) * auVar262._2_2_;
        uVar463 = ((short)uVar69 < (short)auVar262._4_2_) * uVar69 |
                  ((short)uVar69 >= (short)auVar262._4_2_) * auVar262._4_2_;
        uVar70 = ((short)uVar70 < (short)auVar262._6_2_) * uVar70 |
                 ((short)uVar70 >= (short)auVar262._6_2_) * auVar262._6_2_;
        uVar455 = ((short)uVar455 < (short)auVar262._8_2_) * uVar455 |
                  ((short)uVar455 >= (short)auVar262._8_2_) * auVar262._8_2_;
        uVar459 = ((short)uVar459 < (short)auVar262._10_2_) * uVar459 |
                  ((short)uVar459 >= (short)auVar262._10_2_) * auVar262._10_2_;
        uVar461 = ((short)uVar461 < (short)auVar262._12_2_) * uVar461 |
                  ((short)uVar461 >= (short)auVar262._12_2_) * auVar262._12_2_;
        uVar465 = ((short)uVar465 < (short)auVar262._14_2_) * uVar465 |
                  ((short)uVar465 >= (short)auVar262._14_2_) * auVar262._14_2_;
        in_XMM4._0_2_ =
             ((short)uVar32 < (short)auVar121._0_2_) * uVar32 |
             ((short)uVar32 >= (short)auVar121._0_2_) * auVar121._0_2_;
        in_XMM4._2_2_ =
             ((short)uVar47 < (short)auVar121._2_2_) * uVar47 |
             ((short)uVar47 >= (short)auVar121._2_2_) * auVar121._2_2_;
        in_XMM4._4_2_ =
             ((short)uVar50 < (short)auVar121._4_2_) * uVar50 |
             ((short)uVar50 >= (short)auVar121._4_2_) * auVar121._4_2_;
        in_XMM4._6_2_ =
             ((short)uVar53 < (short)auVar121._6_2_) * uVar53 |
             ((short)uVar53 >= (short)auVar121._6_2_) * auVar121._6_2_;
        in_XMM4._8_2_ =
             ((short)uVar448 < (short)auVar121._8_2_) * uVar448 |
             ((short)uVar448 >= (short)auVar121._8_2_) * auVar121._8_2_;
        in_XMM4._10_2_ =
             ((short)uVar56 < (short)auVar121._10_2_) * uVar56 |
             ((short)uVar56 >= (short)auVar121._10_2_) * auVar121._10_2_;
        in_XMM4._12_2_ =
             ((short)uVar60 < (short)auVar121._12_2_) * uVar60 |
             ((short)uVar60 >= (short)auVar121._12_2_) * auVar121._12_2_;
        in_XMM4._14_2_ =
             ((short)uVar65 < (short)auVar121._14_2_) * uVar65 |
             ((short)uVar65 >= (short)auVar121._14_2_) * auVar121._14_2_;
        auVar46 = psraw(auVar352,0xf);
        auVar85 = pmovsxbw(auVar93,0x808080808080808);
        auVar353._0_2_ = auVar352._0_2_ + auVar85._0_2_ + auVar46._0_2_;
        auVar353._2_2_ = auVar352._2_2_ + auVar85._2_2_ + auVar46._2_2_;
        auVar353._4_2_ = auVar352._4_2_ + auVar85._4_2_ + auVar46._4_2_;
        auVar353._6_2_ = auVar352._6_2_ + auVar85._6_2_ + auVar46._6_2_;
        auVar353._8_2_ = auVar352._8_2_ + auVar85._8_2_ + auVar46._8_2_;
        auVar353._10_2_ = auVar352._10_2_ + auVar85._10_2_ + auVar46._10_2_;
        auVar353._12_2_ = auVar352._12_2_ + auVar85._12_2_ + auVar46._12_2_;
        auVar353._14_2_ = auVar352._14_2_ + auVar85._14_2_ + auVar46._14_2_;
        auVar46 = psraw(auVar421,0xf);
        auVar422._0_2_ = auVar421._0_2_ + auVar85._0_2_ + auVar46._0_2_;
        auVar422._2_2_ = auVar421._2_2_ + auVar85._2_2_ + auVar46._2_2_;
        auVar422._4_2_ = auVar421._4_2_ + auVar85._4_2_ + auVar46._4_2_;
        auVar422._6_2_ = auVar421._6_2_ + auVar85._6_2_ + auVar46._6_2_;
        auVar422._8_2_ = auVar421._8_2_ + auVar85._8_2_ + auVar46._8_2_;
        auVar422._10_2_ = auVar421._10_2_ + auVar85._10_2_ + auVar46._10_2_;
        auVar422._12_2_ = auVar421._12_2_ + auVar85._12_2_ + auVar46._12_2_;
        auVar422._14_2_ = auVar421._14_2_ + auVar85._14_2_ + auVar46._14_2_;
        auVar46 = psraw(auVar353,4);
        sVar341 = auVar46._0_2_ + sVar341;
        sVar355 = auVar46._2_2_ + sVar355;
        sVar357 = auVar46._4_2_ + sVar357;
        sVar359 = auVar46._6_2_ + sVar359;
        sVar362 = auVar46._8_2_ + sVar362;
        sVar365 = auVar46._10_2_ + sVar365;
        sVar368 = auVar46._12_2_ + sVar368;
        sVar371 = auVar46._14_2_ + sVar371;
        uVar32 = (sVar341 < (short)uVar453) * uVar453 |
                 (ushort)(sVar341 >= (short)uVar453) * sVar341;
        uVar47 = (sVar355 < (short)uVar457) * uVar457 |
                 (ushort)(sVar355 >= (short)uVar457) * sVar355;
        uVar50 = (sVar357 < (short)uVar463) * uVar463 |
                 (ushort)(sVar357 >= (short)uVar463) * sVar357;
        uVar53 = (sVar359 < (short)uVar70) * uVar70 | (ushort)(sVar359 >= (short)uVar70) * sVar359;
        uVar448 = (sVar362 < (short)uVar455) * uVar455 |
                  (ushort)(sVar362 >= (short)uVar455) * sVar362;
        uVar56 = (sVar365 < (short)uVar459) * uVar459 |
                 (ushort)(sVar365 >= (short)uVar459) * sVar365;
        uVar60 = (sVar368 < (short)uVar461) * uVar461 |
                 (ushort)(sVar368 >= (short)uVar461) * sVar368;
        uVar65 = (sVar371 < (short)uVar465) * uVar465 |
                 (ushort)(sVar371 >= (short)uVar465) * sVar371;
        uVar32 = ((short)in_XMM5._0_2_ < (short)uVar32) * in_XMM5._0_2_ |
                 ((short)in_XMM5._0_2_ >= (short)uVar32) * uVar32;
        uVar47 = ((short)in_XMM5._2_2_ < (short)uVar47) * in_XMM5._2_2_ |
                 ((short)in_XMM5._2_2_ >= (short)uVar47) * uVar47;
        uVar50 = ((short)in_XMM5._4_2_ < (short)uVar50) * in_XMM5._4_2_ |
                 ((short)in_XMM5._4_2_ >= (short)uVar50) * uVar50;
        uVar53 = ((short)in_XMM5._6_2_ < (short)uVar53) * in_XMM5._6_2_ |
                 ((short)in_XMM5._6_2_ >= (short)uVar53) * uVar53;
        uVar448 = ((short)in_XMM5._8_2_ < (short)uVar448) * in_XMM5._8_2_ |
                  ((short)in_XMM5._8_2_ >= (short)uVar448) * uVar448;
        uVar56 = ((short)in_XMM5._10_2_ < (short)uVar56) * in_XMM5._10_2_ |
                 ((short)in_XMM5._10_2_ >= (short)uVar56) * uVar56;
        uVar60 = ((short)in_XMM5._12_2_ < (short)uVar60) * in_XMM5._12_2_ |
                 ((short)in_XMM5._12_2_ >= (short)uVar60) * uVar60;
        uVar65 = ((short)in_XMM5._14_2_ < (short)uVar65) * in_XMM5._14_2_ |
                 ((short)in_XMM5._14_2_ >= (short)uVar65) * uVar65;
        auVar46 = psraw(auVar422,4);
        sVar415 = auVar46._0_2_ + sVar415;
        sVar340 = auVar46._2_2_ + sVar340;
        sVar423 = auVar46._4_2_ + sVar423;
        sVar354 = auVar46._6_2_ + sVar354;
        sVar424 = auVar46._8_2_ + sVar424;
        sVar356 = auVar46._10_2_ + sVar356;
        sVar425 = auVar46._12_2_ + sVar425;
        sVar358 = auVar46._14_2_ + sVar358;
        uVar453 = (sVar415 < (short)in_XMM4._0_2_) * in_XMM4._0_2_ |
                  (ushort)(sVar415 >= (short)in_XMM4._0_2_) * sVar415;
        uVar70 = (sVar340 < (short)in_XMM4._2_2_) * in_XMM4._2_2_ |
                 (ushort)(sVar340 >= (short)in_XMM4._2_2_) * sVar340;
        uVar455 = (sVar423 < (short)in_XMM4._4_2_) * in_XMM4._4_2_ |
                  (ushort)(sVar423 >= (short)in_XMM4._4_2_) * sVar423;
        uVar457 = (sVar354 < (short)in_XMM4._6_2_) * in_XMM4._6_2_ |
                  (ushort)(sVar354 >= (short)in_XMM4._6_2_) * sVar354;
        uVar459 = (sVar424 < (short)in_XMM4._8_2_) * in_XMM4._8_2_ |
                  (ushort)(sVar424 >= (short)in_XMM4._8_2_) * sVar424;
        uVar461 = (sVar356 < (short)in_XMM4._10_2_) * in_XMM4._10_2_ |
                  (ushort)(sVar356 >= (short)in_XMM4._10_2_) * sVar356;
        uVar463 = (sVar425 < (short)in_XMM4._12_2_) * in_XMM4._12_2_ |
                  (ushort)(sVar425 >= (short)in_XMM4._12_2_) * sVar425;
        uVar465 = (sVar358 < (short)in_XMM4._14_2_) * in_XMM4._14_2_ |
                  (ushort)(sVar358 >= (short)in_XMM4._14_2_) * sVar358;
        uVar453 = ((short)uVar247 < (short)uVar453) * uVar247 |
                  ((short)uVar247 >= (short)uVar453) * uVar453;
        uVar70 = ((short)uVar146 < (short)uVar70) * uVar146 |
                 ((short)uVar146 >= (short)uVar70) * uVar70;
        uVar455 = ((short)uVar160 < (short)uVar455) * uVar160 |
                  ((short)uVar160 >= (short)uVar455) * uVar455;
        uVar457 = ((short)uVar174 < (short)uVar457) * uVar174 |
                  ((short)uVar174 >= (short)uVar457) * uVar457;
        uVar459 = ((short)uVar190 < (short)uVar459) * uVar190 |
                  ((short)uVar190 >= (short)uVar459) * uVar459;
        uVar461 = ((short)uVar214 < (short)uVar461) * uVar214 |
                  ((short)uVar214 >= (short)uVar461) * uVar461;
        uVar463 = ((short)uVar235 < (short)uVar463) * uVar235 |
                  ((short)uVar235 >= (short)uVar463) * uVar463;
        uVar465 = ((short)uVar237 < (short)uVar465) * uVar237 |
                  ((short)uVar237 >= (short)uVar465) * uVar465;
        *(char *)((long)dest + 0xc) =
             (0 < (short)uVar448) * ((short)uVar448 < 0x100) * (char)uVar448 -
             (0xff < (short)uVar448);
        *(char *)((long)dest + 0xd) =
             (0 < (short)uVar56) * ((short)uVar56 < 0x100) * (char)uVar56 - (0xff < (short)uVar56);
        *(char *)((long)dest + 0xe) =
             (0 < (short)uVar60) * ((short)uVar60 < 0x100) * (char)uVar60 - (0xff < (short)uVar60);
        *(char *)((long)dest + 0xf) =
             (0 < (short)uVar65) * ((short)uVar65 < 0x100) * (char)uVar65 - (0xff < (short)uVar65);
        *(char *)((long)dest + lVar21 + 8) =
             (0 < (short)uVar32) * ((short)uVar32 < 0x100) * (char)uVar32 - (0xff < (short)uVar32);
        *(char *)((long)dest + lVar21 + 9) =
             (0 < (short)uVar47) * ((short)uVar47 < 0x100) * (char)uVar47 - (0xff < (short)uVar47);
        *(char *)((long)dest + lVar21 + 10) =
             (0 < (short)uVar50) * ((short)uVar50 < 0x100) * (char)uVar50 - (0xff < (short)uVar50);
        *(char *)((long)dest + lVar21 + 0xb) =
             (0 < (short)uVar53) * ((short)uVar53 < 0x100) * (char)uVar53 - (0xff < (short)uVar53);
        *(char *)((long)dest + lVar21 * 2 + 4) =
             (0 < (short)uVar459) * ((short)uVar459 < 0x100) * (char)uVar459 -
             (0xff < (short)uVar459);
        *(char *)((long)dest + lVar21 * 2 + 5) =
             (0 < (short)uVar461) * ((short)uVar461 < 0x100) * (char)uVar461 -
             (0xff < (short)uVar461);
        *(char *)((long)dest + lVar21 * 2 + 6) =
             (0 < (short)uVar463) * ((short)uVar463 < 0x100) * (char)uVar463 -
             (0xff < (short)uVar463);
        *(char *)((long)dest + lVar21 * 2 + 7) =
             (0 < (short)uVar465) * ((short)uVar465 < 0x100) * (char)uVar465 -
             (0xff < (short)uVar465);
        pcVar1 = (char *)((long)dest + lVar21 * 3);
        *pcVar1 = (0 < (short)uVar453) * ((short)uVar453 < 0x100) * (char)uVar453 -
                  (0xff < (short)uVar453);
        pcVar1[1] = (0 < (short)uVar70) * ((short)uVar70 < 0x100) * (char)uVar70 -
                    (0xff < (short)uVar70);
        pcVar1[2] = (0 < (short)uVar455) * ((short)uVar455 < 0x100) * (char)uVar455 -
                    (0xff < (short)uVar455);
        pcVar1[3] = (0 < (short)uVar457) * ((short)uVar457 < 0x100) * (char)uVar457 -
                    (0xff < (short)uVar457);
        uVar20 = uVar20 + 4;
        in = in + 0x240;
        dest = (void *)((long)dest + lVar21 * 4);
      } while (uVar20 < (uint)block_height);
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_8_0)(void *dest, int dstride, const uint16_t *in,
                                int pri_strength, int sec_strength, int dir,
                                int pri_damping, int sec_damping,
                                int coeff_shift, int block_width,
                                int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/1, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/1);
  } else {
    filter_block_4x4(/*is_lowbd=*/1, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/1);
  }
}